

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryop_x86_avx2.cpp
# Opt level: O3

int __thiscall
ncnn::BinaryOp_x86_avx2::forward
          (BinaryOp_x86_avx2 *this,vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_blobs,
          vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *top_blobs,Option *opt)

{
  pointer pMVar1;
  float *pfVar2;
  undefined8 *puVar3;
  undefined4 uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  pointer pMVar9;
  Mat *this_00;
  _func_int *p_Var10;
  size_t sVar11;
  void *pvVar12;
  size_t sVar13;
  size_t sVar14;
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  float fVar31;
  float fVar32;
  float fVar33;
  float fVar34;
  float fVar35;
  float fVar36;
  float fVar37;
  float fVar38;
  float fVar39;
  float fVar40;
  float fVar41;
  float fVar42;
  float fVar43;
  void *pvVar44;
  int iVar45;
  ulong uVar46;
  ulong uVar47;
  ulong uVar48;
  undefined1 (*pauVar49) [32];
  undefined1 (*pauVar50) [16];
  __m256 *pafVar51;
  undefined1 (*pauVar52) [32];
  undefined1 (*pauVar53) [16];
  undefined1 (*pauVar54) [32];
  undefined1 (*pauVar55) [16];
  void *pvVar56;
  float *pfVar57;
  float *pfVar58;
  int iVar59;
  long lVar60;
  long lVar61;
  ulong uVar62;
  void *pvVar63;
  uint uVar64;
  uint uVar65;
  uint uVar66;
  ulong uVar67;
  undefined8 *puVar68;
  __m256 *pafVar69;
  __m256 *pafVar70;
  size_t sVar71;
  int iVar72;
  long lVar73;
  bool bVar74;
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined8 uVar201;
  undefined1 auVar134 [32];
  undefined8 uVar198;
  undefined1 auVar75 [16];
  undefined8 uVar199;
  undefined8 uVar202;
  undefined1 auVar135 [32];
  undefined1 auVar136 [32];
  undefined1 auVar137 [32];
  undefined1 auVar138 [32];
  undefined1 auVar139 [32];
  undefined1 auVar140 [32];
  undefined1 auVar141 [32];
  undefined1 auVar142 [32];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar143 [32];
  undefined1 auVar144 [32];
  undefined1 auVar145 [32];
  undefined1 auVar146 [32];
  undefined1 auVar147 [32];
  undefined1 auVar148 [32];
  undefined1 auVar149 [32];
  undefined1 auVar150 [32];
  undefined1 auVar151 [32];
  undefined1 auVar152 [32];
  undefined1 auVar153 [32];
  undefined1 auVar154 [32];
  undefined1 auVar155 [32];
  undefined1 auVar156 [32];
  undefined1 auVar157 [32];
  undefined1 auVar158 [32];
  undefined1 auVar159 [32];
  undefined1 auVar160 [32];
  undefined1 auVar161 [32];
  undefined1 auVar162 [32];
  undefined1 auVar163 [32];
  undefined1 auVar164 [32];
  undefined1 auVar165 [32];
  undefined1 auVar166 [32];
  undefined1 auVar167 [32];
  undefined1 auVar168 [32];
  undefined1 auVar169 [32];
  undefined1 auVar170 [32];
  undefined1 auVar171 [32];
  undefined1 auVar172 [32];
  undefined1 auVar173 [32];
  undefined1 auVar174 [32];
  undefined1 auVar175 [32];
  undefined1 auVar117 [16];
  undefined1 auVar176 [32];
  undefined1 auVar177 [32];
  undefined1 auVar178 [32];
  undefined1 auVar179 [32];
  undefined1 auVar180 [32];
  undefined1 auVar181 [32];
  undefined1 auVar182 [32];
  undefined1 auVar183 [32];
  undefined1 auVar128 [16];
  undefined1 auVar184 [32];
  undefined1 auVar186 [32];
  undefined1 auVar200 [56];
  undefined1 auVar187 [64];
  undefined1 auVar188 [64];
  undefined1 auVar189 [64];
  undefined1 auVar190 [64];
  undefined1 auVar191 [64];
  undefined1 auVar192 [64];
  undefined1 auVar193 [64];
  undefined1 auVar194 [64];
  undefined1 auVar195 [64];
  __m256 afVar185;
  undefined1 auVar196 [64];
  undefined1 auVar197 [64];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  float fVar203;
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  undefined1 auVar233 [32];
  undefined1 auVar234 [32];
  undefined1 auVar235 [32];
  undefined1 auVar236 [32];
  undefined1 auVar237 [32];
  undefined1 auVar238 [32];
  undefined1 auVar239 [32];
  undefined1 auVar240 [32];
  undefined1 auVar241 [32];
  undefined1 auVar242 [32];
  undefined1 auVar243 [32];
  undefined1 auVar244 [32];
  undefined1 auVar245 [32];
  undefined1 in_ZMM1 [64];
  undefined1 auVar246 [64];
  undefined1 auVar247 [64];
  undefined1 auVar248 [64];
  undefined1 auVar249 [64];
  undefined1 auVar250 [64];
  undefined1 auVar251 [64];
  undefined1 auVar252 [64];
  undefined1 auVar253 [64];
  undefined1 auVar254 [64];
  undefined1 auVar255 [64];
  undefined1 auVar256 [64];
  undefined1 auVar257 [64];
  undefined1 auVar258 [64];
  undefined1 auVar259 [64];
  undefined1 auVar260 [64];
  undefined1 auVar261 [64];
  undefined1 auVar262 [64];
  undefined1 auVar263 [64];
  undefined1 auVar264 [64];
  undefined1 auVar265 [64];
  undefined1 auVar266 [64];
  undefined1 auVar267 [64];
  undefined1 auVar268 [16];
  undefined1 auVar269 [32];
  undefined1 auVar270 [32];
  undefined1 auVar272 [16];
  undefined1 auVar273 [16];
  undefined1 auVar274 [16];
  undefined1 auVar275 [16];
  undefined1 auVar276 [16];
  undefined1 auVar277 [16];
  undefined1 auVar299 [32];
  undefined1 auVar271 [16];
  undefined1 auVar278 [16];
  undefined1 auVar279 [16];
  undefined1 auVar280 [16];
  undefined1 auVar281 [16];
  undefined1 auVar282 [16];
  undefined1 auVar283 [16];
  undefined1 auVar284 [16];
  undefined1 auVar285 [16];
  undefined1 auVar286 [16];
  undefined1 auVar287 [16];
  undefined1 auVar288 [16];
  undefined1 auVar289 [16];
  undefined1 auVar290 [16];
  undefined1 auVar291 [16];
  undefined1 auVar292 [16];
  undefined1 auVar293 [16];
  undefined1 auVar294 [16];
  undefined1 auVar295 [16];
  undefined1 auVar296 [16];
  undefined1 auVar297 [16];
  undefined1 auVar298 [16];
  undefined1 in_ZMM3 [64];
  undefined1 auVar300 [64];
  undefined1 auVar301 [64];
  undefined1 auVar302 [64];
  undefined1 auVar303 [64];
  undefined1 auVar304 [64];
  undefined1 auVar305 [64];
  undefined1 auVar306 [64];
  undefined1 auVar308 [64];
  undefined1 auVar309 [64];
  undefined1 auVar310 [64];
  undefined1 auVar311 [64];
  undefined1 auVar312 [64];
  undefined1 auVar313 [64];
  undefined1 auVar314 [64];
  undefined1 auVar315 [64];
  undefined1 auVar316 [64];
  undefined1 auVar317 [64];
  undefined1 auVar318 [64];
  undefined1 auVar319 [64];
  undefined1 auVar320 [64];
  undefined1 auVar321 [64];
  undefined1 auVar322 [64];
  undefined1 auVar323 [64];
  undefined1 auVar324 [64];
  undefined1 auVar325 [64];
  undefined1 auVar326 [64];
  undefined1 auVar327 [64];
  __m128 afVar328;
  binary_op_pow_pack8 op;
  Mat m;
  __m256 _p;
  __m256 *local_158;
  ulong local_150;
  binary_op_pow_pack8 local_139;
  ulong local_138;
  void *local_130;
  ulong local_128;
  Mat *local_120;
  int local_114;
  size_t local_110;
  int local_104;
  undefined1 local_100 [8];
  float fStack_f8;
  float fStack_f4;
  undefined8 uStack_f0;
  float fStack_e8;
  float fStack_e4;
  Allocator *local_e0;
  uint local_d8;
  int local_d4;
  int local_d0;
  int local_cc;
  int local_c8;
  size_t local_c0;
  pointer local_a0;
  ulong local_98;
  size_t local_90;
  bool local_81;
  __m256 local_80;
  size_t local_60;
  undefined1 auVar307 [64];
  
  pMVar9 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pMVar1 = pMVar9 + 1;
  this_00 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
            super__Vector_impl_data._M_start;
  iVar45 = pMVar9->elempack;
  uVar66 = pMVar9[1].elempack;
  uVar4 = local_128._4_4_;
  local_120 = this_00;
  local_114 = iVar45;
  local_a0 = pMVar9;
  if (uVar66 == 8 || iVar45 == 8) {
    switch(*(undefined4 *)(&this->field_0xd0 + (long)this->_vptr_BinaryOp_x86_avx2[-3])) {
    case 0:
      uVar64 = pMVar9->w;
      uVar47 = (ulong)uVar64;
      sVar71 = pMVar9->elemsize;
      uVar65 = pMVar9[1].w;
      uVar5 = pMVar9[1].h;
      uVar6 = pMVar9[1].c;
      local_130 = (void *)(ulong)uVar6;
      iVar72 = uVar5 * uVar65;
      sVar11 = pMVar9[1].elemsize;
      iVar59 = pMVar9->dims;
      if (iVar59 == 1) {
        iVar59 = pMVar9[1].dims;
        if (iVar45 != 1 || uVar64 != 1) {
          if (iVar59 == 1) {
            Mat::create(this_00,uVar64,sVar71,iVar45,opt->blob_allocator);
            pvVar12 = this_00->data;
            if (pvVar12 == (void *)0x0) {
              return -100;
            }
            if ((long)this_00->c * this_00->cstep == 0) {
              return -100;
            }
            if (uVar66 != 1 || pMVar9[1].w != 1) {
              if (0 < (int)uVar64) {
                pvVar56 = pMVar9->data;
                pvVar63 = pMVar9[1].data;
                lVar60 = 0;
                do {
                  pfVar57 = (float *)((long)pvVar63 + lVar60);
                  fVar203 = pfVar57[1];
                  fVar31 = pfVar57[2];
                  fVar32 = pfVar57[3];
                  fVar33 = pfVar57[4];
                  fVar34 = pfVar57[5];
                  fVar35 = pfVar57[6];
                  fVar36 = pfVar57[7];
                  pfVar58 = (float *)((long)pvVar56 + lVar60);
                  fVar37 = pfVar58[1];
                  fVar38 = pfVar58[2];
                  fVar39 = pfVar58[3];
                  fVar40 = pfVar58[4];
                  fVar41 = pfVar58[5];
                  fVar42 = pfVar58[6];
                  fVar43 = pfVar58[7];
                  pfVar2 = (float *)((long)pvVar12 + lVar60);
                  *pfVar2 = *pfVar57 + *pfVar58;
                  pfVar2[1] = fVar203 + fVar37;
                  pfVar2[2] = fVar31 + fVar38;
                  pfVar2[3] = fVar32 + fVar39;
                  pfVar2[4] = fVar33 + fVar40;
                  pfVar2[5] = fVar34 + fVar41;
                  pfVar2[6] = fVar35 + fVar42;
                  pfVar2[7] = fVar36 + fVar43;
                  lVar60 = lVar60 + 0x20;
                  uVar66 = (int)uVar47 - 1;
                  uVar47 = (ulong)uVar66;
                } while (uVar66 != 0);
                return 0;
              }
              return 0;
            }
            if (0 < (int)uVar64) {
              fVar203 = *pMVar1->data;
              pvVar56 = pMVar9->data;
              lVar60 = 0;
              do {
                pfVar57 = (float *)((long)pvVar56 + lVar60);
                fVar31 = pfVar57[1];
                fVar32 = pfVar57[2];
                fVar33 = pfVar57[3];
                fVar34 = pfVar57[4];
                fVar35 = pfVar57[5];
                fVar36 = pfVar57[6];
                fVar37 = pfVar57[7];
                pfVar58 = (float *)((long)pvVar12 + lVar60);
                *pfVar58 = fVar203 + *pfVar57;
                pfVar58[1] = fVar203 + fVar31;
                pfVar58[2] = fVar203 + fVar32;
                pfVar58[3] = fVar203 + fVar33;
                pfVar58[4] = fVar203 + fVar34;
                pfVar58[5] = fVar203 + fVar35;
                pfVar58[6] = fVar203 + fVar36;
                pfVar58[7] = fVar203 + fVar37;
                lVar60 = lVar60 + 0x20;
                uVar66 = (int)uVar47 - 1;
                uVar47 = (ulong)uVar66;
              } while (uVar66 != 0);
              return 0;
            }
            return 0;
          }
          if (iVar59 == 2) {
            Mat::create(this_00,uVar65,uVar5,sVar11,uVar66,opt->blob_allocator);
            pauVar49 = (undefined1 (*) [32])this_00->data;
            if (pauVar49 == (undefined1 (*) [32])0x0) {
              return -100;
            }
            if ((long)this_00->c * this_00->cstep != 0) {
              if (0 < (int)uVar5) {
                pauVar54 = (undefined1 (*) [32])pMVar9->data;
                pfVar57 = (float *)pMVar9[1].data;
                uVar66 = 0;
                do {
                  if (0 < (int)uVar65) {
                    auVar163 = *pauVar54;
                    uVar64 = uVar65;
                    do {
                      auVar239._0_4_ = auVar163._0_4_ + *pfVar57;
                      auVar239._4_4_ = auVar163._4_4_ + pfVar57[1];
                      auVar239._8_4_ = auVar163._8_4_ + pfVar57[2];
                      auVar239._12_4_ = auVar163._12_4_ + pfVar57[3];
                      auVar239._16_4_ = auVar163._16_4_ + pfVar57[4];
                      auVar239._20_4_ = auVar163._20_4_ + pfVar57[5];
                      auVar239._24_4_ = auVar163._24_4_ + pfVar57[6];
                      auVar239._28_4_ = auVar163._28_4_ + pfVar57[7];
                      *pauVar49 = auVar239;
                      pfVar57 = pfVar57 + 8;
                      pauVar49 = pauVar49 + 1;
                      uVar64 = uVar64 - 1;
                    } while (uVar64 != 0);
                  }
                  pauVar54 = pauVar54 + 1;
                  uVar66 = uVar66 + 1;
                } while (uVar66 != uVar5);
                return 0;
              }
              return 0;
            }
            return -100;
          }
          if (iVar59 != 3) {
            return 0;
          }
          Mat::create(this_00,uVar65,uVar5,uVar6,sVar11,uVar66,opt->blob_allocator);
          if (this_00->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep == 0) {
            return -100;
          }
          if (0 < (int)local_130) {
            uVar47 = 0;
            do {
              if (0 < iVar72) {
                sVar71 = this_00->cstep;
                sVar11 = this_00->elemsize;
                auVar163 = *(undefined1 (*) [32])((long)pMVar9->data + uVar47 * 0x20);
                pvVar12 = this_00->data;
                sVar13 = pMVar9[1].cstep;
                sVar14 = pMVar9[1].elemsize;
                pvVar56 = pMVar9[1].data;
                lVar60 = 0;
                iVar45 = iVar72;
                do {
                  pfVar57 = (float *)((long)pvVar56 + lVar60 + sVar13 * sVar14 * uVar47);
                  auVar236._0_4_ = auVar163._0_4_ + *pfVar57;
                  auVar236._4_4_ = auVar163._4_4_ + pfVar57[1];
                  auVar236._8_4_ = auVar163._8_4_ + pfVar57[2];
                  auVar236._12_4_ = auVar163._12_4_ + pfVar57[3];
                  auVar236._16_4_ = auVar163._16_4_ + pfVar57[4];
                  auVar236._20_4_ = auVar163._20_4_ + pfVar57[5];
                  auVar236._24_4_ = auVar163._24_4_ + pfVar57[6];
                  auVar236._28_4_ = auVar163._28_4_ + pfVar57[7];
                  *(undefined1 (*) [32])((long)pvVar12 + lVar60 + sVar71 * sVar11 * uVar47) =
                       auVar236;
                  lVar60 = lVar60 + 0x20;
                  iVar45 = iVar45 + -1;
                } while (iVar45 != 0);
              }
              uVar47 = uVar47 + 1;
            } while ((void *)uVar47 != local_130);
            return 0;
          }
          return 0;
        }
        if (iVar59 == 1) {
          Mat::create(this_00,uVar65,sVar11,uVar66,opt->blob_allocator);
          pvVar12 = this_00->data;
          if (pvVar12 == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep != 0) {
            if (0 < (int)uVar65) {
              fVar203 = *pMVar9->data;
              pvVar56 = pMVar1->data;
              lVar60 = 0;
              do {
                pfVar57 = (float *)((long)pvVar56 + lVar60);
                fVar31 = pfVar57[1];
                fVar32 = pfVar57[2];
                fVar33 = pfVar57[3];
                fVar34 = pfVar57[4];
                fVar35 = pfVar57[5];
                fVar36 = pfVar57[6];
                fVar37 = pfVar57[7];
                pfVar58 = (float *)((long)pvVar12 + lVar60);
                *pfVar58 = fVar203 + *pfVar57;
                pfVar58[1] = fVar203 + fVar31;
                pfVar58[2] = fVar203 + fVar32;
                pfVar58[3] = fVar203 + fVar33;
                pfVar58[4] = fVar203 + fVar34;
                pfVar58[5] = fVar203 + fVar35;
                pfVar58[6] = fVar203 + fVar36;
                pfVar58[7] = fVar203 + fVar37;
                lVar60 = lVar60 + 0x20;
                uVar65 = uVar65 - 1;
              } while (uVar65 != 0);
              return 0;
            }
            return 0;
          }
          return -100;
        }
        if (iVar59 == 2) {
          Mat::create(this_00,uVar65,uVar5,sVar11,uVar66,opt->blob_allocator);
          pvVar12 = this_00->data;
          if (pvVar12 == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep != 0) {
            if (0 < iVar72) {
              fVar203 = *pMVar9->data;
              pvVar56 = pMVar1->data;
              lVar60 = 0;
              do {
                pfVar57 = (float *)((long)pvVar56 + lVar60);
                fVar31 = pfVar57[1];
                fVar32 = pfVar57[2];
                fVar33 = pfVar57[3];
                fVar34 = pfVar57[4];
                fVar35 = pfVar57[5];
                fVar36 = pfVar57[6];
                fVar37 = pfVar57[7];
                pfVar58 = (float *)((long)pvVar12 + lVar60);
                *pfVar58 = fVar203 + *pfVar57;
                pfVar58[1] = fVar203 + fVar31;
                pfVar58[2] = fVar203 + fVar32;
                pfVar58[3] = fVar203 + fVar33;
                pfVar58[4] = fVar203 + fVar34;
                pfVar58[5] = fVar203 + fVar35;
                pfVar58[6] = fVar203 + fVar36;
                pfVar58[7] = fVar203 + fVar37;
                lVar60 = lVar60 + 0x20;
                iVar72 = iVar72 + -1;
              } while (iVar72 != 0);
              return 0;
            }
            return 0;
          }
          return -100;
        }
        if (iVar59 != 3) {
          return 0;
        }
        Mat::create(this_00,uVar65,uVar5,uVar6,sVar11,uVar66,opt->blob_allocator);
        if (this_00->data == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep == 0) {
          return -100;
        }
        if (0 < (int)local_130) {
          fVar203 = *pMVar9->data;
          uVar47 = 0;
          do {
            if (0 < iVar72) {
              sVar71 = this_00->cstep;
              sVar11 = this_00->elemsize;
              pvVar12 = this_00->data;
              sVar13 = pMVar9[1].cstep;
              sVar14 = pMVar9[1].elemsize;
              pvVar56 = pMVar9[1].data;
              lVar60 = 0;
              iVar45 = iVar72;
              do {
                pfVar57 = (float *)((long)pvVar56 + lVar60 + sVar13 * sVar14 * uVar47);
                auVar235._0_4_ = fVar203 + *pfVar57;
                auVar235._4_4_ = fVar203 + pfVar57[1];
                auVar235._8_4_ = fVar203 + pfVar57[2];
                auVar235._12_4_ = fVar203 + pfVar57[3];
                auVar235._16_4_ = fVar203 + pfVar57[4];
                auVar235._20_4_ = fVar203 + pfVar57[5];
                auVar235._24_4_ = fVar203 + pfVar57[6];
                auVar235._28_4_ = fVar203 + pfVar57[7];
                *(undefined1 (*) [32])((long)pvVar12 + lVar60 + sVar71 * sVar11 * uVar47) = auVar235
                ;
                lVar60 = lVar60 + 0x20;
                iVar45 = iVar45 + -1;
              } while (iVar45 != 0);
            }
            uVar47 = uVar47 + 1;
          } while ((void *)uVar47 != local_130);
          return 0;
        }
        return 0;
      }
      uVar7 = pMVar9->h;
      local_138 = CONCAT44(local_138._4_4_,uVar7 * uVar64);
      if (iVar59 == 2) {
        if (pMVar9[1].dims == 3) {
          Mat::create(this_00,uVar65,uVar5,uVar6,sVar11,uVar66,opt->blob_allocator);
          if (this_00->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep != 0) {
            if (0 < (int)local_130) {
              uVar47 = 0;
              do {
                if (0 < (int)uVar5) {
                  pauVar49 = (undefined1 (*) [32])
                             (this_00->cstep * uVar47 * this_00->elemsize + (long)this_00->data);
                  pfVar57 = (float *)(pMVar9[1].cstep * uVar47 * pMVar9[1].elemsize +
                                     (long)pMVar9[1].data);
                  pauVar54 = (undefined1 (*) [32])
                             ((long)pMVar9->w * uVar47 * pMVar9->elemsize + (long)pMVar9->data);
                  uVar66 = 0;
                  do {
                    if (0 < (int)uVar65) {
                      auVar163 = *pauVar54;
                      uVar64 = uVar65;
                      do {
                        auVar234._0_4_ = auVar163._0_4_ + *pfVar57;
                        auVar234._4_4_ = auVar163._4_4_ + pfVar57[1];
                        auVar234._8_4_ = auVar163._8_4_ + pfVar57[2];
                        auVar234._12_4_ = auVar163._12_4_ + pfVar57[3];
                        auVar234._16_4_ = auVar163._16_4_ + pfVar57[4];
                        auVar234._20_4_ = auVar163._20_4_ + pfVar57[5];
                        auVar234._24_4_ = auVar163._24_4_ + pfVar57[6];
                        auVar234._28_4_ = auVar163._28_4_ + pfVar57[7];
                        *pauVar49 = auVar234;
                        pfVar57 = pfVar57 + 8;
                        pauVar49 = pauVar49 + 1;
                        uVar64 = uVar64 - 1;
                      } while (uVar64 != 0);
                    }
                    pauVar54 = pauVar54 + 1;
                    uVar66 = uVar66 + 1;
                  } while (uVar66 != uVar5);
                }
                uVar47 = uVar47 + 1;
              } while ((void *)uVar47 != local_130);
              return 0;
            }
            return 0;
          }
          return -100;
        }
        local_128 = CONCAT44(uVar4,uVar66);
        Mat::create(this_00,uVar64,uVar7,sVar71,iVar45,opt->blob_allocator);
        pvVar12 = this_00->data;
        if (pvVar12 == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep == 0) {
          return -100;
        }
        if (pMVar9[1].dims != 1) {
          if (pMVar9[1].dims != 2) {
            return 0;
          }
          if (0 < (int)local_138) {
            pvVar56 = pMVar9->data;
            pvVar63 = pMVar9[1].data;
            lVar60 = 0;
            do {
              pfVar57 = (float *)((long)pvVar63 + lVar60);
              fVar203 = pfVar57[1];
              fVar31 = pfVar57[2];
              fVar32 = pfVar57[3];
              fVar33 = pfVar57[4];
              fVar34 = pfVar57[5];
              fVar35 = pfVar57[6];
              fVar36 = pfVar57[7];
              pfVar58 = (float *)((long)pvVar56 + lVar60);
              fVar37 = pfVar58[1];
              fVar38 = pfVar58[2];
              fVar39 = pfVar58[3];
              fVar40 = pfVar58[4];
              fVar41 = pfVar58[5];
              fVar42 = pfVar58[6];
              fVar43 = pfVar58[7];
              pfVar2 = (float *)((long)pvVar12 + lVar60);
              *pfVar2 = *pfVar57 + *pfVar58;
              pfVar2[1] = fVar203 + fVar37;
              pfVar2[2] = fVar31 + fVar38;
              pfVar2[3] = fVar32 + fVar39;
              pfVar2[4] = fVar33 + fVar40;
              pfVar2[5] = fVar34 + fVar41;
              pfVar2[6] = fVar35 + fVar42;
              pfVar2[7] = fVar36 + fVar43;
              lVar60 = lVar60 + 0x20;
              local_138._0_4_ = (int)local_138 + -1;
            } while ((int)local_138 != 0);
            return 0;
          }
          return 0;
        }
        Mat::create(this_00,uVar64,uVar7,sVar71,iVar45,opt->blob_allocator);
        pauVar49 = (undefined1 (*) [32])this_00->data;
        if (pauVar49 == (undefined1 (*) [32])0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep != 0) {
          if ((int)local_128 != 1 || pMVar9[1].w != 1) {
            if (0 < (int)uVar7) {
              pfVar57 = (float *)pMVar9->data;
              pauVar54 = (undefined1 (*) [32])pMVar9[1].data;
              uVar66 = 0;
              do {
                if (0 < (int)uVar64) {
                  auVar163 = *pauVar54;
                  uVar46 = uVar47;
                  do {
                    auVar245._0_4_ = auVar163._0_4_ + *pfVar57;
                    auVar245._4_4_ = auVar163._4_4_ + pfVar57[1];
                    auVar245._8_4_ = auVar163._8_4_ + pfVar57[2];
                    auVar245._12_4_ = auVar163._12_4_ + pfVar57[3];
                    auVar245._16_4_ = auVar163._16_4_ + pfVar57[4];
                    auVar245._20_4_ = auVar163._20_4_ + pfVar57[5];
                    auVar245._24_4_ = auVar163._24_4_ + pfVar57[6];
                    auVar245._28_4_ = auVar163._28_4_ + pfVar57[7];
                    *pauVar49 = auVar245;
                    pfVar57 = pfVar57 + 8;
                    pauVar49 = pauVar49 + 1;
                    uVar65 = (int)uVar46 - 1;
                    uVar46 = (ulong)uVar65;
                  } while (uVar65 != 0);
                }
                pauVar54 = pauVar54 + 1;
                uVar66 = uVar66 + 1;
              } while (uVar66 != uVar7);
              return 0;
            }
            return 0;
          }
          if (0 < (int)local_138) {
            fVar203 = *pMVar1->data;
            pvVar12 = pMVar9->data;
            lVar60 = 0;
            do {
              pfVar57 = (float *)((long)pvVar12 + lVar60);
              fVar31 = pfVar57[1];
              fVar32 = pfVar57[2];
              fVar33 = pfVar57[3];
              fVar34 = pfVar57[4];
              fVar35 = pfVar57[5];
              fVar36 = pfVar57[6];
              fVar37 = pfVar57[7];
              pfVar58 = (float *)((long)*pauVar49 + lVar60);
              *pfVar58 = fVar203 + *pfVar57;
              pfVar58[1] = fVar203 + fVar31;
              pfVar58[2] = fVar203 + fVar32;
              pfVar58[3] = fVar203 + fVar33;
              pfVar58[4] = fVar203 + fVar34;
              pfVar58[5] = fVar203 + fVar35;
              pfVar58[6] = fVar203 + fVar36;
              pfVar58[7] = fVar203 + fVar37;
              lVar60 = lVar60 + 0x20;
              local_138._0_4_ = (int)local_138 + -1;
            } while ((int)local_138 != 0);
            return 0;
          }
          return 0;
        }
        return -100;
      }
      if (iVar59 != 3) {
        return 0;
      }
      uVar8 = pMVar9->c;
      uVar46 = (ulong)uVar8;
      if (pMVar9[1].dims != 3) {
        Mat::create(this_00,uVar64,uVar7,uVar8,sVar71,iVar45,opt->blob_allocator);
        if (this_00->data == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep == 0) {
          return -100;
        }
        if (pMVar9[1].dims == 1) {
          if (uVar66 != 1 || pMVar9[1].w != 1) {
            if (0 < (int)uVar8) {
              uVar47 = 0;
              do {
                if (0 < (int)local_138) {
                  sVar71 = this_00->cstep;
                  sVar11 = this_00->elemsize;
                  auVar163 = *(undefined1 (*) [32])((long)pMVar1->data + uVar47 * 0x20);
                  pvVar12 = this_00->data;
                  sVar13 = pMVar9->cstep;
                  sVar14 = pMVar9->elemsize;
                  pvVar56 = pMVar9->data;
                  lVar60 = 0;
                  iVar45 = (int)local_138;
                  do {
                    pfVar57 = (float *)((long)pvVar56 + lVar60 + sVar13 * sVar14 * uVar47);
                    auVar243._0_4_ = auVar163._0_4_ + *pfVar57;
                    auVar243._4_4_ = auVar163._4_4_ + pfVar57[1];
                    auVar243._8_4_ = auVar163._8_4_ + pfVar57[2];
                    auVar243._12_4_ = auVar163._12_4_ + pfVar57[3];
                    auVar243._16_4_ = auVar163._16_4_ + pfVar57[4];
                    auVar243._20_4_ = auVar163._20_4_ + pfVar57[5];
                    auVar243._24_4_ = auVar163._24_4_ + pfVar57[6];
                    auVar243._28_4_ = auVar163._28_4_ + pfVar57[7];
                    *(undefined1 (*) [32])((long)pvVar12 + lVar60 + sVar71 * sVar11 * uVar47) =
                         auVar243;
                    lVar60 = lVar60 + 0x20;
                    iVar45 = iVar45 + -1;
                  } while (iVar45 != 0);
                }
                uVar47 = uVar47 + 1;
              } while (uVar47 != uVar46);
              return 0;
            }
            return 0;
          }
          if (0 < (int)uVar8) {
            fVar203 = *pMVar1->data;
            uVar47 = 0;
            do {
              if (0 < (int)local_138) {
                sVar71 = this_00->cstep;
                sVar11 = this_00->elemsize;
                pvVar12 = this_00->data;
                sVar13 = pMVar9->cstep;
                sVar14 = pMVar9->elemsize;
                pvVar56 = pMVar9->data;
                lVar60 = 0;
                iVar45 = (int)local_138;
                do {
                  pfVar57 = (float *)((long)pvVar56 + lVar60 + sVar13 * sVar14 * uVar47);
                  auVar241._0_4_ = fVar203 + *pfVar57;
                  auVar241._4_4_ = fVar203 + pfVar57[1];
                  auVar241._8_4_ = fVar203 + pfVar57[2];
                  auVar241._12_4_ = fVar203 + pfVar57[3];
                  auVar241._16_4_ = fVar203 + pfVar57[4];
                  auVar241._20_4_ = fVar203 + pfVar57[5];
                  auVar241._24_4_ = fVar203 + pfVar57[6];
                  auVar241._28_4_ = fVar203 + pfVar57[7];
                  *(undefined1 (*) [32])((long)pvVar12 + lVar60 + sVar71 * sVar11 * uVar47) =
                       auVar241;
                  lVar60 = lVar60 + 0x20;
                  iVar45 = iVar45 + -1;
                } while (iVar45 != 0);
              }
              uVar47 = uVar47 + 1;
            } while (uVar47 != uVar46);
            return 0;
          }
          return 0;
        }
        if (pMVar9[1].dims != 2) {
          return 0;
        }
        if (0 < (int)uVar8) {
          uVar48 = 0;
          do {
            if (0 < (int)uVar7) {
              pauVar49 = (undefined1 (*) [32])
                         (this_00->cstep * uVar48 * this_00->elemsize + (long)this_00->data);
              pauVar54 = (undefined1 (*) [32])
                         ((long)pMVar9[1].w * uVar48 * pMVar9[1].elemsize + (long)pMVar9[1].data);
              pfVar57 = (float *)(pMVar9->cstep * uVar48 * pMVar9->elemsize + (long)pMVar9->data);
              uVar66 = 0;
              do {
                if (0 < (int)uVar64) {
                  auVar163 = *pauVar54;
                  uVar62 = uVar47;
                  do {
                    auVar237._0_4_ = auVar163._0_4_ + *pfVar57;
                    auVar237._4_4_ = auVar163._4_4_ + pfVar57[1];
                    auVar237._8_4_ = auVar163._8_4_ + pfVar57[2];
                    auVar237._12_4_ = auVar163._12_4_ + pfVar57[3];
                    auVar237._16_4_ = auVar163._16_4_ + pfVar57[4];
                    auVar237._20_4_ = auVar163._20_4_ + pfVar57[5];
                    auVar237._24_4_ = auVar163._24_4_ + pfVar57[6];
                    auVar237._28_4_ = auVar163._28_4_ + pfVar57[7];
                    *pauVar49 = auVar237;
                    pfVar57 = pfVar57 + 8;
                    pauVar49 = pauVar49 + 1;
                    uVar65 = (int)uVar62 - 1;
                    uVar62 = (ulong)uVar65;
                  } while (uVar65 != 0);
                }
                pauVar54 = pauVar54 + 1;
                uVar66 = uVar66 + 1;
              } while (uVar66 != uVar7);
            }
            uVar48 = uVar48 + 1;
          } while (uVar48 != uVar46);
          return 0;
        }
        return 0;
      }
      if (uVar8 == uVar6 && ((uVar65 ^ 1) == 0 && (uVar5 ^ 1) == 0)) {
        Mat::create(this_00,uVar64,uVar7,uVar8,sVar71,iVar45,opt->blob_allocator);
        if (this_00->data == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep != 0) {
          if (0 < (int)uVar8) {
            uVar47 = 0;
            do {
              if (0 < (int)local_138) {
                sVar71 = pMVar9->cstep;
                sVar11 = pMVar9->elemsize;
                auVar163 = *(undefined1 (*) [32])
                            ((long)pMVar9[1].data + pMVar9[1].cstep * uVar47 * pMVar9[1].elemsize);
                pvVar12 = pMVar9->data;
                sVar13 = this_00->cstep;
                sVar14 = this_00->elemsize;
                pvVar56 = this_00->data;
                lVar60 = 0;
                iVar45 = (int)local_138;
                do {
                  pfVar57 = (float *)((long)pvVar12 + lVar60 + sVar71 * sVar11 * uVar47);
                  auVar233._0_4_ = auVar163._0_4_ + *pfVar57;
                  auVar233._4_4_ = auVar163._4_4_ + pfVar57[1];
                  auVar233._8_4_ = auVar163._8_4_ + pfVar57[2];
                  auVar233._12_4_ = auVar163._12_4_ + pfVar57[3];
                  auVar233._16_4_ = auVar163._16_4_ + pfVar57[4];
                  auVar233._20_4_ = auVar163._20_4_ + pfVar57[5];
                  auVar233._24_4_ = auVar163._24_4_ + pfVar57[6];
                  auVar233._28_4_ = auVar163._28_4_ + pfVar57[7];
                  *(undefined1 (*) [32])((long)pvVar56 + lVar60 + sVar13 * sVar14 * uVar47) =
                       auVar233;
                  lVar60 = lVar60 + 0x20;
                  iVar45 = iVar45 + -1;
                } while (iVar45 != 0);
              }
              uVar47 = uVar47 + 1;
            } while (uVar47 != uVar46);
            return 0;
          }
          return 0;
        }
        return -100;
      }
      local_110 = sVar71;
      if (uVar65 == uVar64) {
        if (uVar66 == 1 && (uVar6 == 1 && uVar5 == uVar7)) {
          Mat::create(this_00,uVar64,uVar7,uVar8,sVar71,iVar45,opt->blob_allocator);
          if (this_00->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep != 0) {
            if (0 < (int)uVar8) {
              uVar47 = 0;
              do {
                if (0 < (int)local_138) {
                  sVar71 = pMVar9->cstep;
                  sVar11 = pMVar9->elemsize;
                  sVar13 = this_00->cstep;
                  pvVar12 = pMVar9->data;
                  pvVar56 = pMVar9[1].data;
                  sVar14 = this_00->elemsize;
                  pvVar63 = this_00->data;
                  lVar60 = 0;
                  iVar45 = (int)local_138;
                  do {
                    fVar203 = *(float *)((long)pvVar56 + lVar60);
                    pfVar57 = (float *)((long)pvVar12 + lVar60 * 8 + sVar71 * sVar11 * uVar47);
                    auVar145._0_4_ = fVar203 + *pfVar57;
                    auVar145._4_4_ = fVar203 + pfVar57[1];
                    auVar145._8_4_ = fVar203 + pfVar57[2];
                    auVar145._12_4_ = fVar203 + pfVar57[3];
                    auVar145._16_4_ = fVar203 + pfVar57[4];
                    auVar145._20_4_ = fVar203 + pfVar57[5];
                    auVar145._24_4_ = fVar203 + pfVar57[6];
                    auVar145._28_4_ = fVar203 + pfVar57[7];
                    *(undefined1 (*) [32])((long)pvVar63 + lVar60 * 8 + sVar13 * sVar14 * uVar47) =
                         auVar145;
                    lVar60 = lVar60 + 4;
                    iVar45 = iVar45 + -1;
                  } while (iVar45 != 0);
                }
                uVar47 = uVar47 + 1;
              } while (uVar47 != uVar46);
              return 0;
            }
            return 0;
          }
          return -100;
        }
        local_128 = CONCAT71(local_128._1_7_,uVar64 == 1);
        local_104 = CONCAT31(local_104._1_3_,uVar7 == 1);
        if ((uVar64 != 1 || uVar7 != 1) || uVar6 != uVar8) {
          if (((iVar45 == 1) && (uVar5 == uVar7)) && (uVar8 == 1)) {
            Mat::create(this_00,uVar64,uVar7,uVar6,sVar11,uVar66,opt->blob_allocator);
            if (this_00->data == (void *)0x0) {
              return -100;
            }
            if ((long)this_00->c * this_00->cstep != 0) {
              if (0 < (int)local_130) {
                uVar47 = 0;
                do {
                  if (0 < iVar72) {
                    sVar71 = pMVar9[1].cstep;
                    sVar11 = pMVar9[1].elemsize;
                    sVar13 = this_00->cstep;
                    pvVar12 = pMVar9[1].data;
                    pvVar56 = pMVar9->data;
                    sVar14 = this_00->elemsize;
                    pvVar63 = this_00->data;
                    lVar60 = 0;
                    iVar45 = iVar72;
                    do {
                      fVar203 = *(float *)((long)pvVar56 + lVar60);
                      pfVar57 = (float *)((long)pvVar12 + lVar60 * 8 + sVar71 * sVar11 * uVar47);
                      auVar179._0_4_ = fVar203 + *pfVar57;
                      auVar179._4_4_ = fVar203 + pfVar57[1];
                      auVar179._8_4_ = fVar203 + pfVar57[2];
                      auVar179._12_4_ = fVar203 + pfVar57[3];
                      auVar179._16_4_ = fVar203 + pfVar57[4];
                      auVar179._20_4_ = fVar203 + pfVar57[5];
                      auVar179._24_4_ = fVar203 + pfVar57[6];
                      auVar179._28_4_ = fVar203 + pfVar57[7];
                      *(undefined1 (*) [32])((long)pvVar63 + lVar60 * 8 + sVar13 * sVar14 * uVar47)
                           = auVar179;
                      lVar60 = lVar60 + 4;
                      iVar45 = iVar45 + -1;
                    } while (iVar45 != 0);
                  }
                  uVar47 = uVar47 + 1;
                } while ((void *)uVar47 != local_130);
                return 0;
              }
              return 0;
            }
            return -100;
          }
LAB_00246790:
          if ((((uVar65 ^ 1) == 0 && uVar5 == uVar7) && uVar8 == uVar6) && uVar64 != 1) {
            Mat::create(this_00,uVar64,uVar7,uVar8,sVar71,iVar45,opt->blob_allocator);
            if (this_00->data == (void *)0x0) {
              return -100;
            }
            if ((long)this_00->c * this_00->cstep != 0) {
              if (0 < (int)uVar8) {
                uVar48 = 0;
                do {
                  if (0 < (int)uVar7) {
                    sVar71 = pMVar9[1].cstep;
                    sVar11 = pMVar9[1].elemsize;
                    pvVar12 = pMVar9[1].data;
                    pauVar49 = (undefined1 (*) [32])
                               (this_00->cstep * uVar48 * this_00->elemsize + (long)this_00->data);
                    pfVar57 = (float *)(pMVar9->cstep * uVar48 * pMVar9->elemsize +
                                       (long)pMVar9->data);
                    uVar62 = 0;
                    do {
                      if (0 < (int)uVar64) {
                        auVar163 = *(undefined1 (*) [32])
                                    ((long)pvVar12 + uVar62 * 0x20 + sVar71 * uVar48 * sVar11);
                        uVar67 = uVar47;
                        do {
                          auVar240._0_4_ = auVar163._0_4_ + *pfVar57;
                          auVar240._4_4_ = auVar163._4_4_ + pfVar57[1];
                          auVar240._8_4_ = auVar163._8_4_ + pfVar57[2];
                          auVar240._12_4_ = auVar163._12_4_ + pfVar57[3];
                          auVar240._16_4_ = auVar163._16_4_ + pfVar57[4];
                          auVar240._20_4_ = auVar163._20_4_ + pfVar57[5];
                          auVar240._24_4_ = auVar163._24_4_ + pfVar57[6];
                          auVar240._28_4_ = auVar163._28_4_ + pfVar57[7];
                          *pauVar49 = auVar240;
                          pfVar57 = pfVar57 + 8;
                          pauVar49 = pauVar49 + 1;
                          uVar66 = (int)uVar67 - 1;
                          uVar67 = (ulong)uVar66;
                        } while (uVar66 != 0);
                      }
                      uVar62 = uVar62 + 1;
                    } while (uVar62 != uVar7);
                  }
                  uVar48 = uVar48 + 1;
                } while (uVar48 != uVar46);
                return 0;
              }
              return 0;
            }
            return -100;
          }
          if (((uVar65 == uVar64 && (uVar5 ^ 1) == 0) && uVar8 == uVar6) && uVar7 != 1) {
            Mat::create(this_00,uVar64,uVar7,uVar8,sVar71,iVar45,opt->blob_allocator);
            if (this_00->data == (void *)0x0) {
              return -100;
            }
            if ((long)this_00->c * this_00->cstep != 0) {
              if (0 < (int)uVar8) {
                uVar48 = 0;
                do {
                  if (0 < (int)uVar7) {
                    sVar71 = pMVar9[1].elemsize;
                    pvVar56 = (void *)(this_00->cstep * uVar48 * this_00->elemsize +
                                      (long)this_00->data);
                    pvVar63 = (void *)(pMVar9->cstep * uVar48 * pMVar9->elemsize +
                                      (long)pMVar9->data);
                    sVar11 = pMVar9[1].cstep;
                    pvVar12 = pMVar9[1].data;
                    uVar66 = 0;
                    do {
                      if (0 < (int)uVar64) {
                        lVar60 = 0;
                        do {
                          pfVar57 = (float *)((long)pvVar12 + lVar60 + sVar71 * sVar11 * uVar48);
                          pfVar58 = (float *)((long)pvVar63 + lVar60);
                          auVar175._0_4_ = *pfVar57 + *pfVar58;
                          auVar175._4_4_ = pfVar57[1] + pfVar58[1];
                          auVar175._8_4_ = pfVar57[2] + pfVar58[2];
                          auVar175._12_4_ = pfVar57[3] + pfVar58[3];
                          auVar175._16_4_ = pfVar57[4] + pfVar58[4];
                          auVar175._20_4_ = pfVar57[5] + pfVar58[5];
                          auVar175._24_4_ = pfVar57[6] + pfVar58[6];
                          auVar175._28_4_ = pfVar57[7] + pfVar58[7];
                          *(undefined1 (*) [32])((long)pvVar56 + lVar60) = auVar175;
                          lVar60 = lVar60 + 0x20;
                        } while (uVar47 << 5 != lVar60);
                        pvVar56 = (void *)((long)pvVar56 + lVar60);
                        pvVar63 = (void *)((long)pvVar63 + lVar60);
                      }
                      uVar66 = uVar66 + 1;
                    } while (uVar66 != uVar7);
                  }
                  uVar48 = uVar48 + 1;
                } while (uVar48 != uVar46);
                return 0;
              }
              return 0;
            }
            return -100;
          }
          if (((uVar6 == uVar8 && uVar5 == uVar7) & uVar65 != 1 & (byte)local_128) == 1) {
            Mat::create(this_00,uVar65,uVar7,uVar8,sVar11,uVar66,opt->blob_allocator);
            if (this_00->data == (void *)0x0) {
              return -100;
            }
            if ((long)this_00->c * this_00->cstep != 0) {
              if (0 < (int)uVar8) {
                uVar47 = 0;
                do {
                  if (0 < (int)uVar7) {
                    sVar71 = pMVar9->cstep;
                    sVar11 = pMVar9->elemsize;
                    pvVar12 = pMVar9->data;
                    pauVar49 = (undefined1 (*) [32])
                               (this_00->cstep * uVar47 * this_00->elemsize + (long)this_00->data);
                    pfVar57 = (float *)(pMVar9[1].cstep * uVar47 * pMVar9[1].elemsize +
                                       (long)pMVar9[1].data);
                    uVar48 = 0;
                    do {
                      if (0 < (int)uVar65) {
                        auVar163 = *(undefined1 (*) [32])
                                    ((long)pvVar12 + uVar48 * 0x20 + sVar71 * uVar47 * sVar11);
                        uVar66 = uVar65;
                        do {
                          auVar244._0_4_ = auVar163._0_4_ + *pfVar57;
                          auVar244._4_4_ = auVar163._4_4_ + pfVar57[1];
                          auVar244._8_4_ = auVar163._8_4_ + pfVar57[2];
                          auVar244._12_4_ = auVar163._12_4_ + pfVar57[3];
                          auVar244._16_4_ = auVar163._16_4_ + pfVar57[4];
                          auVar244._20_4_ = auVar163._20_4_ + pfVar57[5];
                          auVar244._24_4_ = auVar163._24_4_ + pfVar57[6];
                          auVar244._28_4_ = auVar163._28_4_ + pfVar57[7];
                          *pauVar49 = auVar244;
                          pfVar57 = pfVar57 + 8;
                          pauVar49 = pauVar49 + 1;
                          uVar66 = uVar66 - 1;
                        } while (uVar66 != 0);
                      }
                      uVar48 = uVar48 + 1;
                    } while (uVar48 != uVar7);
                  }
                  uVar47 = uVar47 + 1;
                } while (uVar47 != uVar46);
                return 0;
              }
              return 0;
            }
            return -100;
          }
          if (((byte)local_104 & uVar6 == uVar8 & (uVar5 != 1 && uVar65 == uVar64)) == 1) {
            Mat::create(this_00,uVar64,uVar5,uVar8,sVar11,uVar66,opt->blob_allocator);
            if (this_00->data == (void *)0x0) {
              return -100;
            }
            if ((long)local_120->c * local_120->cstep != 0) {
              if (0 < (int)uVar8) {
                local_158 = (__m256 *)0x0;
                do {
                  pMVar1 = local_a0;
                  afVar185 = _local_100;
                  bVar74 = local_a0->dims == 3;
                  local_c8 = 1;
                  if (!bVar74) {
                    local_c8 = local_a0->d;
                  }
                  local_d4 = local_a0->w;
                  local_d0 = local_a0->h;
                  local_130 = (void *)local_a0->cstep;
                  pvVar12 = local_a0->data;
                  local_138 = local_a0->elemsize;
                  local_e0 = local_a0->allocator;
                  _fStack_f8 = 0;
                  local_100 = (undefined1  [8])
                              ((long)local_130 * (long)local_158 * local_138 + (long)pvVar12);
                  uStack_f0 = local_138;
                  fStack_e4 = afVar185[7];
                  fStack_e8 = (float)local_a0->elempack;
                  local_d8 = bVar74 ^ 3;
                  local_c0 = (long)local_d0 * (long)local_d4;
                  local_cc = 1;
                  Mat::~Mat((Mat *)local_100);
                  bVar74 = pMVar1[1].dims == 3;
                  local_c8 = 1;
                  if (!bVar74) {
                    local_c8 = pMVar1[1].d;
                  }
                  local_d4 = pMVar1[1].w;
                  local_d0 = pMVar1[1].h;
                  pvVar56 = (void *)(pMVar1[1].cstep * (long)local_158 * pMVar1[1].elemsize +
                                    (long)pMVar1[1].data);
                  local_d8 = bVar74 ^ 3;
                  local_e0 = pMVar1[1].allocator;
                  _fStack_f8 = 0;
                  local_100 = (undefined1  [8])pvVar56;
                  uStack_f0 = pMVar1[1].elemsize;
                  fStack_e8 = (float)pMVar1[1].elempack;
                  local_c0 = (long)local_d0 * (long)local_d4;
                  local_cc = 1;
                  Mat::~Mat((Mat *)local_100);
                  bVar74 = local_120->dims == 3;
                  local_d4 = local_120->w;
                  local_d0 = local_120->h;
                  local_c8 = 1;
                  if (!bVar74) {
                    local_c8 = local_120->d;
                  }
                  sVar71 = local_120->elemsize;
                  pvVar63 = (void *)(local_120->cstep * (long)local_158 * sVar71 +
                                    (long)local_120->data);
                  local_d8 = bVar74 ^ 3;
                  local_e0 = local_120->allocator;
                  fStack_f8 = 0.0;
                  fStack_f4 = 0.0;
                  local_100 = (undefined1  [8])pvVar63;
                  uStack_f0._0_4_ = (float)(int)sVar71;
                  uStack_f0._4_4_ = (float)(int)(sVar71 >> 0x20);
                  fStack_e8 = (float)local_120->elempack;
                  local_c0 = (long)local_d0 * (long)local_d4;
                  local_cc = 1;
                  Mat::~Mat((Mat *)local_100);
                  if (0 < (int)uVar5) {
                    uVar66 = 0;
                    do {
                      if (0 < (int)uVar64) {
                        lVar60 = 0;
                        do {
                          pfVar57 = (float *)((long)pvVar56 + lVar60);
                          pfVar58 = (float *)((long)pvVar12 +
                                             lVar60 + (long)local_130 * local_138 * (long)local_158)
                          ;
                          auVar184._0_4_ = *pfVar57 + *pfVar58;
                          auVar184._4_4_ = pfVar57[1] + pfVar58[1];
                          auVar184._8_4_ = pfVar57[2] + pfVar58[2];
                          auVar184._12_4_ = pfVar57[3] + pfVar58[3];
                          auVar184._16_4_ = pfVar57[4] + pfVar58[4];
                          auVar184._20_4_ = pfVar57[5] + pfVar58[5];
                          auVar184._24_4_ = pfVar57[6] + pfVar58[6];
                          auVar184._28_4_ = pfVar57[7] + pfVar58[7];
                          *(undefined1 (*) [32])((long)pvVar63 + lVar60) = auVar184;
                          lVar60 = lVar60 + 0x20;
                        } while (uVar47 << 5 != lVar60);
                        pvVar63 = (void *)((long)pvVar63 + lVar60);
                        pvVar56 = (void *)((long)pvVar56 + lVar60);
                      }
                      uVar66 = uVar66 + 1;
                    } while (uVar66 != uVar5);
                  }
                  local_158 = (__m256 *)((long)local_158 + 1);
                } while (local_158 != (__m256 *)uVar46);
                return 0;
              }
              return 0;
            }
            return -100;
          }
          Mat::create(this_00,uVar64,uVar7,uVar8,sVar71,iVar45,opt->blob_allocator);
          if (this_00->data == (void *)0x0) {
            return -100;
          }
          if ((long)local_120->c * local_120->cstep != 0) {
            if (0 < (int)uVar8) {
              local_158 = (__m256 *)0x0;
              do {
                pMVar1 = local_a0;
                afVar185 = _local_100;
                bVar74 = local_a0->dims == 3;
                local_c8 = 1;
                if (!bVar74) {
                  local_c8 = local_a0->d;
                }
                local_d4 = local_a0->w;
                local_d0 = local_a0->h;
                sVar71 = local_a0->cstep;
                pvVar12 = local_a0->data;
                local_130 = (void *)local_a0->elemsize;
                local_e0 = local_a0->allocator;
                _fStack_f8 = 0;
                local_100 = (undefined1  [8])
                            (sVar71 * (long)local_158 * (long)local_130 + (long)pvVar12);
                uStack_f0 = local_130;
                fStack_e4 = afVar185[7];
                fStack_e8 = (float)local_a0->elempack;
                local_d8 = bVar74 ^ 3;
                local_c0 = (long)local_d0 * (long)local_d4;
                local_cc = 1;
                Mat::~Mat((Mat *)local_100);
                bVar74 = pMVar1[1].dims == 3;
                local_c8 = 1;
                if (!bVar74) {
                  local_c8 = pMVar1[1].d;
                }
                local_d4 = pMVar1[1].w;
                local_d0 = pMVar1[1].h;
                local_110 = pMVar1[1].cstep;
                pvVar56 = pMVar1[1].data;
                local_128 = pMVar1[1].elemsize;
                local_e0 = pMVar1[1].allocator;
                _fStack_f8 = 0;
                local_100 = (undefined1  [8])
                            (local_110 * (long)local_158 * local_128 + (long)pvVar56);
                uStack_f0 = local_128;
                fStack_e8 = (float)pMVar1[1].elempack;
                local_d8 = bVar74 ^ 3;
                local_c0 = (long)local_d0 * (long)local_d4;
                local_cc = 1;
                Mat::~Mat((Mat *)local_100);
                bVar74 = local_120->dims == 3;
                local_d4 = local_120->w;
                local_d0 = local_120->h;
                local_c8 = 1;
                if (!bVar74) {
                  local_c8 = local_120->d;
                }
                sVar11 = local_120->cstep;
                pvVar63 = local_120->data;
                sVar13 = local_120->elemsize;
                local_e0 = local_120->allocator;
                fStack_f8 = 0.0;
                fStack_f4 = 0.0;
                local_100 = (undefined1  [8])(sVar11 * (long)local_158 * sVar13 + (long)pvVar63);
                uStack_f0._0_4_ = (float)(int)sVar13;
                uStack_f0._4_4_ = (float)(int)(sVar13 >> 0x20);
                fStack_e8 = (float)local_120->elempack;
                local_d8 = bVar74 ^ 3;
                local_c0 = (long)local_d0 * (long)local_d4;
                local_cc = 1;
                Mat::~Mat((Mat *)local_100);
                if (0 < (int)local_138) {
                  lVar60 = 0;
                  iVar45 = (int)local_138;
                  do {
                    pfVar57 = (float *)((long)pvVar56 +
                                       lVar60 + local_110 * local_128 * (long)local_158);
                    pfVar58 = (float *)((long)pvVar12 +
                                       lVar60 + sVar71 * (long)local_130 * (long)local_158);
                    auVar186._0_4_ = *pfVar57 + *pfVar58;
                    auVar186._4_4_ = pfVar57[1] + pfVar58[1];
                    auVar186._8_4_ = pfVar57[2] + pfVar58[2];
                    auVar186._12_4_ = pfVar57[3] + pfVar58[3];
                    auVar186._16_4_ = pfVar57[4] + pfVar58[4];
                    auVar186._20_4_ = pfVar57[5] + pfVar58[5];
                    auVar186._24_4_ = pfVar57[6] + pfVar58[6];
                    auVar186._28_4_ = pfVar57[7] + pfVar58[7];
                    *(undefined1 (*) [32])
                     ((long)pvVar63 + lVar60 + sVar11 * sVar13 * (long)local_158) = auVar186;
                    lVar60 = lVar60 + 0x20;
                    iVar45 = iVar45 + -1;
                  } while (iVar45 != 0);
                }
                local_158 = (__m256 *)((long)local_158 + 1);
              } while (local_158 != (__m256 *)uVar46);
              return 0;
            }
            return 0;
          }
          return -100;
        }
      }
      else {
        local_128 = CONCAT71(local_128._1_7_,uVar64 == 1);
        local_104 = CONCAT31(local_104._1_3_,uVar7 == 1);
        if ((uVar64 != 1 || uVar7 != 1) || uVar6 != uVar8) goto LAB_00246790;
      }
      Mat::create(this_00,uVar65,uVar5,uVar6,sVar11,uVar66,opt->blob_allocator);
      if (this_00->data == (void *)0x0) {
        return -100;
      }
      if ((long)this_00->c * this_00->cstep != 0) {
        if (0 < (int)local_130) {
          uVar47 = 0;
          do {
            if (0 < iVar72) {
              sVar71 = pMVar9[1].cstep;
              sVar11 = pMVar9[1].elemsize;
              auVar163 = *(undefined1 (*) [32])
                          ((long)pMVar9->data + pMVar9->cstep * uVar47 * pMVar9->elemsize);
              pvVar12 = pMVar9[1].data;
              sVar13 = this_00->cstep;
              sVar14 = this_00->elemsize;
              pvVar56 = this_00->data;
              lVar60 = 0;
              iVar45 = iVar72;
              do {
                pfVar57 = (float *)((long)pvVar12 + lVar60 + sVar71 * sVar11 * uVar47);
                auVar242._0_4_ = auVar163._0_4_ + *pfVar57;
                auVar242._4_4_ = auVar163._4_4_ + pfVar57[1];
                auVar242._8_4_ = auVar163._8_4_ + pfVar57[2];
                auVar242._12_4_ = auVar163._12_4_ + pfVar57[3];
                auVar242._16_4_ = auVar163._16_4_ + pfVar57[4];
                auVar242._20_4_ = auVar163._20_4_ + pfVar57[5];
                auVar242._24_4_ = auVar163._24_4_ + pfVar57[6];
                auVar242._28_4_ = auVar163._28_4_ + pfVar57[7];
                *(undefined1 (*) [32])((long)pvVar56 + lVar60 + sVar13 * sVar14 * uVar47) = auVar242
                ;
                lVar60 = lVar60 + 0x20;
                iVar45 = iVar45 + -1;
              } while (iVar45 != 0);
            }
            uVar47 = uVar47 + 1;
          } while ((void *)uVar47 != local_130);
          return 0;
        }
        return 0;
      }
      return -100;
    case 1:
      uVar64 = pMVar9->w;
      uVar47 = (ulong)uVar64;
      sVar71 = pMVar9->elemsize;
      uVar65 = pMVar9[1].w;
      uVar5 = pMVar9[1].h;
      uVar6 = pMVar9[1].c;
      local_130 = (void *)(ulong)uVar6;
      iVar72 = uVar5 * uVar65;
      sVar11 = pMVar9[1].elemsize;
      iVar59 = pMVar9->dims;
      if (iVar59 == 1) {
        iVar59 = pMVar9[1].dims;
        if (iVar45 != 1 || uVar64 != 1) {
          if (iVar59 == 1) {
            Mat::create(this_00,uVar64,sVar71,iVar45,opt->blob_allocator);
            pvVar12 = this_00->data;
            if (pvVar12 == (void *)0x0) {
              return -100;
            }
            if ((long)this_00->c * this_00->cstep == 0) {
              return -100;
            }
            if (uVar66 != 1 || pMVar9[1].w != 1) {
              if (0 < (int)uVar64) {
                pvVar56 = pMVar9->data;
                pvVar63 = pMVar9[1].data;
                lVar60 = 0;
                do {
                  auVar163 = vsubps_avx(*(undefined1 (*) [32])((long)pvVar56 + lVar60),
                                        *(undefined1 (*) [32])((long)pvVar63 + lVar60));
                  *(undefined1 (*) [32])((long)pvVar12 + lVar60) = auVar163;
                  lVar60 = lVar60 + 0x20;
                  uVar66 = (int)uVar47 - 1;
                  uVar47 = (ulong)uVar66;
                } while (uVar66 != 0);
                return 0;
              }
              return 0;
            }
            if (0 < (int)uVar64) {
              uVar4 = *pMVar1->data;
              auVar157._4_4_ = uVar4;
              auVar157._0_4_ = uVar4;
              auVar157._8_4_ = uVar4;
              auVar157._12_4_ = uVar4;
              auVar157._16_4_ = uVar4;
              auVar157._20_4_ = uVar4;
              auVar157._24_4_ = uVar4;
              auVar157._28_4_ = uVar4;
              pvVar56 = pMVar9->data;
              lVar60 = 0;
              do {
                auVar163 = vsubps_avx(*(undefined1 (*) [32])((long)pvVar56 + lVar60),auVar157);
                *(undefined1 (*) [32])((long)pvVar12 + lVar60) = auVar163;
                lVar60 = lVar60 + 0x20;
                uVar66 = (int)uVar47 - 1;
                uVar47 = (ulong)uVar66;
              } while (uVar66 != 0);
              return 0;
            }
            return 0;
          }
          if (iVar59 == 2) {
            Mat::create(this_00,uVar65,uVar5,sVar11,uVar66,opt->blob_allocator);
            pauVar49 = (undefined1 (*) [32])this_00->data;
            if (pauVar49 == (undefined1 (*) [32])0x0) {
              return -100;
            }
            if ((long)this_00->c * this_00->cstep != 0) {
              if (0 < (int)uVar5) {
                pauVar54 = (undefined1 (*) [32])pMVar9->data;
                pauVar52 = (undefined1 (*) [32])pMVar9[1].data;
                uVar66 = 0;
                do {
                  if (0 < (int)uVar65) {
                    auVar163 = *pauVar54;
                    uVar64 = uVar65;
                    do {
                      auVar160 = vsubps_avx(auVar163,*pauVar52);
                      *pauVar49 = auVar160;
                      pauVar52 = pauVar52 + 1;
                      pauVar49 = pauVar49 + 1;
                      uVar64 = uVar64 - 1;
                    } while (uVar64 != 0);
                  }
                  pauVar54 = pauVar54 + 1;
                  uVar66 = uVar66 + 1;
                } while (uVar66 != uVar5);
                return 0;
              }
              return 0;
            }
            return -100;
          }
          if (iVar59 != 3) {
            return 0;
          }
          Mat::create(this_00,uVar65,uVar5,uVar6,sVar11,uVar66,opt->blob_allocator);
          if (this_00->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep == 0) {
            return -100;
          }
          if (0 < (int)local_130) {
            uVar47 = 0;
            do {
              if (0 < iVar72) {
                sVar71 = this_00->cstep;
                sVar11 = this_00->elemsize;
                auVar163 = *(undefined1 (*) [32])((long)pMVar9->data + uVar47 * 0x20);
                pvVar12 = this_00->data;
                sVar13 = pMVar9[1].cstep;
                sVar14 = pMVar9[1].elemsize;
                pvVar56 = pMVar9[1].data;
                lVar60 = 0;
                iVar45 = iVar72;
                do {
                  auVar160 = vsubps_avx(auVar163,*(undefined1 (*) [32])
                                                  ((long)pvVar56 + lVar60 + sVar13 * sVar14 * uVar47
                                                  ));
                  *(undefined1 (*) [32])((long)pvVar12 + lVar60 + sVar71 * sVar11 * uVar47) =
                       auVar160;
                  lVar60 = lVar60 + 0x20;
                  iVar45 = iVar45 + -1;
                } while (iVar45 != 0);
              }
              uVar47 = uVar47 + 1;
            } while ((void *)uVar47 != local_130);
            return 0;
          }
          return 0;
        }
        if (iVar59 == 1) {
          Mat::create(this_00,uVar65,sVar11,uVar66,opt->blob_allocator);
          pvVar12 = this_00->data;
          if (pvVar12 == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep != 0) {
            if (0 < (int)uVar65) {
              uVar4 = *pMVar9->data;
              auVar156._4_4_ = uVar4;
              auVar156._0_4_ = uVar4;
              auVar156._8_4_ = uVar4;
              auVar156._12_4_ = uVar4;
              auVar156._16_4_ = uVar4;
              auVar156._20_4_ = uVar4;
              auVar156._24_4_ = uVar4;
              auVar156._28_4_ = uVar4;
              pvVar56 = pMVar1->data;
              lVar60 = 0;
              do {
                auVar163 = vsubps_avx(auVar156,*(undefined1 (*) [32])((long)pvVar56 + lVar60));
                *(undefined1 (*) [32])((long)pvVar12 + lVar60) = auVar163;
                lVar60 = lVar60 + 0x20;
                uVar65 = uVar65 - 1;
              } while (uVar65 != 0);
              return 0;
            }
            return 0;
          }
          return -100;
        }
        if (iVar59 == 2) {
          Mat::create(this_00,uVar65,uVar5,sVar11,uVar66,opt->blob_allocator);
          pvVar12 = this_00->data;
          if (pvVar12 == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep != 0) {
            if (0 < iVar72) {
              uVar4 = *pMVar9->data;
              auVar152._4_4_ = uVar4;
              auVar152._0_4_ = uVar4;
              auVar152._8_4_ = uVar4;
              auVar152._12_4_ = uVar4;
              auVar152._16_4_ = uVar4;
              auVar152._20_4_ = uVar4;
              auVar152._24_4_ = uVar4;
              auVar152._28_4_ = uVar4;
              pvVar56 = pMVar1->data;
              lVar60 = 0;
              do {
                auVar163 = vsubps_avx(auVar152,*(undefined1 (*) [32])((long)pvVar56 + lVar60));
                *(undefined1 (*) [32])((long)pvVar12 + lVar60) = auVar163;
                lVar60 = lVar60 + 0x20;
                iVar72 = iVar72 + -1;
              } while (iVar72 != 0);
              return 0;
            }
            return 0;
          }
          return -100;
        }
        if (iVar59 != 3) {
          return 0;
        }
        Mat::create(this_00,uVar65,uVar5,uVar6,sVar11,uVar66,opt->blob_allocator);
        if (this_00->data == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep == 0) {
          return -100;
        }
        if (0 < (int)local_130) {
          uVar4 = *pMVar9->data;
          auVar138._4_4_ = uVar4;
          auVar138._0_4_ = uVar4;
          auVar138._8_4_ = uVar4;
          auVar138._12_4_ = uVar4;
          auVar138._16_4_ = uVar4;
          auVar138._20_4_ = uVar4;
          auVar138._24_4_ = uVar4;
          auVar138._28_4_ = uVar4;
          uVar47 = 0;
          do {
            if (0 < iVar72) {
              sVar71 = this_00->cstep;
              sVar11 = this_00->elemsize;
              pvVar12 = this_00->data;
              sVar13 = pMVar9[1].cstep;
              sVar14 = pMVar9[1].elemsize;
              pvVar56 = pMVar9[1].data;
              lVar60 = 0;
              iVar45 = iVar72;
              do {
                auVar163 = vsubps_avx(auVar138,*(undefined1 (*) [32])
                                                ((long)pvVar56 + lVar60 + sVar13 * sVar14 * uVar47))
                ;
                *(undefined1 (*) [32])((long)pvVar12 + lVar60 + sVar71 * sVar11 * uVar47) = auVar163
                ;
                lVar60 = lVar60 + 0x20;
                iVar45 = iVar45 + -1;
              } while (iVar45 != 0);
            }
            uVar47 = uVar47 + 1;
          } while ((void *)uVar47 != local_130);
          return 0;
        }
        return 0;
      }
      uVar7 = pMVar9->h;
      local_138 = CONCAT44(local_138._4_4_,uVar7 * uVar64);
      if (iVar59 == 2) {
        if (pMVar9[1].dims == 3) {
          Mat::create(this_00,uVar65,uVar5,uVar6,sVar11,uVar66,opt->blob_allocator);
          if (this_00->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep != 0) {
            if (0 < (int)local_130) {
              uVar47 = 0;
              do {
                if (0 < (int)uVar5) {
                  pauVar49 = (undefined1 (*) [32])
                             (this_00->cstep * uVar47 * this_00->elemsize + (long)this_00->data);
                  pauVar54 = (undefined1 (*) [32])
                             (pMVar9[1].cstep * uVar47 * pMVar9[1].elemsize + (long)pMVar9[1].data);
                  pauVar52 = (undefined1 (*) [32])
                             ((long)pMVar9->w * uVar47 * pMVar9->elemsize + (long)pMVar9->data);
                  uVar66 = 0;
                  do {
                    if (0 < (int)uVar65) {
                      auVar163 = *pauVar52;
                      uVar64 = uVar65;
                      do {
                        auVar160 = vsubps_avx(auVar163,*pauVar54);
                        *pauVar49 = auVar160;
                        pauVar54 = pauVar54 + 1;
                        pauVar49 = pauVar49 + 1;
                        uVar64 = uVar64 - 1;
                      } while (uVar64 != 0);
                    }
                    pauVar52 = pauVar52 + 1;
                    uVar66 = uVar66 + 1;
                  } while (uVar66 != uVar5);
                }
                uVar47 = uVar47 + 1;
              } while ((void *)uVar47 != local_130);
              return 0;
            }
            return 0;
          }
          return -100;
        }
        local_128 = CONCAT44(uVar4,uVar66);
        Mat::create(this_00,uVar64,uVar7,sVar71,iVar45,opt->blob_allocator);
        pvVar12 = this_00->data;
        if (pvVar12 == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep == 0) {
          return -100;
        }
        if (pMVar9[1].dims != 1) {
          if (pMVar9[1].dims != 2) {
            return 0;
          }
          if (0 < (int)local_138) {
            pvVar56 = pMVar9->data;
            pvVar63 = pMVar9[1].data;
            lVar60 = 0;
            do {
              auVar163 = vsubps_avx(*(undefined1 (*) [32])((long)pvVar56 + lVar60),
                                    *(undefined1 (*) [32])((long)pvVar63 + lVar60));
              *(undefined1 (*) [32])((long)pvVar12 + lVar60) = auVar163;
              lVar60 = lVar60 + 0x20;
              local_138._0_4_ = (int)local_138 + -1;
            } while ((int)local_138 != 0);
            return 0;
          }
          return 0;
        }
        Mat::create(this_00,uVar64,uVar7,sVar71,iVar45,opt->blob_allocator);
        pauVar49 = (undefined1 (*) [32])this_00->data;
        if (pauVar49 == (undefined1 (*) [32])0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep != 0) {
          if ((int)local_128 != 1 || pMVar9[1].w != 1) {
            if (0 < (int)uVar7) {
              pauVar54 = (undefined1 (*) [32])pMVar9->data;
              pauVar52 = (undefined1 (*) [32])pMVar9[1].data;
              uVar66 = 0;
              do {
                if (0 < (int)uVar64) {
                  auVar163 = *pauVar52;
                  uVar46 = uVar47;
                  do {
                    auVar160 = vsubps_avx(*pauVar54,auVar163);
                    *pauVar49 = auVar160;
                    pauVar54 = pauVar54 + 1;
                    pauVar49 = pauVar49 + 1;
                    uVar65 = (int)uVar46 - 1;
                    uVar46 = (ulong)uVar65;
                  } while (uVar65 != 0);
                }
                pauVar52 = pauVar52 + 1;
                uVar66 = uVar66 + 1;
              } while (uVar66 != uVar7);
              return 0;
            }
            return 0;
          }
          if (0 < (int)local_138) {
            uVar4 = *pMVar1->data;
            auVar167._4_4_ = uVar4;
            auVar167._0_4_ = uVar4;
            auVar167._8_4_ = uVar4;
            auVar167._12_4_ = uVar4;
            auVar167._16_4_ = uVar4;
            auVar167._20_4_ = uVar4;
            auVar167._24_4_ = uVar4;
            auVar167._28_4_ = uVar4;
            pvVar12 = pMVar9->data;
            lVar60 = 0;
            do {
              auVar163 = vsubps_avx(*(undefined1 (*) [32])((long)pvVar12 + lVar60),auVar167);
              *(undefined1 (*) [32])((long)*pauVar49 + lVar60) = auVar163;
              lVar60 = lVar60 + 0x20;
              local_138._0_4_ = (int)local_138 + -1;
            } while ((int)local_138 != 0);
            return 0;
          }
          return 0;
        }
        return -100;
      }
      if (iVar59 != 3) {
        return 0;
      }
      uVar8 = pMVar9->c;
      uVar46 = (ulong)uVar8;
      if (pMVar9[1].dims != 3) {
        Mat::create(this_00,uVar64,uVar7,uVar8,sVar71,iVar45,opt->blob_allocator);
        if (this_00->data == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep == 0) {
          return -100;
        }
        if (pMVar9[1].dims == 1) {
          if (uVar66 != 1 || pMVar9[1].w != 1) {
            if (0 < (int)uVar8) {
              uVar47 = 0;
              do {
                if (0 < (int)local_138) {
                  sVar71 = this_00->cstep;
                  sVar11 = this_00->elemsize;
                  auVar163 = *(undefined1 (*) [32])((long)pMVar1->data + uVar47 * 0x20);
                  pvVar12 = this_00->data;
                  sVar13 = pMVar9->cstep;
                  sVar14 = pMVar9->elemsize;
                  pvVar56 = pMVar9->data;
                  lVar60 = 0;
                  iVar45 = (int)local_138;
                  do {
                    auVar160 = vsubps_avx(*(undefined1 (*) [32])
                                           ((long)pvVar56 + lVar60 + sVar13 * sVar14 * uVar47),
                                          auVar163);
                    *(undefined1 (*) [32])((long)pvVar12 + lVar60 + sVar71 * sVar11 * uVar47) =
                         auVar160;
                    lVar60 = lVar60 + 0x20;
                    iVar45 = iVar45 + -1;
                  } while (iVar45 != 0);
                }
                uVar47 = uVar47 + 1;
              } while (uVar47 != uVar46);
              return 0;
            }
            return 0;
          }
          if (0 < (int)uVar8) {
            uVar4 = *pMVar1->data;
            auVar170._4_4_ = uVar4;
            auVar170._0_4_ = uVar4;
            auVar170._8_4_ = uVar4;
            auVar170._12_4_ = uVar4;
            auVar170._16_4_ = uVar4;
            auVar170._20_4_ = uVar4;
            auVar170._24_4_ = uVar4;
            auVar170._28_4_ = uVar4;
            uVar47 = 0;
            do {
              if (0 < (int)local_138) {
                sVar71 = this_00->cstep;
                sVar11 = this_00->elemsize;
                pvVar12 = this_00->data;
                sVar13 = pMVar9->cstep;
                sVar14 = pMVar9->elemsize;
                pvVar56 = pMVar9->data;
                lVar60 = 0;
                iVar45 = (int)local_138;
                do {
                  auVar163 = vsubps_avx(*(undefined1 (*) [32])
                                         ((long)pvVar56 + lVar60 + sVar13 * sVar14 * uVar47),
                                        auVar170);
                  *(undefined1 (*) [32])((long)pvVar12 + lVar60 + sVar71 * sVar11 * uVar47) =
                       auVar163;
                  lVar60 = lVar60 + 0x20;
                  iVar45 = iVar45 + -1;
                } while (iVar45 != 0);
              }
              uVar47 = uVar47 + 1;
            } while (uVar47 != uVar46);
            return 0;
          }
          return 0;
        }
        if (pMVar9[1].dims != 2) {
          return 0;
        }
        if (0 < (int)uVar8) {
          uVar48 = 0;
          do {
            if (0 < (int)uVar7) {
              pauVar49 = (undefined1 (*) [32])
                         (this_00->cstep * uVar48 * this_00->elemsize + (long)this_00->data);
              pauVar54 = (undefined1 (*) [32])
                         ((long)pMVar9[1].w * uVar48 * pMVar9[1].elemsize + (long)pMVar9[1].data);
              pauVar52 = (undefined1 (*) [32])
                         (pMVar9->cstep * uVar48 * pMVar9->elemsize + (long)pMVar9->data);
              uVar66 = 0;
              do {
                if (0 < (int)uVar64) {
                  auVar163 = *pauVar54;
                  uVar62 = uVar47;
                  do {
                    auVar160 = vsubps_avx(*pauVar52,auVar163);
                    *pauVar49 = auVar160;
                    pauVar52 = pauVar52 + 1;
                    pauVar49 = pauVar49 + 1;
                    uVar65 = (int)uVar62 - 1;
                    uVar62 = (ulong)uVar65;
                  } while (uVar65 != 0);
                }
                pauVar54 = pauVar54 + 1;
                uVar66 = uVar66 + 1;
              } while (uVar66 != uVar7);
            }
            uVar48 = uVar48 + 1;
          } while (uVar48 != uVar46);
          return 0;
        }
        return 0;
      }
      if (uVar8 == uVar6 && ((uVar65 ^ 1) == 0 && (uVar5 ^ 1) == 0)) {
        Mat::create(this_00,uVar64,uVar7,uVar8,sVar71,iVar45,opt->blob_allocator);
        if (this_00->data == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep != 0) {
          if (0 < (int)uVar8) {
            uVar47 = 0;
            do {
              if (0 < (int)local_138) {
                sVar71 = pMVar9->cstep;
                sVar11 = pMVar9->elemsize;
                auVar163 = *(undefined1 (*) [32])
                            ((long)pMVar9[1].data + pMVar9[1].cstep * uVar47 * pMVar9[1].elemsize);
                pvVar12 = pMVar9->data;
                sVar13 = this_00->cstep;
                sVar14 = this_00->elemsize;
                pvVar56 = this_00->data;
                lVar60 = 0;
                iVar45 = (int)local_138;
                do {
                  auVar160 = vsubps_avx(*(undefined1 (*) [32])
                                         ((long)pvVar12 + lVar60 + sVar71 * sVar11 * uVar47),
                                        auVar163);
                  *(undefined1 (*) [32])((long)pvVar56 + lVar60 + sVar13 * sVar14 * uVar47) =
                       auVar160;
                  lVar60 = lVar60 + 0x20;
                  iVar45 = iVar45 + -1;
                } while (iVar45 != 0);
              }
              uVar47 = uVar47 + 1;
            } while (uVar47 != uVar46);
            return 0;
          }
          return 0;
        }
        return -100;
      }
      local_110 = sVar71;
      if (uVar65 == uVar64) {
        if (uVar66 == 1 && (uVar6 == 1 && uVar5 == uVar7)) {
          Mat::create(this_00,uVar64,uVar7,uVar8,sVar71,iVar45,opt->blob_allocator);
          if (this_00->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep != 0) {
            if (0 < (int)uVar8) {
              uVar47 = 0;
              do {
                if (0 < (int)local_138) {
                  sVar71 = pMVar9->cstep;
                  sVar11 = pMVar9->elemsize;
                  sVar13 = this_00->cstep;
                  pvVar12 = pMVar9->data;
                  pvVar56 = pMVar9[1].data;
                  sVar14 = this_00->elemsize;
                  pvVar63 = this_00->data;
                  lVar60 = 0;
                  iVar45 = (int)local_138;
                  do {
                    uVar4 = *(undefined4 *)((long)pvVar56 + lVar60);
                    auVar238._4_4_ = uVar4;
                    auVar238._0_4_ = uVar4;
                    auVar238._8_4_ = uVar4;
                    auVar238._12_4_ = uVar4;
                    auVar238._16_4_ = uVar4;
                    auVar238._20_4_ = uVar4;
                    auVar238._24_4_ = uVar4;
                    auVar238._28_4_ = uVar4;
                    auVar163 = vsubps_avx(*(undefined1 (*) [32])
                                           ((long)pvVar12 + lVar60 * 8 + sVar71 * sVar11 * uVar47),
                                          auVar238);
                    *(undefined1 (*) [32])((long)pvVar63 + lVar60 * 8 + sVar13 * sVar14 * uVar47) =
                         auVar163;
                    lVar60 = lVar60 + 4;
                    iVar45 = iVar45 + -1;
                  } while (iVar45 != 0);
                }
                uVar47 = uVar47 + 1;
              } while (uVar47 != uVar46);
              return 0;
            }
            return 0;
          }
          return -100;
        }
        local_128 = CONCAT71(local_128._1_7_,uVar64 == 1);
        local_104 = CONCAT31(local_104._1_3_,uVar7 == 1);
        if ((uVar64 != 1 || uVar7 != 1) || uVar6 != uVar8) {
          if (((iVar45 == 1) && (uVar5 == uVar7)) && (uVar8 == 1)) {
            Mat::create(this_00,uVar64,uVar7,uVar6,sVar11,uVar66,opt->blob_allocator);
            if (this_00->data == (void *)0x0) {
              return -100;
            }
            if ((long)this_00->c * this_00->cstep != 0) {
              if (0 < (int)local_130) {
                uVar47 = 0;
                do {
                  if (0 < iVar72) {
                    sVar71 = pMVar9[1].cstep;
                    sVar11 = pMVar9[1].elemsize;
                    sVar13 = this_00->cstep;
                    pvVar12 = pMVar9[1].data;
                    pvVar56 = pMVar9->data;
                    sVar14 = this_00->elemsize;
                    pvVar63 = this_00->data;
                    lVar60 = 0;
                    iVar45 = iVar72;
                    do {
                      uVar4 = *(undefined4 *)((long)pvVar56 + lVar60);
                      auVar180._4_4_ = uVar4;
                      auVar180._0_4_ = uVar4;
                      auVar180._8_4_ = uVar4;
                      auVar180._12_4_ = uVar4;
                      auVar180._16_4_ = uVar4;
                      auVar180._20_4_ = uVar4;
                      auVar180._24_4_ = uVar4;
                      auVar180._28_4_ = uVar4;
                      auVar163 = vsubps_avx(auVar180,*(undefined1 (*) [32])
                                                      ((long)pvVar12 +
                                                      lVar60 * 8 + sVar71 * sVar11 * uVar47));
                      *(undefined1 (*) [32])((long)pvVar63 + lVar60 * 8 + sVar13 * sVar14 * uVar47)
                           = auVar163;
                      lVar60 = lVar60 + 4;
                      iVar45 = iVar45 + -1;
                    } while (iVar45 != 0);
                  }
                  uVar47 = uVar47 + 1;
                } while ((void *)uVar47 != local_130);
                return 0;
              }
              return 0;
            }
            return -100;
          }
LAB_002468da:
          if ((((uVar65 ^ 1) == 0 && uVar5 == uVar7) && uVar8 == uVar6) && uVar64 != 1) {
            Mat::create(this_00,uVar64,uVar7,uVar8,sVar71,iVar45,opt->blob_allocator);
            if (this_00->data == (void *)0x0) {
              return -100;
            }
            if ((long)this_00->c * this_00->cstep != 0) {
              if (0 < (int)uVar8) {
                uVar48 = 0;
                do {
                  if (0 < (int)uVar7) {
                    sVar71 = pMVar9[1].cstep;
                    sVar11 = pMVar9[1].elemsize;
                    pvVar12 = pMVar9[1].data;
                    pauVar49 = (undefined1 (*) [32])
                               (this_00->cstep * uVar48 * this_00->elemsize + (long)this_00->data);
                    pauVar54 = (undefined1 (*) [32])
                               (pMVar9->cstep * uVar48 * pMVar9->elemsize + (long)pMVar9->data);
                    uVar62 = 0;
                    do {
                      if (0 < (int)uVar64) {
                        auVar163 = *(undefined1 (*) [32])
                                    ((long)pvVar12 + uVar62 * 0x20 + sVar71 * uVar48 * sVar11);
                        uVar67 = uVar47;
                        do {
                          auVar160 = vsubps_avx(*pauVar54,auVar163);
                          *pauVar49 = auVar160;
                          pauVar54 = pauVar54 + 1;
                          pauVar49 = pauVar49 + 1;
                          uVar66 = (int)uVar67 - 1;
                          uVar67 = (ulong)uVar66;
                        } while (uVar66 != 0);
                      }
                      uVar62 = uVar62 + 1;
                    } while (uVar62 != uVar7);
                  }
                  uVar48 = uVar48 + 1;
                } while (uVar48 != uVar46);
                return 0;
              }
              return 0;
            }
            return -100;
          }
          if (((uVar65 == uVar64 && (uVar5 ^ 1) == 0) && uVar8 == uVar6) && uVar7 != 1) {
            Mat::create(this_00,uVar64,uVar7,uVar8,sVar71,iVar45,opt->blob_allocator);
            if (this_00->data == (void *)0x0) {
              return -100;
            }
            if ((long)this_00->c * this_00->cstep != 0) {
              if (0 < (int)uVar8) {
                uVar48 = 0;
                do {
                  if (0 < (int)uVar7) {
                    sVar71 = pMVar9[1].elemsize;
                    pvVar56 = (void *)(this_00->cstep * uVar48 * this_00->elemsize +
                                      (long)this_00->data);
                    pvVar63 = (void *)(pMVar9->cstep * uVar48 * pMVar9->elemsize +
                                      (long)pMVar9->data);
                    sVar11 = pMVar9[1].cstep;
                    pvVar12 = pMVar9[1].data;
                    uVar66 = 0;
                    do {
                      if (0 < (int)uVar64) {
                        lVar60 = 0;
                        do {
                          auVar163 = vsubps_avx(*(undefined1 (*) [32])((long)pvVar63 + lVar60),
                                                *(undefined1 (*) [32])
                                                 ((long)pvVar12 + lVar60 + sVar71 * sVar11 * uVar48)
                                               );
                          *(undefined1 (*) [32])((long)pvVar56 + lVar60) = auVar163;
                          lVar60 = lVar60 + 0x20;
                        } while (uVar47 << 5 != lVar60);
                        pvVar56 = (void *)((long)pvVar56 + lVar60);
                        pvVar63 = (void *)((long)pvVar63 + lVar60);
                      }
                      uVar66 = uVar66 + 1;
                    } while (uVar66 != uVar7);
                  }
                  uVar48 = uVar48 + 1;
                } while (uVar48 != uVar46);
                return 0;
              }
              return 0;
            }
            return -100;
          }
          if (((uVar6 == uVar8 && uVar5 == uVar7) & uVar65 != 1 & (byte)local_128) == 1) {
            Mat::create(this_00,uVar65,uVar7,uVar8,sVar11,uVar66,opt->blob_allocator);
            if (this_00->data == (void *)0x0) {
              return -100;
            }
            if ((long)this_00->c * this_00->cstep != 0) {
              if (0 < (int)uVar8) {
                uVar47 = 0;
                do {
                  if (0 < (int)uVar7) {
                    sVar71 = pMVar9->cstep;
                    sVar11 = pMVar9->elemsize;
                    pvVar12 = pMVar9->data;
                    pauVar49 = (undefined1 (*) [32])
                               (this_00->cstep * uVar47 * this_00->elemsize + (long)this_00->data);
                    pauVar54 = (undefined1 (*) [32])
                               (pMVar9[1].cstep * uVar47 * pMVar9[1].elemsize + (long)pMVar9[1].data
                               );
                    uVar48 = 0;
                    do {
                      if (0 < (int)uVar65) {
                        auVar163 = *(undefined1 (*) [32])
                                    ((long)pvVar12 + uVar48 * 0x20 + sVar71 * uVar47 * sVar11);
                        uVar66 = uVar65;
                        do {
                          auVar160 = vsubps_avx(auVar163,*pauVar54);
                          *pauVar49 = auVar160;
                          pauVar54 = pauVar54 + 1;
                          pauVar49 = pauVar49 + 1;
                          uVar66 = uVar66 - 1;
                        } while (uVar66 != 0);
                      }
                      uVar48 = uVar48 + 1;
                    } while (uVar48 != uVar7);
                  }
                  uVar47 = uVar47 + 1;
                } while (uVar47 != uVar46);
                return 0;
              }
              return 0;
            }
            return -100;
          }
          if (((byte)local_104 & uVar6 == uVar8 & (uVar5 != 1 && uVar65 == uVar64)) == 1) {
            Mat::create(this_00,uVar64,uVar5,uVar8,sVar11,uVar66,opt->blob_allocator);
            if (this_00->data == (void *)0x0) {
              return -100;
            }
            if ((long)local_120->c * local_120->cstep != 0) {
              if (0 < (int)uVar8) {
                local_158 = (__m256 *)0x0;
                do {
                  pMVar1 = local_a0;
                  afVar185 = _local_100;
                  bVar74 = local_a0->dims == 3;
                  local_c8 = 1;
                  if (!bVar74) {
                    local_c8 = local_a0->d;
                  }
                  local_d4 = local_a0->w;
                  local_d0 = local_a0->h;
                  local_130 = (void *)local_a0->cstep;
                  pvVar12 = local_a0->data;
                  local_138 = local_a0->elemsize;
                  local_e0 = local_a0->allocator;
                  _fStack_f8 = 0;
                  local_100 = (undefined1  [8])
                              ((long)local_130 * (long)local_158 * local_138 + (long)pvVar12);
                  uStack_f0 = local_138;
                  fStack_e4 = afVar185[7];
                  fStack_e8 = (float)local_a0->elempack;
                  local_d8 = bVar74 ^ 3;
                  local_c0 = (long)local_d0 * (long)local_d4;
                  local_cc = 1;
                  Mat::~Mat((Mat *)local_100);
                  bVar74 = pMVar1[1].dims == 3;
                  local_c8 = 1;
                  if (!bVar74) {
                    local_c8 = pMVar1[1].d;
                  }
                  local_d4 = pMVar1[1].w;
                  local_d0 = pMVar1[1].h;
                  pvVar56 = (void *)(pMVar1[1].cstep * (long)local_158 * pMVar1[1].elemsize +
                                    (long)pMVar1[1].data);
                  local_d8 = bVar74 ^ 3;
                  local_e0 = pMVar1[1].allocator;
                  _fStack_f8 = 0;
                  local_100 = (undefined1  [8])pvVar56;
                  uStack_f0 = pMVar1[1].elemsize;
                  fStack_e8 = (float)pMVar1[1].elempack;
                  local_c0 = (long)local_d0 * (long)local_d4;
                  local_cc = 1;
                  Mat::~Mat((Mat *)local_100);
                  bVar74 = local_120->dims == 3;
                  local_d4 = local_120->w;
                  local_d0 = local_120->h;
                  local_c8 = 1;
                  if (!bVar74) {
                    local_c8 = local_120->d;
                  }
                  sVar71 = local_120->elemsize;
                  pvVar63 = (void *)(local_120->cstep * (long)local_158 * sVar71 +
                                    (long)local_120->data);
                  local_d8 = bVar74 ^ 3;
                  local_e0 = local_120->allocator;
                  fStack_f8 = 0.0;
                  fStack_f4 = 0.0;
                  local_100 = (undefined1  [8])pvVar63;
                  uStack_f0._0_4_ = (float)(int)sVar71;
                  uStack_f0._4_4_ = (float)(int)(sVar71 >> 0x20);
                  fStack_e8 = (float)local_120->elempack;
                  local_c0 = (long)local_d0 * (long)local_d4;
                  local_cc = 1;
                  Mat::~Mat((Mat *)local_100);
                  if (0 < (int)uVar5) {
                    uVar66 = 0;
                    do {
                      if (0 < (int)uVar64) {
                        lVar60 = 0;
                        do {
                          auVar163 = vsubps_avx(*(undefined1 (*) [32])
                                                 ((long)pvVar12 +
                                                 lVar60 + (long)local_130 * local_138 *
                                                          (long)local_158),
                                                *(undefined1 (*) [32])((long)pvVar56 + lVar60));
                          *(undefined1 (*) [32])((long)pvVar63 + lVar60) = auVar163;
                          lVar60 = lVar60 + 0x20;
                        } while (uVar47 << 5 != lVar60);
                        pvVar63 = (void *)((long)pvVar63 + lVar60);
                        pvVar56 = (void *)((long)pvVar56 + lVar60);
                      }
                      uVar66 = uVar66 + 1;
                    } while (uVar66 != uVar5);
                  }
                  local_158 = (__m256 *)((long)local_158 + 1);
                } while (local_158 != (__m256 *)uVar46);
                return 0;
              }
              return 0;
            }
            return -100;
          }
          Mat::create(this_00,uVar64,uVar7,uVar8,sVar71,iVar45,opt->blob_allocator);
          if (this_00->data == (void *)0x0) {
            return -100;
          }
          if ((long)local_120->c * local_120->cstep != 0) {
            if (0 < (int)uVar8) {
              local_158 = (__m256 *)0x0;
              do {
                pMVar1 = local_a0;
                afVar185 = _local_100;
                bVar74 = local_a0->dims == 3;
                local_c8 = 1;
                if (!bVar74) {
                  local_c8 = local_a0->d;
                }
                local_d4 = local_a0->w;
                local_d0 = local_a0->h;
                sVar71 = local_a0->cstep;
                pvVar12 = local_a0->data;
                local_130 = (void *)local_a0->elemsize;
                local_e0 = local_a0->allocator;
                _fStack_f8 = 0;
                local_100 = (undefined1  [8])
                            (sVar71 * (long)local_158 * (long)local_130 + (long)pvVar12);
                uStack_f0 = local_130;
                fStack_e4 = afVar185[7];
                fStack_e8 = (float)local_a0->elempack;
                local_d8 = bVar74 ^ 3;
                local_c0 = (long)local_d0 * (long)local_d4;
                local_cc = 1;
                Mat::~Mat((Mat *)local_100);
                bVar74 = pMVar1[1].dims == 3;
                local_c8 = 1;
                if (!bVar74) {
                  local_c8 = pMVar1[1].d;
                }
                local_d4 = pMVar1[1].w;
                local_d0 = pMVar1[1].h;
                local_110 = pMVar1[1].cstep;
                pvVar56 = pMVar1[1].data;
                local_128 = pMVar1[1].elemsize;
                local_e0 = pMVar1[1].allocator;
                _fStack_f8 = 0;
                local_100 = (undefined1  [8])
                            (local_110 * (long)local_158 * local_128 + (long)pvVar56);
                uStack_f0 = local_128;
                fStack_e8 = (float)pMVar1[1].elempack;
                local_d8 = bVar74 ^ 3;
                local_c0 = (long)local_d0 * (long)local_d4;
                local_cc = 1;
                Mat::~Mat((Mat *)local_100);
                bVar74 = local_120->dims == 3;
                local_d4 = local_120->w;
                local_d0 = local_120->h;
                local_c8 = 1;
                if (!bVar74) {
                  local_c8 = local_120->d;
                }
                sVar11 = local_120->cstep;
                pvVar63 = local_120->data;
                sVar13 = local_120->elemsize;
                local_e0 = local_120->allocator;
                fStack_f8 = 0.0;
                fStack_f4 = 0.0;
                local_100 = (undefined1  [8])(sVar11 * (long)local_158 * sVar13 + (long)pvVar63);
                uStack_f0._0_4_ = (float)(int)sVar13;
                uStack_f0._4_4_ = (float)(int)(sVar13 >> 0x20);
                fStack_e8 = (float)local_120->elempack;
                local_d8 = bVar74 ^ 3;
                local_c0 = (long)local_d0 * (long)local_d4;
                local_cc = 1;
                Mat::~Mat((Mat *)local_100);
                if (0 < (int)local_138) {
                  lVar60 = 0;
                  iVar45 = (int)local_138;
                  do {
                    auVar163 = vsubps_avx(*(undefined1 (*) [32])
                                           ((long)pvVar12 +
                                           lVar60 + sVar71 * (long)local_130 * (long)local_158),
                                          *(undefined1 (*) [32])
                                           ((long)pvVar56 +
                                           lVar60 + local_110 * local_128 * (long)local_158));
                    *(undefined1 (*) [32])
                     ((long)pvVar63 + lVar60 + sVar11 * sVar13 * (long)local_158) = auVar163;
                    lVar60 = lVar60 + 0x20;
                    iVar45 = iVar45 + -1;
                  } while (iVar45 != 0);
                }
                local_158 = (__m256 *)((long)local_158 + 1);
              } while (local_158 != (__m256 *)uVar46);
              return 0;
            }
            return 0;
          }
          return -100;
        }
      }
      else {
        local_128 = CONCAT71(local_128._1_7_,uVar64 == 1);
        local_104 = CONCAT31(local_104._1_3_,uVar7 == 1);
        if ((uVar64 != 1 || uVar7 != 1) || uVar6 != uVar8) goto LAB_002468da;
      }
      Mat::create(this_00,uVar65,uVar5,uVar6,sVar11,uVar66,opt->blob_allocator);
      if (this_00->data == (void *)0x0) {
        return -100;
      }
      if ((long)this_00->c * this_00->cstep != 0) {
        if (0 < (int)local_130) {
          uVar47 = 0;
          do {
            if (0 < iVar72) {
              sVar71 = pMVar9[1].cstep;
              sVar11 = pMVar9[1].elemsize;
              auVar163 = *(undefined1 (*) [32])
                          ((long)pMVar9->data + pMVar9->cstep * uVar47 * pMVar9->elemsize);
              pvVar12 = pMVar9[1].data;
              sVar13 = this_00->cstep;
              sVar14 = this_00->elemsize;
              pvVar56 = this_00->data;
              lVar60 = 0;
              iVar45 = iVar72;
              do {
                auVar160 = vsubps_avx(auVar163,*(undefined1 (*) [32])
                                                ((long)pvVar12 + lVar60 + sVar71 * sVar11 * uVar47))
                ;
                *(undefined1 (*) [32])((long)pvVar56 + lVar60 + sVar13 * sVar14 * uVar47) = auVar160
                ;
                lVar60 = lVar60 + 0x20;
                iVar45 = iVar45 + -1;
              } while (iVar45 != 0);
            }
            uVar47 = uVar47 + 1;
          } while ((void *)uVar47 != local_130);
          return 0;
        }
        return 0;
      }
      return -100;
    case 2:
      uVar64 = pMVar9->w;
      uVar47 = (ulong)uVar64;
      sVar71 = pMVar9->elemsize;
      uVar65 = pMVar9[1].w;
      uVar5 = pMVar9[1].h;
      uVar6 = pMVar9[1].c;
      local_130 = (void *)(ulong)uVar6;
      iVar72 = uVar5 * uVar65;
      sVar11 = pMVar9[1].elemsize;
      iVar59 = pMVar9->dims;
      if (iVar59 == 1) {
        iVar59 = pMVar9[1].dims;
        if (iVar45 != 1 || uVar64 != 1) {
          if (iVar59 == 1) {
            Mat::create(this_00,uVar64,sVar71,iVar45,opt->blob_allocator);
            pvVar12 = this_00->data;
            if (pvVar12 == (void *)0x0) {
              return -100;
            }
            if ((long)this_00->c * this_00->cstep == 0) {
              return -100;
            }
            if (uVar66 != 1 || pMVar9[1].w != 1) {
              if (0 < (int)uVar64) {
                pvVar56 = pMVar9->data;
                pvVar63 = pMVar9[1].data;
                lVar60 = 0;
                do {
                  pfVar57 = (float *)((long)pvVar63 + lVar60);
                  fVar203 = pfVar57[1];
                  fVar31 = pfVar57[2];
                  fVar32 = pfVar57[3];
                  fVar33 = pfVar57[4];
                  fVar34 = pfVar57[5];
                  fVar35 = pfVar57[6];
                  fVar36 = pfVar57[7];
                  pfVar58 = (float *)((long)pvVar56 + lVar60);
                  fVar37 = pfVar58[1];
                  fVar38 = pfVar58[2];
                  fVar39 = pfVar58[3];
                  fVar40 = pfVar58[4];
                  fVar41 = pfVar58[5];
                  fVar42 = pfVar58[6];
                  pfVar2 = (float *)((long)pvVar12 + lVar60);
                  *pfVar2 = *pfVar57 * *pfVar58;
                  pfVar2[1] = fVar203 * fVar37;
                  pfVar2[2] = fVar31 * fVar38;
                  pfVar2[3] = fVar32 * fVar39;
                  pfVar2[4] = fVar33 * fVar40;
                  pfVar2[5] = fVar34 * fVar41;
                  pfVar2[6] = fVar35 * fVar42;
                  pfVar2[7] = fVar36;
                  lVar60 = lVar60 + 0x20;
                  uVar66 = (int)uVar47 - 1;
                  uVar47 = (ulong)uVar66;
                } while (uVar66 != 0);
                return 0;
              }
              return 0;
            }
            if (0 < (int)uVar64) {
              fVar203 = *pMVar1->data;
              pvVar56 = pMVar9->data;
              lVar60 = 0;
              do {
                pfVar57 = (float *)((long)pvVar56 + lVar60);
                auVar255._0_4_ = fVar203 * *pfVar57;
                auVar255._4_4_ = fVar203 * pfVar57[1];
                auVar255._8_4_ = fVar203 * pfVar57[2];
                auVar255._12_4_ = fVar203 * pfVar57[3];
                auVar255._16_4_ = fVar203 * pfVar57[4];
                auVar255._20_4_ = fVar203 * pfVar57[5];
                auVar255._28_36_ = in_ZMM1._28_36_;
                auVar255._24_4_ = fVar203 * pfVar57[6];
                in_ZMM1 = ZEXT3264(auVar255._0_32_);
                *(undefined1 (*) [32])((long)pvVar12 + lVar60) = auVar255._0_32_;
                lVar60 = lVar60 + 0x20;
                uVar66 = (int)uVar47 - 1;
                uVar47 = (ulong)uVar66;
              } while (uVar66 != 0);
              return 0;
            }
            return 0;
          }
          if (iVar59 == 2) {
            Mat::create(this_00,uVar65,uVar5,sVar11,uVar66,opt->blob_allocator);
            pauVar49 = (undefined1 (*) [32])this_00->data;
            if (pauVar49 == (undefined1 (*) [32])0x0) {
              return -100;
            }
            if ((long)this_00->c * this_00->cstep != 0) {
              if (0 < (int)uVar5) {
                pauVar54 = (undefined1 (*) [32])pMVar9->data;
                pfVar57 = (float *)pMVar9[1].data;
                uVar66 = 0;
                do {
                  if (0 < (int)uVar65) {
                    auVar163 = *pauVar54;
                    uVar64 = uVar65;
                    do {
                      auVar253._0_4_ = auVar163._0_4_ * *pfVar57;
                      auVar253._4_4_ = auVar163._4_4_ * pfVar57[1];
                      auVar253._8_4_ = auVar163._8_4_ * pfVar57[2];
                      auVar253._12_4_ = auVar163._12_4_ * pfVar57[3];
                      auVar253._16_4_ = auVar163._16_4_ * pfVar57[4];
                      auVar253._20_4_ = auVar163._20_4_ * pfVar57[5];
                      auVar253._28_36_ = in_ZMM1._28_36_;
                      auVar253._24_4_ = auVar163._24_4_ * pfVar57[6];
                      in_ZMM1 = ZEXT3264(auVar253._0_32_);
                      *pauVar49 = auVar253._0_32_;
                      pfVar57 = pfVar57 + 8;
                      pauVar49 = pauVar49 + 1;
                      uVar64 = uVar64 - 1;
                    } while (uVar64 != 0);
                  }
                  pauVar54 = pauVar54 + 1;
                  uVar66 = uVar66 + 1;
                } while (uVar66 != uVar5);
                return 0;
              }
              return 0;
            }
            return -100;
          }
          if (iVar59 != 3) {
            return 0;
          }
          Mat::create(this_00,uVar65,uVar5,uVar6,sVar11,uVar66,opt->blob_allocator);
          if (this_00->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep == 0) {
            return -100;
          }
          if (0 < (int)local_130) {
            uVar47 = 0;
            do {
              if (0 < iVar72) {
                sVar71 = this_00->cstep;
                sVar11 = this_00->elemsize;
                auVar163 = *(undefined1 (*) [32])((long)pMVar9->data + uVar47 * 0x20);
                pvVar12 = this_00->data;
                sVar13 = pMVar9[1].cstep;
                sVar14 = pMVar9[1].elemsize;
                pvVar56 = pMVar9[1].data;
                lVar60 = 0;
                iVar45 = iVar72;
                do {
                  pfVar57 = (float *)((long)pvVar56 + lVar60 + sVar13 * sVar14 * uVar47);
                  auVar250._0_4_ = auVar163._0_4_ * *pfVar57;
                  auVar250._4_4_ = auVar163._4_4_ * pfVar57[1];
                  auVar250._8_4_ = auVar163._8_4_ * pfVar57[2];
                  auVar250._12_4_ = auVar163._12_4_ * pfVar57[3];
                  auVar250._16_4_ = auVar163._16_4_ * pfVar57[4];
                  auVar250._20_4_ = auVar163._20_4_ * pfVar57[5];
                  auVar250._28_36_ = in_ZMM1._28_36_;
                  auVar250._24_4_ = auVar163._24_4_ * pfVar57[6];
                  in_ZMM1 = ZEXT3264(auVar250._0_32_);
                  *(undefined1 (*) [32])((long)pvVar12 + lVar60 + sVar71 * sVar11 * uVar47) =
                       auVar250._0_32_;
                  lVar60 = lVar60 + 0x20;
                  iVar45 = iVar45 + -1;
                } while (iVar45 != 0);
              }
              uVar47 = uVar47 + 1;
            } while ((void *)uVar47 != local_130);
            return 0;
          }
          return 0;
        }
        if (iVar59 == 1) {
          Mat::create(this_00,uVar65,sVar11,uVar66,opt->blob_allocator);
          pvVar12 = this_00->data;
          if (pvVar12 == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep != 0) {
            if (0 < (int)uVar65) {
              fVar203 = *pMVar9->data;
              pvVar56 = pMVar1->data;
              lVar60 = 0;
              do {
                pfVar57 = (float *)((long)pvVar56 + lVar60);
                auVar254._0_4_ = fVar203 * *pfVar57;
                auVar254._4_4_ = fVar203 * pfVar57[1];
                auVar254._8_4_ = fVar203 * pfVar57[2];
                auVar254._12_4_ = fVar203 * pfVar57[3];
                auVar254._16_4_ = fVar203 * pfVar57[4];
                auVar254._20_4_ = fVar203 * pfVar57[5];
                auVar254._28_36_ = in_ZMM1._28_36_;
                auVar254._24_4_ = fVar203 * pfVar57[6];
                in_ZMM1 = ZEXT3264(auVar254._0_32_);
                *(undefined1 (*) [32])((long)pvVar12 + lVar60) = auVar254._0_32_;
                lVar60 = lVar60 + 0x20;
                uVar65 = uVar65 - 1;
              } while (uVar65 != 0);
              return 0;
            }
            return 0;
          }
          return -100;
        }
        if (iVar59 == 2) {
          Mat::create(this_00,uVar65,uVar5,sVar11,uVar66,opt->blob_allocator);
          pvVar12 = this_00->data;
          if (pvVar12 == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep != 0) {
            if (0 < iVar72) {
              fVar203 = *pMVar9->data;
              pvVar56 = pMVar1->data;
              lVar60 = 0;
              do {
                pfVar57 = (float *)((long)pvVar56 + lVar60);
                auVar252._0_4_ = fVar203 * *pfVar57;
                auVar252._4_4_ = fVar203 * pfVar57[1];
                auVar252._8_4_ = fVar203 * pfVar57[2];
                auVar252._12_4_ = fVar203 * pfVar57[3];
                auVar252._16_4_ = fVar203 * pfVar57[4];
                auVar252._20_4_ = fVar203 * pfVar57[5];
                auVar252._28_36_ = in_ZMM1._28_36_;
                auVar252._24_4_ = fVar203 * pfVar57[6];
                in_ZMM1 = ZEXT3264(auVar252._0_32_);
                *(undefined1 (*) [32])((long)pvVar12 + lVar60) = auVar252._0_32_;
                lVar60 = lVar60 + 0x20;
                iVar72 = iVar72 + -1;
              } while (iVar72 != 0);
              return 0;
            }
            return 0;
          }
          return -100;
        }
        if (iVar59 != 3) {
          return 0;
        }
        Mat::create(this_00,uVar65,uVar5,uVar6,sVar11,uVar66,opt->blob_allocator);
        if (this_00->data == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep == 0) {
          return -100;
        }
        if (0 < (int)local_130) {
          fVar203 = *pMVar9->data;
          uVar47 = 0;
          do {
            if (0 < iVar72) {
              sVar71 = this_00->cstep;
              sVar11 = this_00->elemsize;
              pvVar12 = this_00->data;
              sVar13 = pMVar9[1].cstep;
              sVar14 = pMVar9[1].elemsize;
              pvVar56 = pMVar9[1].data;
              lVar60 = 0;
              iVar45 = iVar72;
              do {
                pfVar57 = (float *)((long)pvVar56 + lVar60 + sVar13 * sVar14 * uVar47);
                auVar248._0_4_ = fVar203 * *pfVar57;
                auVar248._4_4_ = fVar203 * pfVar57[1];
                auVar248._8_4_ = fVar203 * pfVar57[2];
                auVar248._12_4_ = fVar203 * pfVar57[3];
                auVar248._16_4_ = fVar203 * pfVar57[4];
                auVar248._20_4_ = fVar203 * pfVar57[5];
                auVar248._28_36_ = in_ZMM1._28_36_;
                auVar248._24_4_ = fVar203 * pfVar57[6];
                in_ZMM1 = ZEXT3264(auVar248._0_32_);
                *(undefined1 (*) [32])((long)pvVar12 + lVar60 + sVar71 * sVar11 * uVar47) =
                     auVar248._0_32_;
                lVar60 = lVar60 + 0x20;
                iVar45 = iVar45 + -1;
              } while (iVar45 != 0);
            }
            uVar47 = uVar47 + 1;
          } while ((void *)uVar47 != local_130);
          return 0;
        }
        return 0;
      }
      uVar7 = pMVar9->h;
      local_138 = CONCAT44(local_138._4_4_,uVar7 * uVar64);
      if (iVar59 == 2) {
        if (pMVar9[1].dims == 3) {
          Mat::create(this_00,uVar65,uVar5,uVar6,sVar11,uVar66,opt->blob_allocator);
          if (this_00->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep != 0) {
            if (0 < (int)local_130) {
              uVar47 = 0;
              do {
                if (0 < (int)uVar5) {
                  pauVar49 = (undefined1 (*) [32])
                             (this_00->cstep * uVar47 * this_00->elemsize + (long)this_00->data);
                  pfVar57 = (float *)(pMVar9[1].cstep * uVar47 * pMVar9[1].elemsize +
                                     (long)pMVar9[1].data);
                  pauVar54 = (undefined1 (*) [32])
                             ((long)pMVar9->w * uVar47 * pMVar9->elemsize + (long)pMVar9->data);
                  uVar66 = 0;
                  do {
                    if (0 < (int)uVar65) {
                      auVar163 = *pauVar54;
                      uVar64 = uVar65;
                      do {
                        auVar247._0_4_ = auVar163._0_4_ * *pfVar57;
                        auVar247._4_4_ = auVar163._4_4_ * pfVar57[1];
                        auVar247._8_4_ = auVar163._8_4_ * pfVar57[2];
                        auVar247._12_4_ = auVar163._12_4_ * pfVar57[3];
                        auVar247._16_4_ = auVar163._16_4_ * pfVar57[4];
                        auVar247._20_4_ = auVar163._20_4_ * pfVar57[5];
                        auVar247._28_36_ = in_ZMM1._28_36_;
                        auVar247._24_4_ = auVar163._24_4_ * pfVar57[6];
                        in_ZMM1 = ZEXT3264(auVar247._0_32_);
                        *pauVar49 = auVar247._0_32_;
                        pfVar57 = pfVar57 + 8;
                        pauVar49 = pauVar49 + 1;
                        uVar64 = uVar64 - 1;
                      } while (uVar64 != 0);
                    }
                    pauVar54 = pauVar54 + 1;
                    uVar66 = uVar66 + 1;
                  } while (uVar66 != uVar5);
                }
                uVar47 = uVar47 + 1;
              } while ((void *)uVar47 != local_130);
              return 0;
            }
            return 0;
          }
          return -100;
        }
        local_128 = CONCAT44(uVar4,uVar66);
        Mat::create(this_00,uVar64,uVar7,sVar71,iVar45,opt->blob_allocator);
        pvVar12 = this_00->data;
        if (pvVar12 == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep == 0) {
          return -100;
        }
        if (pMVar9[1].dims != 1) {
          if (pMVar9[1].dims != 2) {
            return 0;
          }
          if (0 < (int)local_138) {
            pvVar56 = pMVar9->data;
            pvVar63 = pMVar9[1].data;
            lVar60 = 0;
            do {
              pfVar57 = (float *)((long)pvVar63 + lVar60);
              fVar203 = pfVar57[1];
              fVar31 = pfVar57[2];
              fVar32 = pfVar57[3];
              fVar33 = pfVar57[4];
              fVar34 = pfVar57[5];
              fVar35 = pfVar57[6];
              fVar36 = pfVar57[7];
              pfVar58 = (float *)((long)pvVar56 + lVar60);
              fVar37 = pfVar58[1];
              fVar38 = pfVar58[2];
              fVar39 = pfVar58[3];
              fVar40 = pfVar58[4];
              fVar41 = pfVar58[5];
              fVar42 = pfVar58[6];
              pfVar2 = (float *)((long)pvVar12 + lVar60);
              *pfVar2 = *pfVar57 * *pfVar58;
              pfVar2[1] = fVar203 * fVar37;
              pfVar2[2] = fVar31 * fVar38;
              pfVar2[3] = fVar32 * fVar39;
              pfVar2[4] = fVar33 * fVar40;
              pfVar2[5] = fVar34 * fVar41;
              pfVar2[6] = fVar35 * fVar42;
              pfVar2[7] = fVar36;
              lVar60 = lVar60 + 0x20;
              local_138._0_4_ = (int)local_138 + -1;
            } while ((int)local_138 != 0);
            return 0;
          }
          return 0;
        }
        Mat::create(this_00,uVar64,uVar7,sVar71,iVar45,opt->blob_allocator);
        pauVar49 = (undefined1 (*) [32])this_00->data;
        if (pauVar49 == (undefined1 (*) [32])0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep != 0) {
          if ((int)local_128 != 1 || pMVar9[1].w != 1) {
            if (0 < (int)uVar7) {
              pfVar57 = (float *)pMVar9->data;
              pauVar54 = (undefined1 (*) [32])pMVar9[1].data;
              uVar66 = 0;
              do {
                if (0 < (int)uVar64) {
                  auVar163 = *pauVar54;
                  uVar46 = uVar47;
                  do {
                    auVar267._0_4_ = auVar163._0_4_ * *pfVar57;
                    auVar267._4_4_ = auVar163._4_4_ * pfVar57[1];
                    auVar267._8_4_ = auVar163._8_4_ * pfVar57[2];
                    auVar267._12_4_ = auVar163._12_4_ * pfVar57[3];
                    auVar267._16_4_ = auVar163._16_4_ * pfVar57[4];
                    auVar267._20_4_ = auVar163._20_4_ * pfVar57[5];
                    auVar267._28_36_ = in_ZMM1._28_36_;
                    auVar267._24_4_ = auVar163._24_4_ * pfVar57[6];
                    in_ZMM1 = ZEXT3264(auVar267._0_32_);
                    *pauVar49 = auVar267._0_32_;
                    pfVar57 = pfVar57 + 8;
                    pauVar49 = pauVar49 + 1;
                    uVar65 = (int)uVar46 - 1;
                    uVar46 = (ulong)uVar65;
                  } while (uVar65 != 0);
                }
                pauVar54 = pauVar54 + 1;
                uVar66 = uVar66 + 1;
              } while (uVar66 != uVar7);
              return 0;
            }
            return 0;
          }
          if (0 < (int)local_138) {
            fVar203 = *pMVar1->data;
            pvVar12 = pMVar9->data;
            lVar60 = 0;
            do {
              pfVar57 = (float *)((long)pvVar12 + lVar60);
              auVar260._0_4_ = fVar203 * *pfVar57;
              auVar260._4_4_ = fVar203 * pfVar57[1];
              auVar260._8_4_ = fVar203 * pfVar57[2];
              auVar260._12_4_ = fVar203 * pfVar57[3];
              auVar260._16_4_ = fVar203 * pfVar57[4];
              auVar260._20_4_ = fVar203 * pfVar57[5];
              auVar260._28_36_ = in_ZMM1._28_36_;
              auVar260._24_4_ = fVar203 * pfVar57[6];
              in_ZMM1 = ZEXT3264(auVar260._0_32_);
              *(undefined1 (*) [32])((long)*pauVar49 + lVar60) = auVar260._0_32_;
              lVar60 = lVar60 + 0x20;
              local_138._0_4_ = (int)local_138 + -1;
            } while ((int)local_138 != 0);
            return 0;
          }
          return 0;
        }
        return -100;
      }
      if (iVar59 != 3) {
        return 0;
      }
      uVar8 = pMVar9->c;
      uVar46 = (ulong)uVar8;
      if (pMVar9[1].dims != 3) {
        Mat::create(this_00,uVar64,uVar7,uVar8,sVar71,iVar45,opt->blob_allocator);
        if (this_00->data == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep == 0) {
          return -100;
        }
        if (pMVar9[1].dims == 1) {
          if (uVar66 != 1 || pMVar9[1].w != 1) {
            if (0 < (int)uVar8) {
              uVar47 = 0;
              do {
                if (0 < (int)local_138) {
                  sVar71 = this_00->cstep;
                  sVar11 = this_00->elemsize;
                  auVar163 = *(undefined1 (*) [32])((long)pMVar1->data + uVar47 * 0x20);
                  pvVar12 = this_00->data;
                  sVar13 = pMVar9->cstep;
                  sVar14 = pMVar9->elemsize;
                  pvVar56 = pMVar9->data;
                  lVar60 = 0;
                  iVar45 = (int)local_138;
                  do {
                    pfVar57 = (float *)((long)pvVar56 + lVar60 + sVar13 * sVar14 * uVar47);
                    auVar265._0_4_ = auVar163._0_4_ * *pfVar57;
                    auVar265._4_4_ = auVar163._4_4_ * pfVar57[1];
                    auVar265._8_4_ = auVar163._8_4_ * pfVar57[2];
                    auVar265._12_4_ = auVar163._12_4_ * pfVar57[3];
                    auVar265._16_4_ = auVar163._16_4_ * pfVar57[4];
                    auVar265._20_4_ = auVar163._20_4_ * pfVar57[5];
                    auVar265._28_36_ = in_ZMM1._28_36_;
                    auVar265._24_4_ = auVar163._24_4_ * pfVar57[6];
                    in_ZMM1 = ZEXT3264(auVar265._0_32_);
                    *(undefined1 (*) [32])((long)pvVar12 + lVar60 + sVar71 * sVar11 * uVar47) =
                         auVar265._0_32_;
                    lVar60 = lVar60 + 0x20;
                    iVar45 = iVar45 + -1;
                  } while (iVar45 != 0);
                }
                uVar47 = uVar47 + 1;
              } while (uVar47 != uVar46);
              return 0;
            }
            return 0;
          }
          if (0 < (int)uVar8) {
            fVar203 = *pMVar1->data;
            uVar47 = 0;
            do {
              if (0 < (int)local_138) {
                sVar71 = this_00->cstep;
                sVar11 = this_00->elemsize;
                pvVar12 = this_00->data;
                sVar13 = pMVar9->cstep;
                sVar14 = pMVar9->elemsize;
                pvVar56 = pMVar9->data;
                lVar60 = 0;
                iVar45 = (int)local_138;
                do {
                  pfVar57 = (float *)((long)pvVar56 + lVar60 + sVar13 * sVar14 * uVar47);
                  auVar262._0_4_ = fVar203 * *pfVar57;
                  auVar262._4_4_ = fVar203 * pfVar57[1];
                  auVar262._8_4_ = fVar203 * pfVar57[2];
                  auVar262._12_4_ = fVar203 * pfVar57[3];
                  auVar262._16_4_ = fVar203 * pfVar57[4];
                  auVar262._20_4_ = fVar203 * pfVar57[5];
                  auVar262._28_36_ = in_ZMM1._28_36_;
                  auVar262._24_4_ = fVar203 * pfVar57[6];
                  in_ZMM1 = ZEXT3264(auVar262._0_32_);
                  *(undefined1 (*) [32])((long)pvVar12 + lVar60 + sVar71 * sVar11 * uVar47) =
                       auVar262._0_32_;
                  lVar60 = lVar60 + 0x20;
                  iVar45 = iVar45 + -1;
                } while (iVar45 != 0);
              }
              uVar47 = uVar47 + 1;
            } while (uVar47 != uVar46);
            return 0;
          }
          return 0;
        }
        if (pMVar9[1].dims != 2) {
          return 0;
        }
        if (0 < (int)uVar8) {
          uVar48 = 0;
          do {
            if (0 < (int)uVar7) {
              pauVar49 = (undefined1 (*) [32])
                         (this_00->cstep * uVar48 * this_00->elemsize + (long)this_00->data);
              pauVar54 = (undefined1 (*) [32])
                         ((long)pMVar9[1].w * uVar48 * pMVar9[1].elemsize + (long)pMVar9[1].data);
              pfVar57 = (float *)(pMVar9->cstep * uVar48 * pMVar9->elemsize + (long)pMVar9->data);
              uVar66 = 0;
              do {
                if (0 < (int)uVar64) {
                  auVar163 = *pauVar54;
                  uVar62 = uVar47;
                  do {
                    auVar251._0_4_ = auVar163._0_4_ * *pfVar57;
                    auVar251._4_4_ = auVar163._4_4_ * pfVar57[1];
                    auVar251._8_4_ = auVar163._8_4_ * pfVar57[2];
                    auVar251._12_4_ = auVar163._12_4_ * pfVar57[3];
                    auVar251._16_4_ = auVar163._16_4_ * pfVar57[4];
                    auVar251._20_4_ = auVar163._20_4_ * pfVar57[5];
                    auVar251._28_36_ = in_ZMM1._28_36_;
                    auVar251._24_4_ = auVar163._24_4_ * pfVar57[6];
                    in_ZMM1 = ZEXT3264(auVar251._0_32_);
                    *pauVar49 = auVar251._0_32_;
                    pfVar57 = pfVar57 + 8;
                    pauVar49 = pauVar49 + 1;
                    uVar65 = (int)uVar62 - 1;
                    uVar62 = (ulong)uVar65;
                  } while (uVar65 != 0);
                }
                pauVar54 = pauVar54 + 1;
                uVar66 = uVar66 + 1;
              } while (uVar66 != uVar7);
            }
            uVar48 = uVar48 + 1;
          } while (uVar48 != uVar46);
          return 0;
        }
        return 0;
      }
      if (uVar8 == uVar6 && ((uVar65 ^ 1) == 0 && (uVar5 ^ 1) == 0)) {
        Mat::create(this_00,uVar64,uVar7,uVar8,sVar71,iVar45,opt->blob_allocator);
        if (this_00->data == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep != 0) {
          if (0 < (int)uVar8) {
            uVar47 = 0;
            do {
              if (0 < (int)local_138) {
                sVar71 = pMVar9->cstep;
                sVar11 = pMVar9->elemsize;
                auVar163 = *(undefined1 (*) [32])
                            ((long)pMVar9[1].data + pMVar9[1].cstep * uVar47 * pMVar9[1].elemsize);
                pvVar12 = pMVar9->data;
                sVar13 = this_00->cstep;
                sVar14 = this_00->elemsize;
                pvVar56 = this_00->data;
                lVar60 = 0;
                iVar45 = (int)local_138;
                do {
                  pfVar57 = (float *)((long)pvVar12 + lVar60 + sVar71 * sVar11 * uVar47);
                  auVar246._0_4_ = auVar163._0_4_ * *pfVar57;
                  auVar246._4_4_ = auVar163._4_4_ * pfVar57[1];
                  auVar246._8_4_ = auVar163._8_4_ * pfVar57[2];
                  auVar246._12_4_ = auVar163._12_4_ * pfVar57[3];
                  auVar246._16_4_ = auVar163._16_4_ * pfVar57[4];
                  auVar246._20_4_ = auVar163._20_4_ * pfVar57[5];
                  auVar246._28_36_ = in_ZMM1._28_36_;
                  auVar246._24_4_ = auVar163._24_4_ * pfVar57[6];
                  in_ZMM1 = ZEXT3264(auVar246._0_32_);
                  *(undefined1 (*) [32])((long)pvVar56 + lVar60 + sVar13 * sVar14 * uVar47) =
                       auVar246._0_32_;
                  lVar60 = lVar60 + 0x20;
                  iVar45 = iVar45 + -1;
                } while (iVar45 != 0);
              }
              uVar47 = uVar47 + 1;
            } while (uVar47 != uVar46);
            return 0;
          }
          return 0;
        }
        return -100;
      }
      local_110 = sVar71;
      if (uVar65 == uVar64) {
        if (uVar66 == 1 && (uVar6 == 1 && uVar5 == uVar7)) {
          Mat::create(this_00,uVar64,uVar7,uVar8,sVar71,iVar45,opt->blob_allocator);
          if (this_00->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep != 0) {
            if (0 < (int)uVar8) {
              uVar47 = 0;
              do {
                if (0 < (int)local_138) {
                  sVar71 = pMVar9->cstep;
                  sVar11 = pMVar9->elemsize;
                  sVar13 = this_00->cstep;
                  pvVar12 = pMVar9->data;
                  pvVar56 = pMVar9[1].data;
                  sVar14 = this_00->elemsize;
                  pvVar63 = this_00->data;
                  lVar60 = 0;
                  iVar45 = (int)local_138;
                  do {
                    fVar203 = *(float *)((long)pvVar56 + lVar60);
                    pfVar57 = (float *)((long)pvVar12 + lVar60 * 8 + sVar71 * sVar11 * uVar47);
                    auVar15._4_4_ = fVar203 * pfVar57[1];
                    auVar15._0_4_ = fVar203 * *pfVar57;
                    auVar15._8_4_ = fVar203 * pfVar57[2];
                    auVar15._12_4_ = fVar203 * pfVar57[3];
                    auVar15._16_4_ = fVar203 * pfVar57[4];
                    auVar15._20_4_ = fVar203 * pfVar57[5];
                    auVar15._24_4_ = fVar203 * pfVar57[6];
                    auVar15._28_4_ = fVar203;
                    *(undefined1 (*) [32])((long)pvVar63 + lVar60 * 8 + sVar13 * sVar14 * uVar47) =
                         auVar15;
                    lVar60 = lVar60 + 4;
                    iVar45 = iVar45 + -1;
                  } while (iVar45 != 0);
                }
                uVar47 = uVar47 + 1;
              } while (uVar47 != uVar46);
              return 0;
            }
            return 0;
          }
          return -100;
        }
        local_128 = CONCAT71(local_128._1_7_,uVar64 == 1);
        local_104 = CONCAT31(local_104._1_3_,uVar7 == 1);
        if ((uVar64 != 1 || uVar7 != 1) || uVar6 != uVar8) {
          if (((iVar45 == 1) && (uVar5 == uVar7)) && (uVar8 == 1)) {
            Mat::create(this_00,uVar64,uVar7,uVar6,sVar11,uVar66,opt->blob_allocator);
            if (this_00->data == (void *)0x0) {
              return -100;
            }
            if ((long)this_00->c * this_00->cstep != 0) {
              if (0 < (int)local_130) {
                uVar47 = 0;
                do {
                  if (0 < iVar72) {
                    sVar71 = pMVar9[1].cstep;
                    sVar11 = pMVar9[1].elemsize;
                    sVar13 = this_00->cstep;
                    pvVar12 = pMVar9[1].data;
                    pvVar56 = pMVar9->data;
                    sVar14 = this_00->elemsize;
                    pvVar63 = this_00->data;
                    lVar60 = 0;
                    iVar45 = iVar72;
                    do {
                      fVar203 = *(float *)((long)pvVar56 + lVar60);
                      pfVar57 = (float *)((long)pvVar12 + lVar60 * 8 + sVar71 * sVar11 * uVar47);
                      auVar18._4_4_ = fVar203 * pfVar57[1];
                      auVar18._0_4_ = fVar203 * *pfVar57;
                      auVar18._8_4_ = fVar203 * pfVar57[2];
                      auVar18._12_4_ = fVar203 * pfVar57[3];
                      auVar18._16_4_ = fVar203 * pfVar57[4];
                      auVar18._20_4_ = fVar203 * pfVar57[5];
                      auVar18._24_4_ = fVar203 * pfVar57[6];
                      auVar18._28_4_ = fVar203;
                      *(undefined1 (*) [32])((long)pvVar63 + lVar60 * 8 + sVar13 * sVar14 * uVar47)
                           = auVar18;
                      lVar60 = lVar60 + 4;
                      iVar45 = iVar45 + -1;
                    } while (iVar45 != 0);
                  }
                  uVar47 = uVar47 + 1;
                } while ((void *)uVar47 != local_130);
                return 0;
              }
              return 0;
            }
            return -100;
          }
LAB_00245dd9:
          if ((((uVar65 ^ 1) == 0 && uVar5 == uVar7) && uVar8 == uVar6) && uVar64 != 1) {
            Mat::create(this_00,uVar64,uVar7,uVar8,sVar71,iVar45,opt->blob_allocator);
            if (this_00->data == (void *)0x0) {
              return -100;
            }
            if ((long)this_00->c * this_00->cstep != 0) {
              if (0 < (int)uVar8) {
                uVar48 = 0;
                do {
                  if (0 < (int)uVar7) {
                    sVar71 = pMVar9[1].cstep;
                    sVar11 = pMVar9[1].elemsize;
                    pvVar12 = pMVar9[1].data;
                    pauVar49 = (undefined1 (*) [32])
                               (this_00->cstep * uVar48 * this_00->elemsize + (long)this_00->data);
                    pfVar57 = (float *)(pMVar9->cstep * uVar48 * pMVar9->elemsize +
                                       (long)pMVar9->data);
                    uVar62 = 0;
                    do {
                      if (0 < (int)uVar64) {
                        auVar163 = *(undefined1 (*) [32])
                                    ((long)pvVar12 + uVar62 * 0x20 + sVar71 * uVar48 * sVar11);
                        uVar67 = uVar47;
                        do {
                          auVar256._0_4_ = auVar163._0_4_ * *pfVar57;
                          auVar256._4_4_ = auVar163._4_4_ * pfVar57[1];
                          auVar256._8_4_ = auVar163._8_4_ * pfVar57[2];
                          auVar256._12_4_ = auVar163._12_4_ * pfVar57[3];
                          auVar256._16_4_ = auVar163._16_4_ * pfVar57[4];
                          auVar256._20_4_ = auVar163._20_4_ * pfVar57[5];
                          auVar256._28_36_ = in_ZMM1._28_36_;
                          auVar256._24_4_ = auVar163._24_4_ * pfVar57[6];
                          in_ZMM1 = ZEXT3264(auVar256._0_32_);
                          *pauVar49 = auVar256._0_32_;
                          pfVar57 = pfVar57 + 8;
                          pauVar49 = pauVar49 + 1;
                          uVar66 = (int)uVar67 - 1;
                          uVar67 = (ulong)uVar66;
                        } while (uVar66 != 0);
                      }
                      uVar62 = uVar62 + 1;
                    } while (uVar62 != uVar7);
                  }
                  uVar48 = uVar48 + 1;
                } while (uVar48 != uVar46);
                return 0;
              }
              return 0;
            }
            return -100;
          }
          if (((uVar65 == uVar64 && (uVar5 ^ 1) == 0) && uVar8 == uVar6) && uVar7 != 1) {
            Mat::create(this_00,uVar64,uVar7,uVar8,sVar71,iVar45,opt->blob_allocator);
            if (this_00->data == (void *)0x0) {
              return -100;
            }
            if ((long)this_00->c * this_00->cstep != 0) {
              if (0 < (int)uVar8) {
                uVar48 = 0;
                do {
                  if (0 < (int)uVar7) {
                    sVar71 = pMVar9[1].elemsize;
                    pvVar56 = (void *)(this_00->cstep * uVar48 * this_00->elemsize +
                                      (long)this_00->data);
                    pvVar63 = (void *)(pMVar9->cstep * uVar48 * pMVar9->elemsize +
                                      (long)pMVar9->data);
                    sVar11 = pMVar9[1].cstep;
                    pvVar12 = pMVar9[1].data;
                    uVar66 = 0;
                    do {
                      if (0 < (int)uVar64) {
                        lVar60 = 0;
                        do {
                          pfVar57 = (float *)((long)pvVar12 + lVar60 + sVar71 * sVar11 * uVar48);
                          pfVar58 = (float *)((long)pvVar63 + lVar60);
                          auVar17._4_4_ = pfVar57[1] * pfVar58[1];
                          auVar17._0_4_ = *pfVar57 * *pfVar58;
                          auVar17._8_4_ = pfVar57[2] * pfVar58[2];
                          auVar17._12_4_ = pfVar57[3] * pfVar58[3];
                          auVar17._16_4_ = pfVar57[4] * pfVar58[4];
                          auVar17._20_4_ = pfVar57[5] * pfVar58[5];
                          auVar17._24_4_ = pfVar57[6] * pfVar58[6];
                          auVar17._28_4_ = pfVar57[7];
                          *(undefined1 (*) [32])((long)pvVar56 + lVar60) = auVar17;
                          lVar60 = lVar60 + 0x20;
                        } while (uVar47 << 5 != lVar60);
                        pvVar56 = (void *)((long)pvVar56 + lVar60);
                        pvVar63 = (void *)((long)pvVar63 + lVar60);
                      }
                      uVar66 = uVar66 + 1;
                    } while (uVar66 != uVar7);
                  }
                  uVar48 = uVar48 + 1;
                } while (uVar48 != uVar46);
                return 0;
              }
              return 0;
            }
            return -100;
          }
          if (((uVar6 == uVar8 && uVar5 == uVar7) & uVar65 != 1 & (byte)local_128) == 1) {
            Mat::create(this_00,uVar65,uVar7,uVar8,sVar11,uVar66,opt->blob_allocator);
            if (this_00->data == (void *)0x0) {
              return -100;
            }
            if ((long)this_00->c * this_00->cstep != 0) {
              if (0 < (int)uVar8) {
                uVar47 = 0;
                do {
                  if (0 < (int)uVar7) {
                    sVar71 = pMVar9->cstep;
                    sVar11 = pMVar9->elemsize;
                    pvVar12 = pMVar9->data;
                    pauVar49 = (undefined1 (*) [32])
                               (this_00->cstep * uVar47 * this_00->elemsize + (long)this_00->data);
                    pfVar57 = (float *)(pMVar9[1].cstep * uVar47 * pMVar9[1].elemsize +
                                       (long)pMVar9[1].data);
                    uVar48 = 0;
                    do {
                      if (0 < (int)uVar65) {
                        auVar163 = *(undefined1 (*) [32])
                                    ((long)pvVar12 + uVar48 * 0x20 + sVar71 * uVar47 * sVar11);
                        uVar66 = uVar65;
                        do {
                          auVar266._0_4_ = auVar163._0_4_ * *pfVar57;
                          auVar266._4_4_ = auVar163._4_4_ * pfVar57[1];
                          auVar266._8_4_ = auVar163._8_4_ * pfVar57[2];
                          auVar266._12_4_ = auVar163._12_4_ * pfVar57[3];
                          auVar266._16_4_ = auVar163._16_4_ * pfVar57[4];
                          auVar266._20_4_ = auVar163._20_4_ * pfVar57[5];
                          auVar266._28_36_ = in_ZMM1._28_36_;
                          auVar266._24_4_ = auVar163._24_4_ * pfVar57[6];
                          in_ZMM1 = ZEXT3264(auVar266._0_32_);
                          *pauVar49 = auVar266._0_32_;
                          pfVar57 = pfVar57 + 8;
                          pauVar49 = pauVar49 + 1;
                          uVar66 = uVar66 - 1;
                        } while (uVar66 != 0);
                      }
                      uVar48 = uVar48 + 1;
                    } while (uVar48 != uVar7);
                  }
                  uVar47 = uVar47 + 1;
                } while (uVar47 != uVar46);
                return 0;
              }
              return 0;
            }
            return -100;
          }
          if (((byte)local_104 & uVar6 == uVar8 & (uVar5 != 1 && uVar65 == uVar64)) == 1) {
            Mat::create(this_00,uVar64,uVar5,uVar8,sVar11,uVar66,opt->blob_allocator);
            if (this_00->data == (void *)0x0) {
              return -100;
            }
            if ((long)local_120->c * local_120->cstep != 0) {
              if (0 < (int)uVar8) {
                local_158 = (__m256 *)0x0;
                do {
                  pMVar1 = local_a0;
                  afVar185 = _local_100;
                  bVar74 = local_a0->dims == 3;
                  local_c8 = 1;
                  if (!bVar74) {
                    local_c8 = local_a0->d;
                  }
                  local_d4 = local_a0->w;
                  local_d0 = local_a0->h;
                  local_130 = (void *)local_a0->cstep;
                  pvVar12 = local_a0->data;
                  local_138 = local_a0->elemsize;
                  local_e0 = local_a0->allocator;
                  _fStack_f8 = 0;
                  local_100 = (undefined1  [8])
                              ((long)local_130 * (long)local_158 * local_138 + (long)pvVar12);
                  uStack_f0 = local_138;
                  fStack_e4 = afVar185[7];
                  fStack_e8 = (float)local_a0->elempack;
                  local_d8 = bVar74 ^ 3;
                  local_c0 = (long)local_d0 * (long)local_d4;
                  local_cc = 1;
                  Mat::~Mat((Mat *)local_100);
                  bVar74 = pMVar1[1].dims == 3;
                  local_c8 = 1;
                  if (!bVar74) {
                    local_c8 = pMVar1[1].d;
                  }
                  local_d4 = pMVar1[1].w;
                  local_d0 = pMVar1[1].h;
                  pvVar56 = (void *)(pMVar1[1].cstep * (long)local_158 * pMVar1[1].elemsize +
                                    (long)pMVar1[1].data);
                  local_d8 = bVar74 ^ 3;
                  local_e0 = pMVar1[1].allocator;
                  _fStack_f8 = 0;
                  local_100 = (undefined1  [8])pvVar56;
                  uStack_f0 = pMVar1[1].elemsize;
                  fStack_e8 = (float)pMVar1[1].elempack;
                  local_c0 = (long)local_d0 * (long)local_d4;
                  local_cc = 1;
                  Mat::~Mat((Mat *)local_100);
                  bVar74 = local_120->dims == 3;
                  local_d4 = local_120->w;
                  local_d0 = local_120->h;
                  local_c8 = 1;
                  if (!bVar74) {
                    local_c8 = local_120->d;
                  }
                  sVar71 = local_120->elemsize;
                  pvVar63 = (void *)(local_120->cstep * (long)local_158 * sVar71 +
                                    (long)local_120->data);
                  local_d8 = bVar74 ^ 3;
                  local_e0 = local_120->allocator;
                  fStack_f8 = 0.0;
                  fStack_f4 = 0.0;
                  local_100 = (undefined1  [8])pvVar63;
                  uStack_f0._0_4_ = (float)(int)sVar71;
                  uStack_f0._4_4_ = (float)(int)(sVar71 >> 0x20);
                  fStack_e8 = (float)local_120->elempack;
                  local_c0 = (long)local_d0 * (long)local_d4;
                  local_cc = 1;
                  Mat::~Mat((Mat *)local_100);
                  if (0 < (int)uVar5) {
                    uVar66 = 0;
                    do {
                      if (0 < (int)uVar64) {
                        lVar60 = 0;
                        do {
                          pfVar57 = (float *)((long)pvVar56 + lVar60);
                          pfVar58 = (float *)((long)pvVar12 +
                                             lVar60 + (long)local_130 * local_138 * (long)local_158)
                          ;
                          auVar20._4_4_ = pfVar57[1] * pfVar58[1];
                          auVar20._0_4_ = *pfVar57 * *pfVar58;
                          auVar20._8_4_ = pfVar57[2] * pfVar58[2];
                          auVar20._12_4_ = pfVar57[3] * pfVar58[3];
                          auVar20._16_4_ = pfVar57[4] * pfVar58[4];
                          auVar20._20_4_ = pfVar57[5] * pfVar58[5];
                          auVar20._24_4_ = pfVar57[6] * pfVar58[6];
                          auVar20._28_4_ = pfVar57[7];
                          *(undefined1 (*) [32])((long)pvVar63 + lVar60) = auVar20;
                          lVar60 = lVar60 + 0x20;
                        } while (uVar47 << 5 != lVar60);
                        pvVar63 = (void *)((long)pvVar63 + lVar60);
                        pvVar56 = (void *)((long)pvVar56 + lVar60);
                      }
                      uVar66 = uVar66 + 1;
                    } while (uVar66 != uVar5);
                  }
                  local_158 = (__m256 *)((long)local_158 + 1);
                } while (local_158 != (__m256 *)uVar46);
                return 0;
              }
              return 0;
            }
            return -100;
          }
          Mat::create(this_00,uVar64,uVar7,uVar8,sVar71,iVar45,opt->blob_allocator);
          if (this_00->data == (void *)0x0) {
            return -100;
          }
          if ((long)local_120->c * local_120->cstep != 0) {
            if (0 < (int)uVar8) {
              local_158 = (__m256 *)0x0;
              do {
                pMVar1 = local_a0;
                afVar185 = _local_100;
                bVar74 = local_a0->dims == 3;
                local_c8 = 1;
                if (!bVar74) {
                  local_c8 = local_a0->d;
                }
                local_d4 = local_a0->w;
                local_d0 = local_a0->h;
                sVar71 = local_a0->cstep;
                pvVar12 = local_a0->data;
                local_130 = (void *)local_a0->elemsize;
                local_e0 = local_a0->allocator;
                _fStack_f8 = 0;
                local_100 = (undefined1  [8])
                            (sVar71 * (long)local_158 * (long)local_130 + (long)pvVar12);
                uStack_f0 = local_130;
                fStack_e4 = afVar185[7];
                fStack_e8 = (float)local_a0->elempack;
                local_d8 = bVar74 ^ 3;
                local_c0 = (long)local_d0 * (long)local_d4;
                local_cc = 1;
                Mat::~Mat((Mat *)local_100);
                bVar74 = pMVar1[1].dims == 3;
                local_c8 = 1;
                if (!bVar74) {
                  local_c8 = pMVar1[1].d;
                }
                local_d4 = pMVar1[1].w;
                local_d0 = pMVar1[1].h;
                local_110 = pMVar1[1].cstep;
                pvVar56 = pMVar1[1].data;
                local_128 = pMVar1[1].elemsize;
                local_e0 = pMVar1[1].allocator;
                _fStack_f8 = 0;
                local_100 = (undefined1  [8])
                            (local_110 * (long)local_158 * local_128 + (long)pvVar56);
                uStack_f0 = local_128;
                fStack_e8 = (float)pMVar1[1].elempack;
                local_d8 = bVar74 ^ 3;
                local_c0 = (long)local_d0 * (long)local_d4;
                local_cc = 1;
                Mat::~Mat((Mat *)local_100);
                bVar74 = local_120->dims == 3;
                local_d4 = local_120->w;
                local_d0 = local_120->h;
                local_c8 = 1;
                if (!bVar74) {
                  local_c8 = local_120->d;
                }
                sVar11 = local_120->cstep;
                pvVar63 = local_120->data;
                sVar13 = local_120->elemsize;
                local_e0 = local_120->allocator;
                fStack_f8 = 0.0;
                fStack_f4 = 0.0;
                local_100 = (undefined1  [8])(sVar11 * (long)local_158 * sVar13 + (long)pvVar63);
                uStack_f0._0_4_ = (float)(int)sVar13;
                uStack_f0._4_4_ = (float)(int)(sVar13 >> 0x20);
                fStack_e8 = (float)local_120->elempack;
                local_d8 = bVar74 ^ 3;
                local_c0 = (long)local_d0 * (long)local_d4;
                local_cc = 1;
                Mat::~Mat((Mat *)local_100);
                if (0 < (int)local_138) {
                  lVar60 = 0;
                  iVar45 = (int)local_138;
                  do {
                    pfVar57 = (float *)((long)pvVar56 +
                                       lVar60 + local_110 * local_128 * (long)local_158);
                    pfVar58 = (float *)((long)pvVar12 +
                                       lVar60 + sVar71 * (long)local_130 * (long)local_158);
                    auVar21._4_4_ = pfVar57[1] * pfVar58[1];
                    auVar21._0_4_ = *pfVar57 * *pfVar58;
                    auVar21._8_4_ = pfVar57[2] * pfVar58[2];
                    auVar21._12_4_ = pfVar57[3] * pfVar58[3];
                    auVar21._16_4_ = pfVar57[4] * pfVar58[4];
                    auVar21._20_4_ = pfVar57[5] * pfVar58[5];
                    auVar21._24_4_ = pfVar57[6] * pfVar58[6];
                    auVar21._28_4_ = pfVar57[7];
                    *(undefined1 (*) [32])
                     ((long)pvVar63 + lVar60 + sVar11 * sVar13 * (long)local_158) = auVar21;
                    lVar60 = lVar60 + 0x20;
                    iVar45 = iVar45 + -1;
                  } while (iVar45 != 0);
                }
                local_158 = (__m256 *)((long)local_158 + 1);
              } while (local_158 != (__m256 *)uVar46);
              return 0;
            }
            return 0;
          }
          return -100;
        }
      }
      else {
        local_128 = CONCAT71(local_128._1_7_,uVar64 == 1);
        local_104 = CONCAT31(local_104._1_3_,uVar7 == 1);
        if ((uVar64 != 1 || uVar7 != 1) || uVar6 != uVar8) goto LAB_00245dd9;
      }
      Mat::create(this_00,uVar65,uVar5,uVar6,sVar11,uVar66,opt->blob_allocator);
      if (this_00->data == (void *)0x0) {
        return -100;
      }
      if ((long)this_00->c * this_00->cstep != 0) {
        if (0 < (int)local_130) {
          uVar47 = 0;
          do {
            if (0 < iVar72) {
              sVar71 = pMVar9[1].cstep;
              sVar11 = pMVar9[1].elemsize;
              auVar163 = *(undefined1 (*) [32])
                          ((long)pMVar9->data + pMVar9->cstep * uVar47 * pMVar9->elemsize);
              pvVar12 = pMVar9[1].data;
              sVar13 = this_00->cstep;
              sVar14 = this_00->elemsize;
              pvVar56 = this_00->data;
              lVar60 = 0;
              iVar45 = iVar72;
              do {
                pfVar57 = (float *)((long)pvVar12 + lVar60 + sVar71 * sVar11 * uVar47);
                auVar264._0_4_ = auVar163._0_4_ * *pfVar57;
                auVar264._4_4_ = auVar163._4_4_ * pfVar57[1];
                auVar264._8_4_ = auVar163._8_4_ * pfVar57[2];
                auVar264._12_4_ = auVar163._12_4_ * pfVar57[3];
                auVar264._16_4_ = auVar163._16_4_ * pfVar57[4];
                auVar264._20_4_ = auVar163._20_4_ * pfVar57[5];
                auVar264._28_36_ = in_ZMM1._28_36_;
                auVar264._24_4_ = auVar163._24_4_ * pfVar57[6];
                in_ZMM1 = ZEXT3264(auVar264._0_32_);
                *(undefined1 (*) [32])((long)pvVar56 + lVar60 + sVar13 * sVar14 * uVar47) =
                     auVar264._0_32_;
                lVar60 = lVar60 + 0x20;
                iVar45 = iVar45 + -1;
              } while (iVar45 != 0);
            }
            uVar47 = uVar47 + 1;
          } while ((void *)uVar47 != local_130);
          return 0;
        }
        return 0;
      }
      return -100;
    case 3:
      uVar64 = pMVar9->w;
      uVar47 = (ulong)uVar64;
      sVar71 = pMVar9->elemsize;
      uVar65 = pMVar9[1].w;
      uVar5 = pMVar9[1].h;
      uVar6 = pMVar9[1].c;
      local_130 = (void *)(ulong)uVar6;
      iVar72 = uVar5 * uVar65;
      sVar11 = pMVar9[1].elemsize;
      iVar59 = pMVar9->dims;
      if (iVar59 == 1) {
        iVar59 = pMVar9[1].dims;
        if (iVar45 != 1 || uVar64 != 1) {
          if (iVar59 == 1) {
            Mat::create(this_00,uVar64,sVar71,iVar45,opt->blob_allocator);
            pvVar12 = this_00->data;
            if (pvVar12 == (void *)0x0) {
              return -100;
            }
            if ((long)this_00->c * this_00->cstep == 0) {
              return -100;
            }
            if (uVar66 != 1 || pMVar9[1].w != 1) {
              if (0 < (int)uVar64) {
                pvVar56 = pMVar9->data;
                pvVar63 = pMVar9[1].data;
                lVar60 = 0;
                do {
                  auVar163 = *(undefined1 (*) [32])((long)pvVar63 + lVar60);
                  auVar299 = vrcpps_avx(auVar163);
                  auVar160 = *(undefined1 (*) [32])((long)pvVar56 + lVar60);
                  auVar320._0_4_ = auVar160._0_4_ * auVar299._0_4_;
                  auVar320._4_4_ = auVar160._4_4_ * auVar299._4_4_;
                  auVar320._8_4_ = auVar160._8_4_ * auVar299._8_4_;
                  auVar320._12_4_ = auVar160._12_4_ * auVar299._12_4_;
                  auVar320._16_4_ = auVar160._16_4_ * auVar299._16_4_;
                  auVar320._20_4_ = auVar160._20_4_ * auVar299._20_4_;
                  auVar320._28_36_ = in_ZMM3._28_36_;
                  auVar320._24_4_ = auVar160._24_4_ * auVar299._24_4_;
                  auVar142 = auVar320._0_32_;
                  in_ZMM3 = ZEXT3264(auVar142);
                  auVar106 = vfmsub213ps_fma(auVar163,auVar142,auVar160);
                  auVar106 = vfnmadd213ps_fma(ZEXT1632(auVar106),auVar299,auVar142);
                  *(undefined1 (*) [32])((long)pvVar12 + lVar60) = ZEXT1632(auVar106);
                  lVar60 = lVar60 + 0x20;
                  uVar66 = (int)uVar47 - 1;
                  uVar47 = (ulong)uVar66;
                } while (uVar66 != 0);
                return 0;
              }
              return 0;
            }
            if (0 < (int)uVar64) {
              fVar203 = 1.0 / *pMVar1->data;
              pvVar56 = pMVar9->data;
              lVar60 = 0;
              do {
                pfVar57 = (float *)((long)pvVar56 + lVar60);
                auVar257._0_4_ = fVar203 * *pfVar57;
                auVar257._4_4_ = fVar203 * pfVar57[1];
                auVar257._8_4_ = fVar203 * pfVar57[2];
                auVar257._12_4_ = fVar203 * pfVar57[3];
                auVar257._16_4_ = fVar203 * pfVar57[4];
                auVar257._20_4_ = fVar203 * pfVar57[5];
                auVar257._28_36_ = in_ZMM1._28_36_;
                auVar257._24_4_ = fVar203 * pfVar57[6];
                in_ZMM1 = ZEXT3264(auVar257._0_32_);
                *(undefined1 (*) [32])((long)pvVar12 + lVar60) = auVar257._0_32_;
                lVar60 = lVar60 + 0x20;
                uVar66 = (int)uVar47 - 1;
                uVar47 = (ulong)uVar66;
              } while (uVar66 != 0);
              return 0;
            }
            return 0;
          }
          if (iVar59 == 2) {
            Mat::create(this_00,uVar65,uVar5,sVar11,uVar66,opt->blob_allocator);
            pauVar49 = (undefined1 (*) [32])this_00->data;
            if (pauVar49 == (undefined1 (*) [32])0x0) {
              return -100;
            }
            if ((long)this_00->c * this_00->cstep != 0) {
              if (0 < (int)uVar5) {
                pauVar54 = (undefined1 (*) [32])pMVar9->data;
                pauVar52 = (undefined1 (*) [32])pMVar9[1].data;
                uVar66 = 0;
                do {
                  if (0 < (int)uVar65) {
                    auVar163 = *pauVar54;
                    uVar64 = uVar65;
                    do {
                      auVar160 = vrcpps_avx(*pauVar52);
                      auVar309._0_4_ = auVar163._0_4_ * auVar160._0_4_;
                      auVar309._4_4_ = auVar163._4_4_ * auVar160._4_4_;
                      auVar309._8_4_ = auVar163._8_4_ * auVar160._8_4_;
                      auVar309._12_4_ = auVar163._12_4_ * auVar160._12_4_;
                      auVar309._16_4_ = auVar163._16_4_ * auVar160._16_4_;
                      auVar309._20_4_ = auVar163._20_4_ * auVar160._20_4_;
                      auVar309._28_36_ = in_ZMM3._28_36_;
                      auVar309._24_4_ = auVar163._24_4_ * auVar160._24_4_;
                      auVar299 = auVar309._0_32_;
                      in_ZMM3 = ZEXT3264(auVar299);
                      auVar106 = vfmsub213ps_fma(*pauVar52,auVar299,auVar163);
                      auVar106 = vfnmadd213ps_fma(ZEXT1632(auVar106),auVar160,auVar299);
                      *pauVar49 = ZEXT1632(auVar106);
                      pauVar52 = pauVar52 + 1;
                      pauVar49 = pauVar49 + 1;
                      uVar64 = uVar64 - 1;
                    } while (uVar64 != 0);
                  }
                  pauVar54 = pauVar54 + 1;
                  uVar66 = uVar66 + 1;
                } while (uVar66 != uVar5);
                return 0;
              }
              return 0;
            }
            return -100;
          }
          if (iVar59 != 3) {
            return 0;
          }
          Mat::create(this_00,uVar65,uVar5,uVar6,sVar11,uVar66,opt->blob_allocator);
          if (this_00->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep == 0) {
            return -100;
          }
          if (0 < (int)local_130) {
            uVar47 = 0;
            do {
              if (0 < iVar72) {
                sVar71 = this_00->cstep;
                sVar11 = this_00->elemsize;
                auVar163 = *(undefined1 (*) [32])((long)pMVar9->data + uVar47 * 0x20);
                pvVar12 = this_00->data;
                sVar13 = pMVar9[1].cstep;
                sVar14 = pMVar9[1].elemsize;
                pvVar56 = pMVar9[1].data;
                lVar60 = 0;
                iVar45 = iVar72;
                do {
                  auVar160 = *(undefined1 (*) [32])
                              ((long)pvVar56 + lVar60 + sVar13 * sVar14 * uVar47);
                  auVar299 = vrcpps_avx(auVar160);
                  auVar304._0_4_ = auVar163._0_4_ * auVar299._0_4_;
                  auVar304._4_4_ = auVar163._4_4_ * auVar299._4_4_;
                  auVar304._8_4_ = auVar163._8_4_ * auVar299._8_4_;
                  auVar304._12_4_ = auVar163._12_4_ * auVar299._12_4_;
                  auVar304._16_4_ = auVar163._16_4_ * auVar299._16_4_;
                  auVar304._20_4_ = auVar163._20_4_ * auVar299._20_4_;
                  auVar304._28_36_ = in_ZMM3._28_36_;
                  auVar304._24_4_ = auVar163._24_4_ * auVar299._24_4_;
                  auVar142 = auVar304._0_32_;
                  in_ZMM3 = ZEXT3264(auVar142);
                  auVar106 = vfmsub213ps_fma(auVar160,auVar142,auVar163);
                  auVar106 = vfnmadd213ps_fma(ZEXT1632(auVar106),auVar299,auVar142);
                  *(undefined1 (*) [32])((long)pvVar12 + lVar60 + sVar71 * sVar11 * uVar47) =
                       ZEXT1632(auVar106);
                  lVar60 = lVar60 + 0x20;
                  iVar45 = iVar45 + -1;
                } while (iVar45 != 0);
              }
              uVar47 = uVar47 + 1;
            } while ((void *)uVar47 != local_130);
            return 0;
          }
          return 0;
        }
        if (iVar59 == 1) {
          Mat::create(this_00,uVar65,sVar11,uVar66,opt->blob_allocator);
          pvVar12 = this_00->data;
          if (pvVar12 == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep != 0) {
            if (0 < (int)uVar65) {
              fVar203 = *pMVar9->data;
              auVar153._4_4_ = fVar203;
              auVar153._0_4_ = fVar203;
              auVar153._8_4_ = fVar203;
              auVar153._12_4_ = fVar203;
              auVar153._16_4_ = fVar203;
              auVar153._20_4_ = fVar203;
              auVar153._24_4_ = fVar203;
              auVar153._28_4_ = fVar203;
              pvVar56 = pMVar1->data;
              lVar60 = 0;
              do {
                auVar163 = *(undefined1 (*) [32])((long)pvVar56 + lVar60);
                auVar160 = vrcpps_avx(auVar163);
                auVar310._0_4_ = fVar203 * auVar160._0_4_;
                auVar310._4_4_ = fVar203 * auVar160._4_4_;
                auVar310._8_4_ = fVar203 * auVar160._8_4_;
                auVar310._12_4_ = fVar203 * auVar160._12_4_;
                auVar310._16_4_ = fVar203 * auVar160._16_4_;
                auVar310._20_4_ = fVar203 * auVar160._20_4_;
                auVar310._28_36_ = in_ZMM3._28_36_;
                auVar310._24_4_ = fVar203 * auVar160._24_4_;
                auVar299 = auVar310._0_32_;
                in_ZMM3 = ZEXT3264(auVar299);
                auVar106 = vfmsub213ps_fma(auVar163,auVar299,auVar153);
                auVar106 = vfnmadd213ps_fma(ZEXT1632(auVar106),auVar160,auVar299);
                *(undefined1 (*) [32])((long)pvVar12 + lVar60) = ZEXT1632(auVar106);
                lVar60 = lVar60 + 0x20;
                uVar65 = uVar65 - 1;
              } while (uVar65 != 0);
              return 0;
            }
            return 0;
          }
          return -100;
        }
        if (iVar59 == 2) {
          Mat::create(this_00,uVar65,uVar5,sVar11,uVar66,opt->blob_allocator);
          pvVar12 = this_00->data;
          if (pvVar12 == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep != 0) {
            if (0 < iVar72) {
              fVar203 = *pMVar9->data;
              auVar150._4_4_ = fVar203;
              auVar150._0_4_ = fVar203;
              auVar150._8_4_ = fVar203;
              auVar150._12_4_ = fVar203;
              auVar150._16_4_ = fVar203;
              auVar150._20_4_ = fVar203;
              auVar150._24_4_ = fVar203;
              auVar150._28_4_ = fVar203;
              pvVar56 = pMVar1->data;
              lVar60 = 0;
              do {
                auVar163 = *(undefined1 (*) [32])((long)pvVar56 + lVar60);
                auVar160 = vrcpps_avx(auVar163);
                auVar308._0_4_ = fVar203 * auVar160._0_4_;
                auVar308._4_4_ = fVar203 * auVar160._4_4_;
                auVar308._8_4_ = fVar203 * auVar160._8_4_;
                auVar308._12_4_ = fVar203 * auVar160._12_4_;
                auVar308._16_4_ = fVar203 * auVar160._16_4_;
                auVar308._20_4_ = fVar203 * auVar160._20_4_;
                auVar308._28_36_ = in_ZMM3._28_36_;
                auVar308._24_4_ = fVar203 * auVar160._24_4_;
                auVar299 = auVar308._0_32_;
                in_ZMM3 = ZEXT3264(auVar299);
                auVar106 = vfmsub213ps_fma(auVar163,auVar299,auVar150);
                auVar106 = vfnmadd213ps_fma(ZEXT1632(auVar106),auVar160,auVar299);
                *(undefined1 (*) [32])((long)pvVar12 + lVar60) = ZEXT1632(auVar106);
                lVar60 = lVar60 + 0x20;
                iVar72 = iVar72 + -1;
              } while (iVar72 != 0);
              return 0;
            }
            return 0;
          }
          return -100;
        }
        if (iVar59 != 3) {
          return 0;
        }
        Mat::create(this_00,uVar65,uVar5,uVar6,sVar11,uVar66,opt->blob_allocator);
        if (this_00->data == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep == 0) {
          return -100;
        }
        if (0 < (int)local_130) {
          fVar203 = *pMVar9->data;
          auVar136._4_4_ = fVar203;
          auVar136._0_4_ = fVar203;
          auVar136._8_4_ = fVar203;
          auVar136._12_4_ = fVar203;
          auVar136._16_4_ = fVar203;
          auVar136._20_4_ = fVar203;
          auVar136._24_4_ = fVar203;
          auVar136._28_4_ = fVar203;
          uVar47 = 0;
          do {
            if (0 < iVar72) {
              sVar71 = this_00->cstep;
              sVar11 = this_00->elemsize;
              pvVar12 = this_00->data;
              sVar13 = pMVar9[1].cstep;
              sVar14 = pMVar9[1].elemsize;
              pvVar56 = pMVar9[1].data;
              lVar60 = 0;
              iVar45 = iVar72;
              do {
                auVar163 = *(undefined1 (*) [32])((long)pvVar56 + lVar60 + sVar13 * sVar14 * uVar47)
                ;
                auVar160 = vrcpps_avx(auVar163);
                auVar302._0_4_ = fVar203 * auVar160._0_4_;
                auVar302._4_4_ = fVar203 * auVar160._4_4_;
                auVar302._8_4_ = fVar203 * auVar160._8_4_;
                auVar302._12_4_ = fVar203 * auVar160._12_4_;
                auVar302._16_4_ = fVar203 * auVar160._16_4_;
                auVar302._20_4_ = fVar203 * auVar160._20_4_;
                auVar302._28_36_ = in_ZMM3._28_36_;
                auVar302._24_4_ = fVar203 * auVar160._24_4_;
                auVar299 = auVar302._0_32_;
                in_ZMM3 = ZEXT3264(auVar299);
                auVar106 = vfmsub213ps_fma(auVar163,auVar299,auVar136);
                auVar106 = vfnmadd213ps_fma(ZEXT1632(auVar106),auVar160,auVar299);
                *(undefined1 (*) [32])((long)pvVar12 + lVar60 + sVar71 * sVar11 * uVar47) =
                     ZEXT1632(auVar106);
                lVar60 = lVar60 + 0x20;
                iVar45 = iVar45 + -1;
              } while (iVar45 != 0);
            }
            uVar47 = uVar47 + 1;
          } while ((void *)uVar47 != local_130);
          return 0;
        }
        return 0;
      }
      uVar7 = pMVar9->h;
      local_138 = CONCAT44(local_138._4_4_,uVar7 * uVar64);
      if (iVar59 == 2) {
        if (pMVar9[1].dims == 3) {
          Mat::create(this_00,uVar65,uVar5,uVar6,sVar11,uVar66,opt->blob_allocator);
          if (this_00->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep != 0) {
            if (0 < (int)local_130) {
              uVar47 = 0;
              do {
                if (0 < (int)uVar5) {
                  pauVar49 = (undefined1 (*) [32])
                             (this_00->cstep * uVar47 * this_00->elemsize + (long)this_00->data);
                  pauVar54 = (undefined1 (*) [32])
                             (pMVar9[1].cstep * uVar47 * pMVar9[1].elemsize + (long)pMVar9[1].data);
                  pauVar52 = (undefined1 (*) [32])
                             ((long)pMVar9->w * uVar47 * pMVar9->elemsize + (long)pMVar9->data);
                  uVar66 = 0;
                  do {
                    if (0 < (int)uVar65) {
                      auVar163 = *pauVar52;
                      uVar64 = uVar65;
                      do {
                        auVar160 = vrcpps_avx(*pauVar54);
                        auVar301._0_4_ = auVar163._0_4_ * auVar160._0_4_;
                        auVar301._4_4_ = auVar163._4_4_ * auVar160._4_4_;
                        auVar301._8_4_ = auVar163._8_4_ * auVar160._8_4_;
                        auVar301._12_4_ = auVar163._12_4_ * auVar160._12_4_;
                        auVar301._16_4_ = auVar163._16_4_ * auVar160._16_4_;
                        auVar301._20_4_ = auVar163._20_4_ * auVar160._20_4_;
                        auVar301._28_36_ = in_ZMM3._28_36_;
                        auVar301._24_4_ = auVar163._24_4_ * auVar160._24_4_;
                        auVar299 = auVar301._0_32_;
                        in_ZMM3 = ZEXT3264(auVar299);
                        auVar106 = vfmsub213ps_fma(*pauVar54,auVar299,auVar163);
                        auVar106 = vfnmadd213ps_fma(ZEXT1632(auVar106),auVar160,auVar299);
                        *pauVar49 = ZEXT1632(auVar106);
                        pauVar54 = pauVar54 + 1;
                        pauVar49 = pauVar49 + 1;
                        uVar64 = uVar64 - 1;
                      } while (uVar64 != 0);
                    }
                    pauVar52 = pauVar52 + 1;
                    uVar66 = uVar66 + 1;
                  } while (uVar66 != uVar5);
                }
                uVar47 = uVar47 + 1;
              } while ((void *)uVar47 != local_130);
              return 0;
            }
            return 0;
          }
          return -100;
        }
        local_128 = CONCAT44(uVar4,uVar66);
        Mat::create(this_00,uVar64,uVar7,sVar71,iVar45,opt->blob_allocator);
        pvVar12 = this_00->data;
        if (pvVar12 == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep == 0) {
          return -100;
        }
        if (pMVar9[1].dims != 1) {
          if (pMVar9[1].dims != 2) {
            return 0;
          }
          if (0 < (int)local_138) {
            pvVar56 = pMVar9->data;
            pvVar63 = pMVar9[1].data;
            lVar60 = 0;
            do {
              auVar163 = *(undefined1 (*) [32])((long)pvVar63 + lVar60);
              auVar299 = vrcpps_avx(auVar163);
              auVar160 = *(undefined1 (*) [32])((long)pvVar56 + lVar60);
              auVar303._0_4_ = auVar160._0_4_ * auVar299._0_4_;
              auVar303._4_4_ = auVar160._4_4_ * auVar299._4_4_;
              auVar303._8_4_ = auVar160._8_4_ * auVar299._8_4_;
              auVar303._12_4_ = auVar160._12_4_ * auVar299._12_4_;
              auVar303._16_4_ = auVar160._16_4_ * auVar299._16_4_;
              auVar303._20_4_ = auVar160._20_4_ * auVar299._20_4_;
              auVar303._28_36_ = in_ZMM3._28_36_;
              auVar303._24_4_ = auVar160._24_4_ * auVar299._24_4_;
              auVar142 = auVar303._0_32_;
              in_ZMM3 = ZEXT3264(auVar142);
              auVar106 = vfmsub213ps_fma(auVar163,auVar142,auVar160);
              auVar106 = vfnmadd213ps_fma(ZEXT1632(auVar106),auVar299,auVar142);
              *(undefined1 (*) [32])((long)pvVar12 + lVar60) = ZEXT1632(auVar106);
              lVar60 = lVar60 + 0x20;
              local_138._0_4_ = (int)local_138 + -1;
            } while ((int)local_138 != 0);
            return 0;
          }
          return 0;
        }
        Mat::create(this_00,uVar64,uVar7,sVar71,iVar45,opt->blob_allocator);
        pauVar49 = (undefined1 (*) [32])this_00->data;
        if (pauVar49 == (undefined1 (*) [32])0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep != 0) {
          if ((int)local_128 != 1 || pMVar9[1].w != 1) {
            if (0 < (int)uVar7) {
              pfVar57 = (float *)pMVar9->data;
              pauVar54 = (undefined1 (*) [32])pMVar9[1].data;
              uVar66 = 0;
              auVar183._8_4_ = 0x3f800000;
              auVar183._0_8_ = 0x3f8000003f800000;
              auVar183._12_4_ = 0x3f800000;
              auVar183._16_4_ = 0x3f800000;
              auVar183._20_4_ = 0x3f800000;
              auVar183._24_4_ = 0x3f800000;
              auVar183._28_4_ = 0x3f800000;
              do {
                if (0 < (int)uVar64) {
                  auVar163 = vrcpps_avx(*pauVar54);
                  auVar106 = vfmsub213ps_fma(*pauVar54,auVar163,auVar183);
                  auVar106 = vfnmadd132ps_fma(ZEXT1632(auVar106),auVar163,auVar163);
                  uVar46 = uVar47;
                  do {
                    auVar30._4_4_ = auVar106._4_4_ * pfVar57[1];
                    auVar30._0_4_ = auVar106._0_4_ * *pfVar57;
                    auVar30._8_4_ = auVar106._8_4_ * pfVar57[2];
                    auVar30._12_4_ = auVar106._12_4_ * pfVar57[3];
                    auVar30._16_4_ = pfVar57[4] * 0.0;
                    auVar30._20_4_ = pfVar57[5] * 0.0;
                    auVar30._24_4_ = pfVar57[6] * 0.0;
                    auVar30._28_4_ = auVar163._28_4_;
                    *pauVar49 = auVar30;
                    pfVar57 = pfVar57 + 8;
                    pauVar49 = pauVar49 + 1;
                    uVar65 = (int)uVar46 - 1;
                    uVar46 = (ulong)uVar65;
                    auVar163 = auVar30;
                  } while (uVar65 != 0);
                }
                pauVar54 = pauVar54 + 1;
                uVar66 = uVar66 + 1;
              } while (uVar66 != uVar7);
              return 0;
            }
            return 0;
          }
          if (0 < (int)local_138) {
            fVar203 = 1.0 / *pMVar1->data;
            pvVar12 = pMVar9->data;
            lVar60 = 0;
            do {
              pfVar57 = (float *)((long)pvVar12 + lVar60);
              auVar261._0_4_ = fVar203 * *pfVar57;
              auVar261._4_4_ = fVar203 * pfVar57[1];
              auVar261._8_4_ = fVar203 * pfVar57[2];
              auVar261._12_4_ = fVar203 * pfVar57[3];
              auVar261._16_4_ = fVar203 * pfVar57[4];
              auVar261._20_4_ = fVar203 * pfVar57[5];
              auVar261._28_36_ = in_ZMM1._28_36_;
              auVar261._24_4_ = fVar203 * pfVar57[6];
              in_ZMM1 = ZEXT3264(auVar261._0_32_);
              *(undefined1 (*) [32])((long)*pauVar49 + lVar60) = auVar261._0_32_;
              lVar60 = lVar60 + 0x20;
              local_138._0_4_ = (int)local_138 + -1;
            } while ((int)local_138 != 0);
            return 0;
          }
          return 0;
        }
        return -100;
      }
      if (iVar59 != 3) {
        return 0;
      }
      uVar8 = pMVar9->c;
      uVar46 = (ulong)uVar8;
      if (pMVar9[1].dims != 3) {
        Mat::create(this_00,uVar64,uVar7,uVar8,sVar71,iVar45,opt->blob_allocator);
        if (this_00->data == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep == 0) {
          return -100;
        }
        if (pMVar9[1].dims == 1) {
          if (uVar66 != 1 || pMVar9[1].w != 1) {
            if (0 < (int)uVar8) {
              uVar47 = 0;
              auVar176._8_4_ = 0x3f800000;
              auVar176._0_8_ = 0x3f8000003f800000;
              auVar176._12_4_ = 0x3f800000;
              auVar176._16_4_ = 0x3f800000;
              auVar176._20_4_ = 0x3f800000;
              auVar176._24_4_ = 0x3f800000;
              auVar176._28_4_ = 0x3f800000;
              do {
                if (0 < (int)local_138) {
                  auVar163 = *(undefined1 (*) [32])((long)pMVar9[1].data + uVar47 * 0x20);
                  auVar160 = vrcpps_avx(auVar163);
                  sVar71 = pMVar9->cstep;
                  sVar11 = this_00->cstep;
                  sVar13 = this_00->elemsize;
                  auVar106 = vfmsub213ps_fma(auVar163,auVar160,auVar176);
                  pvVar12 = this_00->data;
                  auVar106 = vfnmadd132ps_fma(ZEXT1632(auVar106),auVar160,auVar160);
                  sVar14 = pMVar9->elemsize;
                  pvVar56 = pMVar9->data;
                  lVar60 = 0;
                  iVar45 = (int)local_138;
                  do {
                    pfVar57 = (float *)((long)pvVar56 + lVar60 + sVar71 * sVar14 * uVar47);
                    auVar28._4_4_ = auVar106._4_4_ * pfVar57[1];
                    auVar28._0_4_ = auVar106._0_4_ * *pfVar57;
                    auVar28._8_4_ = auVar106._8_4_ * pfVar57[2];
                    auVar28._12_4_ = auVar106._12_4_ * pfVar57[3];
                    auVar28._16_4_ = pfVar57[4] * 0.0;
                    auVar28._20_4_ = pfVar57[5] * 0.0;
                    auVar28._24_4_ = pfVar57[6] * 0.0;
                    auVar28._28_4_ = auVar160._28_4_;
                    *(undefined1 (*) [32])((long)pvVar12 + lVar60 + sVar11 * sVar13 * uVar47) =
                         auVar28;
                    lVar60 = lVar60 + 0x20;
                    iVar45 = iVar45 + -1;
                    auVar160 = auVar28;
                  } while (iVar45 != 0);
                }
                uVar47 = uVar47 + 1;
              } while (uVar47 != uVar46);
              return 0;
            }
            return 0;
          }
          if (0 < (int)uVar8) {
            fVar203 = 1.0 / *pMVar9[1].data;
            uVar47 = 0;
            do {
              if (0 < (int)local_138) {
                sVar71 = this_00->cstep;
                sVar11 = this_00->elemsize;
                pvVar12 = this_00->data;
                sVar13 = pMVar9->cstep;
                sVar14 = pMVar9->elemsize;
                pvVar56 = pMVar9->data;
                lVar60 = 0;
                iVar45 = (int)local_138;
                do {
                  pfVar57 = (float *)((long)pvVar56 + lVar60 + sVar13 * sVar14 * uVar47);
                  auVar263._0_4_ = fVar203 * *pfVar57;
                  auVar263._4_4_ = fVar203 * pfVar57[1];
                  auVar263._8_4_ = fVar203 * pfVar57[2];
                  auVar263._12_4_ = fVar203 * pfVar57[3];
                  auVar263._16_4_ = fVar203 * pfVar57[4];
                  auVar263._20_4_ = fVar203 * pfVar57[5];
                  auVar263._28_36_ = in_ZMM1._28_36_;
                  auVar263._24_4_ = fVar203 * pfVar57[6];
                  in_ZMM1 = ZEXT3264(auVar263._0_32_);
                  *(undefined1 (*) [32])((long)pvVar12 + lVar60 + sVar71 * sVar11 * uVar47) =
                       auVar263._0_32_;
                  lVar60 = lVar60 + 0x20;
                  iVar45 = iVar45 + -1;
                } while (iVar45 != 0);
              }
              uVar47 = uVar47 + 1;
            } while (uVar47 != uVar46);
            return 0;
          }
          return 0;
        }
        if (pMVar9[1].dims != 2) {
          return 0;
        }
        if (0 < (int)uVar8) {
          uVar48 = 0;
          auVar141._8_4_ = 0x3f800000;
          auVar141._0_8_ = 0x3f8000003f800000;
          auVar141._12_4_ = 0x3f800000;
          auVar141._16_4_ = 0x3f800000;
          auVar141._20_4_ = 0x3f800000;
          auVar141._24_4_ = 0x3f800000;
          auVar141._28_4_ = 0x3f800000;
          do {
            if (0 < (int)uVar7) {
              pauVar49 = (undefined1 (*) [32])
                         (this_00->cstep * uVar48 * this_00->elemsize + (long)this_00->data);
              pauVar54 = (undefined1 (*) [32])
                         ((long)pMVar9[1].w * uVar48 * pMVar9[1].elemsize + (long)pMVar9[1].data);
              pfVar57 = (float *)(pMVar9->cstep * uVar48 * pMVar9->elemsize + (long)pMVar9->data);
              uVar66 = 0;
              do {
                if (0 < (int)uVar64) {
                  auVar163 = vrcpps_avx(*pauVar54);
                  auVar106 = vfmsub213ps_fma(*pauVar54,auVar163,auVar141);
                  auVar106 = vfnmadd132ps_fma(ZEXT1632(auVar106),auVar163,auVar163);
                  uVar62 = uVar47;
                  do {
                    auVar24._4_4_ = auVar106._4_4_ * pfVar57[1];
                    auVar24._0_4_ = auVar106._0_4_ * *pfVar57;
                    auVar24._8_4_ = auVar106._8_4_ * pfVar57[2];
                    auVar24._12_4_ = auVar106._12_4_ * pfVar57[3];
                    auVar24._16_4_ = pfVar57[4] * 0.0;
                    auVar24._20_4_ = pfVar57[5] * 0.0;
                    auVar24._24_4_ = pfVar57[6] * 0.0;
                    auVar24._28_4_ = auVar163._28_4_;
                    *pauVar49 = auVar24;
                    pfVar57 = pfVar57 + 8;
                    pauVar49 = pauVar49 + 1;
                    uVar65 = (int)uVar62 - 1;
                    uVar62 = (ulong)uVar65;
                    auVar163 = auVar24;
                  } while (uVar65 != 0);
                }
                pauVar54 = pauVar54 + 1;
                uVar66 = uVar66 + 1;
              } while (uVar66 != uVar7);
            }
            uVar48 = uVar48 + 1;
          } while (uVar48 != uVar46);
          return 0;
        }
        return 0;
      }
      if (uVar8 == uVar6 && ((uVar65 ^ 1) == 0 && (uVar5 ^ 1) == 0)) {
        Mat::create(this_00,uVar64,uVar7,uVar8,sVar71,iVar45,opt->blob_allocator);
        if (this_00->data == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep != 0) {
          if (0 < (int)uVar8) {
            uVar47 = 0;
            auVar134._8_4_ = 0x3f800000;
            auVar134._0_8_ = 0x3f8000003f800000;
            auVar134._12_4_ = 0x3f800000;
            auVar134._16_4_ = 0x3f800000;
            auVar134._20_4_ = 0x3f800000;
            auVar134._24_4_ = 0x3f800000;
            auVar134._28_4_ = 0x3f800000;
            do {
              if (0 < (int)local_138) {
                auVar163 = *(undefined1 (*) [32])
                            ((long)pMVar9[1].data + pMVar9[1].cstep * uVar47 * pMVar9[1].elemsize);
                auVar160 = vrcpps_avx(auVar163);
                sVar71 = pMVar9->cstep;
                auVar106 = vfmsub213ps_fma(auVar163,auVar160,auVar134);
                sVar11 = pMVar9->elemsize;
                auVar106 = vfnmadd132ps_fma(ZEXT1632(auVar106),auVar160,auVar160);
                pvVar12 = pMVar9->data;
                sVar13 = this_00->cstep;
                sVar14 = this_00->elemsize;
                pvVar56 = this_00->data;
                lVar60 = 0;
                iVar45 = (int)local_138;
                do {
                  pfVar57 = (float *)((long)pvVar12 + lVar60 + sVar71 * sVar11 * uVar47);
                  auVar22._4_4_ = auVar106._4_4_ * pfVar57[1];
                  auVar22._0_4_ = auVar106._0_4_ * *pfVar57;
                  auVar22._8_4_ = auVar106._8_4_ * pfVar57[2];
                  auVar22._12_4_ = auVar106._12_4_ * pfVar57[3];
                  auVar22._16_4_ = pfVar57[4] * 0.0;
                  auVar22._20_4_ = pfVar57[5] * 0.0;
                  auVar22._24_4_ = pfVar57[6] * 0.0;
                  auVar22._28_4_ = auVar160._28_4_;
                  *(undefined1 (*) [32])((long)pvVar56 + lVar60 + sVar13 * sVar14 * uVar47) =
                       auVar22;
                  lVar60 = lVar60 + 0x20;
                  iVar45 = iVar45 + -1;
                  auVar160 = auVar22;
                } while (iVar45 != 0);
              }
              uVar47 = uVar47 + 1;
            } while (uVar47 != uVar46);
            return 0;
          }
          return 0;
        }
        return -100;
      }
      local_110 = sVar71;
      if (uVar65 == uVar64) {
        if (uVar66 == 1 && (uVar6 == 1 && uVar5 == uVar7)) {
          Mat::create(this_00,uVar64,uVar7,uVar8,sVar71,iVar45,opt->blob_allocator);
          if (this_00->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep != 0) {
            if (0 < (int)uVar8) {
              uVar47 = 0;
              do {
                if (0 < (int)local_138) {
                  sVar71 = pMVar9->cstep;
                  sVar11 = pMVar9->elemsize;
                  sVar13 = this_00->cstep;
                  pvVar12 = pMVar9->data;
                  pvVar56 = pMVar9[1].data;
                  sVar14 = this_00->elemsize;
                  pvVar63 = this_00->data;
                  lVar60 = 0;
                  iVar45 = (int)local_138;
                  do {
                    fVar203 = 1.0 / *(float *)((long)pvVar56 + lVar60);
                    pfVar57 = (float *)((long)pvVar12 + lVar60 * 8 + sVar71 * sVar11 * uVar47);
                    auVar16._4_4_ = fVar203 * pfVar57[1];
                    auVar16._0_4_ = fVar203 * *pfVar57;
                    auVar16._8_4_ = fVar203 * pfVar57[2];
                    auVar16._12_4_ = fVar203 * pfVar57[3];
                    auVar16._16_4_ = fVar203 * pfVar57[4];
                    auVar16._20_4_ = fVar203 * pfVar57[5];
                    auVar16._24_4_ = fVar203 * pfVar57[6];
                    auVar16._28_4_ = fVar203;
                    *(undefined1 (*) [32])((long)pvVar63 + lVar60 * 8 + sVar13 * sVar14 * uVar47) =
                         auVar16;
                    lVar60 = lVar60 + 4;
                    iVar45 = iVar45 + -1;
                  } while (iVar45 != 0);
                }
                uVar47 = uVar47 + 1;
              } while (uVar47 != uVar46);
              return 0;
            }
            return 0;
          }
          return -100;
        }
        local_128 = CONCAT71(local_128._1_7_,uVar64 == 1);
        local_104 = CONCAT31(local_104._1_3_,uVar7 == 1);
        if ((uVar64 != 1 || uVar7 != 1) || uVar6 != uVar8) {
          if (((iVar45 == 1) && (uVar5 == uVar7)) && (uVar8 == 1)) {
            Mat::create(this_00,uVar64,uVar7,uVar6,sVar11,uVar66,opt->blob_allocator);
            if (this_00->data == (void *)0x0) {
              return -100;
            }
            if ((long)this_00->c * this_00->cstep != 0) {
              if (0 < (int)local_130) {
                uVar47 = 0;
                do {
                  if (0 < iVar72) {
                    sVar71 = pMVar9[1].cstep;
                    sVar11 = pMVar9[1].elemsize;
                    sVar13 = this_00->cstep;
                    pvVar12 = pMVar9[1].data;
                    pvVar56 = pMVar9->data;
                    sVar14 = this_00->elemsize;
                    pvVar63 = this_00->data;
                    lVar60 = 0;
                    iVar45 = iVar72;
                    do {
                      auVar163 = *(undefined1 (*) [32])
                                  ((long)pvVar12 + lVar60 * 8 + sVar71 * sVar11 * uVar47);
                      auVar160 = vrcpps_avx(auVar163);
                      fVar203 = *(float *)((long)pvVar56 + lVar60);
                      auVar270._4_4_ = fVar203;
                      auVar270._0_4_ = fVar203;
                      auVar270._8_4_ = fVar203;
                      auVar270._12_4_ = fVar203;
                      auVar270._16_4_ = fVar203;
                      auVar270._20_4_ = fVar203;
                      auVar270._24_4_ = fVar203;
                      auVar270._28_4_ = fVar203;
                      auVar319._0_4_ = fVar203 * auVar160._0_4_;
                      auVar319._4_4_ = fVar203 * auVar160._4_4_;
                      auVar319._8_4_ = fVar203 * auVar160._8_4_;
                      auVar319._12_4_ = fVar203 * auVar160._12_4_;
                      auVar319._16_4_ = fVar203 * auVar160._16_4_;
                      auVar319._20_4_ = fVar203 * auVar160._20_4_;
                      auVar319._28_36_ = in_ZMM3._28_36_;
                      auVar319._24_4_ = fVar203 * auVar160._24_4_;
                      auVar299 = auVar319._0_32_;
                      in_ZMM3 = ZEXT3264(auVar299);
                      auVar106 = vfmsub213ps_fma(auVar163,auVar299,auVar270);
                      auVar106 = vfnmadd213ps_fma(ZEXT1632(auVar106),auVar160,auVar299);
                      *(undefined1 (*) [32])((long)pvVar63 + lVar60 * 8 + sVar13 * sVar14 * uVar47)
                           = ZEXT1632(auVar106);
                      lVar60 = lVar60 + 4;
                      iVar45 = iVar45 + -1;
                    } while (iVar45 != 0);
                  }
                  uVar47 = uVar47 + 1;
                } while ((void *)uVar47 != local_130);
                return 0;
              }
              return 0;
            }
            return -100;
          }
LAB_002463a7:
          if ((((uVar65 ^ 1) == 0 && uVar5 == uVar7) && uVar8 == uVar6) && uVar64 != 1) {
            Mat::create(this_00,uVar64,uVar7,uVar8,sVar71,iVar45,opt->blob_allocator);
            if (this_00->data == (void *)0x0) {
              return -100;
            }
            if ((long)this_00->c * this_00->cstep != 0) {
              if (0 < (int)uVar8) {
                uVar48 = 0;
                auVar158._8_4_ = 0x3f800000;
                auVar158._0_8_ = 0x3f8000003f800000;
                auVar158._12_4_ = 0x3f800000;
                auVar158._16_4_ = 0x3f800000;
                auVar158._20_4_ = 0x3f800000;
                auVar158._24_4_ = 0x3f800000;
                auVar158._28_4_ = 0x3f800000;
                do {
                  if (0 < (int)uVar7) {
                    sVar71 = pMVar9[1].cstep;
                    sVar11 = pMVar9[1].elemsize;
                    pvVar12 = pMVar9[1].data;
                    pauVar49 = (undefined1 (*) [32])
                               (this_00->cstep * uVar48 * this_00->elemsize + (long)this_00->data);
                    pfVar57 = (float *)(pMVar9->cstep * uVar48 * pMVar9->elemsize +
                                       (long)pMVar9->data);
                    uVar62 = 0;
                    do {
                      if (0 < (int)uVar64) {
                        auVar163 = *(undefined1 (*) [32])
                                    ((long)pvVar12 + uVar62 * 0x20 + sVar71 * uVar48 * sVar11);
                        auVar160 = vrcpps_avx(auVar163);
                        auVar106 = vfmsub213ps_fma(auVar163,auVar160,auVar158);
                        auVar106 = vfnmadd132ps_fma(ZEXT1632(auVar106),auVar160,auVar160);
                        uVar67 = uVar47;
                        do {
                          auVar26._4_4_ = auVar106._4_4_ * pfVar57[1];
                          auVar26._0_4_ = auVar106._0_4_ * *pfVar57;
                          auVar26._8_4_ = auVar106._8_4_ * pfVar57[2];
                          auVar26._12_4_ = auVar106._12_4_ * pfVar57[3];
                          auVar26._16_4_ = pfVar57[4] * 0.0;
                          auVar26._20_4_ = pfVar57[5] * 0.0;
                          auVar26._24_4_ = pfVar57[6] * 0.0;
                          auVar26._28_4_ = auVar160._28_4_;
                          *pauVar49 = auVar26;
                          pfVar57 = pfVar57 + 8;
                          pauVar49 = pauVar49 + 1;
                          uVar66 = (int)uVar67 - 1;
                          uVar67 = (ulong)uVar66;
                          auVar160 = auVar26;
                        } while (uVar66 != 0);
                      }
                      uVar62 = uVar62 + 1;
                    } while (uVar62 != uVar7);
                  }
                  uVar48 = uVar48 + 1;
                } while (uVar48 != uVar46);
                return 0;
              }
              return 0;
            }
            return -100;
          }
          if (((uVar65 == uVar64 && (uVar5 ^ 1) == 0) && uVar8 == uVar6) && uVar7 != 1) {
            Mat::create(this_00,uVar64,uVar7,uVar8,sVar71,iVar45,opt->blob_allocator);
            if (this_00->data == (void *)0x0) {
              return -100;
            }
            if ((long)this_00->c * this_00->cstep != 0) {
              if (0 < (int)uVar8) {
                uVar48 = 0;
                do {
                  if (0 < (int)uVar7) {
                    sVar71 = pMVar9[1].elemsize;
                    pvVar56 = (void *)(this_00->cstep * uVar48 * this_00->elemsize +
                                      (long)this_00->data);
                    pvVar63 = (void *)(pMVar9->cstep * uVar48 * pMVar9->elemsize +
                                      (long)pMVar9->data);
                    sVar11 = pMVar9[1].cstep;
                    pvVar12 = pMVar9[1].data;
                    uVar66 = 0;
                    do {
                      if (0 < (int)uVar64) {
                        lVar60 = 0;
                        do {
                          auVar163 = *(undefined1 (*) [32])
                                      ((long)pvVar12 + lVar60 + sVar71 * sVar11 * uVar48);
                          auVar299 = vrcpps_avx(auVar163);
                          auVar160 = *(undefined1 (*) [32])((long)pvVar63 + lVar60);
                          auVar316._0_4_ = auVar160._0_4_ * auVar299._0_4_;
                          auVar316._4_4_ = auVar160._4_4_ * auVar299._4_4_;
                          auVar316._8_4_ = auVar160._8_4_ * auVar299._8_4_;
                          auVar316._12_4_ = auVar160._12_4_ * auVar299._12_4_;
                          auVar316._16_4_ = auVar160._16_4_ * auVar299._16_4_;
                          auVar316._20_4_ = auVar160._20_4_ * auVar299._20_4_;
                          auVar316._28_36_ = in_ZMM3._28_36_;
                          auVar316._24_4_ = auVar160._24_4_ * auVar299._24_4_;
                          auVar142 = auVar316._0_32_;
                          in_ZMM3 = ZEXT3264(auVar142);
                          auVar106 = vfmsub213ps_fma(auVar163,auVar142,auVar160);
                          auVar106 = vfnmadd213ps_fma(ZEXT1632(auVar106),auVar299,auVar142);
                          *(undefined1 (*) [32])((long)pvVar56 + lVar60) = ZEXT1632(auVar106);
                          lVar60 = lVar60 + 0x20;
                        } while (uVar47 << 5 != lVar60);
                        pvVar56 = (void *)((long)pvVar56 + lVar60);
                        pvVar63 = (void *)((long)pvVar63 + lVar60);
                      }
                      uVar66 = uVar66 + 1;
                    } while (uVar66 != uVar7);
                  }
                  uVar48 = uVar48 + 1;
                } while (uVar48 != uVar46);
                return 0;
              }
              return 0;
            }
            return -100;
          }
          if (((uVar6 == uVar8 && uVar5 == uVar7) & uVar65 != 1 & (byte)local_128) == 1) {
            Mat::create(this_00,uVar65,uVar7,uVar8,sVar11,uVar66,opt->blob_allocator);
            if (this_00->data == (void *)0x0) {
              return -100;
            }
            if ((long)this_00->c * this_00->cstep != 0) {
              if (0 < (int)uVar8) {
                uVar47 = 0;
                do {
                  if (0 < (int)uVar7) {
                    sVar71 = pMVar9->cstep;
                    sVar11 = pMVar9->elemsize;
                    pvVar12 = pMVar9->data;
                    pauVar49 = (undefined1 (*) [32])
                               (this_00->cstep * uVar47 * this_00->elemsize + (long)this_00->data);
                    pauVar54 = (undefined1 (*) [32])
                               (pMVar9[1].cstep * uVar47 * pMVar9[1].elemsize + (long)pMVar9[1].data
                               );
                    uVar48 = 0;
                    do {
                      if (0 < (int)uVar65) {
                        auVar163 = *(undefined1 (*) [32])
                                    ((long)pvVar12 + uVar48 * 0x20 + sVar71 * uVar47 * sVar11);
                        uVar66 = uVar65;
                        do {
                          auVar160 = vrcpps_avx(*pauVar54);
                          auVar322._0_4_ = auVar163._0_4_ * auVar160._0_4_;
                          auVar322._4_4_ = auVar163._4_4_ * auVar160._4_4_;
                          auVar322._8_4_ = auVar163._8_4_ * auVar160._8_4_;
                          auVar322._12_4_ = auVar163._12_4_ * auVar160._12_4_;
                          auVar322._16_4_ = auVar163._16_4_ * auVar160._16_4_;
                          auVar322._20_4_ = auVar163._20_4_ * auVar160._20_4_;
                          auVar322._28_36_ = in_ZMM3._28_36_;
                          auVar322._24_4_ = auVar163._24_4_ * auVar160._24_4_;
                          auVar299 = auVar322._0_32_;
                          in_ZMM3 = ZEXT3264(auVar299);
                          auVar106 = vfmsub213ps_fma(*pauVar54,auVar299,auVar163);
                          auVar106 = vfnmadd213ps_fma(ZEXT1632(auVar106),auVar160,auVar299);
                          *pauVar49 = ZEXT1632(auVar106);
                          pauVar54 = pauVar54 + 1;
                          pauVar49 = pauVar49 + 1;
                          uVar66 = uVar66 - 1;
                        } while (uVar66 != 0);
                      }
                      uVar48 = uVar48 + 1;
                    } while (uVar48 != uVar7);
                  }
                  uVar47 = uVar47 + 1;
                } while (uVar47 != uVar46);
                return 0;
              }
              return 0;
            }
            return -100;
          }
          if (((byte)local_104 & uVar6 == uVar8 & (uVar5 != 1 && uVar65 == uVar64)) == 1) {
            Mat::create(this_00,uVar64,uVar5,uVar8,sVar11,uVar66,opt->blob_allocator);
            if (this_00->data == (void *)0x0) {
              return -100;
            }
            if ((long)local_120->c * local_120->cstep != 0) {
              if (0 < (int)uVar8) {
                local_158 = (__m256 *)0x0;
                do {
                  pMVar1 = local_a0;
                  afVar185 = _local_100;
                  bVar74 = local_a0->dims == 3;
                  local_c8 = 1;
                  if (!bVar74) {
                    local_c8 = local_a0->d;
                  }
                  local_d4 = local_a0->w;
                  local_d0 = local_a0->h;
                  local_130 = (void *)local_a0->cstep;
                  pvVar12 = local_a0->data;
                  local_138 = local_a0->elemsize;
                  local_e0 = local_a0->allocator;
                  _fStack_f8 = 0;
                  local_100 = (undefined1  [8])
                              ((long)local_130 * (long)local_158 * local_138 + (long)pvVar12);
                  uStack_f0 = local_138;
                  fStack_e4 = afVar185[7];
                  fStack_e8 = (float)local_a0->elempack;
                  local_d8 = bVar74 ^ 3;
                  local_c0 = (long)local_d0 * (long)local_d4;
                  local_cc = 1;
                  in_ZMM3 = ZEXT1664(in_ZMM3._0_16_);
                  Mat::~Mat((Mat *)local_100);
                  bVar74 = pMVar1[1].dims == 3;
                  local_c8 = 1;
                  if (!bVar74) {
                    local_c8 = pMVar1[1].d;
                  }
                  local_d4 = pMVar1[1].w;
                  local_d0 = pMVar1[1].h;
                  pvVar56 = (void *)(pMVar1[1].cstep * (long)local_158 * pMVar1[1].elemsize +
                                    (long)pMVar1[1].data);
                  local_d8 = bVar74 ^ 3;
                  local_e0 = pMVar1[1].allocator;
                  _fStack_f8 = 0;
                  local_100 = (undefined1  [8])pvVar56;
                  uStack_f0 = pMVar1[1].elemsize;
                  fStack_e8 = (float)pMVar1[1].elempack;
                  local_c0 = (long)local_d0 * (long)local_d4;
                  local_cc = 1;
                  Mat::~Mat((Mat *)local_100);
                  bVar74 = local_120->dims == 3;
                  local_d4 = local_120->w;
                  local_d0 = local_120->h;
                  local_c8 = 1;
                  if (!bVar74) {
                    local_c8 = local_120->d;
                  }
                  sVar71 = local_120->elemsize;
                  pvVar63 = (void *)(local_120->cstep * (long)local_158 * sVar71 +
                                    (long)local_120->data);
                  local_d8 = bVar74 ^ 3;
                  local_e0 = local_120->allocator;
                  fStack_f8 = 0.0;
                  fStack_f4 = 0.0;
                  local_100 = (undefined1  [8])pvVar63;
                  uStack_f0._0_4_ = (float)(int)sVar71;
                  uStack_f0._4_4_ = (float)(int)(sVar71 >> 0x20);
                  fStack_e8 = (float)local_120->elempack;
                  local_c0 = (long)local_d0 * (long)local_d4;
                  local_cc = 1;
                  Mat::~Mat((Mat *)local_100);
                  if (0 < (int)uVar5) {
                    uVar66 = 0;
                    do {
                      if (0 < (int)uVar64) {
                        lVar60 = 0;
                        do {
                          auVar160 = vrcpps_avx(*(undefined1 (*) [32])((long)pvVar56 + lVar60));
                          auVar163 = *(undefined1 (*) [32])
                                      ((long)pvVar12 +
                                      lVar60 + (long)local_130 * local_138 * (long)local_158);
                          auVar324._0_4_ = auVar163._0_4_ * auVar160._0_4_;
                          auVar324._4_4_ = auVar163._4_4_ * auVar160._4_4_;
                          auVar324._8_4_ = auVar163._8_4_ * auVar160._8_4_;
                          auVar324._12_4_ = auVar163._12_4_ * auVar160._12_4_;
                          auVar324._16_4_ = auVar163._16_4_ * auVar160._16_4_;
                          auVar324._20_4_ = auVar163._20_4_ * auVar160._20_4_;
                          auVar324._28_36_ = in_ZMM3._28_36_;
                          auVar324._24_4_ = auVar163._24_4_ * auVar160._24_4_;
                          auVar299 = auVar324._0_32_;
                          in_ZMM3 = ZEXT3264(auVar299);
                          auVar106 = vfmsub213ps_fma(*(undefined1 (*) [32])((long)pvVar56 + lVar60),
                                                     auVar299,auVar163);
                          auVar106 = vfnmadd213ps_fma(ZEXT1632(auVar106),auVar160,auVar299);
                          *(undefined1 (*) [32])((long)pvVar63 + lVar60) = ZEXT1632(auVar106);
                          lVar60 = lVar60 + 0x20;
                        } while (uVar47 << 5 != lVar60);
                        pvVar63 = (void *)((long)pvVar63 + lVar60);
                        pvVar56 = (void *)((long)pvVar56 + lVar60);
                      }
                      uVar66 = uVar66 + 1;
                    } while (uVar66 != uVar5);
                  }
                  local_158 = (__m256 *)((long)local_158 + 1);
                } while (local_158 != (__m256 *)uVar46);
                return 0;
              }
              return 0;
            }
            return -100;
          }
          Mat::create(this_00,uVar64,uVar7,uVar8,sVar71,iVar45,opt->blob_allocator);
          if (this_00->data == (void *)0x0) {
            return -100;
          }
          if ((long)local_120->c * local_120->cstep != 0) {
            if (0 < (int)uVar8) {
              local_158 = (__m256 *)0x0;
              do {
                pMVar1 = local_a0;
                afVar185 = _local_100;
                bVar74 = local_a0->dims == 3;
                local_c8 = 1;
                if (!bVar74) {
                  local_c8 = local_a0->d;
                }
                local_d4 = local_a0->w;
                local_d0 = local_a0->h;
                sVar71 = local_a0->cstep;
                pvVar12 = local_a0->data;
                local_130 = (void *)local_a0->elemsize;
                local_e0 = local_a0->allocator;
                _fStack_f8 = 0;
                local_100 = (undefined1  [8])
                            (sVar71 * (long)local_158 * (long)local_130 + (long)pvVar12);
                uStack_f0 = local_130;
                fStack_e4 = afVar185[7];
                fStack_e8 = (float)local_a0->elempack;
                local_d8 = bVar74 ^ 3;
                local_c0 = (long)local_d0 * (long)local_d4;
                local_cc = 1;
                in_ZMM3 = ZEXT1664(in_ZMM3._0_16_);
                Mat::~Mat((Mat *)local_100);
                bVar74 = pMVar1[1].dims == 3;
                local_c8 = 1;
                if (!bVar74) {
                  local_c8 = pMVar1[1].d;
                }
                local_d4 = pMVar1[1].w;
                local_d0 = pMVar1[1].h;
                local_110 = pMVar1[1].cstep;
                pvVar56 = pMVar1[1].data;
                local_128 = pMVar1[1].elemsize;
                local_e0 = pMVar1[1].allocator;
                _fStack_f8 = 0;
                local_100 = (undefined1  [8])
                            (local_110 * (long)local_158 * local_128 + (long)pvVar56);
                uStack_f0 = local_128;
                fStack_e8 = (float)pMVar1[1].elempack;
                local_d8 = bVar74 ^ 3;
                local_c0 = (long)local_d0 * (long)local_d4;
                local_cc = 1;
                Mat::~Mat((Mat *)local_100);
                bVar74 = local_120->dims == 3;
                local_d4 = local_120->w;
                local_d0 = local_120->h;
                local_c8 = 1;
                if (!bVar74) {
                  local_c8 = local_120->d;
                }
                sVar11 = local_120->cstep;
                pvVar63 = local_120->data;
                sVar13 = local_120->elemsize;
                local_e0 = local_120->allocator;
                fStack_f8 = 0.0;
                fStack_f4 = 0.0;
                local_100 = (undefined1  [8])(sVar11 * (long)local_158 * sVar13 + (long)pvVar63);
                uStack_f0._0_4_ = (float)(int)sVar13;
                uStack_f0._4_4_ = (float)(int)(sVar13 >> 0x20);
                fStack_e8 = (float)local_120->elempack;
                local_d8 = bVar74 ^ 3;
                local_c0 = (long)local_d0 * (long)local_d4;
                local_cc = 1;
                Mat::~Mat((Mat *)local_100);
                if (0 < (int)local_138) {
                  lVar60 = 0;
                  iVar45 = (int)local_138;
                  do {
                    auVar163 = *(undefined1 (*) [32])
                                ((long)pvVar56 + lVar60 + local_110 * local_128 * (long)local_158);
                    auVar299 = vrcpps_avx(auVar163);
                    auVar160 = *(undefined1 (*) [32])
                                ((long)pvVar12 + lVar60 + sVar71 * (long)local_130 * (long)local_158
                                );
                    auVar326._0_4_ = auVar160._0_4_ * auVar299._0_4_;
                    auVar326._4_4_ = auVar160._4_4_ * auVar299._4_4_;
                    auVar326._8_4_ = auVar160._8_4_ * auVar299._8_4_;
                    auVar326._12_4_ = auVar160._12_4_ * auVar299._12_4_;
                    auVar326._16_4_ = auVar160._16_4_ * auVar299._16_4_;
                    auVar326._20_4_ = auVar160._20_4_ * auVar299._20_4_;
                    auVar326._28_36_ = in_ZMM3._28_36_;
                    auVar326._24_4_ = auVar160._24_4_ * auVar299._24_4_;
                    auVar142 = auVar326._0_32_;
                    in_ZMM3 = ZEXT3264(auVar142);
                    auVar106 = vfmsub213ps_fma(auVar163,auVar142,auVar160);
                    auVar106 = vfnmadd213ps_fma(ZEXT1632(auVar106),auVar299,auVar142);
                    *(undefined1 (*) [32])
                     ((long)pvVar63 + lVar60 + sVar11 * sVar13 * (long)local_158) =
                         ZEXT1632(auVar106);
                    lVar60 = lVar60 + 0x20;
                    iVar45 = iVar45 + -1;
                  } while (iVar45 != 0);
                }
                local_158 = (__m256 *)((long)local_158 + 1);
              } while (local_158 != (__m256 *)uVar46);
              return 0;
            }
            return 0;
          }
          return -100;
        }
      }
      else {
        local_128 = CONCAT71(local_128._1_7_,uVar64 == 1);
        local_104 = CONCAT31(local_104._1_3_,uVar7 == 1);
        if ((uVar64 != 1 || uVar7 != 1) || uVar6 != uVar8) goto LAB_002463a7;
      }
      Mat::create(this_00,uVar65,uVar5,uVar6,sVar11,uVar66,opt->blob_allocator);
      if (this_00->data == (void *)0x0) {
        return -100;
      }
      if ((long)this_00->c * this_00->cstep != 0) {
        if (0 < (int)local_130) {
          uVar47 = 0;
          do {
            if (0 < iVar72) {
              sVar71 = pMVar9[1].cstep;
              sVar11 = pMVar9[1].elemsize;
              auVar163 = *(undefined1 (*) [32])
                          ((long)pMVar9->data + pMVar9->cstep * uVar47 * pMVar9->elemsize);
              pvVar12 = pMVar9[1].data;
              sVar13 = this_00->cstep;
              sVar14 = this_00->elemsize;
              pvVar56 = this_00->data;
              lVar60 = 0;
              iVar45 = iVar72;
              do {
                auVar160 = *(undefined1 (*) [32])((long)pvVar12 + lVar60 + sVar71 * sVar11 * uVar47)
                ;
                auVar299 = vrcpps_avx(auVar160);
                auVar315._0_4_ = auVar163._0_4_ * auVar299._0_4_;
                auVar315._4_4_ = auVar163._4_4_ * auVar299._4_4_;
                auVar315._8_4_ = auVar163._8_4_ * auVar299._8_4_;
                auVar315._12_4_ = auVar163._12_4_ * auVar299._12_4_;
                auVar315._16_4_ = auVar163._16_4_ * auVar299._16_4_;
                auVar315._20_4_ = auVar163._20_4_ * auVar299._20_4_;
                auVar315._28_36_ = in_ZMM3._28_36_;
                auVar315._24_4_ = auVar163._24_4_ * auVar299._24_4_;
                auVar142 = auVar315._0_32_;
                in_ZMM3 = ZEXT3264(auVar142);
                auVar106 = vfmsub213ps_fma(auVar160,auVar142,auVar163);
                auVar106 = vfnmadd213ps_fma(ZEXT1632(auVar106),auVar299,auVar142);
                *(undefined1 (*) [32])((long)pvVar56 + lVar60 + sVar13 * sVar14 * uVar47) =
                     ZEXT1632(auVar106);
                lVar60 = lVar60 + 0x20;
                iVar45 = iVar45 + -1;
              } while (iVar45 != 0);
            }
            uVar47 = uVar47 + 1;
          } while ((void *)uVar47 != local_130);
          return 0;
        }
        return 0;
      }
      return -100;
    case 4:
      uVar64 = pMVar9->w;
      uVar47 = (ulong)uVar64;
      sVar71 = pMVar9->elemsize;
      uVar65 = pMVar9[1].w;
      uVar5 = pMVar9[1].h;
      uVar6 = pMVar9[1].c;
      local_130 = (void *)(ulong)uVar6;
      iVar72 = uVar5 * uVar65;
      sVar11 = pMVar9[1].elemsize;
      iVar59 = pMVar9->dims;
      if (iVar59 == 1) {
        iVar59 = pMVar9[1].dims;
        if (iVar45 != 1 || uVar64 != 1) {
          if (iVar59 == 1) {
            Mat::create(this_00,uVar64,sVar71,iVar45,opt->blob_allocator);
            pvVar12 = this_00->data;
            if (pvVar12 == (void *)0x0) {
              return -100;
            }
            if ((long)this_00->c * this_00->cstep == 0) {
              return -100;
            }
            if (uVar66 != 1 || pMVar9[1].w != 1) {
              if (0 < (int)uVar64) {
                pvVar56 = pMVar9->data;
                pvVar63 = pMVar9[1].data;
                lVar60 = 0;
                do {
                  auVar163 = vmaxps_avx(*(undefined1 (*) [32])((long)pvVar56 + lVar60),
                                        *(undefined1 (*) [32])((long)pvVar63 + lVar60));
                  *(undefined1 (*) [32])((long)pvVar12 + lVar60) = auVar163;
                  lVar60 = lVar60 + 0x20;
                  uVar66 = (int)uVar47 - 1;
                  uVar47 = (ulong)uVar66;
                } while (uVar66 != 0);
                return 0;
              }
              return 0;
            }
            if (0 < (int)uVar64) {
              uVar4 = *pMVar1->data;
              auVar149._4_4_ = uVar4;
              auVar149._0_4_ = uVar4;
              auVar149._8_4_ = uVar4;
              auVar149._12_4_ = uVar4;
              auVar149._16_4_ = uVar4;
              auVar149._20_4_ = uVar4;
              auVar149._24_4_ = uVar4;
              auVar149._28_4_ = uVar4;
              pvVar56 = pMVar9->data;
              lVar60 = 0;
              do {
                auVar163 = vmaxps_avx(auVar149,*(undefined1 (*) [32])((long)pvVar56 + lVar60));
                *(undefined1 (*) [32])((long)pvVar12 + lVar60) = auVar163;
                lVar60 = lVar60 + 0x20;
                uVar66 = (int)uVar47 - 1;
                uVar47 = (ulong)uVar66;
              } while (uVar66 != 0);
              return 0;
            }
            return 0;
          }
          if (iVar59 == 2) {
            Mat::create(this_00,uVar65,uVar5,sVar11,uVar66,opt->blob_allocator);
            pauVar49 = (undefined1 (*) [32])this_00->data;
            if (pauVar49 == (undefined1 (*) [32])0x0) {
              return -100;
            }
            if ((long)this_00->c * this_00->cstep != 0) {
              if (0 < (int)uVar5) {
                pauVar54 = (undefined1 (*) [32])pMVar9->data;
                pauVar52 = (undefined1 (*) [32])pMVar9[1].data;
                uVar66 = 0;
                do {
                  if (0 < (int)uVar65) {
                    auVar163 = *pauVar54;
                    uVar64 = uVar65;
                    do {
                      auVar160 = vmaxps_avx(auVar163,*pauVar52);
                      *pauVar49 = auVar160;
                      pauVar52 = pauVar52 + 1;
                      pauVar49 = pauVar49 + 1;
                      uVar64 = uVar64 - 1;
                    } while (uVar64 != 0);
                  }
                  pauVar54 = pauVar54 + 1;
                  uVar66 = uVar66 + 1;
                } while (uVar66 != uVar5);
                return 0;
              }
              return 0;
            }
            return -100;
          }
          if (iVar59 != 3) {
            return 0;
          }
          Mat::create(this_00,uVar65,uVar5,uVar6,sVar11,uVar66,opt->blob_allocator);
          if (this_00->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep == 0) {
            return -100;
          }
          if (0 < (int)local_130) {
            uVar47 = 0;
            do {
              if (0 < iVar72) {
                sVar71 = this_00->cstep;
                sVar11 = this_00->elemsize;
                auVar163 = *(undefined1 (*) [32])((long)pMVar9->data + uVar47 * 0x20);
                pvVar12 = this_00->data;
                sVar13 = pMVar9[1].cstep;
                sVar14 = pMVar9[1].elemsize;
                pvVar56 = pMVar9[1].data;
                lVar60 = 0;
                iVar45 = iVar72;
                do {
                  auVar160 = vmaxps_avx(auVar163,*(undefined1 (*) [32])
                                                  ((long)pvVar56 + lVar60 + sVar13 * sVar14 * uVar47
                                                  ));
                  *(undefined1 (*) [32])((long)pvVar12 + lVar60 + sVar71 * sVar11 * uVar47) =
                       auVar160;
                  lVar60 = lVar60 + 0x20;
                  iVar45 = iVar45 + -1;
                } while (iVar45 != 0);
              }
              uVar47 = uVar47 + 1;
            } while ((void *)uVar47 != local_130);
            return 0;
          }
          return 0;
        }
        if (iVar59 == 1) {
          Mat::create(this_00,uVar65,sVar11,uVar66,opt->blob_allocator);
          pvVar12 = this_00->data;
          if (pvVar12 == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep != 0) {
            if (0 < (int)uVar65) {
              uVar4 = *pMVar9->data;
              auVar148._4_4_ = uVar4;
              auVar148._0_4_ = uVar4;
              auVar148._8_4_ = uVar4;
              auVar148._12_4_ = uVar4;
              auVar148._16_4_ = uVar4;
              auVar148._20_4_ = uVar4;
              auVar148._24_4_ = uVar4;
              auVar148._28_4_ = uVar4;
              pvVar56 = pMVar1->data;
              lVar60 = 0;
              do {
                auVar163 = vmaxps_avx(auVar148,*(undefined1 (*) [32])((long)pvVar56 + lVar60));
                *(undefined1 (*) [32])((long)pvVar12 + lVar60) = auVar163;
                lVar60 = lVar60 + 0x20;
                uVar65 = uVar65 - 1;
              } while (uVar65 != 0);
              return 0;
            }
            return 0;
          }
          return -100;
        }
        if (iVar59 == 2) {
          Mat::create(this_00,uVar65,uVar5,sVar11,uVar66,opt->blob_allocator);
          pvVar12 = this_00->data;
          if (pvVar12 == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep != 0) {
            if (0 < iVar72) {
              uVar4 = *pMVar9->data;
              auVar147._4_4_ = uVar4;
              auVar147._0_4_ = uVar4;
              auVar147._8_4_ = uVar4;
              auVar147._12_4_ = uVar4;
              auVar147._16_4_ = uVar4;
              auVar147._20_4_ = uVar4;
              auVar147._24_4_ = uVar4;
              auVar147._28_4_ = uVar4;
              pvVar56 = pMVar1->data;
              lVar60 = 0;
              do {
                auVar163 = vmaxps_avx(auVar147,*(undefined1 (*) [32])((long)pvVar56 + lVar60));
                *(undefined1 (*) [32])((long)pvVar12 + lVar60) = auVar163;
                lVar60 = lVar60 + 0x20;
                iVar72 = iVar72 + -1;
              } while (iVar72 != 0);
              return 0;
            }
            return 0;
          }
          return -100;
        }
        if (iVar59 != 3) {
          return 0;
        }
        Mat::create(this_00,uVar65,uVar5,uVar6,sVar11,uVar66,opt->blob_allocator);
        if (this_00->data == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep == 0) {
          return -100;
        }
        if (0 < (int)local_130) {
          uVar4 = *pMVar9->data;
          auVar135._4_4_ = uVar4;
          auVar135._0_4_ = uVar4;
          auVar135._8_4_ = uVar4;
          auVar135._12_4_ = uVar4;
          auVar135._16_4_ = uVar4;
          auVar135._20_4_ = uVar4;
          auVar135._24_4_ = uVar4;
          auVar135._28_4_ = uVar4;
          uVar47 = 0;
          do {
            if (0 < iVar72) {
              sVar71 = this_00->cstep;
              sVar11 = this_00->elemsize;
              pvVar12 = this_00->data;
              sVar13 = pMVar9[1].cstep;
              sVar14 = pMVar9[1].elemsize;
              pvVar56 = pMVar9[1].data;
              lVar60 = 0;
              iVar45 = iVar72;
              do {
                auVar163 = vmaxps_avx(auVar135,*(undefined1 (*) [32])
                                                ((long)pvVar56 + lVar60 + sVar13 * sVar14 * uVar47))
                ;
                *(undefined1 (*) [32])((long)pvVar12 + lVar60 + sVar71 * sVar11 * uVar47) = auVar163
                ;
                lVar60 = lVar60 + 0x20;
                iVar45 = iVar45 + -1;
              } while (iVar45 != 0);
            }
            uVar47 = uVar47 + 1;
          } while ((void *)uVar47 != local_130);
          return 0;
        }
        return 0;
      }
      uVar7 = pMVar9->h;
      local_138 = CONCAT44(local_138._4_4_,uVar7 * uVar64);
      if (iVar59 == 2) {
        if (pMVar9[1].dims == 3) {
          Mat::create(this_00,uVar65,uVar5,uVar6,sVar11,uVar66,opt->blob_allocator);
          if (this_00->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep != 0) {
            if (0 < (int)local_130) {
              uVar47 = 0;
              do {
                if (0 < (int)uVar5) {
                  pauVar49 = (undefined1 (*) [32])
                             (this_00->cstep * uVar47 * this_00->elemsize + (long)this_00->data);
                  pauVar54 = (undefined1 (*) [32])
                             (pMVar9[1].cstep * uVar47 * pMVar9[1].elemsize + (long)pMVar9[1].data);
                  pauVar52 = (undefined1 (*) [32])
                             ((long)pMVar9->w * uVar47 * pMVar9->elemsize + (long)pMVar9->data);
                  uVar66 = 0;
                  do {
                    if (0 < (int)uVar65) {
                      auVar163 = *pauVar52;
                      uVar64 = uVar65;
                      do {
                        auVar160 = vmaxps_avx(auVar163,*pauVar54);
                        *pauVar49 = auVar160;
                        pauVar54 = pauVar54 + 1;
                        pauVar49 = pauVar49 + 1;
                        uVar64 = uVar64 - 1;
                      } while (uVar64 != 0);
                    }
                    pauVar52 = pauVar52 + 1;
                    uVar66 = uVar66 + 1;
                  } while (uVar66 != uVar5);
                }
                uVar47 = uVar47 + 1;
              } while ((void *)uVar47 != local_130);
              return 0;
            }
            return 0;
          }
          return -100;
        }
        local_128 = CONCAT44(uVar4,uVar66);
        Mat::create(this_00,uVar64,uVar7,sVar71,iVar45,opt->blob_allocator);
        pvVar12 = this_00->data;
        if (pvVar12 == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep == 0) {
          return -100;
        }
        if (pMVar9[1].dims != 1) {
          if (pMVar9[1].dims != 2) {
            return 0;
          }
          if (0 < (int)local_138) {
            pvVar56 = pMVar9->data;
            pvVar63 = pMVar9[1].data;
            lVar60 = 0;
            do {
              auVar163 = vmaxps_avx(*(undefined1 (*) [32])((long)pvVar56 + lVar60),
                                    *(undefined1 (*) [32])((long)pvVar63 + lVar60));
              *(undefined1 (*) [32])((long)pvVar12 + lVar60) = auVar163;
              lVar60 = lVar60 + 0x20;
              local_138._0_4_ = (int)local_138 + -1;
            } while ((int)local_138 != 0);
            return 0;
          }
          return 0;
        }
        Mat::create(this_00,uVar64,uVar7,sVar71,iVar45,opt->blob_allocator);
        pauVar49 = (undefined1 (*) [32])this_00->data;
        if (pauVar49 == (undefined1 (*) [32])0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep != 0) {
          if ((int)local_128 != 1 || pMVar9[1].w != 1) {
            if (0 < (int)uVar7) {
              pauVar54 = (undefined1 (*) [32])pMVar9->data;
              pauVar52 = (undefined1 (*) [32])pMVar9[1].data;
              uVar66 = 0;
              do {
                if (0 < (int)uVar64) {
                  auVar163 = *pauVar52;
                  uVar46 = uVar47;
                  do {
                    auVar160 = vmaxps_avx(auVar163,*pauVar54);
                    *pauVar49 = auVar160;
                    pauVar54 = pauVar54 + 1;
                    pauVar49 = pauVar49 + 1;
                    uVar65 = (int)uVar46 - 1;
                    uVar46 = (ulong)uVar65;
                  } while (uVar65 != 0);
                }
                pauVar52 = pauVar52 + 1;
                uVar66 = uVar66 + 1;
              } while (uVar66 != uVar7);
              return 0;
            }
            return 0;
          }
          if (0 < (int)local_138) {
            uVar4 = *pMVar1->data;
            auVar164._4_4_ = uVar4;
            auVar164._0_4_ = uVar4;
            auVar164._8_4_ = uVar4;
            auVar164._12_4_ = uVar4;
            auVar164._16_4_ = uVar4;
            auVar164._20_4_ = uVar4;
            auVar164._24_4_ = uVar4;
            auVar164._28_4_ = uVar4;
            pvVar12 = pMVar9->data;
            lVar60 = 0;
            do {
              auVar163 = vmaxps_avx(auVar164,*(undefined1 (*) [32])((long)pvVar12 + lVar60));
              *(undefined1 (*) [32])((long)*pauVar49 + lVar60) = auVar163;
              lVar60 = lVar60 + 0x20;
              local_138._0_4_ = (int)local_138 + -1;
            } while ((int)local_138 != 0);
            return 0;
          }
          return 0;
        }
        return -100;
      }
      if (iVar59 != 3) {
        return 0;
      }
      uVar8 = pMVar9->c;
      uVar46 = (ulong)uVar8;
      if (pMVar9[1].dims != 3) {
        Mat::create(this_00,uVar64,uVar7,uVar8,sVar71,iVar45,opt->blob_allocator);
        if (this_00->data == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep == 0) {
          return -100;
        }
        if (pMVar9[1].dims == 1) {
          if (uVar66 != 1 || pMVar9[1].w != 1) {
            if (0 < (int)uVar8) {
              uVar47 = 0;
              do {
                if (0 < (int)local_138) {
                  sVar71 = this_00->cstep;
                  sVar11 = this_00->elemsize;
                  auVar163 = *(undefined1 (*) [32])((long)pMVar1->data + uVar47 * 0x20);
                  pvVar12 = this_00->data;
                  sVar13 = pMVar9->cstep;
                  sVar14 = pMVar9->elemsize;
                  pvVar56 = pMVar9->data;
                  lVar60 = 0;
                  iVar45 = (int)local_138;
                  do {
                    auVar160 = vmaxps_avx(auVar163,*(undefined1 (*) [32])
                                                    ((long)pvVar56 +
                                                    lVar60 + sVar13 * sVar14 * uVar47));
                    *(undefined1 (*) [32])((long)pvVar12 + lVar60 + sVar71 * sVar11 * uVar47) =
                         auVar160;
                    lVar60 = lVar60 + 0x20;
                    iVar45 = iVar45 + -1;
                  } while (iVar45 != 0);
                }
                uVar47 = uVar47 + 1;
              } while (uVar47 != uVar46);
              return 0;
            }
            return 0;
          }
          if (0 < (int)uVar8) {
            uVar4 = *pMVar1->data;
            auVar165._4_4_ = uVar4;
            auVar165._0_4_ = uVar4;
            auVar165._8_4_ = uVar4;
            auVar165._12_4_ = uVar4;
            auVar165._16_4_ = uVar4;
            auVar165._20_4_ = uVar4;
            auVar165._24_4_ = uVar4;
            auVar165._28_4_ = uVar4;
            uVar47 = 0;
            do {
              if (0 < (int)local_138) {
                sVar71 = this_00->cstep;
                sVar11 = this_00->elemsize;
                pvVar12 = this_00->data;
                sVar13 = pMVar9->cstep;
                sVar14 = pMVar9->elemsize;
                pvVar56 = pMVar9->data;
                lVar60 = 0;
                iVar45 = (int)local_138;
                do {
                  auVar163 = vmaxps_avx(auVar165,*(undefined1 (*) [32])
                                                  ((long)pvVar56 + lVar60 + sVar13 * sVar14 * uVar47
                                                  ));
                  *(undefined1 (*) [32])((long)pvVar12 + lVar60 + sVar71 * sVar11 * uVar47) =
                       auVar163;
                  lVar60 = lVar60 + 0x20;
                  iVar45 = iVar45 + -1;
                } while (iVar45 != 0);
              }
              uVar47 = uVar47 + 1;
            } while (uVar47 != uVar46);
            return 0;
          }
          return 0;
        }
        if (pMVar9[1].dims != 2) {
          return 0;
        }
        if (0 < (int)uVar8) {
          uVar48 = 0;
          do {
            if (0 < (int)uVar7) {
              pauVar49 = (undefined1 (*) [32])
                         (this_00->cstep * uVar48 * this_00->elemsize + (long)this_00->data);
              pauVar54 = (undefined1 (*) [32])
                         ((long)pMVar9[1].w * uVar48 * pMVar9[1].elemsize + (long)pMVar9[1].data);
              pauVar52 = (undefined1 (*) [32])
                         (pMVar9->cstep * uVar48 * pMVar9->elemsize + (long)pMVar9->data);
              uVar66 = 0;
              do {
                if (0 < (int)uVar64) {
                  auVar163 = *pauVar54;
                  uVar62 = uVar47;
                  do {
                    auVar160 = vmaxps_avx(auVar163,*pauVar52);
                    *pauVar49 = auVar160;
                    pauVar52 = pauVar52 + 1;
                    pauVar49 = pauVar49 + 1;
                    uVar65 = (int)uVar62 - 1;
                    uVar62 = (ulong)uVar65;
                  } while (uVar65 != 0);
                }
                pauVar54 = pauVar54 + 1;
                uVar66 = uVar66 + 1;
              } while (uVar66 != uVar7);
            }
            uVar48 = uVar48 + 1;
          } while (uVar48 != uVar46);
          return 0;
        }
        return 0;
      }
      if (uVar8 == uVar6 && ((uVar65 ^ 1) == 0 && (uVar5 ^ 1) == 0)) {
        Mat::create(this_00,uVar64,uVar7,uVar8,sVar71,iVar45,opt->blob_allocator);
        if (this_00->data == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep != 0) {
          if (0 < (int)uVar8) {
            uVar47 = 0;
            do {
              if (0 < (int)local_138) {
                sVar71 = pMVar9->cstep;
                sVar11 = pMVar9->elemsize;
                auVar163 = *(undefined1 (*) [32])
                            ((long)pMVar9[1].data + pMVar9[1].cstep * uVar47 * pMVar9[1].elemsize);
                pvVar12 = pMVar9->data;
                sVar13 = this_00->cstep;
                sVar14 = this_00->elemsize;
                pvVar56 = this_00->data;
                lVar60 = 0;
                iVar45 = (int)local_138;
                do {
                  auVar160 = vmaxps_avx(auVar163,*(undefined1 (*) [32])
                                                  ((long)pvVar12 + lVar60 + sVar71 * sVar11 * uVar47
                                                  ));
                  *(undefined1 (*) [32])((long)pvVar56 + lVar60 + sVar13 * sVar14 * uVar47) =
                       auVar160;
                  lVar60 = lVar60 + 0x20;
                  iVar45 = iVar45 + -1;
                } while (iVar45 != 0);
              }
              uVar47 = uVar47 + 1;
            } while (uVar47 != uVar46);
            return 0;
          }
          return 0;
        }
        return -100;
      }
      local_110 = sVar71;
      if (uVar65 == uVar64) {
        if (uVar66 == 1 && (uVar6 == 1 && uVar5 == uVar7)) {
          Mat::create(this_00,uVar64,uVar7,uVar8,sVar71,iVar45,opt->blob_allocator);
          if (this_00->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep != 0) {
            if (0 < (int)uVar8) {
              uVar47 = 0;
              do {
                if (0 < (int)local_138) {
                  sVar71 = pMVar9->cstep;
                  sVar11 = pMVar9->elemsize;
                  sVar13 = this_00->cstep;
                  pvVar12 = pMVar9->data;
                  pvVar56 = pMVar9[1].data;
                  sVar14 = this_00->elemsize;
                  pvVar63 = this_00->data;
                  lVar60 = 0;
                  iVar45 = (int)local_138;
                  do {
                    uVar4 = *(undefined4 *)((long)pvVar56 + lVar60);
                    auVar143._4_4_ = uVar4;
                    auVar143._0_4_ = uVar4;
                    auVar143._8_4_ = uVar4;
                    auVar143._12_4_ = uVar4;
                    auVar143._16_4_ = uVar4;
                    auVar143._20_4_ = uVar4;
                    auVar143._24_4_ = uVar4;
                    auVar143._28_4_ = uVar4;
                    auVar163 = vmaxps_avx(auVar143,*(undefined1 (*) [32])
                                                    ((long)pvVar12 +
                                                    lVar60 * 8 + sVar71 * sVar11 * uVar47));
                    *(undefined1 (*) [32])((long)pvVar63 + lVar60 * 8 + sVar13 * sVar14 * uVar47) =
                         auVar163;
                    lVar60 = lVar60 + 4;
                    iVar45 = iVar45 + -1;
                  } while (iVar45 != 0);
                }
                uVar47 = uVar47 + 1;
              } while (uVar47 != uVar46);
              return 0;
            }
            return 0;
          }
          return -100;
        }
        local_128 = CONCAT71(local_128._1_7_,uVar64 == 1);
        local_104 = CONCAT31(local_104._1_3_,uVar7 == 1);
        if ((uVar64 != 1 || uVar7 != 1) || uVar6 != uVar8) {
          if (((iVar45 == 1) && (uVar5 == uVar7)) && (uVar8 == 1)) {
            Mat::create(this_00,uVar64,uVar7,uVar6,sVar11,uVar66,opt->blob_allocator);
            if (this_00->data == (void *)0x0) {
              return -100;
            }
            if ((long)this_00->c * this_00->cstep != 0) {
              if (0 < (int)local_130) {
                uVar47 = 0;
                do {
                  if (0 < iVar72) {
                    sVar71 = pMVar9[1].cstep;
                    sVar11 = pMVar9[1].elemsize;
                    sVar13 = this_00->cstep;
                    pvVar12 = pMVar9[1].data;
                    pvVar56 = pMVar9->data;
                    sVar14 = this_00->elemsize;
                    pvVar63 = this_00->data;
                    lVar60 = 0;
                    iVar45 = iVar72;
                    do {
                      uVar4 = *(undefined4 *)((long)pvVar56 + lVar60);
                      auVar177._4_4_ = uVar4;
                      auVar177._0_4_ = uVar4;
                      auVar177._8_4_ = uVar4;
                      auVar177._12_4_ = uVar4;
                      auVar177._16_4_ = uVar4;
                      auVar177._20_4_ = uVar4;
                      auVar177._24_4_ = uVar4;
                      auVar177._28_4_ = uVar4;
                      auVar163 = vmaxps_avx(auVar177,*(undefined1 (*) [32])
                                                      ((long)pvVar12 +
                                                      lVar60 * 8 + sVar71 * sVar11 * uVar47));
                      *(undefined1 (*) [32])((long)pvVar63 + lVar60 * 8 + sVar13 * sVar14 * uVar47)
                           = auVar163;
                      lVar60 = lVar60 + 4;
                      iVar45 = iVar45 + -1;
                    } while (iVar45 != 0);
                  }
                  uVar47 = uVar47 + 1;
                } while ((void *)uVar47 != local_130);
                return 0;
              }
              return 0;
            }
            return -100;
          }
LAB_00245701:
          if ((((uVar65 ^ 1) == 0 && uVar5 == uVar7) && uVar8 == uVar6) && uVar64 != 1) {
            Mat::create(this_00,uVar64,uVar7,uVar8,sVar71,iVar45,opt->blob_allocator);
            if (this_00->data == (void *)0x0) {
              return -100;
            }
            if ((long)this_00->c * this_00->cstep != 0) {
              if (0 < (int)uVar8) {
                uVar48 = 0;
                do {
                  if (0 < (int)uVar7) {
                    sVar71 = pMVar9[1].cstep;
                    sVar11 = pMVar9[1].elemsize;
                    pvVar12 = pMVar9[1].data;
                    pauVar49 = (undefined1 (*) [32])
                               (this_00->cstep * uVar48 * this_00->elemsize + (long)this_00->data);
                    pauVar54 = (undefined1 (*) [32])
                               (pMVar9->cstep * uVar48 * pMVar9->elemsize + (long)pMVar9->data);
                    uVar62 = 0;
                    do {
                      if (0 < (int)uVar64) {
                        auVar163 = *(undefined1 (*) [32])
                                    ((long)pvVar12 + uVar62 * 0x20 + sVar71 * uVar48 * sVar11);
                        uVar67 = uVar47;
                        do {
                          auVar160 = vmaxps_avx(auVar163,*pauVar54);
                          *pauVar49 = auVar160;
                          pauVar54 = pauVar54 + 1;
                          pauVar49 = pauVar49 + 1;
                          uVar66 = (int)uVar67 - 1;
                          uVar67 = (ulong)uVar66;
                        } while (uVar66 != 0);
                      }
                      uVar62 = uVar62 + 1;
                    } while (uVar62 != uVar7);
                  }
                  uVar48 = uVar48 + 1;
                } while (uVar48 != uVar46);
                return 0;
              }
              return 0;
            }
            return -100;
          }
          if (((uVar65 == uVar64 && (uVar5 ^ 1) == 0) && uVar8 == uVar6) && uVar7 != 1) {
            Mat::create(this_00,uVar64,uVar7,uVar8,sVar71,iVar45,opt->blob_allocator);
            if (this_00->data == (void *)0x0) {
              return -100;
            }
            if ((long)this_00->c * this_00->cstep != 0) {
              if (0 < (int)uVar8) {
                uVar48 = 0;
                do {
                  if (0 < (int)uVar7) {
                    sVar71 = pMVar9[1].elemsize;
                    pvVar56 = (void *)(this_00->cstep * uVar48 * this_00->elemsize +
                                      (long)this_00->data);
                    pvVar63 = (void *)(pMVar9->cstep * uVar48 * pMVar9->elemsize +
                                      (long)pMVar9->data);
                    sVar11 = pMVar9[1].cstep;
                    pvVar12 = pMVar9[1].data;
                    uVar66 = 0;
                    do {
                      if (0 < (int)uVar64) {
                        lVar60 = 0;
                        do {
                          auVar163 = vmaxps_avx(*(undefined1 (*) [32])((long)pvVar63 + lVar60),
                                                *(undefined1 (*) [32])
                                                 ((long)pvVar12 + lVar60 + sVar71 * sVar11 * uVar48)
                                               );
                          *(undefined1 (*) [32])((long)pvVar56 + lVar60) = auVar163;
                          lVar60 = lVar60 + 0x20;
                        } while (uVar47 << 5 != lVar60);
                        pvVar56 = (void *)((long)pvVar56 + lVar60);
                        pvVar63 = (void *)((long)pvVar63 + lVar60);
                      }
                      uVar66 = uVar66 + 1;
                    } while (uVar66 != uVar7);
                  }
                  uVar48 = uVar48 + 1;
                } while (uVar48 != uVar46);
                return 0;
              }
              return 0;
            }
            return -100;
          }
          if (((uVar6 == uVar8 && uVar5 == uVar7) & uVar65 != 1 & (byte)local_128) == 1) {
            Mat::create(this_00,uVar65,uVar7,uVar8,sVar11,uVar66,opt->blob_allocator);
            if (this_00->data == (void *)0x0) {
              return -100;
            }
            if ((long)this_00->c * this_00->cstep != 0) {
              if (0 < (int)uVar8) {
                uVar47 = 0;
                do {
                  if (0 < (int)uVar7) {
                    sVar71 = pMVar9->cstep;
                    sVar11 = pMVar9->elemsize;
                    pvVar12 = pMVar9->data;
                    pauVar49 = (undefined1 (*) [32])
                               (this_00->cstep * uVar47 * this_00->elemsize + (long)this_00->data);
                    pauVar54 = (undefined1 (*) [32])
                               (pMVar9[1].cstep * uVar47 * pMVar9[1].elemsize + (long)pMVar9[1].data
                               );
                    uVar48 = 0;
                    do {
                      if (0 < (int)uVar65) {
                        auVar163 = *(undefined1 (*) [32])
                                    ((long)pvVar12 + uVar48 * 0x20 + sVar71 * uVar47 * sVar11);
                        uVar66 = uVar65;
                        do {
                          auVar160 = vmaxps_avx(auVar163,*pauVar54);
                          *pauVar49 = auVar160;
                          pauVar54 = pauVar54 + 1;
                          pauVar49 = pauVar49 + 1;
                          uVar66 = uVar66 - 1;
                        } while (uVar66 != 0);
                      }
                      uVar48 = uVar48 + 1;
                    } while (uVar48 != uVar7);
                  }
                  uVar47 = uVar47 + 1;
                } while (uVar47 != uVar46);
                return 0;
              }
              return 0;
            }
            return -100;
          }
          if (((byte)local_104 & uVar6 == uVar8 & (uVar5 != 1 && uVar65 == uVar64)) == 1) {
            Mat::create(this_00,uVar64,uVar5,uVar8,sVar11,uVar66,opt->blob_allocator);
            if (this_00->data == (void *)0x0) {
              return -100;
            }
            if ((long)local_120->c * local_120->cstep != 0) {
              if (0 < (int)uVar8) {
                local_158 = (__m256 *)0x0;
                do {
                  pMVar1 = local_a0;
                  afVar185 = _local_100;
                  bVar74 = local_a0->dims == 3;
                  local_c8 = 1;
                  if (!bVar74) {
                    local_c8 = local_a0->d;
                  }
                  local_d4 = local_a0->w;
                  local_d0 = local_a0->h;
                  local_130 = (void *)local_a0->cstep;
                  pvVar12 = local_a0->data;
                  local_138 = local_a0->elemsize;
                  local_e0 = local_a0->allocator;
                  _fStack_f8 = 0;
                  local_100 = (undefined1  [8])
                              ((long)local_130 * (long)local_158 * local_138 + (long)pvVar12);
                  uStack_f0 = local_138;
                  fStack_e4 = afVar185[7];
                  fStack_e8 = (float)local_a0->elempack;
                  local_d8 = bVar74 ^ 3;
                  local_c0 = (long)local_d0 * (long)local_d4;
                  local_cc = 1;
                  Mat::~Mat((Mat *)local_100);
                  bVar74 = pMVar1[1].dims == 3;
                  local_c8 = 1;
                  if (!bVar74) {
                    local_c8 = pMVar1[1].d;
                  }
                  local_d4 = pMVar1[1].w;
                  local_d0 = pMVar1[1].h;
                  pvVar56 = (void *)(pMVar1[1].cstep * (long)local_158 * pMVar1[1].elemsize +
                                    (long)pMVar1[1].data);
                  local_d8 = bVar74 ^ 3;
                  local_e0 = pMVar1[1].allocator;
                  _fStack_f8 = 0;
                  local_100 = (undefined1  [8])pvVar56;
                  uStack_f0 = pMVar1[1].elemsize;
                  fStack_e8 = (float)pMVar1[1].elempack;
                  local_c0 = (long)local_d0 * (long)local_d4;
                  local_cc = 1;
                  Mat::~Mat((Mat *)local_100);
                  bVar74 = local_120->dims == 3;
                  local_d4 = local_120->w;
                  local_d0 = local_120->h;
                  local_c8 = 1;
                  if (!bVar74) {
                    local_c8 = local_120->d;
                  }
                  sVar71 = local_120->elemsize;
                  pvVar63 = (void *)(local_120->cstep * (long)local_158 * sVar71 +
                                    (long)local_120->data);
                  local_d8 = bVar74 ^ 3;
                  local_e0 = local_120->allocator;
                  fStack_f8 = 0.0;
                  fStack_f4 = 0.0;
                  local_100 = (undefined1  [8])pvVar63;
                  uStack_f0._0_4_ = (float)(int)sVar71;
                  uStack_f0._4_4_ = (float)(int)(sVar71 >> 0x20);
                  fStack_e8 = (float)local_120->elempack;
                  local_c0 = (long)local_d0 * (long)local_d4;
                  local_cc = 1;
                  Mat::~Mat((Mat *)local_100);
                  if (0 < (int)uVar5) {
                    uVar66 = 0;
                    do {
                      if (0 < (int)uVar64) {
                        lVar60 = 0;
                        do {
                          auVar163 = vmaxps_avx(*(undefined1 (*) [32])
                                                 ((long)pvVar12 +
                                                 lVar60 + (long)local_130 * local_138 *
                                                          (long)local_158),
                                                *(undefined1 (*) [32])((long)pvVar56 + lVar60));
                          *(undefined1 (*) [32])((long)pvVar63 + lVar60) = auVar163;
                          lVar60 = lVar60 + 0x20;
                        } while (uVar47 << 5 != lVar60);
                        pvVar63 = (void *)((long)pvVar63 + lVar60);
                        pvVar56 = (void *)((long)pvVar56 + lVar60);
                      }
                      uVar66 = uVar66 + 1;
                    } while (uVar66 != uVar5);
                  }
                  local_158 = (__m256 *)((long)local_158 + 1);
                } while (local_158 != (__m256 *)uVar46);
                return 0;
              }
              return 0;
            }
            return -100;
          }
          Mat::create(this_00,uVar64,uVar7,uVar8,sVar71,iVar45,opt->blob_allocator);
          if (this_00->data == (void *)0x0) {
            return -100;
          }
          if ((long)local_120->c * local_120->cstep != 0) {
            if (0 < (int)uVar8) {
              local_158 = (__m256 *)0x0;
              do {
                pMVar1 = local_a0;
                afVar185 = _local_100;
                bVar74 = local_a0->dims == 3;
                local_c8 = 1;
                if (!bVar74) {
                  local_c8 = local_a0->d;
                }
                local_d4 = local_a0->w;
                local_d0 = local_a0->h;
                sVar71 = local_a0->cstep;
                pvVar12 = local_a0->data;
                local_130 = (void *)local_a0->elemsize;
                local_e0 = local_a0->allocator;
                _fStack_f8 = 0;
                local_100 = (undefined1  [8])
                            (sVar71 * (long)local_158 * (long)local_130 + (long)pvVar12);
                uStack_f0 = local_130;
                fStack_e4 = afVar185[7];
                fStack_e8 = (float)local_a0->elempack;
                local_d8 = bVar74 ^ 3;
                local_c0 = (long)local_d0 * (long)local_d4;
                local_cc = 1;
                Mat::~Mat((Mat *)local_100);
                bVar74 = pMVar1[1].dims == 3;
                local_c8 = 1;
                if (!bVar74) {
                  local_c8 = pMVar1[1].d;
                }
                local_d4 = pMVar1[1].w;
                local_d0 = pMVar1[1].h;
                local_110 = pMVar1[1].cstep;
                pvVar56 = pMVar1[1].data;
                local_128 = pMVar1[1].elemsize;
                local_e0 = pMVar1[1].allocator;
                _fStack_f8 = 0;
                local_100 = (undefined1  [8])
                            (local_110 * (long)local_158 * local_128 + (long)pvVar56);
                uStack_f0 = local_128;
                fStack_e8 = (float)pMVar1[1].elempack;
                local_d8 = bVar74 ^ 3;
                local_c0 = (long)local_d0 * (long)local_d4;
                local_cc = 1;
                Mat::~Mat((Mat *)local_100);
                bVar74 = local_120->dims == 3;
                local_d4 = local_120->w;
                local_d0 = local_120->h;
                local_c8 = 1;
                if (!bVar74) {
                  local_c8 = local_120->d;
                }
                sVar11 = local_120->cstep;
                pvVar63 = local_120->data;
                sVar13 = local_120->elemsize;
                local_e0 = local_120->allocator;
                fStack_f8 = 0.0;
                fStack_f4 = 0.0;
                local_100 = (undefined1  [8])(sVar11 * (long)local_158 * sVar13 + (long)pvVar63);
                uStack_f0._0_4_ = (float)(int)sVar13;
                uStack_f0._4_4_ = (float)(int)(sVar13 >> 0x20);
                fStack_e8 = (float)local_120->elempack;
                local_d8 = bVar74 ^ 3;
                local_c0 = (long)local_d0 * (long)local_d4;
                local_cc = 1;
                Mat::~Mat((Mat *)local_100);
                if (0 < (int)local_138) {
                  lVar60 = 0;
                  iVar45 = (int)local_138;
                  do {
                    auVar163 = vmaxps_avx(*(undefined1 (*) [32])
                                           ((long)pvVar12 +
                                           lVar60 + sVar71 * (long)local_130 * (long)local_158),
                                          *(undefined1 (*) [32])
                                           ((long)pvVar56 +
                                           lVar60 + local_110 * local_128 * (long)local_158));
                    *(undefined1 (*) [32])
                     ((long)pvVar63 + lVar60 + sVar11 * sVar13 * (long)local_158) = auVar163;
                    lVar60 = lVar60 + 0x20;
                    iVar45 = iVar45 + -1;
                  } while (iVar45 != 0);
                }
                local_158 = (__m256 *)((long)local_158 + 1);
              } while (local_158 != (__m256 *)uVar46);
              return 0;
            }
            return 0;
          }
          return -100;
        }
      }
      else {
        local_128 = CONCAT71(local_128._1_7_,uVar64 == 1);
        local_104 = CONCAT31(local_104._1_3_,uVar7 == 1);
        if ((uVar64 != 1 || uVar7 != 1) || uVar6 != uVar8) goto LAB_00245701;
      }
      Mat::create(this_00,uVar65,uVar5,uVar6,sVar11,uVar66,opt->blob_allocator);
      if (this_00->data == (void *)0x0) {
        return -100;
      }
      if ((long)this_00->c * this_00->cstep != 0) {
        if (0 < (int)local_130) {
          uVar47 = 0;
          do {
            if (0 < iVar72) {
              sVar71 = pMVar9[1].cstep;
              sVar11 = pMVar9[1].elemsize;
              auVar163 = *(undefined1 (*) [32])
                          ((long)pMVar9->data + pMVar9->cstep * uVar47 * pMVar9->elemsize);
              pvVar12 = pMVar9[1].data;
              sVar13 = this_00->cstep;
              sVar14 = this_00->elemsize;
              pvVar56 = this_00->data;
              lVar60 = 0;
              iVar45 = iVar72;
              do {
                auVar160 = vmaxps_avx(auVar163,*(undefined1 (*) [32])
                                                ((long)pvVar12 + lVar60 + sVar71 * sVar11 * uVar47))
                ;
                *(undefined1 (*) [32])((long)pvVar56 + lVar60 + sVar13 * sVar14 * uVar47) = auVar160
                ;
                lVar60 = lVar60 + 0x20;
                iVar45 = iVar45 + -1;
              } while (iVar45 != 0);
            }
            uVar47 = uVar47 + 1;
          } while ((void *)uVar47 != local_130);
          return 0;
        }
        return 0;
      }
      return -100;
    case 5:
      uVar64 = pMVar9->w;
      uVar47 = (ulong)uVar64;
      sVar71 = pMVar9->elemsize;
      uVar65 = pMVar9[1].w;
      uVar5 = pMVar9[1].h;
      uVar6 = pMVar9[1].c;
      local_130 = (void *)(ulong)uVar6;
      iVar72 = uVar5 * uVar65;
      sVar11 = pMVar9[1].elemsize;
      iVar59 = pMVar9->dims;
      if (iVar59 == 1) {
        iVar59 = pMVar9[1].dims;
        if (iVar45 != 1 || uVar64 != 1) {
          if (iVar59 == 1) {
            Mat::create(this_00,uVar64,sVar71,iVar45,opt->blob_allocator);
            pvVar12 = this_00->data;
            if (pvVar12 == (void *)0x0) {
              return -100;
            }
            if ((long)this_00->c * this_00->cstep == 0) {
              return -100;
            }
            if (uVar66 != 1 || pMVar9[1].w != 1) {
              if (0 < (int)uVar64) {
                pvVar56 = pMVar9->data;
                pvVar63 = pMVar9[1].data;
                lVar60 = 0;
                do {
                  auVar163 = vminps_avx(*(undefined1 (*) [32])((long)pvVar56 + lVar60),
                                        *(undefined1 (*) [32])((long)pvVar63 + lVar60));
                  *(undefined1 (*) [32])((long)pvVar12 + lVar60) = auVar163;
                  lVar60 = lVar60 + 0x20;
                  uVar66 = (int)uVar47 - 1;
                  uVar47 = (ulong)uVar66;
                } while (uVar66 != 0);
                return 0;
              }
              return 0;
            }
            if (0 < (int)uVar64) {
              uVar4 = *pMVar1->data;
              auVar162._4_4_ = uVar4;
              auVar162._0_4_ = uVar4;
              auVar162._8_4_ = uVar4;
              auVar162._12_4_ = uVar4;
              auVar162._16_4_ = uVar4;
              auVar162._20_4_ = uVar4;
              auVar162._24_4_ = uVar4;
              auVar162._28_4_ = uVar4;
              pvVar56 = pMVar9->data;
              lVar60 = 0;
              do {
                auVar163 = vminps_avx(auVar162,*(undefined1 (*) [32])((long)pvVar56 + lVar60));
                *(undefined1 (*) [32])((long)pvVar12 + lVar60) = auVar163;
                lVar60 = lVar60 + 0x20;
                uVar66 = (int)uVar47 - 1;
                uVar47 = (ulong)uVar66;
              } while (uVar66 != 0);
              return 0;
            }
            return 0;
          }
          if (iVar59 == 2) {
            Mat::create(this_00,uVar65,uVar5,sVar11,uVar66,opt->blob_allocator);
            pauVar49 = (undefined1 (*) [32])this_00->data;
            if (pauVar49 == (undefined1 (*) [32])0x0) {
              return -100;
            }
            if ((long)this_00->c * this_00->cstep != 0) {
              if (0 < (int)uVar5) {
                pauVar54 = (undefined1 (*) [32])pMVar9->data;
                pauVar52 = (undefined1 (*) [32])pMVar9[1].data;
                uVar66 = 0;
                do {
                  if (0 < (int)uVar65) {
                    auVar163 = *pauVar54;
                    uVar64 = uVar65;
                    do {
                      auVar160 = vminps_avx(auVar163,*pauVar52);
                      *pauVar49 = auVar160;
                      pauVar52 = pauVar52 + 1;
                      pauVar49 = pauVar49 + 1;
                      uVar64 = uVar64 - 1;
                    } while (uVar64 != 0);
                  }
                  pauVar54 = pauVar54 + 1;
                  uVar66 = uVar66 + 1;
                } while (uVar66 != uVar5);
                return 0;
              }
              return 0;
            }
            return -100;
          }
          if (iVar59 != 3) {
            return 0;
          }
          Mat::create(this_00,uVar65,uVar5,uVar6,sVar11,uVar66,opt->blob_allocator);
          if (this_00->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep == 0) {
            return -100;
          }
          if (0 < (int)local_130) {
            uVar47 = 0;
            do {
              if (0 < iVar72) {
                sVar71 = this_00->cstep;
                sVar11 = this_00->elemsize;
                auVar163 = *(undefined1 (*) [32])((long)pMVar9->data + uVar47 * 0x20);
                pvVar12 = this_00->data;
                sVar13 = pMVar9[1].cstep;
                sVar14 = pMVar9[1].elemsize;
                pvVar56 = pMVar9[1].data;
                lVar60 = 0;
                iVar45 = iVar72;
                do {
                  auVar160 = vminps_avx(auVar163,*(undefined1 (*) [32])
                                                  ((long)pvVar56 + lVar60 + sVar13 * sVar14 * uVar47
                                                  ));
                  *(undefined1 (*) [32])((long)pvVar12 + lVar60 + sVar71 * sVar11 * uVar47) =
                       auVar160;
                  lVar60 = lVar60 + 0x20;
                  iVar45 = iVar45 + -1;
                } while (iVar45 != 0);
              }
              uVar47 = uVar47 + 1;
            } while ((void *)uVar47 != local_130);
            return 0;
          }
          return 0;
        }
        if (iVar59 == 1) {
          Mat::create(this_00,uVar65,sVar11,uVar66,opt->blob_allocator);
          pvVar12 = this_00->data;
          if (pvVar12 == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep != 0) {
            if (0 < (int)uVar65) {
              uVar4 = *pMVar9->data;
              auVar161._4_4_ = uVar4;
              auVar161._0_4_ = uVar4;
              auVar161._8_4_ = uVar4;
              auVar161._12_4_ = uVar4;
              auVar161._16_4_ = uVar4;
              auVar161._20_4_ = uVar4;
              auVar161._24_4_ = uVar4;
              auVar161._28_4_ = uVar4;
              pvVar56 = pMVar1->data;
              lVar60 = 0;
              do {
                auVar163 = vminps_avx(auVar161,*(undefined1 (*) [32])((long)pvVar56 + lVar60));
                *(undefined1 (*) [32])((long)pvVar12 + lVar60) = auVar163;
                lVar60 = lVar60 + 0x20;
                uVar65 = uVar65 - 1;
              } while (uVar65 != 0);
              return 0;
            }
            return 0;
          }
          return -100;
        }
        if (iVar59 == 2) {
          Mat::create(this_00,uVar65,uVar5,sVar11,uVar66,opt->blob_allocator);
          pvVar12 = this_00->data;
          if (pvVar12 == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep != 0) {
            if (0 < iVar72) {
              uVar4 = *pMVar9->data;
              auVar159._4_4_ = uVar4;
              auVar159._0_4_ = uVar4;
              auVar159._8_4_ = uVar4;
              auVar159._12_4_ = uVar4;
              auVar159._16_4_ = uVar4;
              auVar159._20_4_ = uVar4;
              auVar159._24_4_ = uVar4;
              auVar159._28_4_ = uVar4;
              pvVar56 = pMVar1->data;
              lVar60 = 0;
              do {
                auVar163 = vminps_avx(auVar159,*(undefined1 (*) [32])((long)pvVar56 + lVar60));
                *(undefined1 (*) [32])((long)pvVar12 + lVar60) = auVar163;
                lVar60 = lVar60 + 0x20;
                iVar72 = iVar72 + -1;
              } while (iVar72 != 0);
              return 0;
            }
            return 0;
          }
          return -100;
        }
        if (iVar59 != 3) {
          return 0;
        }
        Mat::create(this_00,uVar65,uVar5,uVar6,sVar11,uVar66,opt->blob_allocator);
        if (this_00->data == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep == 0) {
          return -100;
        }
        if (0 < (int)local_130) {
          uVar4 = *pMVar9->data;
          auVar140._4_4_ = uVar4;
          auVar140._0_4_ = uVar4;
          auVar140._8_4_ = uVar4;
          auVar140._12_4_ = uVar4;
          auVar140._16_4_ = uVar4;
          auVar140._20_4_ = uVar4;
          auVar140._24_4_ = uVar4;
          auVar140._28_4_ = uVar4;
          uVar47 = 0;
          do {
            if (0 < iVar72) {
              sVar71 = this_00->cstep;
              sVar11 = this_00->elemsize;
              pvVar12 = this_00->data;
              sVar13 = pMVar9[1].cstep;
              sVar14 = pMVar9[1].elemsize;
              pvVar56 = pMVar9[1].data;
              lVar60 = 0;
              iVar45 = iVar72;
              do {
                auVar163 = vminps_avx(auVar140,*(undefined1 (*) [32])
                                                ((long)pvVar56 + lVar60 + sVar13 * sVar14 * uVar47))
                ;
                *(undefined1 (*) [32])((long)pvVar12 + lVar60 + sVar71 * sVar11 * uVar47) = auVar163
                ;
                lVar60 = lVar60 + 0x20;
                iVar45 = iVar45 + -1;
              } while (iVar45 != 0);
            }
            uVar47 = uVar47 + 1;
          } while ((void *)uVar47 != local_130);
          return 0;
        }
        return 0;
      }
      uVar7 = pMVar9->h;
      local_138 = CONCAT44(local_138._4_4_,uVar7 * uVar64);
      if (iVar59 == 2) {
        if (pMVar9[1].dims == 3) {
          Mat::create(this_00,uVar65,uVar5,uVar6,sVar11,uVar66,opt->blob_allocator);
          if (this_00->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep != 0) {
            if (0 < (int)local_130) {
              uVar47 = 0;
              do {
                if (0 < (int)uVar5) {
                  pauVar49 = (undefined1 (*) [32])
                             (this_00->cstep * uVar47 * this_00->elemsize + (long)this_00->data);
                  pauVar54 = (undefined1 (*) [32])
                             (pMVar9[1].cstep * uVar47 * pMVar9[1].elemsize + (long)pMVar9[1].data);
                  pauVar52 = (undefined1 (*) [32])
                             ((long)pMVar9->w * uVar47 * pMVar9->elemsize + (long)pMVar9->data);
                  uVar66 = 0;
                  do {
                    if (0 < (int)uVar65) {
                      auVar163 = *pauVar52;
                      uVar64 = uVar65;
                      do {
                        auVar160 = vminps_avx(auVar163,*pauVar54);
                        *pauVar49 = auVar160;
                        pauVar54 = pauVar54 + 1;
                        pauVar49 = pauVar49 + 1;
                        uVar64 = uVar64 - 1;
                      } while (uVar64 != 0);
                    }
                    pauVar52 = pauVar52 + 1;
                    uVar66 = uVar66 + 1;
                  } while (uVar66 != uVar5);
                }
                uVar47 = uVar47 + 1;
              } while ((void *)uVar47 != local_130);
              return 0;
            }
            return 0;
          }
          return -100;
        }
        local_128 = CONCAT44(uVar4,uVar66);
        Mat::create(this_00,uVar64,uVar7,sVar71,iVar45,opt->blob_allocator);
        pvVar12 = this_00->data;
        if (pvVar12 == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep == 0) {
          return -100;
        }
        if (pMVar9[1].dims != 1) {
          if (pMVar9[1].dims != 2) {
            return 0;
          }
          if (0 < (int)local_138) {
            pvVar56 = pMVar9->data;
            pvVar63 = pMVar9[1].data;
            lVar60 = 0;
            do {
              auVar163 = vminps_avx(*(undefined1 (*) [32])((long)pvVar56 + lVar60),
                                    *(undefined1 (*) [32])((long)pvVar63 + lVar60));
              *(undefined1 (*) [32])((long)pvVar12 + lVar60) = auVar163;
              lVar60 = lVar60 + 0x20;
              local_138._0_4_ = (int)local_138 + -1;
            } while ((int)local_138 != 0);
            return 0;
          }
          return 0;
        }
        Mat::create(this_00,uVar64,uVar7,sVar71,iVar45,opt->blob_allocator);
        pauVar49 = (undefined1 (*) [32])this_00->data;
        if (pauVar49 == (undefined1 (*) [32])0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep != 0) {
          if ((int)local_128 != 1 || pMVar9[1].w != 1) {
            if (0 < (int)uVar7) {
              pauVar54 = (undefined1 (*) [32])pMVar9->data;
              pauVar52 = (undefined1 (*) [32])pMVar9[1].data;
              uVar66 = 0;
              do {
                if (0 < (int)uVar64) {
                  auVar163 = *pauVar52;
                  uVar46 = uVar47;
                  do {
                    auVar160 = vminps_avx(auVar163,*pauVar54);
                    *pauVar49 = auVar160;
                    pauVar54 = pauVar54 + 1;
                    pauVar49 = pauVar49 + 1;
                    uVar65 = (int)uVar46 - 1;
                    uVar46 = (ulong)uVar65;
                  } while (uVar65 != 0);
                }
                pauVar52 = pauVar52 + 1;
                uVar66 = uVar66 + 1;
              } while (uVar66 != uVar7);
              return 0;
            }
            return 0;
          }
          if (0 < (int)local_138) {
            uVar4 = *pMVar1->data;
            auVar169._4_4_ = uVar4;
            auVar169._0_4_ = uVar4;
            auVar169._8_4_ = uVar4;
            auVar169._12_4_ = uVar4;
            auVar169._16_4_ = uVar4;
            auVar169._20_4_ = uVar4;
            auVar169._24_4_ = uVar4;
            auVar169._28_4_ = uVar4;
            pvVar12 = pMVar9->data;
            lVar60 = 0;
            do {
              auVar163 = vminps_avx(auVar169,*(undefined1 (*) [32])((long)pvVar12 + lVar60));
              *(undefined1 (*) [32])((long)*pauVar49 + lVar60) = auVar163;
              lVar60 = lVar60 + 0x20;
              local_138._0_4_ = (int)local_138 + -1;
            } while ((int)local_138 != 0);
            return 0;
          }
          return 0;
        }
        return -100;
      }
      if (iVar59 != 3) {
        return 0;
      }
      uVar8 = pMVar9->c;
      uVar46 = (ulong)uVar8;
      if (pMVar9[1].dims != 3) {
        Mat::create(this_00,uVar64,uVar7,uVar8,sVar71,iVar45,opt->blob_allocator);
        if (this_00->data == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep == 0) {
          return -100;
        }
        if (pMVar9[1].dims == 1) {
          if (uVar66 != 1 || pMVar9[1].w != 1) {
            if (0 < (int)uVar8) {
              uVar47 = 0;
              do {
                if (0 < (int)local_138) {
                  sVar71 = this_00->cstep;
                  sVar11 = this_00->elemsize;
                  auVar163 = *(undefined1 (*) [32])((long)pMVar1->data + uVar47 * 0x20);
                  pvVar12 = this_00->data;
                  sVar13 = pMVar9->cstep;
                  sVar14 = pMVar9->elemsize;
                  pvVar56 = pMVar9->data;
                  lVar60 = 0;
                  iVar45 = (int)local_138;
                  do {
                    auVar160 = vminps_avx(auVar163,*(undefined1 (*) [32])
                                                    ((long)pvVar56 +
                                                    lVar60 + sVar13 * sVar14 * uVar47));
                    *(undefined1 (*) [32])((long)pvVar12 + lVar60 + sVar71 * sVar11 * uVar47) =
                         auVar160;
                    lVar60 = lVar60 + 0x20;
                    iVar45 = iVar45 + -1;
                  } while (iVar45 != 0);
                }
                uVar47 = uVar47 + 1;
              } while (uVar47 != uVar46);
              return 0;
            }
            return 0;
          }
          if (0 < (int)uVar8) {
            uVar4 = *pMVar1->data;
            auVar172._4_4_ = uVar4;
            auVar172._0_4_ = uVar4;
            auVar172._8_4_ = uVar4;
            auVar172._12_4_ = uVar4;
            auVar172._16_4_ = uVar4;
            auVar172._20_4_ = uVar4;
            auVar172._24_4_ = uVar4;
            auVar172._28_4_ = uVar4;
            uVar47 = 0;
            do {
              if (0 < (int)local_138) {
                sVar71 = this_00->cstep;
                sVar11 = this_00->elemsize;
                pvVar12 = this_00->data;
                sVar13 = pMVar9->cstep;
                sVar14 = pMVar9->elemsize;
                pvVar56 = pMVar9->data;
                lVar60 = 0;
                iVar45 = (int)local_138;
                do {
                  auVar163 = vminps_avx(auVar172,*(undefined1 (*) [32])
                                                  ((long)pvVar56 + lVar60 + sVar13 * sVar14 * uVar47
                                                  ));
                  *(undefined1 (*) [32])((long)pvVar12 + lVar60 + sVar71 * sVar11 * uVar47) =
                       auVar163;
                  lVar60 = lVar60 + 0x20;
                  iVar45 = iVar45 + -1;
                } while (iVar45 != 0);
              }
              uVar47 = uVar47 + 1;
            } while (uVar47 != uVar46);
            return 0;
          }
          return 0;
        }
        if (pMVar9[1].dims != 2) {
          return 0;
        }
        if (0 < (int)uVar8) {
          uVar48 = 0;
          do {
            if (0 < (int)uVar7) {
              pauVar49 = (undefined1 (*) [32])
                         (this_00->cstep * uVar48 * this_00->elemsize + (long)this_00->data);
              pauVar54 = (undefined1 (*) [32])
                         ((long)pMVar9[1].w * uVar48 * pMVar9[1].elemsize + (long)pMVar9[1].data);
              pauVar52 = (undefined1 (*) [32])
                         (pMVar9->cstep * uVar48 * pMVar9->elemsize + (long)pMVar9->data);
              uVar66 = 0;
              do {
                if (0 < (int)uVar64) {
                  auVar163 = *pauVar54;
                  uVar62 = uVar47;
                  do {
                    auVar160 = vminps_avx(auVar163,*pauVar52);
                    *pauVar49 = auVar160;
                    pauVar52 = pauVar52 + 1;
                    pauVar49 = pauVar49 + 1;
                    uVar65 = (int)uVar62 - 1;
                    uVar62 = (ulong)uVar65;
                  } while (uVar65 != 0);
                }
                pauVar54 = pauVar54 + 1;
                uVar66 = uVar66 + 1;
              } while (uVar66 != uVar7);
            }
            uVar48 = uVar48 + 1;
          } while (uVar48 != uVar46);
          return 0;
        }
        return 0;
      }
      if (uVar8 == uVar6 && ((uVar65 ^ 1) == 0 && (uVar5 ^ 1) == 0)) {
        Mat::create(this_00,uVar64,uVar7,uVar8,sVar71,iVar45,opt->blob_allocator);
        if (this_00->data == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep != 0) {
          if (0 < (int)uVar8) {
            uVar47 = 0;
            do {
              if (0 < (int)local_138) {
                sVar71 = pMVar9->cstep;
                sVar11 = pMVar9->elemsize;
                auVar163 = *(undefined1 (*) [32])
                            ((long)pMVar9[1].data + pMVar9[1].cstep * uVar47 * pMVar9[1].elemsize);
                pvVar12 = pMVar9->data;
                sVar13 = this_00->cstep;
                sVar14 = this_00->elemsize;
                pvVar56 = this_00->data;
                lVar60 = 0;
                iVar45 = (int)local_138;
                do {
                  auVar160 = vminps_avx(auVar163,*(undefined1 (*) [32])
                                                  ((long)pvVar12 + lVar60 + sVar71 * sVar11 * uVar47
                                                  ));
                  *(undefined1 (*) [32])((long)pvVar56 + lVar60 + sVar13 * sVar14 * uVar47) =
                       auVar160;
                  lVar60 = lVar60 + 0x20;
                  iVar45 = iVar45 + -1;
                } while (iVar45 != 0);
              }
              uVar47 = uVar47 + 1;
            } while (uVar47 != uVar46);
            return 0;
          }
          return 0;
        }
        return -100;
      }
      local_110 = sVar71;
      if (uVar65 == uVar64) {
        if (uVar66 == 1 && (uVar6 == 1 && uVar5 == uVar7)) {
          Mat::create(this_00,uVar64,uVar7,uVar8,sVar71,iVar45,opt->blob_allocator);
          if (this_00->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep != 0) {
            if (0 < (int)uVar8) {
              uVar47 = 0;
              do {
                if (0 < (int)local_138) {
                  sVar71 = pMVar9->cstep;
                  sVar11 = pMVar9->elemsize;
                  sVar13 = this_00->cstep;
                  pvVar12 = pMVar9->data;
                  pvVar56 = pMVar9[1].data;
                  sVar14 = this_00->elemsize;
                  pvVar63 = this_00->data;
                  lVar60 = 0;
                  iVar45 = (int)local_138;
                  do {
                    uVar4 = *(undefined4 *)((long)pvVar56 + lVar60);
                    auVar146._4_4_ = uVar4;
                    auVar146._0_4_ = uVar4;
                    auVar146._8_4_ = uVar4;
                    auVar146._12_4_ = uVar4;
                    auVar146._16_4_ = uVar4;
                    auVar146._20_4_ = uVar4;
                    auVar146._24_4_ = uVar4;
                    auVar146._28_4_ = uVar4;
                    auVar163 = vminps_avx(auVar146,*(undefined1 (*) [32])
                                                    ((long)pvVar12 +
                                                    lVar60 * 8 + sVar71 * sVar11 * uVar47));
                    *(undefined1 (*) [32])((long)pvVar63 + lVar60 * 8 + sVar13 * sVar14 * uVar47) =
                         auVar163;
                    lVar60 = lVar60 + 4;
                    iVar45 = iVar45 + -1;
                  } while (iVar45 != 0);
                }
                uVar47 = uVar47 + 1;
              } while (uVar47 != uVar46);
              return 0;
            }
            return 0;
          }
          return -100;
        }
        local_128 = CONCAT71(local_128._1_7_,uVar64 == 1);
        local_104 = CONCAT31(local_104._1_3_,uVar7 == 1);
        if ((uVar64 != 1 || uVar7 != 1) || uVar6 != uVar8) {
          if (((iVar45 == 1) && (uVar5 == uVar7)) && (uVar8 == 1)) {
            Mat::create(this_00,uVar64,uVar7,uVar6,sVar11,uVar66,opt->blob_allocator);
            if (this_00->data == (void *)0x0) {
              return -100;
            }
            if ((long)this_00->c * this_00->cstep != 0) {
              if (0 < (int)local_130) {
                uVar47 = 0;
                do {
                  if (0 < iVar72) {
                    sVar71 = pMVar9[1].cstep;
                    sVar11 = pMVar9[1].elemsize;
                    sVar13 = this_00->cstep;
                    pvVar12 = pMVar9[1].data;
                    pvVar56 = pMVar9->data;
                    sVar14 = this_00->elemsize;
                    pvVar63 = this_00->data;
                    lVar60 = 0;
                    iVar45 = iVar72;
                    do {
                      uVar4 = *(undefined4 *)((long)pvVar56 + lVar60);
                      auVar181._4_4_ = uVar4;
                      auVar181._0_4_ = uVar4;
                      auVar181._8_4_ = uVar4;
                      auVar181._12_4_ = uVar4;
                      auVar181._16_4_ = uVar4;
                      auVar181._20_4_ = uVar4;
                      auVar181._24_4_ = uVar4;
                      auVar181._28_4_ = uVar4;
                      auVar163 = vminps_avx(auVar181,*(undefined1 (*) [32])
                                                      ((long)pvVar12 +
                                                      lVar60 * 8 + sVar71 * sVar11 * uVar47));
                      *(undefined1 (*) [32])((long)pvVar63 + lVar60 * 8 + sVar13 * sVar14 * uVar47)
                           = auVar163;
                      lVar60 = lVar60 + 4;
                      iVar45 = iVar45 + -1;
                    } while (iVar45 != 0);
                  }
                  uVar47 = uVar47 + 1;
                } while ((void *)uVar47 != local_130);
                return 0;
              }
              return 0;
            }
            return -100;
          }
LAB_00246f76:
          if ((((uVar65 ^ 1) == 0 && uVar5 == uVar7) && uVar8 == uVar6) && uVar64 != 1) {
            Mat::create(this_00,uVar64,uVar7,uVar8,sVar71,iVar45,opt->blob_allocator);
            if (this_00->data == (void *)0x0) {
              return -100;
            }
            if ((long)this_00->c * this_00->cstep != 0) {
              if (0 < (int)uVar8) {
                uVar48 = 0;
                do {
                  if (0 < (int)uVar7) {
                    sVar71 = pMVar9[1].cstep;
                    sVar11 = pMVar9[1].elemsize;
                    pvVar12 = pMVar9[1].data;
                    pauVar49 = (undefined1 (*) [32])
                               (this_00->cstep * uVar48 * this_00->elemsize + (long)this_00->data);
                    pauVar54 = (undefined1 (*) [32])
                               (pMVar9->cstep * uVar48 * pMVar9->elemsize + (long)pMVar9->data);
                    uVar62 = 0;
                    do {
                      if (0 < (int)uVar64) {
                        auVar163 = *(undefined1 (*) [32])
                                    ((long)pvVar12 + uVar62 * 0x20 + sVar71 * uVar48 * sVar11);
                        uVar67 = uVar47;
                        do {
                          auVar160 = vminps_avx(auVar163,*pauVar54);
                          *pauVar49 = auVar160;
                          pauVar54 = pauVar54 + 1;
                          pauVar49 = pauVar49 + 1;
                          uVar66 = (int)uVar67 - 1;
                          uVar67 = (ulong)uVar66;
                        } while (uVar66 != 0);
                      }
                      uVar62 = uVar62 + 1;
                    } while (uVar62 != uVar7);
                  }
                  uVar48 = uVar48 + 1;
                } while (uVar48 != uVar46);
                return 0;
              }
              return 0;
            }
            return -100;
          }
          if (((uVar65 == uVar64 && (uVar5 ^ 1) == 0) && uVar8 == uVar6) && uVar7 != 1) {
            Mat::create(this_00,uVar64,uVar7,uVar8,sVar71,iVar45,opt->blob_allocator);
            if (this_00->data == (void *)0x0) {
              return -100;
            }
            if ((long)this_00->c * this_00->cstep != 0) {
              if (0 < (int)uVar8) {
                uVar48 = 0;
                do {
                  if (0 < (int)uVar7) {
                    sVar71 = pMVar9[1].elemsize;
                    pvVar56 = (void *)(this_00->cstep * uVar48 * this_00->elemsize +
                                      (long)this_00->data);
                    pvVar63 = (void *)(pMVar9->cstep * uVar48 * pMVar9->elemsize +
                                      (long)pMVar9->data);
                    sVar11 = pMVar9[1].cstep;
                    pvVar12 = pMVar9[1].data;
                    uVar66 = 0;
                    do {
                      if (0 < (int)uVar64) {
                        lVar60 = 0;
                        do {
                          auVar163 = vminps_avx(*(undefined1 (*) [32])((long)pvVar63 + lVar60),
                                                *(undefined1 (*) [32])
                                                 ((long)pvVar12 + lVar60 + sVar71 * sVar11 * uVar48)
                                               );
                          *(undefined1 (*) [32])((long)pvVar56 + lVar60) = auVar163;
                          lVar60 = lVar60 + 0x20;
                        } while (uVar47 << 5 != lVar60);
                        pvVar56 = (void *)((long)pvVar56 + lVar60);
                        pvVar63 = (void *)((long)pvVar63 + lVar60);
                      }
                      uVar66 = uVar66 + 1;
                    } while (uVar66 != uVar7);
                  }
                  uVar48 = uVar48 + 1;
                } while (uVar48 != uVar46);
                return 0;
              }
              return 0;
            }
            return -100;
          }
          if (((uVar6 == uVar8 && uVar5 == uVar7) & uVar65 != 1 & (byte)local_128) == 1) {
            Mat::create(this_00,uVar65,uVar7,uVar8,sVar11,uVar66,opt->blob_allocator);
            if (this_00->data == (void *)0x0) {
              return -100;
            }
            if ((long)this_00->c * this_00->cstep != 0) {
              if (0 < (int)uVar8) {
                uVar47 = 0;
                do {
                  if (0 < (int)uVar7) {
                    sVar71 = pMVar9->cstep;
                    sVar11 = pMVar9->elemsize;
                    pvVar12 = pMVar9->data;
                    pauVar49 = (undefined1 (*) [32])
                               (this_00->cstep * uVar47 * this_00->elemsize + (long)this_00->data);
                    pauVar54 = (undefined1 (*) [32])
                               (pMVar9[1].cstep * uVar47 * pMVar9[1].elemsize + (long)pMVar9[1].data
                               );
                    uVar48 = 0;
                    do {
                      if (0 < (int)uVar65) {
                        auVar163 = *(undefined1 (*) [32])
                                    ((long)pvVar12 + uVar48 * 0x20 + sVar71 * uVar47 * sVar11);
                        uVar66 = uVar65;
                        do {
                          auVar160 = vminps_avx(auVar163,*pauVar54);
                          *pauVar49 = auVar160;
                          pauVar54 = pauVar54 + 1;
                          pauVar49 = pauVar49 + 1;
                          uVar66 = uVar66 - 1;
                        } while (uVar66 != 0);
                      }
                      uVar48 = uVar48 + 1;
                    } while (uVar48 != uVar7);
                  }
                  uVar47 = uVar47 + 1;
                } while (uVar47 != uVar46);
                return 0;
              }
              return 0;
            }
            return -100;
          }
          if (((byte)local_104 & uVar6 == uVar8 & (uVar5 != 1 && uVar65 == uVar64)) == 1) {
            Mat::create(this_00,uVar64,uVar5,uVar8,sVar11,uVar66,opt->blob_allocator);
            if (this_00->data == (void *)0x0) {
              return -100;
            }
            if ((long)local_120->c * local_120->cstep != 0) {
              if (0 < (int)uVar8) {
                local_158 = (__m256 *)0x0;
                do {
                  pMVar1 = local_a0;
                  afVar185 = _local_100;
                  bVar74 = local_a0->dims == 3;
                  local_c8 = 1;
                  if (!bVar74) {
                    local_c8 = local_a0->d;
                  }
                  local_d4 = local_a0->w;
                  local_d0 = local_a0->h;
                  local_130 = (void *)local_a0->cstep;
                  pvVar12 = local_a0->data;
                  local_138 = local_a0->elemsize;
                  local_e0 = local_a0->allocator;
                  _fStack_f8 = 0;
                  local_100 = (undefined1  [8])
                              ((long)local_130 * (long)local_158 * local_138 + (long)pvVar12);
                  uStack_f0 = local_138;
                  fStack_e4 = afVar185[7];
                  fStack_e8 = (float)local_a0->elempack;
                  local_d8 = bVar74 ^ 3;
                  local_c0 = (long)local_d0 * (long)local_d4;
                  local_cc = 1;
                  Mat::~Mat((Mat *)local_100);
                  bVar74 = pMVar1[1].dims == 3;
                  local_c8 = 1;
                  if (!bVar74) {
                    local_c8 = pMVar1[1].d;
                  }
                  local_d4 = pMVar1[1].w;
                  local_d0 = pMVar1[1].h;
                  pvVar56 = (void *)(pMVar1[1].cstep * (long)local_158 * pMVar1[1].elemsize +
                                    (long)pMVar1[1].data);
                  local_d8 = bVar74 ^ 3;
                  local_e0 = pMVar1[1].allocator;
                  _fStack_f8 = 0;
                  local_100 = (undefined1  [8])pvVar56;
                  uStack_f0 = pMVar1[1].elemsize;
                  fStack_e8 = (float)pMVar1[1].elempack;
                  local_c0 = (long)local_d0 * (long)local_d4;
                  local_cc = 1;
                  Mat::~Mat((Mat *)local_100);
                  bVar74 = local_120->dims == 3;
                  local_d4 = local_120->w;
                  local_d0 = local_120->h;
                  local_c8 = 1;
                  if (!bVar74) {
                    local_c8 = local_120->d;
                  }
                  sVar71 = local_120->elemsize;
                  pvVar63 = (void *)(local_120->cstep * (long)local_158 * sVar71 +
                                    (long)local_120->data);
                  local_d8 = bVar74 ^ 3;
                  local_e0 = local_120->allocator;
                  fStack_f8 = 0.0;
                  fStack_f4 = 0.0;
                  local_100 = (undefined1  [8])pvVar63;
                  uStack_f0._0_4_ = (float)(int)sVar71;
                  uStack_f0._4_4_ = (float)(int)(sVar71 >> 0x20);
                  fStack_e8 = (float)local_120->elempack;
                  local_c0 = (long)local_d0 * (long)local_d4;
                  local_cc = 1;
                  Mat::~Mat((Mat *)local_100);
                  if (0 < (int)uVar5) {
                    uVar66 = 0;
                    do {
                      if (0 < (int)uVar64) {
                        lVar60 = 0;
                        do {
                          auVar163 = vminps_avx(*(undefined1 (*) [32])
                                                 ((long)pvVar12 +
                                                 lVar60 + (long)local_130 * local_138 *
                                                          (long)local_158),
                                                *(undefined1 (*) [32])((long)pvVar56 + lVar60));
                          *(undefined1 (*) [32])((long)pvVar63 + lVar60) = auVar163;
                          lVar60 = lVar60 + 0x20;
                        } while (uVar47 << 5 != lVar60);
                        pvVar63 = (void *)((long)pvVar63 + lVar60);
                        pvVar56 = (void *)((long)pvVar56 + lVar60);
                      }
                      uVar66 = uVar66 + 1;
                    } while (uVar66 != uVar5);
                  }
                  local_158 = (__m256 *)((long)local_158 + 1);
                } while (local_158 != (__m256 *)uVar46);
                return 0;
              }
              return 0;
            }
            return -100;
          }
          Mat::create(this_00,uVar64,uVar7,uVar8,sVar71,iVar45,opt->blob_allocator);
          if (this_00->data == (void *)0x0) {
            return -100;
          }
          if ((long)local_120->c * local_120->cstep != 0) {
            if (0 < (int)uVar8) {
              local_158 = (__m256 *)0x0;
              do {
                pMVar1 = local_a0;
                afVar185 = _local_100;
                bVar74 = local_a0->dims == 3;
                local_c8 = 1;
                if (!bVar74) {
                  local_c8 = local_a0->d;
                }
                local_d4 = local_a0->w;
                local_d0 = local_a0->h;
                sVar71 = local_a0->cstep;
                pvVar12 = local_a0->data;
                local_130 = (void *)local_a0->elemsize;
                local_e0 = local_a0->allocator;
                _fStack_f8 = 0;
                local_100 = (undefined1  [8])
                            (sVar71 * (long)local_158 * (long)local_130 + (long)pvVar12);
                uStack_f0 = local_130;
                fStack_e4 = afVar185[7];
                fStack_e8 = (float)local_a0->elempack;
                local_d8 = bVar74 ^ 3;
                local_c0 = (long)local_d0 * (long)local_d4;
                local_cc = 1;
                Mat::~Mat((Mat *)local_100);
                bVar74 = pMVar1[1].dims == 3;
                local_c8 = 1;
                if (!bVar74) {
                  local_c8 = pMVar1[1].d;
                }
                local_d4 = pMVar1[1].w;
                local_d0 = pMVar1[1].h;
                local_110 = pMVar1[1].cstep;
                pvVar56 = pMVar1[1].data;
                local_128 = pMVar1[1].elemsize;
                local_e0 = pMVar1[1].allocator;
                _fStack_f8 = 0;
                local_100 = (undefined1  [8])
                            (local_110 * (long)local_158 * local_128 + (long)pvVar56);
                uStack_f0 = local_128;
                fStack_e8 = (float)pMVar1[1].elempack;
                local_d8 = bVar74 ^ 3;
                local_c0 = (long)local_d0 * (long)local_d4;
                local_cc = 1;
                Mat::~Mat((Mat *)local_100);
                bVar74 = local_120->dims == 3;
                local_d4 = local_120->w;
                local_d0 = local_120->h;
                local_c8 = 1;
                if (!bVar74) {
                  local_c8 = local_120->d;
                }
                sVar11 = local_120->cstep;
                pvVar63 = local_120->data;
                sVar13 = local_120->elemsize;
                local_e0 = local_120->allocator;
                fStack_f8 = 0.0;
                fStack_f4 = 0.0;
                local_100 = (undefined1  [8])(sVar11 * (long)local_158 * sVar13 + (long)pvVar63);
                uStack_f0._0_4_ = (float)(int)sVar13;
                uStack_f0._4_4_ = (float)(int)(sVar13 >> 0x20);
                fStack_e8 = (float)local_120->elempack;
                local_d8 = bVar74 ^ 3;
                local_c0 = (long)local_d0 * (long)local_d4;
                local_cc = 1;
                Mat::~Mat((Mat *)local_100);
                if (0 < (int)local_138) {
                  lVar60 = 0;
                  iVar45 = (int)local_138;
                  do {
                    auVar163 = vminps_avx(*(undefined1 (*) [32])
                                           ((long)pvVar12 +
                                           lVar60 + sVar71 * (long)local_130 * (long)local_158),
                                          *(undefined1 (*) [32])
                                           ((long)pvVar56 +
                                           lVar60 + local_110 * local_128 * (long)local_158));
                    *(undefined1 (*) [32])
                     ((long)pvVar63 + lVar60 + sVar11 * sVar13 * (long)local_158) = auVar163;
                    lVar60 = lVar60 + 0x20;
                    iVar45 = iVar45 + -1;
                  } while (iVar45 != 0);
                }
                local_158 = (__m256 *)((long)local_158 + 1);
              } while (local_158 != (__m256 *)uVar46);
              return 0;
            }
            return 0;
          }
          return -100;
        }
      }
      else {
        local_128 = CONCAT71(local_128._1_7_,uVar64 == 1);
        local_104 = CONCAT31(local_104._1_3_,uVar7 == 1);
        if ((uVar64 != 1 || uVar7 != 1) || uVar6 != uVar8) goto LAB_00246f76;
      }
      Mat::create(this_00,uVar65,uVar5,uVar6,sVar11,uVar66,opt->blob_allocator);
      if (this_00->data == (void *)0x0) {
        return -100;
      }
      if ((long)this_00->c * this_00->cstep != 0) {
        if (0 < (int)local_130) {
          uVar47 = 0;
          do {
            if (0 < iVar72) {
              sVar71 = pMVar9[1].cstep;
              sVar11 = pMVar9[1].elemsize;
              auVar163 = *(undefined1 (*) [32])
                          ((long)pMVar9->data + pMVar9->cstep * uVar47 * pMVar9->elemsize);
              pvVar12 = pMVar9[1].data;
              sVar13 = this_00->cstep;
              sVar14 = this_00->elemsize;
              pvVar56 = this_00->data;
              lVar60 = 0;
              iVar45 = iVar72;
              do {
                auVar160 = vminps_avx(auVar163,*(undefined1 (*) [32])
                                                ((long)pvVar12 + lVar60 + sVar71 * sVar11 * uVar47))
                ;
                *(undefined1 (*) [32])((long)pvVar56 + lVar60 + sVar13 * sVar14 * uVar47) = auVar160
                ;
                lVar60 = lVar60 + 0x20;
                iVar45 = iVar45 + -1;
              } while (iVar45 != 0);
            }
            uVar47 = uVar47 + 1;
          } while ((void *)uVar47 != local_130);
          return 0;
        }
        return 0;
      }
      return -100;
    case 6:
      uVar64 = pMVar9->w;
      local_110 = (size_t)uVar64;
      local_60 = pMVar9->elemsize;
      uVar65 = pMVar9[1].w;
      uVar5 = pMVar9[1].h;
      uVar6 = pMVar9[1].c;
      uVar47 = (ulong)uVar6;
      sVar71 = pMVar9[1].elemsize;
      iVar59 = pMVar9->dims;
      local_128 = uVar47;
      if (iVar59 == 1) {
        local_90 = CONCAT44(local_90._4_4_,uVar5 * uVar65);
        iVar59 = pMVar9[1].dims;
        if (iVar45 == 1 && uVar64 == 1) {
          if (iVar59 == 1) {
            Mat::create(this_00,uVar65,sVar71,uVar66,opt->blob_allocator);
            pvVar12 = this_00->data;
            if (pvVar12 == (void *)0x0) {
              return -100;
            }
            if ((long)this_00->c * this_00->cstep == 0) {
              return -100;
            }
            local_100._4_4_ = *local_a0->data;
            local_100._0_4_ = local_100._4_4_;
            fStack_f8 = (float)local_100._4_4_;
            fStack_f4 = (float)local_100._4_4_;
            uStack_f0._0_4_ = (float)local_100._4_4_;
            uStack_f0._4_4_ = (float)local_100._4_4_;
            fStack_e8 = (float)local_100._4_4_;
            fStack_e4 = (float)local_100._4_4_;
            if (0 < (int)uVar65) {
              pvVar56 = pMVar1->data;
              lVar60 = 0;
              do {
                pafVar51 = (__m256 *)((long)pvVar56 + lVar60);
                uVar199 = *(undefined8 *)*pafVar51;
                uVar198 = *(undefined8 *)(*pafVar51 + 2);
                uVar201 = *(undefined8 *)(*pafVar51 + 4);
                uVar202 = *(undefined8 *)(*pafVar51 + 6);
                local_80 = *pafVar51;
                binary_op_pow_pack8::operator()(&local_139,(__m256 *)local_100,&local_80);
                puVar68 = (undefined8 *)((long)pvVar12 + lVar60);
                *puVar68 = uVar199;
                puVar68[1] = uVar198;
                puVar68[2] = uVar201;
                puVar68[3] = uVar202;
                lVar60 = lVar60 + 0x20;
                uVar65 = uVar65 - 1;
              } while (uVar65 != 0);
            }
          }
          else if (iVar59 == 2) {
            Mat::create(this_00,uVar65,uVar5,sVar71,uVar66,opt->blob_allocator);
            pvVar12 = this_00->data;
            if (pvVar12 == (void *)0x0) {
              return -100;
            }
            if ((long)this_00->c * this_00->cstep == 0) {
              return -100;
            }
            local_100._4_4_ = *local_a0->data;
            local_100._0_4_ = local_100._4_4_;
            fStack_f8 = (float)local_100._4_4_;
            fStack_f4 = (float)local_100._4_4_;
            uStack_f0._0_4_ = (float)local_100._4_4_;
            uStack_f0._4_4_ = (float)local_100._4_4_;
            fStack_e8 = (float)local_100._4_4_;
            fStack_e4 = (float)local_100._4_4_;
            if (0 < (int)local_90) {
              pvVar56 = pMVar1->data;
              lVar60 = 0;
              iVar45 = (int)local_90;
              do {
                pafVar51 = (__m256 *)((long)pvVar56 + lVar60);
                uVar199 = *(undefined8 *)*pafVar51;
                uVar198 = *(undefined8 *)(*pafVar51 + 2);
                uVar201 = *(undefined8 *)(*pafVar51 + 4);
                uVar202 = *(undefined8 *)(*pafVar51 + 6);
                local_80 = *pafVar51;
                binary_op_pow_pack8::operator()(&local_139,(__m256 *)local_100,&local_80);
                puVar68 = (undefined8 *)((long)pvVar12 + lVar60);
                *puVar68 = uVar199;
                puVar68[1] = uVar198;
                puVar68[2] = uVar201;
                puVar68[3] = uVar202;
                lVar60 = lVar60 + 0x20;
                iVar45 = iVar45 + -1;
              } while (iVar45 != 0);
            }
          }
          else if (iVar59 == 3) {
            Mat::create(this_00,uVar65,uVar5,uVar6,sVar71,uVar66,opt->blob_allocator);
            if (local_120->data == (void *)0x0) {
              return -100;
            }
            if ((long)local_120->c * local_120->cstep == 0) {
              return -100;
            }
            fVar203 = *local_a0->data;
            local_100._4_4_ = fVar203;
            local_100._0_4_ = fVar203;
            fStack_f8 = fVar203;
            fStack_f4 = fVar203;
            uStack_f0._0_4_ = fVar203;
            uStack_f0._4_4_ = fVar203;
            fStack_e8 = fVar203;
            fStack_e4 = fVar203;
            if (0 < (int)uVar6) {
              local_150 = 0;
              do {
                if (0 < (int)local_90) {
                  sVar71 = local_120->cstep;
                  sVar11 = local_120->elemsize;
                  pvVar12 = local_120->data;
                  sVar13 = local_a0[1].cstep;
                  sVar14 = local_a0[1].elemsize;
                  pvVar56 = local_a0[1].data;
                  lVar60 = 0;
                  iVar45 = (int)local_90;
                  do {
                    local_80 = *(__m256 *)((long)pvVar56 + lVar60 + sVar13 * sVar14 * local_150);
                    binary_op_pow_pack8::operator()(&local_139,(__m256 *)local_100,&local_80);
                    *(__m256 *)((long)pvVar12 + lVar60 + sVar71 * sVar11 * local_150) = local_80;
                    lVar60 = lVar60 + 0x20;
                    iVar45 = iVar45 + -1;
                  } while (iVar45 != 0);
                }
                local_150 = local_150 + 1;
              } while (local_150 != local_128);
            }
          }
        }
        else if (iVar59 == 1) {
          Mat::create(this_00,uVar64,local_60,iVar45,opt->blob_allocator);
          pvVar12 = this_00->data;
          if (pvVar12 == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep == 0) {
            return -100;
          }
          if (uVar66 == 1 && local_a0[1].w == 1) {
            local_100._4_4_ = *pMVar1->data;
            local_100._0_4_ = local_100._4_4_;
            fStack_f8 = (float)local_100._4_4_;
            fStack_f4 = (float)local_100._4_4_;
            uStack_f0._0_4_ = (float)local_100._4_4_;
            uStack_f0._4_4_ = (float)local_100._4_4_;
            fStack_e8 = (float)local_100._4_4_;
            fStack_e4 = (float)local_100._4_4_;
            if (0 < (int)local_110) {
              pvVar56 = local_a0->data;
              lVar60 = 0;
              sVar71 = local_110;
              do {
                pafVar51 = (__m256 *)((long)pvVar56 + lVar60);
                uVar199 = *(undefined8 *)*pafVar51;
                uVar198 = *(undefined8 *)(*pafVar51 + 2);
                uVar201 = *(undefined8 *)(*pafVar51 + 4);
                uVar202 = *(undefined8 *)(*pafVar51 + 6);
                local_80 = *pafVar51;
                binary_op_pow_pack8::operator()(&local_139,&local_80,(__m256 *)local_100);
                puVar68 = (undefined8 *)((long)pvVar12 + lVar60);
                *puVar68 = uVar199;
                puVar68[1] = uVar198;
                puVar68[2] = uVar201;
                puVar68[3] = uVar202;
                lVar60 = lVar60 + 0x20;
                uVar66 = (int)sVar71 - 1;
                sVar71 = (size_t)uVar66;
              } while (uVar66 != 0);
            }
          }
          else {
            if ((int)local_110 < 1) {
              return 0;
            }
            pvVar56 = local_a0->data;
            pvVar63 = local_a0[1].data;
            lVar60 = 0;
            sVar71 = local_110;
            do {
              _local_100 = *(__m256 *)((long)pvVar56 + lVar60);
              pafVar51 = (__m256 *)((long)pvVar63 + lVar60);
              uVar199 = *(undefined8 *)*pafVar51;
              uVar198 = *(undefined8 *)(*pafVar51 + 2);
              uVar201 = *(undefined8 *)(*pafVar51 + 4);
              uVar202 = *(undefined8 *)(*pafVar51 + 6);
              local_80 = *pafVar51;
              binary_op_pow_pack8::operator()(&local_139,(__m256 *)local_100,&local_80);
              puVar68 = (undefined8 *)((long)pvVar12 + lVar60);
              *puVar68 = uVar199;
              puVar68[1] = uVar198;
              puVar68[2] = uVar201;
              puVar68[3] = uVar202;
              lVar60 = lVar60 + 0x20;
              uVar66 = (int)sVar71 - 1;
              sVar71 = (size_t)uVar66;
            } while (uVar66 != 0);
          }
        }
        else {
          if (iVar59 == 2) {
            Mat::create(this_00,uVar65,uVar5,sVar71,uVar66,opt->blob_allocator);
            puVar68 = (undefined8 *)this_00->data;
            if (puVar68 == (undefined8 *)0x0) {
              return -100;
            }
            local_130 = (void *)CONCAT44(local_130._4_4_,uVar5);
            if ((long)this_00->c * this_00->cstep != 0) {
              if (0 < (int)uVar5) {
                local_158 = (__m256 *)local_a0->data;
                pafVar51 = (__m256 *)local_a0[1].data;
                iVar45 = 0;
                do {
                  _local_100 = *local_158;
                  uVar66 = uVar65;
                  if (0 < (int)uVar65) {
                    do {
                      uVar199 = *(undefined8 *)*pafVar51;
                      uVar198 = *(undefined8 *)(*pafVar51 + 2);
                      uVar201 = *(undefined8 *)(*pafVar51 + 4);
                      uVar202 = *(undefined8 *)(*pafVar51 + 6);
                      local_80 = *pafVar51;
                      binary_op_pow_pack8::operator()(&local_139,(__m256 *)local_100,&local_80);
                      *puVar68 = uVar199;
                      puVar68[1] = uVar198;
                      puVar68[2] = uVar201;
                      puVar68[3] = uVar202;
                      pafVar51 = pafVar51 + 1;
                      puVar68 = puVar68 + 4;
                      uVar66 = uVar66 - 1;
                    } while (uVar66 != 0);
                  }
                  local_158 = local_158 + 1;
                  iVar45 = iVar45 + 1;
                } while (iVar45 != (int)local_130);
                return 0;
              }
              return 0;
            }
            return -100;
          }
          if (iVar59 == 3) {
            Mat::create(this_00,uVar65,uVar5,uVar6,sVar71,uVar66,opt->blob_allocator);
            if (local_120->data == (void *)0x0) {
              return -100;
            }
            if ((long)local_120->c * local_120->cstep != 0) {
              if (0 < (int)uVar6) {
                local_150 = 0;
                do {
                  _local_100 = *(__m256 *)((long)local_a0->data + local_150 * 0x20);
                  if (0 < (int)local_90) {
                    sVar71 = local_120->cstep;
                    sVar11 = local_120->elemsize;
                    pvVar12 = local_120->data;
                    sVar13 = local_a0[1].cstep;
                    sVar14 = local_a0[1].elemsize;
                    pvVar56 = local_a0[1].data;
                    lVar60 = 0;
                    iVar45 = (int)local_90;
                    do {
                      pafVar51 = (__m256 *)((long)pvVar56 + lVar60 + sVar13 * sVar14 * local_150);
                      uVar199 = *(undefined8 *)*pafVar51;
                      uVar198 = *(undefined8 *)(*pafVar51 + 2);
                      uVar201 = *(undefined8 *)(*pafVar51 + 4);
                      uVar202 = *(undefined8 *)(*pafVar51 + 6);
                      local_80 = *pafVar51;
                      binary_op_pow_pack8::operator()(&local_139,(__m256 *)local_100,&local_80);
                      puVar68 = (undefined8 *)((long)pvVar12 + lVar60 + sVar71 * sVar11 * local_150)
                      ;
                      *puVar68 = uVar199;
                      puVar68[1] = uVar198;
                      puVar68[2] = uVar201;
                      puVar68[3] = uVar202;
                      lVar60 = lVar60 + 0x20;
                      iVar45 = iVar45 + -1;
                    } while (iVar45 != 0);
                  }
                  local_150 = local_150 + 1;
                } while (local_150 != local_128);
                return 0;
              }
              return 0;
            }
            return -100;
          }
        }
      }
      else {
        uVar7 = pMVar9->h;
        local_138 = (ulong)uVar7;
        local_104 = uVar7 * uVar64;
        if (iVar59 == 2) {
          local_130 = (void *)CONCAT44(local_130._4_4_,uVar5);
          if (pMVar9[1].dims == 3) {
            Mat::create(this_00,uVar65,uVar5,uVar6,sVar71,uVar66,opt->blob_allocator);
            if (local_120->data == (void *)0x0) {
              return -100;
            }
            if ((long)local_120->c * local_120->cstep != 0) {
              if (0 < (int)uVar6) {
                local_138 = 0;
                do {
                  if (0 < (int)local_130) {
                    pafVar69 = (__m256 *)
                               (local_120->cstep * local_138 * local_120->elemsize +
                               (long)local_120->data);
                    pafVar70 = (__m256 *)
                               (local_a0[1].cstep * local_138 * local_a0[1].elemsize +
                               (long)local_a0[1].data);
                    pafVar51 = (__m256 *)
                               ((long)local_a0->w * local_138 * local_a0->elemsize +
                               (long)local_a0->data);
                    iVar45 = 0;
                    do {
                      _local_100 = *pafVar51;
                      uVar66 = uVar65;
                      if (0 < (int)uVar65) {
                        do {
                          local_80 = *pafVar70;
                          binary_op_pow_pack8::operator()(&local_139,(__m256 *)local_100,&local_80);
                          *pafVar69 = local_80;
                          pafVar70 = pafVar70 + 1;
                          pafVar69 = pafVar69 + 1;
                          uVar66 = uVar66 - 1;
                        } while (uVar66 != 0);
                      }
                      pafVar51 = pafVar51 + 1;
                      iVar45 = iVar45 + 1;
                    } while (iVar45 != (int)local_130);
                  }
                  local_138 = local_138 + 1;
                } while (local_138 != local_128);
                return 0;
              }
              return 0;
            }
            return -100;
          }
          local_128 = CONCAT44(uVar4,uVar66);
          Mat::create(this_00,uVar64,uVar7,local_60,iVar45,opt->blob_allocator);
          pMVar9 = local_a0;
          pvVar12 = this_00->data;
          if (pvVar12 == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep == 0) {
            return -100;
          }
          if (local_a0[1].dims == 1) {
            Mat::create(this_00,(int)local_110,(int)local_138,local_60,iVar45,opt->blob_allocator);
            puVar68 = (undefined8 *)this_00->data;
            if (puVar68 == (undefined8 *)0x0) {
              return -100;
            }
            if ((long)this_00->c * this_00->cstep == 0) {
              return -100;
            }
            if ((int)local_128 != 1 || pMVar9[1].w != 1) {
              if (0 < (int)local_138) {
                pafVar51 = (__m256 *)pMVar9->data;
                local_158 = (__m256 *)pMVar9[1].data;
                iVar45 = 0;
                do {
                  _local_100 = *local_158;
                  uVar47 = local_110 & 0xffffffff;
                  if (0 < (int)local_110) {
                    do {
                      uVar199 = *(undefined8 *)*pafVar51;
                      uVar198 = *(undefined8 *)(*pafVar51 + 2);
                      uVar201 = *(undefined8 *)(*pafVar51 + 4);
                      uVar202 = *(undefined8 *)(*pafVar51 + 6);
                      local_80 = *pafVar51;
                      binary_op_pow_pack8::operator()(&local_139,&local_80,(__m256 *)local_100);
                      *puVar68 = uVar199;
                      puVar68[1] = uVar198;
                      puVar68[2] = uVar201;
                      puVar68[3] = uVar202;
                      pafVar51 = pafVar51 + 1;
                      puVar68 = puVar68 + 4;
                      uVar66 = (int)uVar47 - 1;
                      uVar47 = (ulong)uVar66;
                    } while (uVar66 != 0);
                  }
                  local_158 = local_158 + 1;
                  iVar45 = iVar45 + 1;
                } while (iVar45 != (int)local_138);
                return 0;
              }
              return 0;
            }
            local_100._4_4_ = *pMVar1->data;
            local_100._0_4_ = local_100._4_4_;
            fStack_f8 = (float)local_100._4_4_;
            fStack_f4 = (float)local_100._4_4_;
            uStack_f0._0_4_ = (float)local_100._4_4_;
            uStack_f0._4_4_ = (float)local_100._4_4_;
            fStack_e8 = (float)local_100._4_4_;
            fStack_e4 = (float)local_100._4_4_;
            if (0 < local_104) {
              pvVar12 = pMVar9->data;
              lVar60 = 0;
              iVar45 = local_104;
              do {
                pafVar51 = (__m256 *)((long)pvVar12 + lVar60);
                uVar199 = *(undefined8 *)*pafVar51;
                uVar198 = *(undefined8 *)(*pafVar51 + 2);
                uVar201 = *(undefined8 *)(*pafVar51 + 4);
                uVar202 = *(undefined8 *)(*pafVar51 + 6);
                local_80 = *pafVar51;
                binary_op_pow_pack8::operator()(&local_139,&local_80,(__m256 *)local_100);
                puVar3 = (undefined8 *)((long)puVar68 + lVar60);
                *puVar3 = uVar199;
                puVar3[1] = uVar198;
                puVar3[2] = uVar201;
                puVar3[3] = uVar202;
                lVar60 = lVar60 + 0x20;
                iVar45 = iVar45 + -1;
              } while (iVar45 != 0);
            }
          }
          else if (local_a0[1].dims == 2) {
            if (local_104 < 1) {
              return 0;
            }
            pvVar56 = local_a0->data;
            pvVar63 = local_a0[1].data;
            lVar60 = 0;
            iVar45 = local_104;
            do {
              _local_100 = *(__m256 *)((long)pvVar56 + lVar60);
              pafVar51 = (__m256 *)((long)pvVar63 + lVar60);
              uVar199 = *(undefined8 *)*pafVar51;
              uVar198 = *(undefined8 *)(*pafVar51 + 2);
              uVar201 = *(undefined8 *)(*pafVar51 + 4);
              uVar202 = *(undefined8 *)(*pafVar51 + 6);
              local_80 = *pafVar51;
              binary_op_pow_pack8::operator()(&local_139,(__m256 *)local_100,&local_80);
              puVar68 = (undefined8 *)((long)pvVar12 + lVar60);
              *puVar68 = uVar199;
              puVar68[1] = uVar198;
              puVar68[2] = uVar201;
              puVar68[3] = uVar202;
              lVar60 = lVar60 + 0x20;
              iVar45 = iVar45 + -1;
            } while (iVar45 != 0);
          }
        }
        else if (iVar59 == 3) {
          uVar8 = pMVar9->c;
          local_98 = (ulong)uVar8;
          if (pMVar9[1].dims == 3) {
            local_90 = CONCAT44(local_90._4_4_,uVar5 * uVar65);
            if (uVar8 == uVar6 && ((uVar65 ^ 1) == 0 && (uVar5 ^ 1) == 0)) {
              Mat::create(this_00,uVar64,uVar7,uVar8,local_60,iVar45,opt->blob_allocator);
              if (local_120->data == (void *)0x0) {
                return -100;
              }
              if ((long)local_120->c * local_120->cstep != 0) {
                if (0 < (int)uVar8) {
                  local_150 = 0;
                  do {
                    pvVar12 = local_a0->data;
                    sVar71 = local_a0->elemsize;
                    sVar11 = local_a0->cstep;
                    pvVar56 = local_120->data;
                    sVar13 = local_120->elemsize;
                    sVar14 = local_120->cstep;
                    _local_100 = *(__m256 *)
                                  ((long)local_a0[1].data +
                                  local_a0[1].cstep * local_150 * local_a0[1].elemsize);
                    if (0 < local_104) {
                      lVar60 = 0;
                      iVar45 = local_104;
                      do {
                        pafVar51 = (__m256 *)((long)pvVar12 + lVar60 + sVar11 * sVar71 * local_150);
                        uVar199 = *(undefined8 *)*pafVar51;
                        uVar198 = *(undefined8 *)(*pafVar51 + 2);
                        uVar201 = *(undefined8 *)(*pafVar51 + 4);
                        uVar202 = *(undefined8 *)(*pafVar51 + 6);
                        local_80 = *pafVar51;
                        binary_op_pow_pack8::operator()(&local_139,&local_80,(__m256 *)local_100);
                        puVar68 = (undefined8 *)
                                  ((long)pvVar56 + lVar60 + sVar14 * sVar13 * local_150);
                        *puVar68 = uVar199;
                        puVar68[1] = uVar198;
                        puVar68[2] = uVar201;
                        puVar68[3] = uVar202;
                        lVar60 = lVar60 + 0x20;
                        iVar45 = iVar45 + -1;
                      } while (iVar45 != 0);
                    }
                    local_150 = local_150 + 1;
                  } while (local_150 != local_98);
                  return 0;
                }
                return 0;
              }
              return -100;
            }
            local_130 = (void *)CONCAT44(local_130._4_4_,uVar5);
            if (uVar65 == uVar64) {
              if (uVar66 == 1 && (uVar6 == 1 && uVar5 == uVar7)) {
                Mat::create(this_00,uVar64,uVar7,uVar8,local_60,iVar45,opt->blob_allocator);
                if (local_120->data == (void *)0x0) {
                  return -100;
                }
                if ((long)local_120->c * local_120->cstep != 0) {
                  if (0 < (int)uVar8) {
                    local_130 = (void *)0x0;
                    do {
                      if (0 < local_104) {
                        lVar60 = local_a0->cstep * local_a0->elemsize * (long)local_130;
                        pvVar12 = local_a0->data;
                        pvVar56 = local_a0[1].data;
                        lVar61 = local_120->cstep * local_120->elemsize * (long)local_130;
                        pvVar63 = local_120->data;
                        lVar73 = 0;
                        iVar45 = local_104;
                        do {
                          _local_100 = *(__m256 *)((long)pvVar12 + lVar73 * 8 + lVar60);
                          fVar203 = *(float *)((long)pvVar56 + lVar73);
                          local_80[1] = fVar203;
                          local_80[0] = fVar203;
                          local_80[2] = fVar203;
                          local_80[3] = fVar203;
                          local_80[4] = fVar203;
                          local_80[5] = fVar203;
                          local_80[6] = fVar203;
                          local_80[7] = fVar203;
                          binary_op_pow_pack8::operator()(&local_139,(__m256 *)local_100,&local_80);
                          *(__m256 *)((long)pvVar63 + lVar73 * 8 + lVar61) = local_80;
                          lVar73 = lVar73 + 4;
                          iVar45 = iVar45 + -1;
                        } while (iVar45 != 0);
                      }
                      local_130 = (void *)((long)local_130 + 1);
                    } while (local_130 != (void *)local_98);
                    return 0;
                  }
                  return 0;
                }
                return -100;
              }
              local_81 = uVar7 == 1;
              if ((uVar64 == 1 && local_81) && uVar6 == uVar8) {
LAB_0024aa0a:
                local_81 = uVar7 == 1;
                Mat::create(this_00,uVar65,uVar5,uVar6,sVar71,uVar66,opt->blob_allocator);
                if (local_120->data == (void *)0x0) {
                  return -100;
                }
                if ((long)local_120->c * local_120->cstep != 0) {
                  if (0 < (int)local_128) {
                    local_150 = 0;
                    do {
                      pvVar12 = local_a0[1].data;
                      sVar71 = local_a0[1].cstep;
                      sVar11 = local_a0[1].elemsize;
                      pvVar56 = local_120->data;
                      sVar13 = local_120->elemsize;
                      sVar14 = local_120->cstep;
                      _local_100 = *(__m256 *)
                                    ((long)local_a0->data +
                                    local_a0->cstep * local_150 * local_a0->elemsize);
                      if (0 < (int)local_90) {
                        lVar60 = 0;
                        iVar45 = (int)local_90;
                        do {
                          pafVar51 = (__m256 *)
                                     ((long)pvVar12 + lVar60 + sVar71 * sVar11 * local_150);
                          uVar199 = *(undefined8 *)*pafVar51;
                          uVar198 = *(undefined8 *)(*pafVar51 + 2);
                          uVar201 = *(undefined8 *)(*pafVar51 + 4);
                          uVar202 = *(undefined8 *)(*pafVar51 + 6);
                          local_80 = *pafVar51;
                          binary_op_pow_pack8::operator()(&local_139,(__m256 *)local_100,&local_80);
                          puVar68 = (undefined8 *)
                                    ((long)pvVar56 + lVar60 + sVar14 * sVar13 * local_150);
                          *puVar68 = uVar199;
                          puVar68[1] = uVar198;
                          puVar68[2] = uVar201;
                          puVar68[3] = uVar202;
                          lVar60 = lVar60 + 0x20;
                          iVar45 = iVar45 + -1;
                        } while (iVar45 != 0);
                      }
                      local_150 = local_150 + 1;
                    } while (local_150 != local_128);
                    return 0;
                  }
                  return 0;
                }
                return -100;
              }
              if (((iVar45 == 1) && (uVar5 == uVar7)) && (uVar8 == 1)) {
                Mat::create(this_00,uVar64,uVar7,uVar6,sVar71,uVar66,opt->blob_allocator);
                if (local_120->data == (void *)0x0) {
                  return -100;
                }
                if ((long)local_120->c * local_120->cstep != 0) {
                  if (0 < (int)local_128) {
                    local_130 = (void *)0x0;
                    do {
                      if (0 < (int)local_90) {
                        lVar60 = local_a0[1].cstep * local_a0[1].elemsize * (long)local_130;
                        pvVar12 = local_a0[1].data;
                        pvVar56 = local_a0->data;
                        lVar61 = local_120->cstep * local_120->elemsize * (long)local_130;
                        pvVar63 = local_120->data;
                        lVar73 = 0;
                        iVar45 = (int)local_90;
                        do {
                          local_100._4_4_ = *(float *)((long)pvVar56 + lVar73);
                          local_100._0_4_ = local_100._4_4_;
                          fStack_f8 = (float)local_100._4_4_;
                          fStack_f4 = (float)local_100._4_4_;
                          uStack_f0._0_4_ = (float)local_100._4_4_;
                          uStack_f0._4_4_ = (float)local_100._4_4_;
                          fStack_e8 = (float)local_100._4_4_;
                          fStack_e4 = (float)local_100._4_4_;
                          local_80 = *(__m256 *)((long)pvVar12 + lVar73 * 8 + lVar60);
                          binary_op_pow_pack8::operator()(&local_139,(__m256 *)local_100,&local_80);
                          *(__m256 *)((long)pvVar63 + lVar73 * 8 + lVar61) = local_80;
                          lVar73 = lVar73 + 4;
                          iVar45 = iVar45 + -1;
                        } while (iVar45 != 0);
                      }
                      local_130 = (void *)((long)local_130 + 1);
                    } while (local_130 != (void *)local_128);
                    return 0;
                  }
                  return 0;
                }
                return -100;
              }
            }
            else if ((uVar64 == 1 && uVar7 == 1) && uVar6 == uVar8) goto LAB_0024aa0a;
            local_81 = uVar7 == 1;
            local_128 = (ulong)uVar66;
            if ((((uVar65 ^ 1) == 0 && uVar5 == uVar7) && uVar8 == uVar6) && uVar64 != 1) {
              Mat::create(this_00,uVar64,uVar7,uVar8,local_60,iVar45,opt->blob_allocator);
              if (local_120->data == (void *)0x0) {
                return -100;
              }
              if ((long)local_120->c * local_120->cstep != 0) {
                if (0 < (int)uVar8) {
                  local_150 = 0;
                  do {
                    if (0 < (int)local_138) {
                      sVar71 = local_a0[1].cstep;
                      sVar11 = local_a0[1].elemsize;
                      pvVar12 = local_a0[1].data;
                      pafVar51 = (__m256 *)
                                 (local_120->cstep * local_150 * local_120->elemsize +
                                 (long)local_120->data);
                      pafVar70 = (__m256 *)
                                 (local_a0->cstep * local_150 * local_a0->elemsize +
                                 (long)local_a0->data);
                      uVar47 = 0;
                      do {
                        _local_100 = *(__m256 *)
                                      ((long)pvVar12 + uVar47 * 0x20 + sVar71 * local_150 * sVar11);
                        uVar46 = local_110 & 0xffffffff;
                        if (0 < (int)local_110) {
                          do {
                            local_80 = *pafVar70;
                            binary_op_pow_pack8::operator()
                                      (&local_139,&local_80,(__m256 *)local_100);
                            *pafVar51 = local_80;
                            pafVar70 = pafVar70 + 1;
                            pafVar51 = pafVar51 + 1;
                            uVar66 = (int)uVar46 - 1;
                            uVar46 = (ulong)uVar66;
                          } while (uVar66 != 0);
                        }
                        uVar47 = uVar47 + 1;
                      } while (uVar47 != local_138);
                    }
                    local_150 = local_150 + 1;
                  } while (local_150 != local_98);
                  return 0;
                }
                return 0;
              }
              return -100;
            }
            if (((uVar65 != uVar64 || (uVar5 ^ 1) != 0) || uVar8 != uVar6) || uVar7 == 1) {
              if ((uVar6 == uVar8 && uVar5 == uVar7) && (uVar65 != 1 && uVar64 == 1)) {
                Mat::create(this_00,uVar65,uVar7,uVar8,sVar71,uVar66,opt->blob_allocator);
                if (local_120->data == (void *)0x0) {
                  return -100;
                }
                if ((long)local_120->c * local_120->cstep != 0) {
                  if (0 < (int)local_98) {
                    local_130 = (void *)0x0;
                    do {
                      if (0 < (int)local_138) {
                        lVar60 = local_a0->cstep * (long)local_130;
                        sVar71 = local_a0->elemsize;
                        pvVar12 = local_a0->data;
                        pafVar51 = (__m256 *)
                                   (local_120->cstep * (long)local_130 * local_120->elemsize +
                                   (long)local_120->data);
                        pafVar70 = (__m256 *)
                                   (local_a0[1].cstep * (long)local_130 * local_a0[1].elemsize +
                                   (long)local_a0[1].data);
                        uVar47 = 0;
                        do {
                          _local_100 = *(__m256 *)((long)pvVar12 + uVar47 * 0x20 + lVar60 * sVar71);
                          uVar66 = uVar65;
                          if (0 < (int)uVar65) {
                            do {
                              local_80 = *pafVar70;
                              binary_op_pow_pack8::operator()
                                        (&local_139,(__m256 *)local_100,&local_80);
                              *pafVar51 = local_80;
                              pafVar70 = pafVar70 + 1;
                              pafVar51 = pafVar51 + 1;
                              uVar66 = uVar66 - 1;
                            } while (uVar66 != 0);
                          }
                          uVar47 = uVar47 + 1;
                        } while (uVar47 != local_138);
                      }
                      local_130 = (void *)((long)local_130 + 1);
                    } while (local_130 != (void *)local_98);
                    return 0;
                  }
                  return 0;
                }
                return -100;
              }
              if ((local_81 && uVar6 == uVar8) && (uVar5 != 1 && uVar65 == uVar64)) {
                Mat::create(this_00,uVar64,uVar5,uVar8,sVar71,uVar66,opt->blob_allocator);
                if (this_00->data != (void *)0x0) {
                  if ((long)local_120->c * local_120->cstep == 0) {
                    return -100;
                  }
                  if (0 < (int)local_98) {
                    lVar60 = local_110 << 5;
                    local_138 = 0;
                    do {
                      pMVar1 = local_a0;
                      afVar185 = _local_100;
                      bVar74 = local_a0->dims == 3;
                      local_c8 = 1;
                      if (!bVar74) {
                        local_c8 = local_a0->d;
                      }
                      local_d4 = local_a0->w;
                      local_d0 = local_a0->h;
                      sVar71 = local_a0->cstep;
                      pvVar12 = local_a0->data;
                      sVar11 = local_a0->elemsize;
                      local_e0 = local_a0->allocator;
                      _fStack_f8 = 0;
                      local_100 = (undefined1  [8])(sVar71 * local_138 * sVar11 + (long)pvVar12);
                      uStack_f0 = sVar11;
                      fStack_e4 = afVar185[7];
                      fStack_e8 = (float)local_a0->elempack;
                      local_d8 = bVar74 ^ 3;
                      local_c0 = (long)local_d0 * (long)local_d4;
                      local_cc = 1;
                      Mat::~Mat((Mat *)local_100);
                      bVar74 = pMVar1[1].dims == 3;
                      local_c8 = 1;
                      if (!bVar74) {
                        local_c8 = pMVar1[1].d;
                      }
                      local_d4 = pMVar1[1].w;
                      local_d0 = pMVar1[1].h;
                      pvVar56 = (void *)(pMVar1[1].cstep * local_138 * pMVar1[1].elemsize +
                                        (long)pMVar1[1].data);
                      local_d8 = bVar74 ^ 3;
                      local_e0 = pMVar1[1].allocator;
                      _fStack_f8 = 0;
                      local_100 = (undefined1  [8])pvVar56;
                      uStack_f0 = pMVar1[1].elemsize;
                      fStack_e8 = (float)pMVar1[1].elempack;
                      local_c0 = (long)local_d0 * (long)local_d4;
                      local_cc = 1;
                      Mat::~Mat((Mat *)local_100);
                      bVar74 = local_120->dims == 3;
                      local_d4 = local_120->w;
                      local_d0 = local_120->h;
                      local_c8 = 1;
                      if (!bVar74) {
                        local_c8 = local_120->d;
                      }
                      sVar13 = local_120->elemsize;
                      pvVar63 = (void *)(local_120->cstep * local_138 * sVar13 +
                                        (long)local_120->data);
                      local_d8 = bVar74 ^ 3;
                      local_e0 = local_120->allocator;
                      fStack_f8 = 0.0;
                      fStack_f4 = 0.0;
                      local_100 = (undefined1  [8])pvVar63;
                      uStack_f0._0_4_ = (float)(int)sVar13;
                      uStack_f0._4_4_ = (float)(int)(sVar13 >> 0x20);
                      fStack_e8 = (float)local_120->elempack;
                      local_c0 = (long)local_d0 * (long)local_d4;
                      local_cc = 1;
                      Mat::~Mat((Mat *)local_100);
                      if (0 < (int)local_130) {
                        lVar61 = sVar71 * sVar11 * local_138;
                        iVar59 = 0;
                        uVar47 = local_110;
                        iVar45 = (int)local_130;
                        do {
                          if (0 < (int)uVar47) {
                            lVar73 = 0;
                            do {
                              _local_100 = *(__m256 *)((long)pvVar12 + lVar73 + lVar61);
                              local_80 = *(__m256 *)((long)pvVar56 + lVar73);
                              afVar185 = local_80;
                              binary_op_pow_pack8::operator()
                                        (&local_139,(__m256 *)local_100,&local_80);
                              *(__m256 *)((long)pvVar63 + lVar73) = afVar185;
                              lVar73 = lVar73 + 0x20;
                            } while (lVar60 != lVar73);
                            pvVar63 = (void *)((long)pvVar63 + lVar73);
                            pvVar56 = (void *)((long)pvVar56 + lVar73);
                            uVar47 = local_110;
                            iVar45 = (int)local_130;
                          }
                          iVar59 = iVar59 + 1;
                        } while (iVar59 != iVar45);
                      }
                      local_138 = local_138 + 1;
                    } while (local_138 != local_98);
                    return 0;
                  }
                  return 0;
                }
              }
              else {
                Mat::create(this_00,uVar64,uVar7,uVar8,local_60,iVar45,opt->blob_allocator);
                if (this_00->data != (void *)0x0) {
                  if ((long)local_120->c * local_120->cstep == 0) {
                    return -100;
                  }
                  if (0 < (int)local_98) {
                    local_150 = 0;
                    do {
                      pMVar1 = local_a0;
                      afVar185 = _local_100;
                      bVar74 = local_a0->dims == 3;
                      local_c8 = 1;
                      if (!bVar74) {
                        local_c8 = local_a0->d;
                      }
                      local_d4 = local_a0->w;
                      local_d0 = local_a0->h;
                      local_138 = local_a0->cstep;
                      pvVar12 = local_a0->data;
                      local_110 = local_a0->elemsize;
                      local_e0 = local_a0->allocator;
                      _fStack_f8 = 0;
                      local_100 = (undefined1  [8])
                                  (local_138 * local_150 * local_110 + (long)pvVar12);
                      uStack_f0 = local_110;
                      fStack_e4 = afVar185[7];
                      fStack_e8 = (float)local_a0->elempack;
                      local_d8 = bVar74 ^ 3;
                      local_c0 = (long)local_d0 * (long)local_d4;
                      local_cc = 1;
                      Mat::~Mat((Mat *)local_100);
                      bVar74 = pMVar1[1].dims == 3;
                      local_c8 = 1;
                      if (!bVar74) {
                        local_c8 = pMVar1[1].d;
                      }
                      local_d4 = pMVar1[1].w;
                      local_d0 = pMVar1[1].h;
                      local_128 = pMVar1[1].cstep;
                      local_130 = pMVar1[1].data;
                      local_90 = pMVar1[1].elemsize;
                      local_e0 = pMVar1[1].allocator;
                      _fStack_f8 = 0;
                      local_100 = (undefined1  [8])
                                  (local_128 * local_150 * local_90 + (long)local_130);
                      uStack_f0 = local_90;
                      fStack_e8 = (float)pMVar1[1].elempack;
                      local_d8 = bVar74 ^ 3;
                      local_c0 = (long)local_d0 * (long)local_d4;
                      local_cc = 1;
                      Mat::~Mat((Mat *)local_100);
                      bVar74 = local_120->dims == 3;
                      local_d4 = local_120->w;
                      local_d0 = local_120->h;
                      local_c8 = 1;
                      if (!bVar74) {
                        local_c8 = local_120->d;
                      }
                      sVar71 = local_120->cstep;
                      pvVar56 = local_120->data;
                      sVar11 = local_120->elemsize;
                      local_e0 = local_120->allocator;
                      fStack_f8 = 0.0;
                      fStack_f4 = 0.0;
                      local_100 = (undefined1  [8])(sVar71 * local_150 * sVar11 + (long)pvVar56);
                      uStack_f0._0_4_ = (float)(int)sVar11;
                      uStack_f0._4_4_ = (float)(int)(sVar11 >> 0x20);
                      fStack_e8 = (float)local_120->elempack;
                      local_d8 = bVar74 ^ 3;
                      local_c0 = (long)local_d0 * (long)local_d4;
                      local_cc = 1;
                      Mat::~Mat((Mat *)local_100);
                      pvVar63 = local_130;
                      if (0 < local_104) {
                        lVar60 = local_128 * local_90;
                        lVar61 = local_138 * local_110;
                        lVar73 = 0;
                        iVar45 = local_104;
                        do {
                          _local_100 = *(__m256 *)((long)pvVar12 + lVar73 + lVar61 * local_150);
                          local_80 = *(__m256 *)((long)pvVar63 + lVar73 + lVar60 * local_150);
                          afVar185 = local_80;
                          binary_op_pow_pack8::operator()(&local_139,(__m256 *)local_100,&local_80);
                          *(__m256 *)((long)pvVar56 + lVar73 + sVar71 * sVar11 * local_150) =
                               afVar185;
                          lVar73 = lVar73 + 0x20;
                          iVar45 = iVar45 + -1;
                        } while (iVar45 != 0);
                      }
                      local_150 = local_150 + 1;
                    } while (local_150 != local_98);
                    return 0;
                  }
                  return 0;
                }
              }
              return -100;
            }
            Mat::create(this_00,uVar64,uVar7,uVar8,local_60,iVar45,opt->blob_allocator);
            if (local_120->data == (void *)0x0) {
              return -100;
            }
            if ((long)local_120->c * local_120->cstep != 0) {
              if (0 < (int)local_98) {
                lVar60 = local_110 << 5;
                local_150 = 0;
                do {
                  if (0 < (int)local_138) {
                    sVar71 = local_a0[1].elemsize;
                    pvVar63 = (void *)(local_120->cstep * local_150 * local_120->elemsize +
                                      (long)local_120->data);
                    pvVar56 = (void *)(local_a0->cstep * local_150 * local_a0->elemsize +
                                      (long)local_a0->data);
                    sVar11 = local_a0[1].cstep;
                    pvVar12 = local_a0[1].data;
                    iVar45 = 0;
                    uVar47 = local_110;
                    do {
                      if (0 < (int)uVar47) {
                        lVar61 = 0;
                        do {
                          _local_100 = *(__m256 *)((long)pvVar56 + lVar61);
                          local_80 = *(__m256 *)
                                      ((long)pvVar12 + lVar61 + sVar71 * sVar11 * local_150);
                          binary_op_pow_pack8::operator()(&local_139,(__m256 *)local_100,&local_80);
                          *(__m256 *)((long)pvVar63 + lVar61) = local_80;
                          lVar61 = lVar61 + 0x20;
                        } while (lVar60 != lVar61);
                        pvVar63 = (void *)((long)pvVar63 + lVar61);
                        pvVar56 = (void *)((long)pvVar56 + lVar61);
                        uVar47 = local_110;
                      }
                      iVar45 = iVar45 + 1;
                    } while (iVar45 != (int)local_138);
                  }
                  local_150 = local_150 + 1;
                } while (local_150 != local_98);
                return 0;
              }
              return 0;
            }
            return -100;
          }
          Mat::create(this_00,uVar64,uVar7,uVar8,local_60,iVar45,opt->blob_allocator);
          if (local_120->data == (void *)0x0) {
            return -100;
          }
          if ((long)local_120->c * local_120->cstep == 0) {
            return -100;
          }
          if (local_a0[1].dims == 1) {
            if (uVar66 != 1 || local_a0[1].w != 1) {
              if (0 < (int)uVar8) {
                local_150 = 0;
                do {
                  pvVar12 = local_a0->data;
                  sVar71 = local_a0->elemsize;
                  sVar11 = local_a0->cstep;
                  _local_100 = *(__m256 *)((long)local_a0[1].data + local_150 * 0x20);
                  if (0 < local_104) {
                    sVar13 = local_120->cstep;
                    sVar14 = local_120->elemsize;
                    pvVar56 = local_120->data;
                    lVar60 = 0;
                    iVar45 = local_104;
                    do {
                      pafVar51 = (__m256 *)((long)pvVar12 + lVar60 + sVar11 * sVar71 * local_150);
                      uVar199 = *(undefined8 *)*pafVar51;
                      uVar198 = *(undefined8 *)(*pafVar51 + 2);
                      uVar201 = *(undefined8 *)(*pafVar51 + 4);
                      uVar202 = *(undefined8 *)(*pafVar51 + 6);
                      local_80 = *pafVar51;
                      binary_op_pow_pack8::operator()(&local_139,&local_80,(__m256 *)local_100);
                      puVar68 = (undefined8 *)((long)pvVar56 + lVar60 + sVar13 * sVar14 * local_150)
                      ;
                      *puVar68 = uVar199;
                      puVar68[1] = uVar198;
                      puVar68[2] = uVar201;
                      puVar68[3] = uVar202;
                      lVar60 = lVar60 + 0x20;
                      iVar45 = iVar45 + -1;
                    } while (iVar45 != 0);
                  }
                  local_150 = local_150 + 1;
                } while (local_150 != local_98);
                return 0;
              }
              return 0;
            }
            fVar203 = *pMVar1->data;
            local_100._4_4_ = fVar203;
            local_100._0_4_ = fVar203;
            fStack_f8 = fVar203;
            fStack_f4 = fVar203;
            uStack_f0._0_4_ = fVar203;
            uStack_f0._4_4_ = fVar203;
            fStack_e8 = fVar203;
            fStack_e4 = fVar203;
            if (0 < (int)uVar8) {
              local_150 = 0;
              do {
                if (0 < local_104) {
                  sVar71 = local_120->cstep;
                  sVar11 = local_120->elemsize;
                  pvVar12 = local_120->data;
                  sVar13 = local_a0->cstep;
                  sVar14 = local_a0->elemsize;
                  pvVar56 = local_a0->data;
                  lVar60 = 0;
                  iVar45 = local_104;
                  do {
                    local_80 = *(__m256 *)((long)pvVar56 + lVar60 + sVar13 * sVar14 * local_150);
                    binary_op_pow_pack8::operator()(&local_139,&local_80,(__m256 *)local_100);
                    *(__m256 *)((long)pvVar12 + lVar60 + sVar71 * sVar11 * local_150) = local_80;
                    lVar60 = lVar60 + 0x20;
                    iVar45 = iVar45 + -1;
                  } while (iVar45 != 0);
                }
                local_150 = local_150 + 1;
              } while (local_150 != local_98);
            }
          }
          else if (local_a0[1].dims == 2) {
            if (0 < (int)uVar8) {
              local_150 = 0;
              do {
                if (0 < (int)local_138) {
                  pafVar69 = (__m256 *)
                             (local_120->cstep * local_150 * local_120->elemsize +
                             (long)local_120->data);
                  pafVar51 = (__m256 *)
                             ((long)local_a0[1].w * local_150 * local_a0[1].elemsize +
                             (long)local_a0[1].data);
                  pafVar70 = (__m256 *)
                             (local_a0->cstep * local_150 * local_a0->elemsize +
                             (long)local_a0->data);
                  iVar45 = 0;
                  do {
                    _local_100 = *pafVar51;
                    uVar47 = local_110 & 0xffffffff;
                    if (0 < (int)local_110) {
                      do {
                        local_80 = *pafVar70;
                        binary_op_pow_pack8::operator()(&local_139,&local_80,(__m256 *)local_100);
                        *pafVar69 = local_80;
                        pafVar70 = pafVar70 + 1;
                        pafVar69 = pafVar69 + 1;
                        uVar66 = (int)uVar47 - 1;
                        uVar47 = (ulong)uVar66;
                      } while (uVar66 != 0);
                    }
                    pafVar51 = pafVar51 + 1;
                    iVar45 = iVar45 + 1;
                  } while (iVar45 != (int)local_138);
                }
                local_150 = local_150 + 1;
              } while (local_150 != local_98);
              return 0;
            }
            return 0;
          }
        }
      }
      return 0;
    case 7:
      uVar64 = pMVar9->w;
      uVar47 = (ulong)uVar64;
      sVar71 = pMVar9->elemsize;
      uVar65 = pMVar9[1].w;
      uVar5 = pMVar9[1].h;
      uVar6 = pMVar9[1].c;
      local_130 = (void *)(ulong)uVar6;
      iVar72 = uVar5 * uVar65;
      sVar11 = pMVar9[1].elemsize;
      iVar59 = pMVar9->dims;
      if (iVar59 == 1) {
        iVar59 = pMVar9[1].dims;
        if (iVar45 != 1 || uVar64 != 1) {
          if (iVar59 == 1) {
            Mat::create(this_00,uVar64,sVar71,iVar45,opt->blob_allocator);
            pvVar12 = this_00->data;
            if (pvVar12 == (void *)0x0) {
              return -100;
            }
            if ((long)this_00->c * this_00->cstep == 0) {
              return -100;
            }
            if (uVar66 != 1 || pMVar9[1].w != 1) {
              if (0 < (int)uVar64) {
                pvVar56 = pMVar9->data;
                pvVar63 = pMVar9[1].data;
                lVar60 = 0;
                do {
                  auVar163 = vsubps_avx(*(undefined1 (*) [32])((long)pvVar63 + lVar60),
                                        *(undefined1 (*) [32])((long)pvVar56 + lVar60));
                  *(undefined1 (*) [32])((long)pvVar12 + lVar60) = auVar163;
                  lVar60 = lVar60 + 0x20;
                  uVar66 = (int)uVar47 - 1;
                  uVar47 = (ulong)uVar66;
                } while (uVar66 != 0);
                return 0;
              }
              return 0;
            }
            if (0 < (int)uVar64) {
              uVar4 = *pMVar1->data;
              auVar155._4_4_ = uVar4;
              auVar155._0_4_ = uVar4;
              auVar155._8_4_ = uVar4;
              auVar155._12_4_ = uVar4;
              auVar155._16_4_ = uVar4;
              auVar155._20_4_ = uVar4;
              auVar155._24_4_ = uVar4;
              auVar155._28_4_ = uVar4;
              pvVar56 = pMVar9->data;
              lVar60 = 0;
              do {
                auVar163 = vsubps_avx(auVar155,*(undefined1 (*) [32])((long)pvVar56 + lVar60));
                *(undefined1 (*) [32])((long)pvVar12 + lVar60) = auVar163;
                lVar60 = lVar60 + 0x20;
                uVar66 = (int)uVar47 - 1;
                uVar47 = (ulong)uVar66;
              } while (uVar66 != 0);
              return 0;
            }
            return 0;
          }
          if (iVar59 == 2) {
            Mat::create(this_00,uVar65,uVar5,sVar11,uVar66,opt->blob_allocator);
            pauVar49 = (undefined1 (*) [32])this_00->data;
            if (pauVar49 == (undefined1 (*) [32])0x0) {
              return -100;
            }
            if ((long)this_00->c * this_00->cstep != 0) {
              if (0 < (int)uVar5) {
                pauVar54 = (undefined1 (*) [32])pMVar9->data;
                pauVar52 = (undefined1 (*) [32])pMVar9[1].data;
                uVar66 = 0;
                do {
                  if (0 < (int)uVar65) {
                    auVar163 = *pauVar54;
                    uVar64 = uVar65;
                    do {
                      auVar160 = vsubps_avx(*pauVar52,auVar163);
                      *pauVar49 = auVar160;
                      pauVar52 = pauVar52 + 1;
                      pauVar49 = pauVar49 + 1;
                      uVar64 = uVar64 - 1;
                    } while (uVar64 != 0);
                  }
                  pauVar54 = pauVar54 + 1;
                  uVar66 = uVar66 + 1;
                } while (uVar66 != uVar5);
                return 0;
              }
              return 0;
            }
            return -100;
          }
          if (iVar59 != 3) {
            return 0;
          }
          Mat::create(this_00,uVar65,uVar5,uVar6,sVar11,uVar66,opt->blob_allocator);
          if (this_00->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep == 0) {
            return -100;
          }
          if (0 < (int)local_130) {
            uVar47 = 0;
            do {
              if (0 < iVar72) {
                sVar71 = this_00->cstep;
                sVar11 = this_00->elemsize;
                auVar163 = *(undefined1 (*) [32])((long)pMVar9->data + uVar47 * 0x20);
                pvVar12 = this_00->data;
                sVar13 = pMVar9[1].cstep;
                sVar14 = pMVar9[1].elemsize;
                pvVar56 = pMVar9[1].data;
                lVar60 = 0;
                iVar45 = iVar72;
                do {
                  auVar160 = vsubps_avx(*(undefined1 (*) [32])
                                         ((long)pvVar56 + lVar60 + sVar13 * sVar14 * uVar47),
                                        auVar163);
                  *(undefined1 (*) [32])((long)pvVar12 + lVar60 + sVar71 * sVar11 * uVar47) =
                       auVar160;
                  lVar60 = lVar60 + 0x20;
                  iVar45 = iVar45 + -1;
                } while (iVar45 != 0);
              }
              uVar47 = uVar47 + 1;
            } while ((void *)uVar47 != local_130);
            return 0;
          }
          return 0;
        }
        if (iVar59 == 1) {
          Mat::create(this_00,uVar65,sVar11,uVar66,opt->blob_allocator);
          pvVar12 = this_00->data;
          if (pvVar12 == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep != 0) {
            if (0 < (int)uVar65) {
              uVar4 = *pMVar9->data;
              auVar154._4_4_ = uVar4;
              auVar154._0_4_ = uVar4;
              auVar154._8_4_ = uVar4;
              auVar154._12_4_ = uVar4;
              auVar154._16_4_ = uVar4;
              auVar154._20_4_ = uVar4;
              auVar154._24_4_ = uVar4;
              auVar154._28_4_ = uVar4;
              pvVar56 = pMVar1->data;
              lVar60 = 0;
              do {
                auVar163 = vsubps_avx(*(undefined1 (*) [32])((long)pvVar56 + lVar60),auVar154);
                *(undefined1 (*) [32])((long)pvVar12 + lVar60) = auVar163;
                lVar60 = lVar60 + 0x20;
                uVar65 = uVar65 - 1;
              } while (uVar65 != 0);
              return 0;
            }
            return 0;
          }
          return -100;
        }
        if (iVar59 == 2) {
          Mat::create(this_00,uVar65,uVar5,sVar11,uVar66,opt->blob_allocator);
          pvVar12 = this_00->data;
          if (pvVar12 == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep != 0) {
            if (0 < iVar72) {
              uVar4 = *pMVar9->data;
              auVar151._4_4_ = uVar4;
              auVar151._0_4_ = uVar4;
              auVar151._8_4_ = uVar4;
              auVar151._12_4_ = uVar4;
              auVar151._16_4_ = uVar4;
              auVar151._20_4_ = uVar4;
              auVar151._24_4_ = uVar4;
              auVar151._28_4_ = uVar4;
              pvVar56 = pMVar1->data;
              lVar60 = 0;
              do {
                auVar163 = vsubps_avx(*(undefined1 (*) [32])((long)pvVar56 + lVar60),auVar151);
                *(undefined1 (*) [32])((long)pvVar12 + lVar60) = auVar163;
                lVar60 = lVar60 + 0x20;
                iVar72 = iVar72 + -1;
              } while (iVar72 != 0);
              return 0;
            }
            return 0;
          }
          return -100;
        }
        if (iVar59 != 3) {
          return 0;
        }
        Mat::create(this_00,uVar65,uVar5,uVar6,sVar11,uVar66,opt->blob_allocator);
        if (this_00->data == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep == 0) {
          return -100;
        }
        if (0 < (int)local_130) {
          uVar4 = *pMVar9->data;
          auVar137._4_4_ = uVar4;
          auVar137._0_4_ = uVar4;
          auVar137._8_4_ = uVar4;
          auVar137._12_4_ = uVar4;
          auVar137._16_4_ = uVar4;
          auVar137._20_4_ = uVar4;
          auVar137._24_4_ = uVar4;
          auVar137._28_4_ = uVar4;
          uVar47 = 0;
          do {
            if (0 < iVar72) {
              sVar71 = this_00->cstep;
              sVar11 = this_00->elemsize;
              pvVar12 = this_00->data;
              sVar13 = pMVar9[1].cstep;
              sVar14 = pMVar9[1].elemsize;
              pvVar56 = pMVar9[1].data;
              lVar60 = 0;
              iVar45 = iVar72;
              do {
                auVar163 = vsubps_avx(*(undefined1 (*) [32])
                                       ((long)pvVar56 + lVar60 + sVar13 * sVar14 * uVar47),auVar137)
                ;
                *(undefined1 (*) [32])((long)pvVar12 + lVar60 + sVar71 * sVar11 * uVar47) = auVar163
                ;
                lVar60 = lVar60 + 0x20;
                iVar45 = iVar45 + -1;
              } while (iVar45 != 0);
            }
            uVar47 = uVar47 + 1;
          } while ((void *)uVar47 != local_130);
          return 0;
        }
        return 0;
      }
      uVar7 = pMVar9->h;
      local_138 = CONCAT44(local_138._4_4_,uVar7 * uVar64);
      if (iVar59 == 2) {
        if (pMVar9[1].dims == 3) {
          Mat::create(this_00,uVar65,uVar5,uVar6,sVar11,uVar66,opt->blob_allocator);
          if (this_00->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep != 0) {
            if (0 < (int)local_130) {
              uVar47 = 0;
              do {
                if (0 < (int)uVar5) {
                  pauVar49 = (undefined1 (*) [32])
                             (this_00->cstep * uVar47 * this_00->elemsize + (long)this_00->data);
                  pauVar54 = (undefined1 (*) [32])
                             (pMVar9[1].cstep * uVar47 * pMVar9[1].elemsize + (long)pMVar9[1].data);
                  pauVar52 = (undefined1 (*) [32])
                             ((long)pMVar9->w * uVar47 * pMVar9->elemsize + (long)pMVar9->data);
                  uVar66 = 0;
                  do {
                    if (0 < (int)uVar65) {
                      auVar163 = *pauVar52;
                      uVar64 = uVar65;
                      do {
                        auVar160 = vsubps_avx(*pauVar54,auVar163);
                        *pauVar49 = auVar160;
                        pauVar54 = pauVar54 + 1;
                        pauVar49 = pauVar49 + 1;
                        uVar64 = uVar64 - 1;
                      } while (uVar64 != 0);
                    }
                    pauVar52 = pauVar52 + 1;
                    uVar66 = uVar66 + 1;
                  } while (uVar66 != uVar5);
                }
                uVar47 = uVar47 + 1;
              } while ((void *)uVar47 != local_130);
              return 0;
            }
            return 0;
          }
          return -100;
        }
        local_128 = CONCAT44(uVar4,uVar66);
        Mat::create(this_00,uVar64,uVar7,sVar71,iVar45,opt->blob_allocator);
        pvVar12 = this_00->data;
        if (pvVar12 == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep == 0) {
          return -100;
        }
        if (pMVar9[1].dims != 1) {
          if (pMVar9[1].dims != 2) {
            return 0;
          }
          if (0 < (int)local_138) {
            pvVar56 = pMVar9->data;
            pvVar63 = pMVar9[1].data;
            lVar60 = 0;
            do {
              auVar163 = vsubps_avx(*(undefined1 (*) [32])((long)pvVar63 + lVar60),
                                    *(undefined1 (*) [32])((long)pvVar56 + lVar60));
              *(undefined1 (*) [32])((long)pvVar12 + lVar60) = auVar163;
              lVar60 = lVar60 + 0x20;
              local_138._0_4_ = (int)local_138 + -1;
            } while ((int)local_138 != 0);
            return 0;
          }
          return 0;
        }
        Mat::create(this_00,uVar64,uVar7,sVar71,iVar45,opt->blob_allocator);
        pauVar49 = (undefined1 (*) [32])this_00->data;
        if (pauVar49 == (undefined1 (*) [32])0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep != 0) {
          if ((int)local_128 != 1 || pMVar9[1].w != 1) {
            if (0 < (int)uVar7) {
              pauVar54 = (undefined1 (*) [32])pMVar9->data;
              pauVar52 = (undefined1 (*) [32])pMVar9[1].data;
              uVar66 = 0;
              do {
                if (0 < (int)uVar64) {
                  auVar163 = *pauVar52;
                  uVar46 = uVar47;
                  do {
                    auVar160 = vsubps_avx(auVar163,*pauVar54);
                    *pauVar49 = auVar160;
                    pauVar54 = pauVar54 + 1;
                    pauVar49 = pauVar49 + 1;
                    uVar65 = (int)uVar46 - 1;
                    uVar46 = (ulong)uVar65;
                  } while (uVar65 != 0);
                }
                pauVar52 = pauVar52 + 1;
                uVar66 = uVar66 + 1;
              } while (uVar66 != uVar7);
              return 0;
            }
            return 0;
          }
          if (0 < (int)local_138) {
            uVar4 = *pMVar1->data;
            auVar166._4_4_ = uVar4;
            auVar166._0_4_ = uVar4;
            auVar166._8_4_ = uVar4;
            auVar166._12_4_ = uVar4;
            auVar166._16_4_ = uVar4;
            auVar166._20_4_ = uVar4;
            auVar166._24_4_ = uVar4;
            auVar166._28_4_ = uVar4;
            pvVar12 = pMVar9->data;
            lVar60 = 0;
            do {
              auVar163 = vsubps_avx(auVar166,*(undefined1 (*) [32])((long)pvVar12 + lVar60));
              *(undefined1 (*) [32])((long)*pauVar49 + lVar60) = auVar163;
              lVar60 = lVar60 + 0x20;
              local_138._0_4_ = (int)local_138 + -1;
            } while ((int)local_138 != 0);
            return 0;
          }
          return 0;
        }
        return -100;
      }
      if (iVar59 != 3) {
        return 0;
      }
      uVar8 = pMVar9->c;
      uVar46 = (ulong)uVar8;
      if (pMVar9[1].dims != 3) {
        Mat::create(this_00,uVar64,uVar7,uVar8,sVar71,iVar45,opt->blob_allocator);
        if (this_00->data == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep == 0) {
          return -100;
        }
        if (pMVar9[1].dims == 1) {
          if (uVar66 != 1 || pMVar9[1].w != 1) {
            if (0 < (int)uVar8) {
              uVar47 = 0;
              do {
                if (0 < (int)local_138) {
                  sVar71 = this_00->cstep;
                  sVar11 = this_00->elemsize;
                  auVar163 = *(undefined1 (*) [32])((long)pMVar1->data + uVar47 * 0x20);
                  pvVar12 = this_00->data;
                  sVar13 = pMVar9->cstep;
                  sVar14 = pMVar9->elemsize;
                  pvVar56 = pMVar9->data;
                  lVar60 = 0;
                  iVar45 = (int)local_138;
                  do {
                    auVar160 = vsubps_avx(auVar163,*(undefined1 (*) [32])
                                                    ((long)pvVar56 +
                                                    lVar60 + sVar13 * sVar14 * uVar47));
                    *(undefined1 (*) [32])((long)pvVar12 + lVar60 + sVar71 * sVar11 * uVar47) =
                         auVar160;
                    lVar60 = lVar60 + 0x20;
                    iVar45 = iVar45 + -1;
                  } while (iVar45 != 0);
                }
                uVar47 = uVar47 + 1;
              } while (uVar47 != uVar46);
              return 0;
            }
            return 0;
          }
          if (0 < (int)uVar8) {
            uVar4 = *pMVar1->data;
            auVar168._4_4_ = uVar4;
            auVar168._0_4_ = uVar4;
            auVar168._8_4_ = uVar4;
            auVar168._12_4_ = uVar4;
            auVar168._16_4_ = uVar4;
            auVar168._20_4_ = uVar4;
            auVar168._24_4_ = uVar4;
            auVar168._28_4_ = uVar4;
            uVar47 = 0;
            do {
              if (0 < (int)local_138) {
                sVar71 = this_00->cstep;
                sVar11 = this_00->elemsize;
                pvVar12 = this_00->data;
                sVar13 = pMVar9->cstep;
                sVar14 = pMVar9->elemsize;
                pvVar56 = pMVar9->data;
                lVar60 = 0;
                iVar45 = (int)local_138;
                do {
                  auVar163 = vsubps_avx(auVar168,*(undefined1 (*) [32])
                                                  ((long)pvVar56 + lVar60 + sVar13 * sVar14 * uVar47
                                                  ));
                  *(undefined1 (*) [32])((long)pvVar12 + lVar60 + sVar71 * sVar11 * uVar47) =
                       auVar163;
                  lVar60 = lVar60 + 0x20;
                  iVar45 = iVar45 + -1;
                } while (iVar45 != 0);
              }
              uVar47 = uVar47 + 1;
            } while (uVar47 != uVar46);
            return 0;
          }
          return 0;
        }
        if (pMVar9[1].dims != 2) {
          return 0;
        }
        if (0 < (int)uVar8) {
          uVar48 = 0;
          do {
            if (0 < (int)uVar7) {
              pauVar49 = (undefined1 (*) [32])
                         (this_00->cstep * uVar48 * this_00->elemsize + (long)this_00->data);
              pauVar54 = (undefined1 (*) [32])
                         ((long)pMVar9[1].w * uVar48 * pMVar9[1].elemsize + (long)pMVar9[1].data);
              pauVar52 = (undefined1 (*) [32])
                         (pMVar9->cstep * uVar48 * pMVar9->elemsize + (long)pMVar9->data);
              uVar66 = 0;
              do {
                if (0 < (int)uVar64) {
                  auVar163 = *pauVar54;
                  uVar62 = uVar47;
                  do {
                    auVar160 = vsubps_avx(auVar163,*pauVar52);
                    *pauVar49 = auVar160;
                    pauVar52 = pauVar52 + 1;
                    pauVar49 = pauVar49 + 1;
                    uVar65 = (int)uVar62 - 1;
                    uVar62 = (ulong)uVar65;
                  } while (uVar65 != 0);
                }
                pauVar54 = pauVar54 + 1;
                uVar66 = uVar66 + 1;
              } while (uVar66 != uVar7);
            }
            uVar48 = uVar48 + 1;
          } while (uVar48 != uVar46);
          return 0;
        }
        return 0;
      }
      if (uVar8 == uVar6 && ((uVar65 ^ 1) == 0 && (uVar5 ^ 1) == 0)) {
        Mat::create(this_00,uVar64,uVar7,uVar8,sVar71,iVar45,opt->blob_allocator);
        if (this_00->data == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep != 0) {
          if (0 < (int)uVar8) {
            uVar47 = 0;
            do {
              if (0 < (int)local_138) {
                sVar71 = pMVar9->cstep;
                sVar11 = pMVar9->elemsize;
                auVar163 = *(undefined1 (*) [32])
                            ((long)pMVar9[1].data + pMVar9[1].cstep * uVar47 * pMVar9[1].elemsize);
                pvVar12 = pMVar9->data;
                sVar13 = this_00->cstep;
                sVar14 = this_00->elemsize;
                pvVar56 = this_00->data;
                lVar60 = 0;
                iVar45 = (int)local_138;
                do {
                  auVar160 = vsubps_avx(auVar163,*(undefined1 (*) [32])
                                                  ((long)pvVar12 + lVar60 + sVar71 * sVar11 * uVar47
                                                  ));
                  *(undefined1 (*) [32])((long)pvVar56 + lVar60 + sVar13 * sVar14 * uVar47) =
                       auVar160;
                  lVar60 = lVar60 + 0x20;
                  iVar45 = iVar45 + -1;
                } while (iVar45 != 0);
              }
              uVar47 = uVar47 + 1;
            } while (uVar47 != uVar46);
            return 0;
          }
          return 0;
        }
        return -100;
      }
      local_110 = sVar71;
      if (uVar65 == uVar64) {
        if (uVar66 == 1 && (uVar6 == 1 && uVar5 == uVar7)) {
          Mat::create(this_00,uVar64,uVar7,uVar8,sVar71,iVar45,opt->blob_allocator);
          if (this_00->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep != 0) {
            if (0 < (int)uVar8) {
              uVar47 = 0;
              do {
                if (0 < (int)local_138) {
                  sVar71 = pMVar9->cstep;
                  sVar11 = pMVar9->elemsize;
                  sVar13 = this_00->cstep;
                  pvVar12 = pMVar9->data;
                  pvVar56 = pMVar9[1].data;
                  sVar14 = this_00->elemsize;
                  pvVar63 = this_00->data;
                  lVar60 = 0;
                  iVar45 = (int)local_138;
                  do {
                    uVar4 = *(undefined4 *)((long)pvVar56 + lVar60);
                    auVar144._4_4_ = uVar4;
                    auVar144._0_4_ = uVar4;
                    auVar144._8_4_ = uVar4;
                    auVar144._12_4_ = uVar4;
                    auVar144._16_4_ = uVar4;
                    auVar144._20_4_ = uVar4;
                    auVar144._24_4_ = uVar4;
                    auVar144._28_4_ = uVar4;
                    auVar163 = vsubps_avx(auVar144,*(undefined1 (*) [32])
                                                    ((long)pvVar12 +
                                                    lVar60 * 8 + sVar71 * sVar11 * uVar47));
                    *(undefined1 (*) [32])((long)pvVar63 + lVar60 * 8 + sVar13 * sVar14 * uVar47) =
                         auVar163;
                    lVar60 = lVar60 + 4;
                    iVar45 = iVar45 + -1;
                  } while (iVar45 != 0);
                }
                uVar47 = uVar47 + 1;
              } while (uVar47 != uVar46);
              return 0;
            }
            return 0;
          }
          return -100;
        }
        local_128 = CONCAT71(local_128._1_7_,uVar64 == 1);
        local_104 = CONCAT31(local_104._1_3_,uVar7 == 1);
        if ((uVar64 != 1 || uVar7 != 1) || uVar6 != uVar8) {
          if (((iVar45 == 1) && (uVar5 == uVar7)) && (uVar8 == 1)) {
            Mat::create(this_00,uVar64,uVar7,uVar6,sVar11,uVar66,opt->blob_allocator);
            if (this_00->data == (void *)0x0) {
              return -100;
            }
            if ((long)this_00->c * this_00->cstep != 0) {
              if (0 < (int)local_130) {
                uVar47 = 0;
                do {
                  if (0 < iVar72) {
                    sVar71 = pMVar9[1].cstep;
                    sVar11 = pMVar9[1].elemsize;
                    sVar13 = this_00->cstep;
                    pvVar12 = pMVar9[1].data;
                    pvVar56 = pMVar9->data;
                    sVar14 = this_00->elemsize;
                    pvVar63 = this_00->data;
                    lVar60 = 0;
                    iVar45 = iVar72;
                    do {
                      uVar4 = *(undefined4 *)((long)pvVar56 + lVar60);
                      auVar178._4_4_ = uVar4;
                      auVar178._0_4_ = uVar4;
                      auVar178._8_4_ = uVar4;
                      auVar178._12_4_ = uVar4;
                      auVar178._16_4_ = uVar4;
                      auVar178._20_4_ = uVar4;
                      auVar178._24_4_ = uVar4;
                      auVar178._28_4_ = uVar4;
                      auVar163 = vsubps_avx(*(undefined1 (*) [32])
                                             ((long)pvVar12 + lVar60 * 8 + sVar71 * sVar11 * uVar47)
                                            ,auVar178);
                      *(undefined1 (*) [32])((long)pvVar63 + lVar60 * 8 + sVar13 * sVar14 * uVar47)
                           = auVar163;
                      lVar60 = lVar60 + 4;
                      iVar45 = iVar45 + -1;
                    } while (iVar45 != 0);
                  }
                  uVar47 = uVar47 + 1;
                } while ((void *)uVar47 != local_130);
                return 0;
              }
              return 0;
            }
            return -100;
          }
LAB_0024651a:
          if ((((uVar65 ^ 1) == 0 && uVar5 == uVar7) && uVar8 == uVar6) && uVar64 != 1) {
            Mat::create(this_00,uVar64,uVar7,uVar8,sVar71,iVar45,opt->blob_allocator);
            if (this_00->data == (void *)0x0) {
              return -100;
            }
            if ((long)this_00->c * this_00->cstep != 0) {
              if (0 < (int)uVar8) {
                uVar48 = 0;
                do {
                  if (0 < (int)uVar7) {
                    sVar71 = pMVar9[1].cstep;
                    sVar11 = pMVar9[1].elemsize;
                    pvVar12 = pMVar9[1].data;
                    pauVar49 = (undefined1 (*) [32])
                               (this_00->cstep * uVar48 * this_00->elemsize + (long)this_00->data);
                    pauVar54 = (undefined1 (*) [32])
                               (pMVar9->cstep * uVar48 * pMVar9->elemsize + (long)pMVar9->data);
                    uVar62 = 0;
                    do {
                      if (0 < (int)uVar64) {
                        auVar163 = *(undefined1 (*) [32])
                                    ((long)pvVar12 + uVar62 * 0x20 + sVar71 * uVar48 * sVar11);
                        uVar67 = uVar47;
                        do {
                          auVar160 = vsubps_avx(auVar163,*pauVar54);
                          *pauVar49 = auVar160;
                          pauVar54 = pauVar54 + 1;
                          pauVar49 = pauVar49 + 1;
                          uVar66 = (int)uVar67 - 1;
                          uVar67 = (ulong)uVar66;
                        } while (uVar66 != 0);
                      }
                      uVar62 = uVar62 + 1;
                    } while (uVar62 != uVar7);
                  }
                  uVar48 = uVar48 + 1;
                } while (uVar48 != uVar46);
                return 0;
              }
              return 0;
            }
            return -100;
          }
          if (((uVar65 == uVar64 && (uVar5 ^ 1) == 0) && uVar8 == uVar6) && uVar7 != 1) {
            Mat::create(this_00,uVar64,uVar7,uVar8,sVar71,iVar45,opt->blob_allocator);
            if (this_00->data == (void *)0x0) {
              return -100;
            }
            if ((long)this_00->c * this_00->cstep != 0) {
              if (0 < (int)uVar8) {
                uVar48 = 0;
                do {
                  if (0 < (int)uVar7) {
                    sVar71 = pMVar9[1].elemsize;
                    pvVar56 = (void *)(this_00->cstep * uVar48 * this_00->elemsize +
                                      (long)this_00->data);
                    pvVar63 = (void *)(pMVar9->cstep * uVar48 * pMVar9->elemsize +
                                      (long)pMVar9->data);
                    sVar11 = pMVar9[1].cstep;
                    pvVar12 = pMVar9[1].data;
                    uVar66 = 0;
                    do {
                      if (0 < (int)uVar64) {
                        lVar60 = 0;
                        do {
                          auVar163 = vsubps_avx(*(undefined1 (*) [32])
                                                 ((long)pvVar12 + lVar60 + sVar71 * sVar11 * uVar48)
                                                ,*(undefined1 (*) [32])((long)pvVar63 + lVar60));
                          *(undefined1 (*) [32])((long)pvVar56 + lVar60) = auVar163;
                          lVar60 = lVar60 + 0x20;
                        } while (uVar47 << 5 != lVar60);
                        pvVar56 = (void *)((long)pvVar56 + lVar60);
                        pvVar63 = (void *)((long)pvVar63 + lVar60);
                      }
                      uVar66 = uVar66 + 1;
                    } while (uVar66 != uVar7);
                  }
                  uVar48 = uVar48 + 1;
                } while (uVar48 != uVar46);
                return 0;
              }
              return 0;
            }
            return -100;
          }
          if (((uVar6 == uVar8 && uVar5 == uVar7) & uVar65 != 1 & (byte)local_128) == 1) {
            Mat::create(this_00,uVar65,uVar7,uVar8,sVar11,uVar66,opt->blob_allocator);
            if (this_00->data == (void *)0x0) {
              return -100;
            }
            if ((long)this_00->c * this_00->cstep != 0) {
              if (0 < (int)uVar8) {
                uVar47 = 0;
                do {
                  if (0 < (int)uVar7) {
                    sVar71 = pMVar9->cstep;
                    sVar11 = pMVar9->elemsize;
                    pvVar12 = pMVar9->data;
                    pauVar49 = (undefined1 (*) [32])
                               (this_00->cstep * uVar47 * this_00->elemsize + (long)this_00->data);
                    pauVar54 = (undefined1 (*) [32])
                               (pMVar9[1].cstep * uVar47 * pMVar9[1].elemsize + (long)pMVar9[1].data
                               );
                    uVar48 = 0;
                    do {
                      if (0 < (int)uVar65) {
                        auVar163 = *(undefined1 (*) [32])
                                    ((long)pvVar12 + uVar48 * 0x20 + sVar71 * uVar47 * sVar11);
                        uVar66 = uVar65;
                        do {
                          auVar160 = vsubps_avx(*pauVar54,auVar163);
                          *pauVar49 = auVar160;
                          pauVar54 = pauVar54 + 1;
                          pauVar49 = pauVar49 + 1;
                          uVar66 = uVar66 - 1;
                        } while (uVar66 != 0);
                      }
                      uVar48 = uVar48 + 1;
                    } while (uVar48 != uVar7);
                  }
                  uVar47 = uVar47 + 1;
                } while (uVar47 != uVar46);
                return 0;
              }
              return 0;
            }
            return -100;
          }
          if (((byte)local_104 & uVar6 == uVar8 & (uVar5 != 1 && uVar65 == uVar64)) == 1) {
            Mat::create(this_00,uVar64,uVar5,uVar8,sVar11,uVar66,opt->blob_allocator);
            if (this_00->data == (void *)0x0) {
              return -100;
            }
            if ((long)local_120->c * local_120->cstep != 0) {
              if (0 < (int)uVar8) {
                local_158 = (__m256 *)0x0;
                do {
                  pMVar1 = local_a0;
                  afVar185 = _local_100;
                  bVar74 = local_a0->dims == 3;
                  local_c8 = 1;
                  if (!bVar74) {
                    local_c8 = local_a0->d;
                  }
                  local_d4 = local_a0->w;
                  local_d0 = local_a0->h;
                  local_130 = (void *)local_a0->cstep;
                  pvVar12 = local_a0->data;
                  local_138 = local_a0->elemsize;
                  local_e0 = local_a0->allocator;
                  _fStack_f8 = 0;
                  local_100 = (undefined1  [8])
                              ((long)local_130 * (long)local_158 * local_138 + (long)pvVar12);
                  uStack_f0 = local_138;
                  fStack_e4 = afVar185[7];
                  fStack_e8 = (float)local_a0->elempack;
                  local_d8 = bVar74 ^ 3;
                  local_c0 = (long)local_d0 * (long)local_d4;
                  local_cc = 1;
                  Mat::~Mat((Mat *)local_100);
                  bVar74 = pMVar1[1].dims == 3;
                  local_c8 = 1;
                  if (!bVar74) {
                    local_c8 = pMVar1[1].d;
                  }
                  local_d4 = pMVar1[1].w;
                  local_d0 = pMVar1[1].h;
                  pvVar56 = (void *)(pMVar1[1].cstep * (long)local_158 * pMVar1[1].elemsize +
                                    (long)pMVar1[1].data);
                  local_d8 = bVar74 ^ 3;
                  local_e0 = pMVar1[1].allocator;
                  _fStack_f8 = 0;
                  local_100 = (undefined1  [8])pvVar56;
                  uStack_f0 = pMVar1[1].elemsize;
                  fStack_e8 = (float)pMVar1[1].elempack;
                  local_c0 = (long)local_d0 * (long)local_d4;
                  local_cc = 1;
                  Mat::~Mat((Mat *)local_100);
                  bVar74 = local_120->dims == 3;
                  local_d4 = local_120->w;
                  local_d0 = local_120->h;
                  local_c8 = 1;
                  if (!bVar74) {
                    local_c8 = local_120->d;
                  }
                  sVar71 = local_120->elemsize;
                  pvVar63 = (void *)(local_120->cstep * (long)local_158 * sVar71 +
                                    (long)local_120->data);
                  local_d8 = bVar74 ^ 3;
                  local_e0 = local_120->allocator;
                  fStack_f8 = 0.0;
                  fStack_f4 = 0.0;
                  local_100 = (undefined1  [8])pvVar63;
                  uStack_f0._0_4_ = (float)(int)sVar71;
                  uStack_f0._4_4_ = (float)(int)(sVar71 >> 0x20);
                  fStack_e8 = (float)local_120->elempack;
                  local_c0 = (long)local_d0 * (long)local_d4;
                  local_cc = 1;
                  Mat::~Mat((Mat *)local_100);
                  if (0 < (int)uVar5) {
                    uVar66 = 0;
                    do {
                      if (0 < (int)uVar64) {
                        lVar60 = 0;
                        do {
                          auVar163 = vsubps_avx(*(undefined1 (*) [32])((long)pvVar56 + lVar60),
                                                *(undefined1 (*) [32])
                                                 ((long)pvVar12 +
                                                 lVar60 + (long)local_130 * local_138 *
                                                          (long)local_158));
                          *(undefined1 (*) [32])((long)pvVar63 + lVar60) = auVar163;
                          lVar60 = lVar60 + 0x20;
                        } while (uVar47 << 5 != lVar60);
                        pvVar63 = (void *)((long)pvVar63 + lVar60);
                        pvVar56 = (void *)((long)pvVar56 + lVar60);
                      }
                      uVar66 = uVar66 + 1;
                    } while (uVar66 != uVar5);
                  }
                  local_158 = (__m256 *)((long)local_158 + 1);
                } while (local_158 != (__m256 *)uVar46);
                return 0;
              }
              return 0;
            }
            return -100;
          }
          Mat::create(this_00,uVar64,uVar7,uVar8,sVar71,iVar45,opt->blob_allocator);
          if (this_00->data == (void *)0x0) {
            return -100;
          }
          if ((long)local_120->c * local_120->cstep != 0) {
            if (0 < (int)uVar8) {
              local_158 = (__m256 *)0x0;
              do {
                pMVar1 = local_a0;
                afVar185 = _local_100;
                bVar74 = local_a0->dims == 3;
                local_c8 = 1;
                if (!bVar74) {
                  local_c8 = local_a0->d;
                }
                local_d4 = local_a0->w;
                local_d0 = local_a0->h;
                sVar71 = local_a0->cstep;
                pvVar12 = local_a0->data;
                local_130 = (void *)local_a0->elemsize;
                local_e0 = local_a0->allocator;
                _fStack_f8 = 0;
                local_100 = (undefined1  [8])
                            (sVar71 * (long)local_158 * (long)local_130 + (long)pvVar12);
                uStack_f0 = local_130;
                fStack_e4 = afVar185[7];
                fStack_e8 = (float)local_a0->elempack;
                local_d8 = bVar74 ^ 3;
                local_c0 = (long)local_d0 * (long)local_d4;
                local_cc = 1;
                Mat::~Mat((Mat *)local_100);
                bVar74 = pMVar1[1].dims == 3;
                local_c8 = 1;
                if (!bVar74) {
                  local_c8 = pMVar1[1].d;
                }
                local_d4 = pMVar1[1].w;
                local_d0 = pMVar1[1].h;
                local_110 = pMVar1[1].cstep;
                pvVar56 = pMVar1[1].data;
                local_128 = pMVar1[1].elemsize;
                local_e0 = pMVar1[1].allocator;
                _fStack_f8 = 0;
                local_100 = (undefined1  [8])
                            (local_110 * (long)local_158 * local_128 + (long)pvVar56);
                uStack_f0 = local_128;
                fStack_e8 = (float)pMVar1[1].elempack;
                local_d8 = bVar74 ^ 3;
                local_c0 = (long)local_d0 * (long)local_d4;
                local_cc = 1;
                Mat::~Mat((Mat *)local_100);
                bVar74 = local_120->dims == 3;
                local_d4 = local_120->w;
                local_d0 = local_120->h;
                local_c8 = 1;
                if (!bVar74) {
                  local_c8 = local_120->d;
                }
                sVar11 = local_120->cstep;
                pvVar63 = local_120->data;
                sVar13 = local_120->elemsize;
                local_e0 = local_120->allocator;
                fStack_f8 = 0.0;
                fStack_f4 = 0.0;
                local_100 = (undefined1  [8])(sVar11 * (long)local_158 * sVar13 + (long)pvVar63);
                uStack_f0._0_4_ = (float)(int)sVar13;
                uStack_f0._4_4_ = (float)(int)(sVar13 >> 0x20);
                fStack_e8 = (float)local_120->elempack;
                local_d8 = bVar74 ^ 3;
                local_c0 = (long)local_d0 * (long)local_d4;
                local_cc = 1;
                Mat::~Mat((Mat *)local_100);
                if (0 < (int)local_138) {
                  lVar60 = 0;
                  iVar45 = (int)local_138;
                  do {
                    auVar163 = vsubps_avx(*(undefined1 (*) [32])
                                           ((long)pvVar56 +
                                           lVar60 + local_110 * local_128 * (long)local_158),
                                          *(undefined1 (*) [32])
                                           ((long)pvVar12 +
                                           lVar60 + sVar71 * (long)local_130 * (long)local_158));
                    *(undefined1 (*) [32])
                     ((long)pvVar63 + lVar60 + sVar11 * sVar13 * (long)local_158) = auVar163;
                    lVar60 = lVar60 + 0x20;
                    iVar45 = iVar45 + -1;
                  } while (iVar45 != 0);
                }
                local_158 = (__m256 *)((long)local_158 + 1);
              } while (local_158 != (__m256 *)uVar46);
              return 0;
            }
            return 0;
          }
          return -100;
        }
      }
      else {
        local_128 = CONCAT71(local_128._1_7_,uVar64 == 1);
        local_104 = CONCAT31(local_104._1_3_,uVar7 == 1);
        if ((uVar64 != 1 || uVar7 != 1) || uVar6 != uVar8) goto LAB_0024651a;
      }
      Mat::create(this_00,uVar65,uVar5,uVar6,sVar11,uVar66,opt->blob_allocator);
      if (this_00->data == (void *)0x0) {
        return -100;
      }
      if ((long)this_00->c * this_00->cstep != 0) {
        if (0 < (int)local_130) {
          uVar47 = 0;
          do {
            if (0 < iVar72) {
              sVar71 = pMVar9[1].cstep;
              sVar11 = pMVar9[1].elemsize;
              auVar163 = *(undefined1 (*) [32])
                          ((long)pMVar9->data + pMVar9->cstep * uVar47 * pMVar9->elemsize);
              pvVar12 = pMVar9[1].data;
              sVar13 = this_00->cstep;
              sVar14 = this_00->elemsize;
              pvVar56 = this_00->data;
              lVar60 = 0;
              iVar45 = iVar72;
              do {
                auVar160 = vsubps_avx(*(undefined1 (*) [32])
                                       ((long)pvVar12 + lVar60 + sVar71 * sVar11 * uVar47),auVar163)
                ;
                *(undefined1 (*) [32])((long)pvVar56 + lVar60 + sVar13 * sVar14 * uVar47) = auVar160
                ;
                lVar60 = lVar60 + 0x20;
                iVar45 = iVar45 + -1;
              } while (iVar45 != 0);
            }
            uVar47 = uVar47 + 1;
          } while ((void *)uVar47 != local_130);
          return 0;
        }
        return 0;
      }
      return -100;
    case 8:
      uVar64 = pMVar9->w;
      uVar47 = (ulong)uVar64;
      sVar71 = pMVar9->elemsize;
      uVar65 = pMVar9[1].w;
      uVar5 = pMVar9[1].h;
      uVar6 = pMVar9[1].c;
      local_130 = (void *)(ulong)uVar6;
      iVar72 = uVar5 * uVar65;
      sVar11 = pMVar9[1].elemsize;
      iVar59 = pMVar9->dims;
      if (iVar59 == 1) {
        iVar59 = pMVar9[1].dims;
        if (iVar45 != 1 || uVar64 != 1) {
          if (iVar59 == 1) {
            Mat::create(this_00,uVar64,sVar71,iVar45,opt->blob_allocator);
            pvVar12 = this_00->data;
            if (pvVar12 == (void *)0x0) {
              return -100;
            }
            if ((long)this_00->c * this_00->cstep == 0) {
              return -100;
            }
            if (uVar66 != 1 || pMVar9[1].w != 1) {
              if (0 < (int)uVar64) {
                pvVar56 = pMVar9->data;
                pvVar63 = pMVar9[1].data;
                lVar60 = 0;
                do {
                  auVar163 = *(undefined1 (*) [32])((long)pvVar56 + lVar60);
                  auVar299 = vrcpps_avx(auVar163);
                  auVar160 = *(undefined1 (*) [32])((long)pvVar63 + lVar60);
                  auVar321._0_4_ = auVar160._0_4_ * auVar299._0_4_;
                  auVar321._4_4_ = auVar160._4_4_ * auVar299._4_4_;
                  auVar321._8_4_ = auVar160._8_4_ * auVar299._8_4_;
                  auVar321._12_4_ = auVar160._12_4_ * auVar299._12_4_;
                  auVar321._16_4_ = auVar160._16_4_ * auVar299._16_4_;
                  auVar321._20_4_ = auVar160._20_4_ * auVar299._20_4_;
                  auVar321._28_36_ = in_ZMM3._28_36_;
                  auVar321._24_4_ = auVar160._24_4_ * auVar299._24_4_;
                  auVar142 = auVar321._0_32_;
                  in_ZMM3 = ZEXT3264(auVar142);
                  auVar106 = vfmsub213ps_fma(auVar163,auVar142,auVar160);
                  auVar106 = vfnmadd213ps_fma(ZEXT1632(auVar106),auVar299,auVar142);
                  *(undefined1 (*) [32])((long)pvVar12 + lVar60) = ZEXT1632(auVar106);
                  lVar60 = lVar60 + 0x20;
                  uVar66 = (int)uVar47 - 1;
                  uVar47 = (ulong)uVar66;
                } while (uVar66 != 0);
                return 0;
              }
              return 0;
            }
            if (0 < (int)uVar64) {
              fVar203 = *pMVar1->data;
              auVar163._4_4_ = fVar203;
              auVar163._0_4_ = fVar203;
              auVar163._8_4_ = fVar203;
              auVar163._12_4_ = fVar203;
              auVar163._16_4_ = fVar203;
              auVar163._20_4_ = fVar203;
              auVar163._24_4_ = fVar203;
              auVar163._28_4_ = fVar203;
              pvVar56 = pMVar9->data;
              lVar60 = 0;
              do {
                auVar160 = *(undefined1 (*) [32])((long)pvVar56 + lVar60);
                auVar299 = vrcpps_avx(auVar160);
                auVar311._0_4_ = fVar203 * auVar299._0_4_;
                auVar311._4_4_ = fVar203 * auVar299._4_4_;
                auVar311._8_4_ = fVar203 * auVar299._8_4_;
                auVar311._12_4_ = fVar203 * auVar299._12_4_;
                auVar311._16_4_ = fVar203 * auVar299._16_4_;
                auVar311._20_4_ = fVar203 * auVar299._20_4_;
                auVar311._28_36_ = in_ZMM3._28_36_;
                auVar311._24_4_ = fVar203 * auVar299._24_4_;
                auVar142 = auVar311._0_32_;
                in_ZMM3 = ZEXT3264(auVar142);
                auVar106 = vfmsub213ps_fma(auVar160,auVar142,auVar163);
                auVar106 = vfnmadd213ps_fma(ZEXT1632(auVar106),auVar299,auVar142);
                *(undefined1 (*) [32])((long)pvVar12 + lVar60) = ZEXT1632(auVar106);
                lVar60 = lVar60 + 0x20;
                uVar66 = (int)uVar47 - 1;
                uVar47 = (ulong)uVar66;
              } while (uVar66 != 0);
              return 0;
            }
            return 0;
          }
          if (iVar59 == 2) {
            Mat::create(this_00,uVar65,uVar5,sVar11,uVar66,opt->blob_allocator);
            pauVar49 = (undefined1 (*) [32])this_00->data;
            if (pauVar49 == (undefined1 (*) [32])0x0) {
              return -100;
            }
            if ((long)this_00->c * this_00->cstep != 0) {
              if (0 < (int)uVar5) {
                pauVar54 = (undefined1 (*) [32])pMVar9->data;
                pfVar57 = (float *)pMVar9[1].data;
                uVar66 = 0;
                auVar160._8_4_ = 0x3f800000;
                auVar160._0_8_ = 0x3f8000003f800000;
                auVar160._12_4_ = 0x3f800000;
                auVar160._16_4_ = 0x3f800000;
                auVar160._20_4_ = 0x3f800000;
                auVar160._24_4_ = 0x3f800000;
                auVar160._28_4_ = 0x3f800000;
                do {
                  if (0 < (int)uVar65) {
                    auVar163 = vrcpps_avx(*pauVar54);
                    auVar106 = vfmsub213ps_fma(*pauVar54,auVar163,auVar160);
                    auVar106 = vfnmadd132ps_fma(ZEXT1632(auVar106),auVar163,auVar163);
                    uVar64 = uVar65;
                    do {
                      auVar299._4_4_ = auVar106._4_4_ * pfVar57[1];
                      auVar299._0_4_ = auVar106._0_4_ * *pfVar57;
                      auVar299._8_4_ = auVar106._8_4_ * pfVar57[2];
                      auVar299._12_4_ = auVar106._12_4_ * pfVar57[3];
                      auVar299._16_4_ = pfVar57[4] * 0.0;
                      auVar299._20_4_ = pfVar57[5] * 0.0;
                      auVar299._24_4_ = pfVar57[6] * 0.0;
                      auVar299._28_4_ = auVar163._28_4_;
                      *pauVar49 = auVar299;
                      pfVar57 = pfVar57 + 8;
                      pauVar49 = pauVar49 + 1;
                      uVar64 = uVar64 - 1;
                      auVar163 = auVar299;
                    } while (uVar64 != 0);
                  }
                  pauVar54 = pauVar54 + 1;
                  uVar66 = uVar66 + 1;
                } while (uVar66 != uVar5);
                return 0;
              }
              return 0;
            }
            return -100;
          }
          if (iVar59 != 3) {
            return 0;
          }
          Mat::create(this_00,uVar65,uVar5,uVar6,sVar11,uVar66,opt->blob_allocator);
          if (this_00->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep == 0) {
            return -100;
          }
          if (0 < (int)local_130) {
            uVar47 = 0;
            auVar142._8_4_ = 0x3f800000;
            auVar142._0_8_ = 0x3f8000003f800000;
            auVar142._12_4_ = 0x3f800000;
            auVar142._16_4_ = 0x3f800000;
            auVar142._20_4_ = 0x3f800000;
            auVar142._24_4_ = 0x3f800000;
            auVar142._28_4_ = 0x3f800000;
            do {
              if (0 < iVar72) {
                auVar163 = *(undefined1 (*) [32])((long)pMVar9->data + uVar47 * 0x20);
                auVar160 = vrcpps_avx(auVar163);
                sVar71 = pMVar9[1].cstep;
                sVar11 = this_00->cstep;
                sVar13 = this_00->elemsize;
                auVar106 = vfmsub213ps_fma(auVar163,auVar160,auVar142);
                pvVar12 = this_00->data;
                auVar106 = vfnmadd132ps_fma(ZEXT1632(auVar106),auVar160,auVar160);
                sVar14 = pMVar9[1].elemsize;
                pvVar56 = pMVar9[1].data;
                lVar60 = 0;
                iVar45 = iVar72;
                do {
                  pfVar57 = (float *)((long)pvVar56 + lVar60 + sVar71 * sVar14 * uVar47);
                  auVar25._4_4_ = auVar106._4_4_ * pfVar57[1];
                  auVar25._0_4_ = auVar106._0_4_ * *pfVar57;
                  auVar25._8_4_ = auVar106._8_4_ * pfVar57[2];
                  auVar25._12_4_ = auVar106._12_4_ * pfVar57[3];
                  auVar25._16_4_ = pfVar57[4] * 0.0;
                  auVar25._20_4_ = pfVar57[5] * 0.0;
                  auVar25._24_4_ = pfVar57[6] * 0.0;
                  auVar25._28_4_ = auVar160._28_4_;
                  *(undefined1 (*) [32])((long)pvVar12 + lVar60 + sVar11 * sVar13 * uVar47) =
                       auVar25;
                  lVar60 = lVar60 + 0x20;
                  iVar45 = iVar45 + -1;
                  auVar160 = auVar25;
                } while (iVar45 != 0);
              }
              uVar47 = uVar47 + 1;
            } while ((void *)uVar47 != local_130);
            return 0;
          }
          return 0;
        }
        if (iVar59 == 1) {
          Mat::create(this_00,uVar65,sVar11,uVar66,opt->blob_allocator);
          pvVar12 = this_00->data;
          if (pvVar12 == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep != 0) {
            if (0 < (int)uVar65) {
              fVar203 = 1.0 / *pMVar9->data;
              pvVar56 = pMVar1->data;
              lVar60 = 0;
              do {
                pfVar57 = (float *)((long)pvVar56 + lVar60);
                auVar259._0_4_ = fVar203 * *pfVar57;
                auVar259._4_4_ = fVar203 * pfVar57[1];
                auVar259._8_4_ = fVar203 * pfVar57[2];
                auVar259._12_4_ = fVar203 * pfVar57[3];
                auVar259._16_4_ = fVar203 * pfVar57[4];
                auVar259._20_4_ = fVar203 * pfVar57[5];
                auVar259._28_36_ = in_ZMM1._28_36_;
                auVar259._24_4_ = fVar203 * pfVar57[6];
                in_ZMM1 = ZEXT3264(auVar259._0_32_);
                *(undefined1 (*) [32])((long)pvVar12 + lVar60) = auVar259._0_32_;
                lVar60 = lVar60 + 0x20;
                uVar65 = uVar65 - 1;
              } while (uVar65 != 0);
              return 0;
            }
            return 0;
          }
          return -100;
        }
        if (iVar59 == 2) {
          Mat::create(this_00,uVar65,uVar5,sVar11,uVar66,opt->blob_allocator);
          pvVar12 = this_00->data;
          if (pvVar12 == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep != 0) {
            if (0 < iVar72) {
              fVar203 = 1.0 / *pMVar9->data;
              pvVar56 = pMVar1->data;
              lVar60 = 0;
              do {
                pfVar57 = (float *)((long)pvVar56 + lVar60);
                auVar258._0_4_ = fVar203 * *pfVar57;
                auVar258._4_4_ = fVar203 * pfVar57[1];
                auVar258._8_4_ = fVar203 * pfVar57[2];
                auVar258._12_4_ = fVar203 * pfVar57[3];
                auVar258._16_4_ = fVar203 * pfVar57[4];
                auVar258._20_4_ = fVar203 * pfVar57[5];
                auVar258._28_36_ = in_ZMM1._28_36_;
                auVar258._24_4_ = fVar203 * pfVar57[6];
                in_ZMM1 = ZEXT3264(auVar258._0_32_);
                *(undefined1 (*) [32])((long)pvVar12 + lVar60) = auVar258._0_32_;
                lVar60 = lVar60 + 0x20;
                iVar72 = iVar72 + -1;
              } while (iVar72 != 0);
              return 0;
            }
            return 0;
          }
          return -100;
        }
        if (iVar59 != 3) {
          return 0;
        }
        Mat::create(this_00,uVar65,uVar5,uVar6,sVar11,uVar66,opt->blob_allocator);
        if (this_00->data == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep == 0) {
          return -100;
        }
        if (0 < (int)local_130) {
          fVar203 = 1.0 / *pMVar9->data;
          uVar47 = 0;
          do {
            if (0 < iVar72) {
              sVar71 = this_00->cstep;
              sVar11 = this_00->elemsize;
              pvVar12 = this_00->data;
              sVar13 = pMVar9[1].cstep;
              sVar14 = pMVar9[1].elemsize;
              pvVar56 = pMVar9[1].data;
              lVar60 = 0;
              iVar45 = iVar72;
              do {
                pfVar57 = (float *)((long)pvVar56 + lVar60 + sVar13 * sVar14 * uVar47);
                auVar249._0_4_ = fVar203 * *pfVar57;
                auVar249._4_4_ = fVar203 * pfVar57[1];
                auVar249._8_4_ = fVar203 * pfVar57[2];
                auVar249._12_4_ = fVar203 * pfVar57[3];
                auVar249._16_4_ = fVar203 * pfVar57[4];
                auVar249._20_4_ = fVar203 * pfVar57[5];
                auVar249._28_36_ = in_ZMM1._28_36_;
                auVar249._24_4_ = fVar203 * pfVar57[6];
                in_ZMM1 = ZEXT3264(auVar249._0_32_);
                *(undefined1 (*) [32])((long)pvVar12 + lVar60 + sVar71 * sVar11 * uVar47) =
                     auVar249._0_32_;
                lVar60 = lVar60 + 0x20;
                iVar45 = iVar45 + -1;
              } while (iVar45 != 0);
            }
            uVar47 = uVar47 + 1;
          } while ((void *)uVar47 != local_130);
          return 0;
        }
        return 0;
      }
      uVar7 = pMVar9->h;
      local_138 = CONCAT44(local_138._4_4_,uVar7 * uVar64);
      if (iVar59 == 2) {
        if (pMVar9[1].dims == 3) {
          Mat::create(this_00,uVar65,uVar5,uVar6,sVar11,uVar66,opt->blob_allocator);
          if (this_00->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep != 0) {
            if (0 < (int)local_130) {
              uVar47 = 0;
              auVar139._8_4_ = 0x3f800000;
              auVar139._0_8_ = 0x3f8000003f800000;
              auVar139._12_4_ = 0x3f800000;
              auVar139._16_4_ = 0x3f800000;
              auVar139._20_4_ = 0x3f800000;
              auVar139._24_4_ = 0x3f800000;
              auVar139._28_4_ = 0x3f800000;
              do {
                if (0 < (int)uVar5) {
                  pauVar49 = (undefined1 (*) [32])
                             (this_00->cstep * uVar47 * this_00->elemsize + (long)this_00->data);
                  pfVar57 = (float *)(pMVar9[1].cstep * uVar47 * pMVar9[1].elemsize +
                                     (long)pMVar9[1].data);
                  pauVar54 = (undefined1 (*) [32])
                             ((long)pMVar9->w * uVar47 * pMVar9->elemsize + (long)pMVar9->data);
                  uVar66 = 0;
                  do {
                    if (0 < (int)uVar65) {
                      auVar163 = vrcpps_avx(*pauVar54);
                      auVar106 = vfmsub213ps_fma(*pauVar54,auVar163,auVar139);
                      auVar106 = vfnmadd132ps_fma(ZEXT1632(auVar106),auVar163,auVar163);
                      uVar64 = uVar65;
                      do {
                        auVar23._4_4_ = auVar106._4_4_ * pfVar57[1];
                        auVar23._0_4_ = auVar106._0_4_ * *pfVar57;
                        auVar23._8_4_ = auVar106._8_4_ * pfVar57[2];
                        auVar23._12_4_ = auVar106._12_4_ * pfVar57[3];
                        auVar23._16_4_ = pfVar57[4] * 0.0;
                        auVar23._20_4_ = pfVar57[5] * 0.0;
                        auVar23._24_4_ = pfVar57[6] * 0.0;
                        auVar23._28_4_ = auVar163._28_4_;
                        *pauVar49 = auVar23;
                        pfVar57 = pfVar57 + 8;
                        pauVar49 = pauVar49 + 1;
                        uVar64 = uVar64 - 1;
                        auVar163 = auVar23;
                      } while (uVar64 != 0);
                    }
                    pauVar54 = pauVar54 + 1;
                    uVar66 = uVar66 + 1;
                  } while (uVar66 != uVar5);
                }
                uVar47 = uVar47 + 1;
              } while ((void *)uVar47 != local_130);
              return 0;
            }
            return 0;
          }
          return -100;
        }
        local_128 = CONCAT44(uVar4,uVar66);
        Mat::create(this_00,uVar64,uVar7,sVar71,iVar45,opt->blob_allocator);
        pvVar12 = this_00->data;
        if (pvVar12 == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep == 0) {
          return -100;
        }
        if (pMVar9[1].dims != 1) {
          if (pMVar9[1].dims != 2) {
            return 0;
          }
          if (0 < (int)local_138) {
            pvVar56 = pMVar9->data;
            pvVar63 = pMVar9[1].data;
            lVar60 = 0;
            do {
              auVar163 = *(undefined1 (*) [32])((long)pvVar56 + lVar60);
              auVar299 = vrcpps_avx(auVar163);
              auVar160 = *(undefined1 (*) [32])((long)pvVar63 + lVar60);
              auVar305._0_4_ = auVar160._0_4_ * auVar299._0_4_;
              auVar305._4_4_ = auVar160._4_4_ * auVar299._4_4_;
              auVar305._8_4_ = auVar160._8_4_ * auVar299._8_4_;
              auVar305._12_4_ = auVar160._12_4_ * auVar299._12_4_;
              auVar305._16_4_ = auVar160._16_4_ * auVar299._16_4_;
              auVar305._20_4_ = auVar160._20_4_ * auVar299._20_4_;
              auVar305._28_36_ = in_ZMM3._28_36_;
              auVar305._24_4_ = auVar160._24_4_ * auVar299._24_4_;
              auVar142 = auVar305._0_32_;
              in_ZMM3 = ZEXT3264(auVar142);
              auVar106 = vfmsub213ps_fma(auVar163,auVar142,auVar160);
              auVar106 = vfnmadd213ps_fma(ZEXT1632(auVar106),auVar299,auVar142);
              *(undefined1 (*) [32])((long)pvVar12 + lVar60) = ZEXT1632(auVar106);
              lVar60 = lVar60 + 0x20;
              local_138._0_4_ = (int)local_138 + -1;
            } while ((int)local_138 != 0);
            return 0;
          }
          return 0;
        }
        Mat::create(this_00,uVar64,uVar7,sVar71,iVar45,opt->blob_allocator);
        pauVar49 = (undefined1 (*) [32])this_00->data;
        if (pauVar49 == (undefined1 (*) [32])0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep != 0) {
          if ((int)local_128 != 1 || pMVar9[1].w != 1) {
            if (0 < (int)uVar7) {
              pauVar54 = (undefined1 (*) [32])pMVar9->data;
              pauVar52 = (undefined1 (*) [32])pMVar9[1].data;
              uVar66 = 0;
              do {
                if (0 < (int)uVar64) {
                  auVar163 = *pauVar52;
                  uVar46 = uVar47;
                  do {
                    auVar160 = vrcpps_avx(*pauVar54);
                    auVar323._0_4_ = auVar163._0_4_ * auVar160._0_4_;
                    auVar323._4_4_ = auVar163._4_4_ * auVar160._4_4_;
                    auVar323._8_4_ = auVar163._8_4_ * auVar160._8_4_;
                    auVar323._12_4_ = auVar163._12_4_ * auVar160._12_4_;
                    auVar323._16_4_ = auVar163._16_4_ * auVar160._16_4_;
                    auVar323._20_4_ = auVar163._20_4_ * auVar160._20_4_;
                    auVar323._28_36_ = in_ZMM3._28_36_;
                    auVar323._24_4_ = auVar163._24_4_ * auVar160._24_4_;
                    auVar299 = auVar323._0_32_;
                    in_ZMM3 = ZEXT3264(auVar299);
                    auVar106 = vfmsub213ps_fma(*pauVar54,auVar299,auVar163);
                    auVar106 = vfnmadd213ps_fma(ZEXT1632(auVar106),auVar160,auVar299);
                    *pauVar49 = ZEXT1632(auVar106);
                    pauVar54 = pauVar54 + 1;
                    pauVar49 = pauVar49 + 1;
                    uVar65 = (int)uVar46 - 1;
                    uVar46 = (ulong)uVar65;
                  } while (uVar65 != 0);
                }
                pauVar52 = pauVar52 + 1;
                uVar66 = uVar66 + 1;
              } while (uVar66 != uVar7);
              return 0;
            }
            return 0;
          }
          if (0 < (int)local_138) {
            fVar203 = *pMVar1->data;
            auVar171._4_4_ = fVar203;
            auVar171._0_4_ = fVar203;
            auVar171._8_4_ = fVar203;
            auVar171._12_4_ = fVar203;
            auVar171._16_4_ = fVar203;
            auVar171._20_4_ = fVar203;
            auVar171._24_4_ = fVar203;
            auVar171._28_4_ = fVar203;
            pvVar12 = pMVar9->data;
            lVar60 = 0;
            do {
              auVar163 = *(undefined1 (*) [32])((long)pvVar12 + lVar60);
              auVar160 = vrcpps_avx(auVar163);
              auVar313._0_4_ = fVar203 * auVar160._0_4_;
              auVar313._4_4_ = fVar203 * auVar160._4_4_;
              auVar313._8_4_ = fVar203 * auVar160._8_4_;
              auVar313._12_4_ = fVar203 * auVar160._12_4_;
              auVar313._16_4_ = fVar203 * auVar160._16_4_;
              auVar313._20_4_ = fVar203 * auVar160._20_4_;
              auVar313._28_36_ = in_ZMM3._28_36_;
              auVar313._24_4_ = fVar203 * auVar160._24_4_;
              auVar299 = auVar313._0_32_;
              in_ZMM3 = ZEXT3264(auVar299);
              auVar106 = vfmsub213ps_fma(auVar163,auVar299,auVar171);
              auVar106 = vfnmadd213ps_fma(ZEXT1632(auVar106),auVar160,auVar299);
              *(undefined1 (*) [32])((long)*pauVar49 + lVar60) = ZEXT1632(auVar106);
              lVar60 = lVar60 + 0x20;
              local_138._0_4_ = (int)local_138 + -1;
            } while ((int)local_138 != 0);
            return 0;
          }
          return 0;
        }
        return -100;
      }
      if (iVar59 != 3) {
        return 0;
      }
      uVar8 = pMVar9->c;
      uVar46 = (ulong)uVar8;
      if (pMVar9[1].dims != 3) {
        Mat::create(this_00,uVar64,uVar7,uVar8,sVar71,iVar45,opt->blob_allocator);
        if (this_00->data == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep == 0) {
          return -100;
        }
        if (pMVar9[1].dims == 1) {
          if (uVar66 != 1 || pMVar9[1].w != 1) {
            if (0 < (int)uVar8) {
              uVar47 = 0;
              do {
                if (0 < (int)local_138) {
                  sVar71 = this_00->cstep;
                  sVar11 = this_00->elemsize;
                  auVar163 = *(undefined1 (*) [32])((long)pMVar1->data + uVar47 * 0x20);
                  pvVar12 = this_00->data;
                  sVar13 = pMVar9->cstep;
                  sVar14 = pMVar9->elemsize;
                  pvVar56 = pMVar9->data;
                  lVar60 = 0;
                  iVar45 = (int)local_138;
                  do {
                    auVar160 = *(undefined1 (*) [32])
                                ((long)pvVar56 + lVar60 + sVar13 * sVar14 * uVar47);
                    auVar299 = vrcpps_avx(auVar160);
                    auVar318._0_4_ = auVar163._0_4_ * auVar299._0_4_;
                    auVar318._4_4_ = auVar163._4_4_ * auVar299._4_4_;
                    auVar318._8_4_ = auVar163._8_4_ * auVar299._8_4_;
                    auVar318._12_4_ = auVar163._12_4_ * auVar299._12_4_;
                    auVar318._16_4_ = auVar163._16_4_ * auVar299._16_4_;
                    auVar318._20_4_ = auVar163._20_4_ * auVar299._20_4_;
                    auVar318._28_36_ = in_ZMM3._28_36_;
                    auVar318._24_4_ = auVar163._24_4_ * auVar299._24_4_;
                    auVar142 = auVar318._0_32_;
                    in_ZMM3 = ZEXT3264(auVar142);
                    auVar106 = vfmsub213ps_fma(auVar160,auVar142,auVar163);
                    auVar106 = vfnmadd213ps_fma(ZEXT1632(auVar106),auVar299,auVar142);
                    *(undefined1 (*) [32])((long)pvVar12 + lVar60 + sVar71 * sVar11 * uVar47) =
                         ZEXT1632(auVar106);
                    lVar60 = lVar60 + 0x20;
                    iVar45 = iVar45 + -1;
                  } while (iVar45 != 0);
                }
                uVar47 = uVar47 + 1;
              } while (uVar47 != uVar46);
              return 0;
            }
            return 0;
          }
          if (0 < (int)uVar8) {
            fVar203 = *pMVar1->data;
            auVar173._4_4_ = fVar203;
            auVar173._0_4_ = fVar203;
            auVar173._8_4_ = fVar203;
            auVar173._12_4_ = fVar203;
            auVar173._16_4_ = fVar203;
            auVar173._20_4_ = fVar203;
            auVar173._24_4_ = fVar203;
            auVar173._28_4_ = fVar203;
            uVar47 = 0;
            do {
              if (0 < (int)local_138) {
                sVar71 = this_00->cstep;
                sVar11 = this_00->elemsize;
                pvVar12 = this_00->data;
                sVar13 = pMVar9->cstep;
                sVar14 = pMVar9->elemsize;
                pvVar56 = pMVar9->data;
                lVar60 = 0;
                iVar45 = (int)local_138;
                do {
                  auVar163 = *(undefined1 (*) [32])
                              ((long)pvVar56 + lVar60 + sVar13 * sVar14 * uVar47);
                  auVar160 = vrcpps_avx(auVar163);
                  auVar314._0_4_ = fVar203 * auVar160._0_4_;
                  auVar314._4_4_ = fVar203 * auVar160._4_4_;
                  auVar314._8_4_ = fVar203 * auVar160._8_4_;
                  auVar314._12_4_ = fVar203 * auVar160._12_4_;
                  auVar314._16_4_ = fVar203 * auVar160._16_4_;
                  auVar314._20_4_ = fVar203 * auVar160._20_4_;
                  auVar314._28_36_ = in_ZMM3._28_36_;
                  auVar314._24_4_ = fVar203 * auVar160._24_4_;
                  auVar299 = auVar314._0_32_;
                  in_ZMM3 = ZEXT3264(auVar299);
                  auVar106 = vfmsub213ps_fma(auVar163,auVar299,auVar173);
                  auVar106 = vfnmadd213ps_fma(ZEXT1632(auVar106),auVar160,auVar299);
                  *(undefined1 (*) [32])((long)pvVar12 + lVar60 + sVar71 * sVar11 * uVar47) =
                       ZEXT1632(auVar106);
                  lVar60 = lVar60 + 0x20;
                  iVar45 = iVar45 + -1;
                } while (iVar45 != 0);
              }
              uVar47 = uVar47 + 1;
            } while (uVar47 != uVar46);
            return 0;
          }
          return 0;
        }
        if (pMVar9[1].dims != 2) {
          return 0;
        }
        if (0 < (int)uVar8) {
          uVar48 = 0;
          do {
            if (0 < (int)uVar7) {
              pauVar49 = (undefined1 (*) [32])
                         (this_00->cstep * uVar48 * this_00->elemsize + (long)this_00->data);
              pauVar54 = (undefined1 (*) [32])
                         ((long)pMVar9[1].w * uVar48 * pMVar9[1].elemsize + (long)pMVar9[1].data);
              pauVar52 = (undefined1 (*) [32])
                         (pMVar9->cstep * uVar48 * pMVar9->elemsize + (long)pMVar9->data);
              uVar66 = 0;
              do {
                if (0 < (int)uVar64) {
                  auVar163 = *pauVar54;
                  uVar62 = uVar47;
                  do {
                    auVar160 = vrcpps_avx(*pauVar52);
                    auVar306._0_4_ = auVar163._0_4_ * auVar160._0_4_;
                    auVar306._4_4_ = auVar163._4_4_ * auVar160._4_4_;
                    auVar306._8_4_ = auVar163._8_4_ * auVar160._8_4_;
                    auVar306._12_4_ = auVar163._12_4_ * auVar160._12_4_;
                    auVar306._16_4_ = auVar163._16_4_ * auVar160._16_4_;
                    auVar306._20_4_ = auVar163._20_4_ * auVar160._20_4_;
                    auVar306._28_36_ = in_ZMM3._28_36_;
                    auVar306._24_4_ = auVar163._24_4_ * auVar160._24_4_;
                    auVar299 = auVar306._0_32_;
                    in_ZMM3 = ZEXT3264(auVar299);
                    auVar106 = vfmsub213ps_fma(*pauVar52,auVar299,auVar163);
                    auVar106 = vfnmadd213ps_fma(ZEXT1632(auVar106),auVar160,auVar299);
                    *pauVar49 = ZEXT1632(auVar106);
                    pauVar52 = pauVar52 + 1;
                    pauVar49 = pauVar49 + 1;
                    uVar65 = (int)uVar62 - 1;
                    uVar62 = (ulong)uVar65;
                  } while (uVar65 != 0);
                }
                pauVar54 = pauVar54 + 1;
                uVar66 = uVar66 + 1;
              } while (uVar66 != uVar7);
            }
            uVar48 = uVar48 + 1;
          } while (uVar48 != uVar46);
          return 0;
        }
        return 0;
      }
      if (uVar8 == uVar6 && ((uVar65 ^ 1) == 0 && (uVar5 ^ 1) == 0)) {
        Mat::create(this_00,uVar64,uVar7,uVar8,sVar71,iVar45,opt->blob_allocator);
        if (this_00->data == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep != 0) {
          if (0 < (int)uVar8) {
            uVar47 = 0;
            do {
              if (0 < (int)local_138) {
                sVar71 = pMVar9->cstep;
                sVar11 = pMVar9->elemsize;
                auVar163 = *(undefined1 (*) [32])
                            ((long)pMVar9[1].data + pMVar9[1].cstep * uVar47 * pMVar9[1].elemsize);
                pvVar12 = pMVar9->data;
                sVar13 = this_00->cstep;
                sVar14 = this_00->elemsize;
                pvVar56 = this_00->data;
                lVar60 = 0;
                iVar45 = (int)local_138;
                do {
                  auVar160 = *(undefined1 (*) [32])
                              ((long)pvVar12 + lVar60 + sVar71 * sVar11 * uVar47);
                  auVar299 = vrcpps_avx(auVar160);
                  auVar300._0_4_ = auVar163._0_4_ * auVar299._0_4_;
                  auVar300._4_4_ = auVar163._4_4_ * auVar299._4_4_;
                  auVar300._8_4_ = auVar163._8_4_ * auVar299._8_4_;
                  auVar300._12_4_ = auVar163._12_4_ * auVar299._12_4_;
                  auVar300._16_4_ = auVar163._16_4_ * auVar299._16_4_;
                  auVar300._20_4_ = auVar163._20_4_ * auVar299._20_4_;
                  auVar300._28_36_ = in_ZMM3._28_36_;
                  auVar300._24_4_ = auVar163._24_4_ * auVar299._24_4_;
                  auVar142 = auVar300._0_32_;
                  in_ZMM3 = ZEXT3264(auVar142);
                  auVar106 = vfmsub213ps_fma(auVar160,auVar142,auVar163);
                  auVar106 = vfnmadd213ps_fma(ZEXT1632(auVar106),auVar299,auVar142);
                  *(undefined1 (*) [32])((long)pvVar56 + lVar60 + sVar13 * sVar14 * uVar47) =
                       ZEXT1632(auVar106);
                  lVar60 = lVar60 + 0x20;
                  iVar45 = iVar45 + -1;
                } while (iVar45 != 0);
              }
              uVar47 = uVar47 + 1;
            } while (uVar47 != uVar46);
            return 0;
          }
          return 0;
        }
        return -100;
      }
      local_110 = sVar71;
      if (uVar65 == uVar64) {
        if (uVar66 == 1 && (uVar6 == 1 && uVar5 == uVar7)) {
          Mat::create(this_00,uVar64,uVar7,uVar8,sVar71,iVar45,opt->blob_allocator);
          if (this_00->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep != 0) {
            if (0 < (int)uVar8) {
              uVar47 = 0;
              do {
                if (0 < (int)local_138) {
                  sVar71 = pMVar9->cstep;
                  sVar11 = pMVar9->elemsize;
                  sVar13 = this_00->cstep;
                  pvVar12 = pMVar9->data;
                  pvVar56 = pMVar9[1].data;
                  sVar14 = this_00->elemsize;
                  pvVar63 = this_00->data;
                  lVar60 = 0;
                  iVar45 = (int)local_138;
                  do {
                    auVar163 = *(undefined1 (*) [32])
                                ((long)pvVar12 + lVar60 * 8 + sVar71 * sVar11 * uVar47);
                    auVar160 = vrcpps_avx(auVar163);
                    fVar203 = *(float *)((long)pvVar56 + lVar60);
                    auVar269._4_4_ = fVar203;
                    auVar269._0_4_ = fVar203;
                    auVar269._8_4_ = fVar203;
                    auVar269._12_4_ = fVar203;
                    auVar269._16_4_ = fVar203;
                    auVar269._20_4_ = fVar203;
                    auVar269._24_4_ = fVar203;
                    auVar269._28_4_ = fVar203;
                    auVar307._0_4_ = fVar203 * auVar160._0_4_;
                    auVar307._4_4_ = fVar203 * auVar160._4_4_;
                    auVar307._8_4_ = fVar203 * auVar160._8_4_;
                    auVar307._12_4_ = fVar203 * auVar160._12_4_;
                    auVar307._16_4_ = fVar203 * auVar160._16_4_;
                    auVar307._20_4_ = fVar203 * auVar160._20_4_;
                    auVar307._28_36_ = in_ZMM3._28_36_;
                    auVar307._24_4_ = fVar203 * auVar160._24_4_;
                    auVar299 = auVar307._0_32_;
                    in_ZMM3 = ZEXT3264(auVar299);
                    auVar106 = vfmsub213ps_fma(auVar163,auVar299,auVar269);
                    auVar106 = vfnmadd213ps_fma(ZEXT1632(auVar106),auVar160,auVar299);
                    *(undefined1 (*) [32])((long)pvVar63 + lVar60 * 8 + sVar13 * sVar14 * uVar47) =
                         ZEXT1632(auVar106);
                    lVar60 = lVar60 + 4;
                    iVar45 = iVar45 + -1;
                  } while (iVar45 != 0);
                }
                uVar47 = uVar47 + 1;
              } while (uVar47 != uVar46);
              return 0;
            }
            return 0;
          }
          return -100;
        }
        local_128 = CONCAT71(local_128._1_7_,uVar64 == 1);
        local_104 = CONCAT31(local_104._1_3_,uVar7 == 1);
        if ((uVar64 != 1 || uVar7 != 1) || uVar6 != uVar8) {
          if (((iVar45 == 1) && (uVar5 == uVar7)) && (uVar8 == 1)) {
            Mat::create(this_00,uVar64,uVar7,uVar6,sVar11,uVar66,opt->blob_allocator);
            if (this_00->data == (void *)0x0) {
              return -100;
            }
            if ((long)this_00->c * this_00->cstep != 0) {
              if (0 < (int)local_130) {
                uVar47 = 0;
                do {
                  if (0 < iVar72) {
                    sVar71 = pMVar9[1].cstep;
                    sVar11 = pMVar9[1].elemsize;
                    sVar13 = this_00->cstep;
                    pvVar12 = pMVar9[1].data;
                    pvVar56 = pMVar9->data;
                    sVar14 = this_00->elemsize;
                    pvVar63 = this_00->data;
                    lVar60 = 0;
                    iVar45 = iVar72;
                    do {
                      fVar203 = 1.0 / *(float *)((long)pvVar56 + lVar60);
                      pfVar57 = (float *)((long)pvVar12 + lVar60 * 8 + sVar71 * sVar11 * uVar47);
                      auVar19._4_4_ = fVar203 * pfVar57[1];
                      auVar19._0_4_ = fVar203 * *pfVar57;
                      auVar19._8_4_ = fVar203 * pfVar57[2];
                      auVar19._12_4_ = fVar203 * pfVar57[3];
                      auVar19._16_4_ = fVar203 * pfVar57[4];
                      auVar19._20_4_ = fVar203 * pfVar57[5];
                      auVar19._24_4_ = fVar203 * pfVar57[6];
                      auVar19._28_4_ = fVar203;
                      *(undefined1 (*) [32])((long)pvVar63 + lVar60 * 8 + sVar13 * sVar14 * uVar47)
                           = auVar19;
                      lVar60 = lVar60 + 4;
                      iVar45 = iVar45 + -1;
                    } while (iVar45 != 0);
                  }
                  uVar47 = uVar47 + 1;
                } while ((void *)uVar47 != local_130);
                return 0;
              }
              return 0;
            }
            return -100;
          }
LAB_002473c9:
          if ((((uVar65 ^ 1) == 0 && uVar5 == uVar7) && uVar8 == uVar6) && uVar64 != 1) {
            Mat::create(this_00,uVar64,uVar7,uVar8,sVar71,iVar45,opt->blob_allocator);
            if (this_00->data == (void *)0x0) {
              return -100;
            }
            if ((long)this_00->c * this_00->cstep != 0) {
              if (0 < (int)uVar8) {
                uVar48 = 0;
                do {
                  if (0 < (int)uVar7) {
                    sVar71 = pMVar9[1].cstep;
                    sVar11 = pMVar9[1].elemsize;
                    pvVar12 = pMVar9[1].data;
                    pauVar49 = (undefined1 (*) [32])
                               (this_00->cstep * uVar48 * this_00->elemsize + (long)this_00->data);
                    pauVar54 = (undefined1 (*) [32])
                               (pMVar9->cstep * uVar48 * pMVar9->elemsize + (long)pMVar9->data);
                    uVar62 = 0;
                    do {
                      if (0 < (int)uVar64) {
                        auVar163 = *(undefined1 (*) [32])
                                    ((long)pvVar12 + uVar62 * 0x20 + sVar71 * uVar48 * sVar11);
                        uVar67 = uVar47;
                        do {
                          auVar160 = vrcpps_avx(*pauVar54);
                          auVar312._0_4_ = auVar163._0_4_ * auVar160._0_4_;
                          auVar312._4_4_ = auVar163._4_4_ * auVar160._4_4_;
                          auVar312._8_4_ = auVar163._8_4_ * auVar160._8_4_;
                          auVar312._12_4_ = auVar163._12_4_ * auVar160._12_4_;
                          auVar312._16_4_ = auVar163._16_4_ * auVar160._16_4_;
                          auVar312._20_4_ = auVar163._20_4_ * auVar160._20_4_;
                          auVar312._28_36_ = in_ZMM3._28_36_;
                          auVar312._24_4_ = auVar163._24_4_ * auVar160._24_4_;
                          auVar299 = auVar312._0_32_;
                          in_ZMM3 = ZEXT3264(auVar299);
                          auVar106 = vfmsub213ps_fma(*pauVar54,auVar299,auVar163);
                          auVar106 = vfnmadd213ps_fma(ZEXT1632(auVar106),auVar160,auVar299);
                          *pauVar49 = ZEXT1632(auVar106);
                          pauVar54 = pauVar54 + 1;
                          pauVar49 = pauVar49 + 1;
                          uVar66 = (int)uVar67 - 1;
                          uVar67 = (ulong)uVar66;
                        } while (uVar66 != 0);
                      }
                      uVar62 = uVar62 + 1;
                    } while (uVar62 != uVar7);
                  }
                  uVar48 = uVar48 + 1;
                } while (uVar48 != uVar46);
                return 0;
              }
              return 0;
            }
            return -100;
          }
          if (((uVar65 == uVar64 && (uVar5 ^ 1) == 0) && uVar8 == uVar6) && uVar7 != 1) {
            Mat::create(this_00,uVar64,uVar7,uVar8,sVar71,iVar45,opt->blob_allocator);
            if (this_00->data == (void *)0x0) {
              return -100;
            }
            if ((long)this_00->c * this_00->cstep != 0) {
              if (0 < (int)uVar8) {
                uVar48 = 0;
                do {
                  if (0 < (int)uVar7) {
                    sVar71 = pMVar9[1].elemsize;
                    pvVar56 = (void *)(this_00->cstep * uVar48 * this_00->elemsize +
                                      (long)this_00->data);
                    pvVar63 = (void *)(pMVar9->cstep * uVar48 * pMVar9->elemsize +
                                      (long)pMVar9->data);
                    sVar11 = pMVar9[1].cstep;
                    pvVar12 = pMVar9[1].data;
                    uVar66 = 0;
                    do {
                      if (0 < (int)uVar64) {
                        lVar60 = 0;
                        do {
                          auVar160 = vrcpps_avx(*(undefined1 (*) [32])((long)pvVar63 + lVar60));
                          auVar163 = *(undefined1 (*) [32])
                                      ((long)pvVar12 + lVar60 + sVar71 * sVar11 * uVar48);
                          auVar317._0_4_ = auVar163._0_4_ * auVar160._0_4_;
                          auVar317._4_4_ = auVar163._4_4_ * auVar160._4_4_;
                          auVar317._8_4_ = auVar163._8_4_ * auVar160._8_4_;
                          auVar317._12_4_ = auVar163._12_4_ * auVar160._12_4_;
                          auVar317._16_4_ = auVar163._16_4_ * auVar160._16_4_;
                          auVar317._20_4_ = auVar163._20_4_ * auVar160._20_4_;
                          auVar317._28_36_ = in_ZMM3._28_36_;
                          auVar317._24_4_ = auVar163._24_4_ * auVar160._24_4_;
                          auVar299 = auVar317._0_32_;
                          in_ZMM3 = ZEXT3264(auVar299);
                          auVar106 = vfmsub213ps_fma(*(undefined1 (*) [32])((long)pvVar63 + lVar60),
                                                     auVar299,auVar163);
                          auVar106 = vfnmadd213ps_fma(ZEXT1632(auVar106),auVar160,auVar299);
                          *(undefined1 (*) [32])((long)pvVar56 + lVar60) = ZEXT1632(auVar106);
                          lVar60 = lVar60 + 0x20;
                        } while (uVar47 << 5 != lVar60);
                        pvVar56 = (void *)((long)pvVar56 + lVar60);
                        pvVar63 = (void *)((long)pvVar63 + lVar60);
                      }
                      uVar66 = uVar66 + 1;
                    } while (uVar66 != uVar7);
                  }
                  uVar48 = uVar48 + 1;
                } while (uVar48 != uVar46);
                return 0;
              }
              return 0;
            }
            return -100;
          }
          if (((uVar6 == uVar8 && uVar5 == uVar7) & uVar65 != 1 & (byte)local_128) == 1) {
            Mat::create(this_00,uVar65,uVar7,uVar8,sVar11,uVar66,opt->blob_allocator);
            if (this_00->data == (void *)0x0) {
              return -100;
            }
            if ((long)this_00->c * this_00->cstep != 0) {
              if (0 < (int)uVar8) {
                uVar47 = 0;
                auVar182._8_4_ = 0x3f800000;
                auVar182._0_8_ = 0x3f8000003f800000;
                auVar182._12_4_ = 0x3f800000;
                auVar182._16_4_ = 0x3f800000;
                auVar182._20_4_ = 0x3f800000;
                auVar182._24_4_ = 0x3f800000;
                auVar182._28_4_ = 0x3f800000;
                do {
                  if (0 < (int)uVar7) {
                    sVar71 = pMVar9->cstep;
                    sVar11 = pMVar9->elemsize;
                    pvVar12 = pMVar9->data;
                    pauVar49 = (undefined1 (*) [32])
                               (this_00->cstep * uVar47 * this_00->elemsize + (long)this_00->data);
                    pfVar57 = (float *)(pMVar9[1].cstep * uVar47 * pMVar9[1].elemsize +
                                       (long)pMVar9[1].data);
                    uVar48 = 0;
                    do {
                      if (0 < (int)uVar65) {
                        auVar163 = *(undefined1 (*) [32])
                                    ((long)pvVar12 + uVar48 * 0x20 + sVar71 * uVar47 * sVar11);
                        auVar160 = vrcpps_avx(auVar163);
                        auVar106 = vfmsub213ps_fma(auVar163,auVar160,auVar182);
                        auVar106 = vfnmadd132ps_fma(ZEXT1632(auVar106),auVar160,auVar160);
                        uVar66 = uVar65;
                        do {
                          auVar29._4_4_ = auVar106._4_4_ * pfVar57[1];
                          auVar29._0_4_ = auVar106._0_4_ * *pfVar57;
                          auVar29._8_4_ = auVar106._8_4_ * pfVar57[2];
                          auVar29._12_4_ = auVar106._12_4_ * pfVar57[3];
                          auVar29._16_4_ = pfVar57[4] * 0.0;
                          auVar29._20_4_ = pfVar57[5] * 0.0;
                          auVar29._24_4_ = pfVar57[6] * 0.0;
                          auVar29._28_4_ = auVar160._28_4_;
                          *pauVar49 = auVar29;
                          pfVar57 = pfVar57 + 8;
                          pauVar49 = pauVar49 + 1;
                          uVar66 = uVar66 - 1;
                          auVar160 = auVar29;
                        } while (uVar66 != 0);
                      }
                      uVar48 = uVar48 + 1;
                    } while (uVar48 != uVar7);
                  }
                  uVar47 = uVar47 + 1;
                } while (uVar47 != uVar46);
                return 0;
              }
              return 0;
            }
            return -100;
          }
          if (((byte)local_104 & uVar6 == uVar8 & (uVar5 != 1 && uVar65 == uVar64)) == 1) {
            Mat::create(this_00,uVar64,uVar5,uVar8,sVar11,uVar66,opt->blob_allocator);
            if (this_00->data == (void *)0x0) {
              return -100;
            }
            if ((long)local_120->c * local_120->cstep != 0) {
              if (0 < (int)uVar8) {
                local_158 = (__m256 *)0x0;
                do {
                  pMVar1 = local_a0;
                  afVar185 = _local_100;
                  bVar74 = local_a0->dims == 3;
                  local_c8 = 1;
                  if (!bVar74) {
                    local_c8 = local_a0->d;
                  }
                  local_d4 = local_a0->w;
                  local_d0 = local_a0->h;
                  local_130 = (void *)local_a0->cstep;
                  pvVar12 = local_a0->data;
                  local_138 = local_a0->elemsize;
                  local_e0 = local_a0->allocator;
                  _fStack_f8 = 0;
                  local_100 = (undefined1  [8])
                              ((long)local_130 * (long)local_158 * local_138 + (long)pvVar12);
                  uStack_f0 = local_138;
                  fStack_e4 = afVar185[7];
                  fStack_e8 = (float)local_a0->elempack;
                  local_d8 = bVar74 ^ 3;
                  local_c0 = (long)local_d0 * (long)local_d4;
                  local_cc = 1;
                  in_ZMM3 = ZEXT1664(in_ZMM3._0_16_);
                  Mat::~Mat((Mat *)local_100);
                  bVar74 = pMVar1[1].dims == 3;
                  local_c8 = 1;
                  if (!bVar74) {
                    local_c8 = pMVar1[1].d;
                  }
                  local_d4 = pMVar1[1].w;
                  local_d0 = pMVar1[1].h;
                  pvVar56 = (void *)(pMVar1[1].cstep * (long)local_158 * pMVar1[1].elemsize +
                                    (long)pMVar1[1].data);
                  local_d8 = bVar74 ^ 3;
                  local_e0 = pMVar1[1].allocator;
                  _fStack_f8 = 0;
                  local_100 = (undefined1  [8])pvVar56;
                  uStack_f0 = pMVar1[1].elemsize;
                  fStack_e8 = (float)pMVar1[1].elempack;
                  local_c0 = (long)local_d0 * (long)local_d4;
                  local_cc = 1;
                  Mat::~Mat((Mat *)local_100);
                  bVar74 = local_120->dims == 3;
                  local_d4 = local_120->w;
                  local_d0 = local_120->h;
                  local_c8 = 1;
                  if (!bVar74) {
                    local_c8 = local_120->d;
                  }
                  sVar71 = local_120->elemsize;
                  pvVar63 = (void *)(local_120->cstep * (long)local_158 * sVar71 +
                                    (long)local_120->data);
                  local_d8 = bVar74 ^ 3;
                  local_e0 = local_120->allocator;
                  fStack_f8 = 0.0;
                  fStack_f4 = 0.0;
                  local_100 = (undefined1  [8])pvVar63;
                  uStack_f0._0_4_ = (float)(int)sVar71;
                  uStack_f0._4_4_ = (float)(int)(sVar71 >> 0x20);
                  fStack_e8 = (float)local_120->elempack;
                  local_c0 = (long)local_d0 * (long)local_d4;
                  local_cc = 1;
                  Mat::~Mat((Mat *)local_100);
                  if (0 < (int)uVar5) {
                    uVar66 = 0;
                    do {
                      if (0 < (int)uVar64) {
                        lVar60 = 0;
                        do {
                          auVar163 = *(undefined1 (*) [32])
                                      ((long)pvVar12 +
                                      lVar60 + (long)local_130 * local_138 * (long)local_158);
                          auVar299 = vrcpps_avx(auVar163);
                          auVar160 = *(undefined1 (*) [32])((long)pvVar56 + lVar60);
                          auVar325._0_4_ = auVar160._0_4_ * auVar299._0_4_;
                          auVar325._4_4_ = auVar160._4_4_ * auVar299._4_4_;
                          auVar325._8_4_ = auVar160._8_4_ * auVar299._8_4_;
                          auVar325._12_4_ = auVar160._12_4_ * auVar299._12_4_;
                          auVar325._16_4_ = auVar160._16_4_ * auVar299._16_4_;
                          auVar325._20_4_ = auVar160._20_4_ * auVar299._20_4_;
                          auVar325._28_36_ = in_ZMM3._28_36_;
                          auVar325._24_4_ = auVar160._24_4_ * auVar299._24_4_;
                          auVar142 = auVar325._0_32_;
                          in_ZMM3 = ZEXT3264(auVar142);
                          auVar106 = vfmsub213ps_fma(auVar163,auVar142,auVar160);
                          auVar106 = vfnmadd213ps_fma(ZEXT1632(auVar106),auVar299,auVar142);
                          *(undefined1 (*) [32])((long)pvVar63 + lVar60) = ZEXT1632(auVar106);
                          lVar60 = lVar60 + 0x20;
                        } while (uVar47 << 5 != lVar60);
                        pvVar63 = (void *)((long)pvVar63 + lVar60);
                        pvVar56 = (void *)((long)pvVar56 + lVar60);
                      }
                      uVar66 = uVar66 + 1;
                    } while (uVar66 != uVar5);
                  }
                  local_158 = (__m256 *)((long)local_158 + 1);
                } while (local_158 != (__m256 *)uVar46);
                return 0;
              }
              return 0;
            }
            return -100;
          }
          Mat::create(this_00,uVar64,uVar7,uVar8,sVar71,iVar45,opt->blob_allocator);
          if (this_00->data == (void *)0x0) {
            return -100;
          }
          if ((long)local_120->c * local_120->cstep != 0) {
            if (0 < (int)uVar8) {
              local_158 = (__m256 *)0x0;
              do {
                pMVar1 = local_a0;
                afVar185 = _local_100;
                bVar74 = local_a0->dims == 3;
                local_c8 = 1;
                if (!bVar74) {
                  local_c8 = local_a0->d;
                }
                local_d4 = local_a0->w;
                local_d0 = local_a0->h;
                sVar71 = local_a0->cstep;
                pvVar12 = local_a0->data;
                local_130 = (void *)local_a0->elemsize;
                local_e0 = local_a0->allocator;
                _fStack_f8 = 0;
                local_100 = (undefined1  [8])
                            (sVar71 * (long)local_158 * (long)local_130 + (long)pvVar12);
                uStack_f0 = local_130;
                fStack_e4 = afVar185[7];
                fStack_e8 = (float)local_a0->elempack;
                local_d8 = bVar74 ^ 3;
                local_c0 = (long)local_d0 * (long)local_d4;
                local_cc = 1;
                in_ZMM3 = ZEXT1664(in_ZMM3._0_16_);
                Mat::~Mat((Mat *)local_100);
                bVar74 = pMVar1[1].dims == 3;
                local_c8 = 1;
                if (!bVar74) {
                  local_c8 = pMVar1[1].d;
                }
                local_d4 = pMVar1[1].w;
                local_d0 = pMVar1[1].h;
                local_110 = pMVar1[1].cstep;
                pvVar56 = pMVar1[1].data;
                local_128 = pMVar1[1].elemsize;
                local_e0 = pMVar1[1].allocator;
                _fStack_f8 = 0;
                local_100 = (undefined1  [8])
                            (local_110 * (long)local_158 * local_128 + (long)pvVar56);
                uStack_f0 = local_128;
                fStack_e8 = (float)pMVar1[1].elempack;
                local_d8 = bVar74 ^ 3;
                local_c0 = (long)local_d0 * (long)local_d4;
                local_cc = 1;
                Mat::~Mat((Mat *)local_100);
                bVar74 = local_120->dims == 3;
                local_d4 = local_120->w;
                local_d0 = local_120->h;
                local_c8 = 1;
                if (!bVar74) {
                  local_c8 = local_120->d;
                }
                sVar11 = local_120->cstep;
                pvVar63 = local_120->data;
                sVar13 = local_120->elemsize;
                local_e0 = local_120->allocator;
                fStack_f8 = 0.0;
                fStack_f4 = 0.0;
                local_100 = (undefined1  [8])(sVar11 * (long)local_158 * sVar13 + (long)pvVar63);
                uStack_f0._0_4_ = (float)(int)sVar13;
                uStack_f0._4_4_ = (float)(int)(sVar13 >> 0x20);
                fStack_e8 = (float)local_120->elempack;
                local_d8 = bVar74 ^ 3;
                local_c0 = (long)local_d0 * (long)local_d4;
                local_cc = 1;
                Mat::~Mat((Mat *)local_100);
                if (0 < (int)local_138) {
                  lVar60 = 0;
                  iVar45 = (int)local_138;
                  do {
                    auVar163 = *(undefined1 (*) [32])
                                ((long)pvVar12 + lVar60 + sVar71 * (long)local_130 * (long)local_158
                                );
                    auVar299 = vrcpps_avx(auVar163);
                    auVar160 = *(undefined1 (*) [32])
                                ((long)pvVar56 + lVar60 + local_110 * local_128 * (long)local_158);
                    auVar327._0_4_ = auVar160._0_4_ * auVar299._0_4_;
                    auVar327._4_4_ = auVar160._4_4_ * auVar299._4_4_;
                    auVar327._8_4_ = auVar160._8_4_ * auVar299._8_4_;
                    auVar327._12_4_ = auVar160._12_4_ * auVar299._12_4_;
                    auVar327._16_4_ = auVar160._16_4_ * auVar299._16_4_;
                    auVar327._20_4_ = auVar160._20_4_ * auVar299._20_4_;
                    auVar327._28_36_ = in_ZMM3._28_36_;
                    auVar327._24_4_ = auVar160._24_4_ * auVar299._24_4_;
                    auVar142 = auVar327._0_32_;
                    in_ZMM3 = ZEXT3264(auVar142);
                    auVar106 = vfmsub213ps_fma(auVar163,auVar142,auVar160);
                    auVar106 = vfnmadd213ps_fma(ZEXT1632(auVar106),auVar299,auVar142);
                    *(undefined1 (*) [32])
                     ((long)pvVar63 + lVar60 + sVar11 * sVar13 * (long)local_158) =
                         ZEXT1632(auVar106);
                    lVar60 = lVar60 + 0x20;
                    iVar45 = iVar45 + -1;
                  } while (iVar45 != 0);
                }
                local_158 = (__m256 *)((long)local_158 + 1);
              } while (local_158 != (__m256 *)uVar46);
              return 0;
            }
            return 0;
          }
          return -100;
        }
      }
      else {
        local_128 = CONCAT71(local_128._1_7_,uVar64 == 1);
        local_104 = CONCAT31(local_104._1_3_,uVar7 == 1);
        if ((uVar64 != 1 || uVar7 != 1) || uVar6 != uVar8) goto LAB_002473c9;
      }
      Mat::create(this_00,uVar65,uVar5,uVar6,sVar11,uVar66,opt->blob_allocator);
      if (this_00->data == (void *)0x0) {
        return -100;
      }
      if ((long)this_00->c * this_00->cstep != 0) {
        if (0 < (int)local_130) {
          uVar47 = 0;
          auVar174._8_4_ = 0x3f800000;
          auVar174._0_8_ = 0x3f8000003f800000;
          auVar174._12_4_ = 0x3f800000;
          auVar174._16_4_ = 0x3f800000;
          auVar174._20_4_ = 0x3f800000;
          auVar174._24_4_ = 0x3f800000;
          auVar174._28_4_ = 0x3f800000;
          do {
            if (0 < iVar72) {
              auVar163 = *(undefined1 (*) [32])
                          ((long)pMVar9->data + pMVar9->cstep * uVar47 * pMVar9->elemsize);
              auVar160 = vrcpps_avx(auVar163);
              sVar71 = pMVar9[1].cstep;
              auVar106 = vfmsub213ps_fma(auVar163,auVar160,auVar174);
              sVar11 = pMVar9[1].elemsize;
              auVar106 = vfnmadd132ps_fma(ZEXT1632(auVar106),auVar160,auVar160);
              pvVar12 = pMVar9[1].data;
              sVar13 = this_00->cstep;
              sVar14 = this_00->elemsize;
              pvVar56 = this_00->data;
              lVar60 = 0;
              iVar45 = iVar72;
              do {
                pfVar57 = (float *)((long)pvVar12 + lVar60 + sVar71 * sVar11 * uVar47);
                auVar27._4_4_ = auVar106._4_4_ * pfVar57[1];
                auVar27._0_4_ = auVar106._0_4_ * *pfVar57;
                auVar27._8_4_ = auVar106._8_4_ * pfVar57[2];
                auVar27._12_4_ = auVar106._12_4_ * pfVar57[3];
                auVar27._16_4_ = pfVar57[4] * 0.0;
                auVar27._20_4_ = pfVar57[5] * 0.0;
                auVar27._24_4_ = pfVar57[6] * 0.0;
                auVar27._28_4_ = auVar160._28_4_;
                *(undefined1 (*) [32])((long)pvVar56 + lVar60 + sVar13 * sVar14 * uVar47) = auVar27;
                lVar60 = lVar60 + 0x20;
                iVar45 = iVar45 + -1;
                auVar160 = auVar27;
              } while (iVar45 != 0);
            }
            uVar47 = uVar47 + 1;
          } while ((void *)uVar47 != local_130);
          return 0;
        }
        return 0;
      }
      return -100;
    }
  }
  p_Var10 = this->_vptr_BinaryOp_x86_avx2[-3];
  if (uVar66 == 4 || iVar45 == 4) {
    switch(*(undefined4 *)(&this->field_0xd0 + (long)p_Var10)) {
    case 0:
      uVar64 = pMVar9->w;
      uVar47 = (ulong)uVar64;
      sVar71 = pMVar9->elemsize;
      uVar65 = pMVar9[1].w;
      uVar5 = pMVar9[1].h;
      uVar6 = pMVar9[1].c;
      local_138 = (ulong)uVar6;
      iVar72 = uVar5 * uVar65;
      sVar11 = pMVar9[1].elemsize;
      iVar59 = pMVar9->dims;
      if (iVar59 == 1) {
        iVar59 = pMVar9[1].dims;
        if (iVar45 != 1 || uVar64 != 1) {
          if (iVar59 == 1) {
            Mat::create(this_00,uVar64,sVar71,iVar45,opt->blob_allocator);
            pvVar12 = this_00->data;
            if (pvVar12 == (void *)0x0) {
              return -100;
            }
            if ((long)this_00->c * this_00->cstep == 0) {
              return -100;
            }
            if (uVar66 != 1 || pMVar9[1].w != 1) {
              if (0 < (int)uVar64) {
                pvVar56 = pMVar9->data;
                pvVar63 = pMVar9[1].data;
                lVar60 = 0;
                do {
                  pfVar57 = (float *)((long)pvVar63 + lVar60);
                  fVar203 = pfVar57[1];
                  fVar31 = pfVar57[2];
                  fVar32 = pfVar57[3];
                  pfVar58 = (float *)((long)pvVar56 + lVar60);
                  fVar33 = pfVar58[1];
                  fVar34 = pfVar58[2];
                  fVar35 = pfVar58[3];
                  pfVar2 = (float *)((long)pvVar12 + lVar60);
                  *pfVar2 = *pfVar57 + *pfVar58;
                  pfVar2[1] = fVar203 + fVar33;
                  pfVar2[2] = fVar31 + fVar34;
                  pfVar2[3] = fVar32 + fVar35;
                  lVar60 = lVar60 + 0x10;
                  uVar66 = (int)uVar47 - 1;
                  uVar47 = (ulong)uVar66;
                } while (uVar66 != 0);
                return 0;
              }
              return 0;
            }
            if (0 < (int)uVar64) {
              fVar203 = *pMVar1->data;
              pvVar56 = pMVar9->data;
              lVar60 = 0;
              do {
                pfVar57 = (float *)((long)pvVar56 + lVar60);
                fVar31 = pfVar57[1];
                fVar32 = pfVar57[2];
                fVar33 = pfVar57[3];
                pfVar58 = (float *)((long)pvVar12 + lVar60);
                *pfVar58 = fVar203 + *pfVar57;
                pfVar58[1] = fVar203 + fVar31;
                pfVar58[2] = fVar203 + fVar32;
                pfVar58[3] = fVar203 + fVar33;
                lVar60 = lVar60 + 0x10;
                uVar66 = (int)uVar47 - 1;
                uVar47 = (ulong)uVar66;
              } while (uVar66 != 0);
              return 0;
            }
            return 0;
          }
          if (iVar59 == 2) {
            Mat::create(this_00,uVar65,uVar5,sVar11,uVar66,opt->blob_allocator);
            pauVar50 = (undefined1 (*) [16])this_00->data;
            if (pauVar50 == (undefined1 (*) [16])0x0) {
              return -100;
            }
            if ((long)this_00->c * this_00->cstep != 0) {
              if (0 < (int)uVar5) {
                pauVar55 = (undefined1 (*) [16])pMVar9->data;
                pfVar57 = (float *)pMVar9[1].data;
                uVar66 = 0;
                do {
                  if (0 < (int)uVar65) {
                    auVar106 = *pauVar55;
                    uVar64 = uVar65;
                    do {
                      auVar218._0_4_ = auVar106._0_4_ + *pfVar57;
                      auVar218._4_4_ = auVar106._4_4_ + pfVar57[1];
                      auVar218._8_4_ = auVar106._8_4_ + pfVar57[2];
                      auVar218._12_4_ = auVar106._12_4_ + pfVar57[3];
                      *pauVar50 = auVar218;
                      pfVar57 = pfVar57 + 4;
                      pauVar50 = pauVar50 + 1;
                      uVar64 = uVar64 - 1;
                    } while (uVar64 != 0);
                  }
                  pauVar55 = pauVar55 + 1;
                  uVar66 = uVar66 + 1;
                } while (uVar66 != uVar5);
                return 0;
              }
              return 0;
            }
            return -100;
          }
          if (iVar59 != 3) {
            return 0;
          }
          Mat::create(this_00,uVar65,uVar5,uVar6,sVar11,uVar66,opt->blob_allocator);
          if (this_00->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep == 0) {
            return -100;
          }
          if (0 < (int)local_138) {
            uVar47 = 0;
            do {
              if (0 < iVar72) {
                sVar71 = this_00->cstep;
                sVar11 = this_00->elemsize;
                auVar106 = *(undefined1 (*) [16])((long)pMVar9->data + uVar47 * 0x10);
                pvVar12 = this_00->data;
                sVar13 = pMVar9[1].cstep;
                sVar14 = pMVar9[1].elemsize;
                pvVar56 = pMVar9[1].data;
                lVar60 = 0;
                iVar45 = iVar72;
                do {
                  pfVar57 = (float *)((long)pvVar56 + lVar60 + sVar13 * sVar14 * uVar47);
                  auVar213._0_4_ = auVar106._0_4_ + *pfVar57;
                  auVar213._4_4_ = auVar106._4_4_ + pfVar57[1];
                  auVar213._8_4_ = auVar106._8_4_ + pfVar57[2];
                  auVar213._12_4_ = auVar106._12_4_ + pfVar57[3];
                  *(undefined1 (*) [16])((long)pvVar12 + lVar60 + sVar71 * sVar11 * uVar47) =
                       auVar213;
                  lVar60 = lVar60 + 0x10;
                  iVar45 = iVar45 + -1;
                } while (iVar45 != 0);
              }
              uVar47 = uVar47 + 1;
            } while (uVar47 != local_138);
            return 0;
          }
          return 0;
        }
        if (iVar59 == 1) {
          Mat::create(this_00,uVar65,sVar11,uVar66,opt->blob_allocator);
          pvVar12 = this_00->data;
          if (pvVar12 == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep != 0) {
            if (0 < (int)uVar65) {
              fVar203 = *pMVar9->data;
              pvVar56 = pMVar1->data;
              lVar60 = 0;
              do {
                pfVar57 = (float *)((long)pvVar56 + lVar60);
                fVar31 = pfVar57[1];
                fVar32 = pfVar57[2];
                fVar33 = pfVar57[3];
                pfVar58 = (float *)((long)pvVar12 + lVar60);
                *pfVar58 = fVar203 + *pfVar57;
                pfVar58[1] = fVar203 + fVar31;
                pfVar58[2] = fVar203 + fVar32;
                pfVar58[3] = fVar203 + fVar33;
                lVar60 = lVar60 + 0x10;
                uVar65 = uVar65 - 1;
              } while (uVar65 != 0);
              return 0;
            }
            return 0;
          }
          return -100;
        }
        if (iVar59 == 2) {
          Mat::create(this_00,uVar65,uVar5,sVar11,uVar66,opt->blob_allocator);
          pvVar12 = this_00->data;
          if (pvVar12 == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep != 0) {
            if (0 < iVar72) {
              fVar203 = *pMVar9->data;
              pvVar56 = pMVar1->data;
              lVar60 = 0;
              do {
                pfVar57 = (float *)((long)pvVar56 + lVar60);
                fVar31 = pfVar57[1];
                fVar32 = pfVar57[2];
                fVar33 = pfVar57[3];
                pfVar58 = (float *)((long)pvVar12 + lVar60);
                *pfVar58 = fVar203 + *pfVar57;
                pfVar58[1] = fVar203 + fVar31;
                pfVar58[2] = fVar203 + fVar32;
                pfVar58[3] = fVar203 + fVar33;
                lVar60 = lVar60 + 0x10;
                iVar72 = iVar72 + -1;
              } while (iVar72 != 0);
              return 0;
            }
            return 0;
          }
          return -100;
        }
        if (iVar59 != 3) {
          return 0;
        }
        Mat::create(this_00,uVar65,uVar5,uVar6,sVar11,uVar66,opt->blob_allocator);
        if (this_00->data == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep == 0) {
          return -100;
        }
        if (0 < (int)local_138) {
          fVar203 = *pMVar9->data;
          uVar47 = 0;
          do {
            if (0 < iVar72) {
              sVar71 = this_00->cstep;
              sVar11 = this_00->elemsize;
              pvVar12 = this_00->data;
              sVar13 = pMVar9[1].cstep;
              sVar14 = pMVar9[1].elemsize;
              pvVar56 = pMVar9[1].data;
              lVar60 = 0;
              iVar45 = iVar72;
              do {
                pfVar57 = (float *)((long)pvVar56 + lVar60 + sVar13 * sVar14 * uVar47);
                auVar209._0_4_ = fVar203 + *pfVar57;
                auVar209._4_4_ = fVar203 + pfVar57[1];
                auVar209._8_4_ = fVar203 + pfVar57[2];
                auVar209._12_4_ = fVar203 + pfVar57[3];
                *(undefined1 (*) [16])((long)pvVar12 + lVar60 + sVar71 * sVar11 * uVar47) = auVar209
                ;
                lVar60 = lVar60 + 0x10;
                iVar45 = iVar45 + -1;
              } while (iVar45 != 0);
            }
            uVar47 = uVar47 + 1;
          } while (uVar47 != local_138);
          return 0;
        }
        return 0;
      }
      uVar7 = pMVar9->h;
      local_130 = (void *)CONCAT44(local_130._4_4_,uVar7 * uVar64);
      if (iVar59 == 2) {
        if (pMVar9[1].dims == 3) {
          Mat::create(this_00,uVar65,uVar5,uVar6,sVar11,uVar66,opt->blob_allocator);
          if (this_00->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep != 0) {
            if (0 < (int)local_138) {
              uVar47 = 0;
              do {
                if (0 < (int)uVar5) {
                  pauVar50 = (undefined1 (*) [16])
                             (this_00->cstep * uVar47 * this_00->elemsize + (long)this_00->data);
                  pfVar57 = (float *)(pMVar9[1].cstep * uVar47 * pMVar9[1].elemsize +
                                     (long)pMVar9[1].data);
                  pauVar55 = (undefined1 (*) [16])
                             ((long)pMVar9->w * uVar47 * pMVar9->elemsize + (long)pMVar9->data);
                  uVar66 = 0;
                  do {
                    if (0 < (int)uVar65) {
                      auVar106 = *pauVar55;
                      uVar64 = uVar65;
                      do {
                        auVar208._0_4_ = auVar106._0_4_ + *pfVar57;
                        auVar208._4_4_ = auVar106._4_4_ + pfVar57[1];
                        auVar208._8_4_ = auVar106._8_4_ + pfVar57[2];
                        auVar208._12_4_ = auVar106._12_4_ + pfVar57[3];
                        *pauVar50 = auVar208;
                        pfVar57 = pfVar57 + 4;
                        pauVar50 = pauVar50 + 1;
                        uVar64 = uVar64 - 1;
                      } while (uVar64 != 0);
                    }
                    pauVar55 = pauVar55 + 1;
                    uVar66 = uVar66 + 1;
                  } while (uVar66 != uVar5);
                }
                uVar47 = uVar47 + 1;
              } while (uVar47 != local_138);
              return 0;
            }
            return 0;
          }
          return -100;
        }
        local_128 = CONCAT44(uVar4,uVar66);
        Mat::create(this_00,uVar64,uVar7,sVar71,iVar45,opt->blob_allocator);
        pvVar12 = this_00->data;
        if (pvVar12 == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep == 0) {
          return -100;
        }
        if (pMVar9[1].dims != 1) {
          if (pMVar9[1].dims != 2) {
            return 0;
          }
          if (0 < (int)local_130) {
            pvVar56 = pMVar9->data;
            pvVar63 = pMVar9[1].data;
            lVar60 = 0;
            do {
              pfVar57 = (float *)((long)pvVar63 + lVar60);
              fVar203 = pfVar57[1];
              fVar31 = pfVar57[2];
              fVar32 = pfVar57[3];
              pfVar58 = (float *)((long)pvVar56 + lVar60);
              fVar33 = pfVar58[1];
              fVar34 = pfVar58[2];
              fVar35 = pfVar58[3];
              pfVar2 = (float *)((long)pvVar12 + lVar60);
              *pfVar2 = *pfVar57 + *pfVar58;
              pfVar2[1] = fVar203 + fVar33;
              pfVar2[2] = fVar31 + fVar34;
              pfVar2[3] = fVar32 + fVar35;
              lVar60 = lVar60 + 0x10;
              local_130._0_4_ = (int)local_130 + -1;
            } while ((int)local_130 != 0);
            return 0;
          }
          return 0;
        }
        Mat::create(this_00,uVar64,uVar7,sVar71,iVar45,opt->blob_allocator);
        pauVar50 = (undefined1 (*) [16])this_00->data;
        if (pauVar50 == (undefined1 (*) [16])0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep != 0) {
          if ((int)local_128 != 1 || pMVar9[1].w != 1) {
            if (0 < (int)uVar7) {
              pfVar57 = (float *)pMVar9->data;
              pauVar55 = (undefined1 (*) [16])pMVar9[1].data;
              uVar66 = 0;
              do {
                if (0 < (int)uVar64) {
                  auVar106 = *pauVar55;
                  uVar46 = uVar47;
                  do {
                    auVar232._0_4_ = auVar106._0_4_ + *pfVar57;
                    auVar232._4_4_ = auVar106._4_4_ + pfVar57[1];
                    auVar232._8_4_ = auVar106._8_4_ + pfVar57[2];
                    auVar232._12_4_ = auVar106._12_4_ + pfVar57[3];
                    *pauVar50 = auVar232;
                    pfVar57 = pfVar57 + 4;
                    pauVar50 = pauVar50 + 1;
                    uVar65 = (int)uVar46 - 1;
                    uVar46 = (ulong)uVar65;
                  } while (uVar65 != 0);
                }
                pauVar55 = pauVar55 + 1;
                uVar66 = uVar66 + 1;
              } while (uVar66 != uVar7);
              return 0;
            }
            return 0;
          }
          if (0 < (int)local_130) {
            fVar203 = *pMVar1->data;
            pvVar12 = pMVar9->data;
            lVar60 = 0;
            do {
              pfVar57 = (float *)((long)pvVar12 + lVar60);
              fVar31 = pfVar57[1];
              fVar32 = pfVar57[2];
              fVar33 = pfVar57[3];
              pfVar58 = (float *)((long)*pauVar50 + lVar60);
              *pfVar58 = fVar203 + *pfVar57;
              pfVar58[1] = fVar203 + fVar31;
              pfVar58[2] = fVar203 + fVar32;
              pfVar58[3] = fVar203 + fVar33;
              lVar60 = lVar60 + 0x10;
              local_130._0_4_ = (int)local_130 + -1;
            } while ((int)local_130 != 0);
            return 0;
          }
          return 0;
        }
        return -100;
      }
      if (iVar59 != 3) {
        return 0;
      }
      uVar8 = pMVar9->c;
      uVar46 = (ulong)uVar8;
      local_110 = sVar71;
      if (pMVar9[1].dims != 3) {
        Mat::create(this_00,uVar64,uVar7,uVar8,sVar71,iVar45,opt->blob_allocator);
        if (this_00->data == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep == 0) {
          return -100;
        }
        if (pMVar9[1].dims == 1) {
          if (uVar66 != 1 || pMVar9[1].w != 1) {
            if (0 < (int)uVar8) {
              uVar47 = 0;
              do {
                if (0 < (int)local_130) {
                  sVar71 = this_00->cstep;
                  sVar11 = this_00->elemsize;
                  auVar106 = *(undefined1 (*) [16])((long)pMVar1->data + uVar47 * 0x10);
                  pvVar12 = this_00->data;
                  sVar13 = pMVar9->cstep;
                  sVar14 = pMVar9->elemsize;
                  pvVar56 = pMVar9->data;
                  lVar60 = 0;
                  iVar45 = (int)local_130;
                  do {
                    pfVar57 = (float *)((long)pvVar56 + lVar60 + sVar13 * sVar14 * uVar47);
                    auVar227._0_4_ = auVar106._0_4_ + *pfVar57;
                    auVar227._4_4_ = auVar106._4_4_ + pfVar57[1];
                    auVar227._8_4_ = auVar106._8_4_ + pfVar57[2];
                    auVar227._12_4_ = auVar106._12_4_ + pfVar57[3];
                    *(undefined1 (*) [16])((long)pvVar12 + lVar60 + sVar71 * sVar11 * uVar47) =
                         auVar227;
                    lVar60 = lVar60 + 0x10;
                    iVar45 = iVar45 + -1;
                  } while (iVar45 != 0);
                }
                uVar47 = uVar47 + 1;
              } while (uVar47 != uVar46);
              return 0;
            }
            return 0;
          }
          if (0 < (int)uVar8) {
            fVar203 = *pMVar1->data;
            uVar47 = 0;
            do {
              if (0 < (int)local_130) {
                sVar71 = this_00->cstep;
                sVar11 = this_00->elemsize;
                pvVar12 = this_00->data;
                sVar13 = pMVar9->cstep;
                sVar14 = pMVar9->elemsize;
                pvVar56 = pMVar9->data;
                lVar60 = 0;
                iVar45 = (int)local_130;
                do {
                  pfVar57 = (float *)((long)pvVar56 + lVar60 + sVar13 * sVar14 * uVar47);
                  auVar223._0_4_ = fVar203 + *pfVar57;
                  auVar223._4_4_ = fVar203 + pfVar57[1];
                  auVar223._8_4_ = fVar203 + pfVar57[2];
                  auVar223._12_4_ = fVar203 + pfVar57[3];
                  *(undefined1 (*) [16])((long)pvVar12 + lVar60 + sVar71 * sVar11 * uVar47) =
                       auVar223;
                  lVar60 = lVar60 + 0x10;
                  iVar45 = iVar45 + -1;
                } while (iVar45 != 0);
              }
              uVar47 = uVar47 + 1;
            } while (uVar47 != uVar46);
            return 0;
          }
          return 0;
        }
        if (pMVar9[1].dims != 2) {
          return 0;
        }
        if (0 < (int)uVar8) {
          uVar48 = 0;
          do {
            if (0 < (int)uVar7) {
              pauVar50 = (undefined1 (*) [16])
                         (this_00->cstep * uVar48 * this_00->elemsize + (long)this_00->data);
              pauVar55 = (undefined1 (*) [16])
                         ((long)pMVar9[1].w * uVar48 * pMVar9[1].elemsize + (long)pMVar9[1].data);
              pfVar57 = (float *)(pMVar9->cstep * uVar48 * pMVar9->elemsize + (long)pMVar9->data);
              uVar66 = 0;
              do {
                if (0 < (int)uVar64) {
                  auVar106 = *pauVar55;
                  uVar62 = uVar47;
                  do {
                    auVar214._0_4_ = auVar106._0_4_ + *pfVar57;
                    auVar214._4_4_ = auVar106._4_4_ + pfVar57[1];
                    auVar214._8_4_ = auVar106._8_4_ + pfVar57[2];
                    auVar214._12_4_ = auVar106._12_4_ + pfVar57[3];
                    *pauVar50 = auVar214;
                    pfVar57 = pfVar57 + 4;
                    pauVar50 = pauVar50 + 1;
                    uVar65 = (int)uVar62 - 1;
                    uVar62 = (ulong)uVar65;
                  } while (uVar65 != 0);
                }
                pauVar55 = pauVar55 + 1;
                uVar66 = uVar66 + 1;
              } while (uVar66 != uVar7);
            }
            uVar48 = uVar48 + 1;
          } while (uVar48 != uVar46);
          return 0;
        }
        return 0;
      }
      if (uVar8 == uVar6 && ((uVar65 ^ 1) == 0 && (uVar5 ^ 1) == 0)) {
        Mat::create(this_00,uVar64,uVar7,uVar8,sVar71,iVar45,opt->blob_allocator);
        if (this_00->data == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep != 0) {
          if (0 < (int)uVar8) {
            uVar47 = 0;
            do {
              if (0 < (int)local_130) {
                sVar71 = pMVar9->cstep;
                sVar11 = pMVar9->elemsize;
                auVar106 = *(undefined1 (*) [16])
                            ((long)pMVar9[1].data + pMVar9[1].cstep * uVar47 * pMVar9[1].elemsize);
                pvVar12 = pMVar9->data;
                sVar13 = this_00->cstep;
                sVar14 = this_00->elemsize;
                pvVar56 = this_00->data;
                lVar60 = 0;
                iVar45 = (int)local_130;
                do {
                  pfVar57 = (float *)((long)pvVar12 + lVar60 + sVar71 * sVar11 * uVar47);
                  auVar204._0_4_ = auVar106._0_4_ + *pfVar57;
                  auVar204._4_4_ = auVar106._4_4_ + pfVar57[1];
                  auVar204._8_4_ = auVar106._8_4_ + pfVar57[2];
                  auVar204._12_4_ = auVar106._12_4_ + pfVar57[3];
                  *(undefined1 (*) [16])((long)pvVar56 + lVar60 + sVar13 * sVar14 * uVar47) =
                       auVar204;
                  lVar60 = lVar60 + 0x10;
                  iVar45 = iVar45 + -1;
                } while (iVar45 != 0);
              }
              uVar47 = uVar47 + 1;
            } while (uVar47 != uVar46);
            return 0;
          }
          return 0;
        }
        return -100;
      }
      if (uVar65 == uVar64) {
        if (uVar66 == 1 && (uVar6 == 1 && uVar5 == uVar7)) {
          Mat::create(this_00,uVar64,uVar7,uVar8,sVar71,iVar45,opt->blob_allocator);
          if (this_00->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep != 0) {
            if (0 < (int)uVar8) {
              uVar47 = 0;
              do {
                if (0 < (int)local_130) {
                  sVar71 = pMVar9->cstep;
                  sVar11 = pMVar9->elemsize;
                  sVar13 = this_00->cstep;
                  pvVar12 = pMVar9->data;
                  pvVar56 = pMVar9[1].data;
                  sVar14 = this_00->elemsize;
                  pvVar63 = this_00->data;
                  lVar60 = 0;
                  iVar45 = (int)local_130;
                  do {
                    fVar203 = *(float *)((long)pvVar56 + lVar60);
                    pfVar57 = (float *)((long)pvVar12 + lVar60 * 4 + sVar71 * sVar11 * uVar47);
                    auVar87._0_4_ = fVar203 + *pfVar57;
                    auVar87._4_4_ = fVar203 + pfVar57[1];
                    auVar87._8_4_ = fVar203 + pfVar57[2];
                    auVar87._12_4_ = fVar203 + pfVar57[3];
                    *(undefined1 (*) [16])((long)pvVar63 + lVar60 * 4 + sVar13 * sVar14 * uVar47) =
                         auVar87;
                    lVar60 = lVar60 + 4;
                    iVar45 = iVar45 + -1;
                  } while (iVar45 != 0);
                }
                uVar47 = uVar47 + 1;
              } while (uVar47 != uVar46);
              return 0;
            }
            return 0;
          }
          return -100;
        }
        local_104 = CONCAT31(local_104._1_3_,uVar7 == 1);
        if ((uVar64 != 1 || uVar7 != 1) || uVar6 != uVar8) {
          if (((iVar45 == 1) && (uVar5 == uVar7)) && (uVar8 == 1)) {
            local_128 = uVar46;
            Mat::create(this_00,uVar64,uVar7,uVar6,sVar11,uVar66,opt->blob_allocator);
            if (this_00->data == (void *)0x0) {
              return -100;
            }
            if ((long)this_00->c * this_00->cstep != 0) {
              if (0 < (int)local_138) {
                uVar47 = 0;
                do {
                  if (0 < iVar72) {
                    sVar71 = pMVar9[1].cstep;
                    sVar11 = pMVar9[1].elemsize;
                    sVar13 = this_00->cstep;
                    pvVar12 = pMVar9[1].data;
                    pvVar56 = pMVar9->data;
                    sVar14 = this_00->elemsize;
                    pvVar63 = this_00->data;
                    lVar60 = 0;
                    iVar45 = iVar72;
                    do {
                      fVar203 = *(float *)((long)pvVar56 + lVar60);
                      pfVar57 = (float *)((long)pvVar12 + lVar60 * 4 + sVar71 * sVar11 * uVar47);
                      auVar125._0_4_ = fVar203 + *pfVar57;
                      auVar125._4_4_ = fVar203 + pfVar57[1];
                      auVar125._8_4_ = fVar203 + pfVar57[2];
                      auVar125._12_4_ = fVar203 + pfVar57[3];
                      *(undefined1 (*) [16])((long)pvVar63 + lVar60 * 4 + sVar13 * sVar14 * uVar47)
                           = auVar125;
                      lVar60 = lVar60 + 4;
                      iVar45 = iVar45 + -1;
                    } while (iVar45 != 0);
                  }
                  uVar47 = uVar47 + 1;
                } while (uVar47 != local_138);
                return 0;
              }
              return 0;
            }
            return -100;
          }
LAB_00248a78:
          if ((((uVar65 ^ 1) == 0 && uVar5 == uVar7) && uVar8 == uVar6) && uVar64 != 1) {
            local_128 = uVar46;
            Mat::create(this_00,uVar64,uVar7,uVar8,sVar71,iVar45,opt->blob_allocator);
            if (this_00->data == (void *)0x0) {
              return -100;
            }
            if ((long)this_00->c * this_00->cstep != 0) {
              if (0 < (int)uVar8) {
                uVar48 = 0;
                do {
                  if (0 < (int)uVar7) {
                    sVar71 = pMVar9[1].cstep;
                    sVar11 = pMVar9[1].elemsize;
                    pvVar12 = pMVar9[1].data;
                    pauVar50 = (undefined1 (*) [16])
                               (this_00->cstep * uVar48 * this_00->elemsize + (long)this_00->data);
                    pfVar57 = (float *)(pMVar9->cstep * uVar48 * pMVar9->elemsize +
                                       (long)pMVar9->data);
                    uVar62 = 0;
                    do {
                      if (0 < (int)uVar64) {
                        auVar106 = *(undefined1 (*) [16])
                                    ((long)pvVar12 + uVar62 * 0x10 + sVar71 * uVar48 * sVar11);
                        uVar67 = uVar47;
                        do {
                          auVar220._0_4_ = auVar106._0_4_ + *pfVar57;
                          auVar220._4_4_ = auVar106._4_4_ + pfVar57[1];
                          auVar220._8_4_ = auVar106._8_4_ + pfVar57[2];
                          auVar220._12_4_ = auVar106._12_4_ + pfVar57[3];
                          *pauVar50 = auVar220;
                          pfVar57 = pfVar57 + 4;
                          pauVar50 = pauVar50 + 1;
                          uVar66 = (int)uVar67 - 1;
                          uVar67 = (ulong)uVar66;
                        } while (uVar66 != 0);
                      }
                      uVar62 = uVar62 + 1;
                    } while (uVar62 != uVar7);
                  }
                  uVar48 = uVar48 + 1;
                } while (uVar48 != uVar46);
                return 0;
              }
              return 0;
            }
            return -100;
          }
          if (((uVar65 == uVar64 && (uVar5 ^ 1) == 0) && uVar8 == uVar6) && uVar7 != 1) {
            local_128 = uVar46;
            Mat::create(this_00,uVar64,uVar7,uVar8,sVar71,iVar45,opt->blob_allocator);
            if (this_00->data == (void *)0x0) {
              return -100;
            }
            if ((long)this_00->c * this_00->cstep != 0) {
              if (0 < (int)uVar8) {
                uVar48 = 0;
                do {
                  if (0 < (int)uVar7) {
                    sVar71 = pMVar9[1].elemsize;
                    pvVar56 = (void *)(this_00->cstep * uVar48 * this_00->elemsize +
                                      (long)this_00->data);
                    pvVar63 = (void *)(pMVar9->cstep * uVar48 * pMVar9->elemsize +
                                      (long)pMVar9->data);
                    sVar11 = pMVar9[1].cstep;
                    pvVar12 = pMVar9[1].data;
                    uVar66 = 0;
                    do {
                      if (0 < (int)uVar64) {
                        lVar60 = 0;
                        do {
                          pfVar57 = (float *)((long)pvVar12 + lVar60 + sVar71 * sVar11 * uVar48);
                          pfVar58 = (float *)((long)pvVar63 + lVar60);
                          auVar119._0_4_ = *pfVar57 + *pfVar58;
                          auVar119._4_4_ = pfVar57[1] + pfVar58[1];
                          auVar119._8_4_ = pfVar57[2] + pfVar58[2];
                          auVar119._12_4_ = pfVar57[3] + pfVar58[3];
                          *(undefined1 (*) [16])((long)pvVar56 + lVar60) = auVar119;
                          lVar60 = lVar60 + 0x10;
                        } while (uVar47 << 4 != lVar60);
                        pvVar56 = (void *)((long)pvVar56 + lVar60);
                        pvVar63 = (void *)((long)pvVar63 + lVar60);
                      }
                      uVar66 = uVar66 + 1;
                    } while (uVar66 != uVar7);
                  }
                  uVar48 = uVar48 + 1;
                } while (uVar48 != uVar46);
                return 0;
              }
              return 0;
            }
            return -100;
          }
          if ((uVar6 == uVar8 && uVar5 == uVar7) && (uVar65 != 1 && uVar64 == 1)) {
            local_128 = uVar46;
            Mat::create(this_00,uVar65,uVar7,uVar8,sVar11,uVar66,opt->blob_allocator);
            if (this_00->data == (void *)0x0) {
              return -100;
            }
            if ((long)this_00->c * this_00->cstep != 0) {
              if (0 < (int)uVar8) {
                uVar47 = 0;
                do {
                  if (0 < (int)uVar7) {
                    sVar71 = pMVar9->cstep;
                    sVar11 = pMVar9->elemsize;
                    pvVar12 = pMVar9->data;
                    pauVar50 = (undefined1 (*) [16])
                               (this_00->cstep * uVar47 * this_00->elemsize + (long)this_00->data);
                    pfVar57 = (float *)(pMVar9[1].cstep * uVar47 * pMVar9[1].elemsize +
                                       (long)pMVar9[1].data);
                    uVar48 = 0;
                    do {
                      if (0 < (int)uVar65) {
                        auVar106 = *(undefined1 (*) [16])
                                    ((long)pvVar12 + uVar48 * 0x10 + sVar71 * uVar47 * sVar11);
                        uVar66 = uVar65;
                        do {
                          auVar230._0_4_ = auVar106._0_4_ + *pfVar57;
                          auVar230._4_4_ = auVar106._4_4_ + pfVar57[1];
                          auVar230._8_4_ = auVar106._8_4_ + pfVar57[2];
                          auVar230._12_4_ = auVar106._12_4_ + pfVar57[3];
                          *pauVar50 = auVar230;
                          pfVar57 = pfVar57 + 4;
                          pauVar50 = pauVar50 + 1;
                          uVar66 = uVar66 - 1;
                        } while (uVar66 != 0);
                      }
                      uVar48 = uVar48 + 1;
                    } while (uVar48 != uVar7);
                  }
                  uVar47 = uVar47 + 1;
                } while (uVar47 != uVar46);
                return 0;
              }
              return 0;
            }
            return -100;
          }
          if (((byte)local_104 & uVar6 == uVar8 & (uVar5 != 1 && uVar65 == uVar64)) == 1) {
            local_128 = uVar46;
            Mat::create(this_00,uVar64,uVar5,uVar8,sVar11,uVar66,opt->blob_allocator);
            if (this_00->data == (void *)0x0) {
              return -100;
            }
            if ((long)local_120->c * local_120->cstep != 0) {
              if (0 < (int)local_128) {
                local_158 = (__m256 *)0x0;
                do {
                  pMVar1 = local_a0;
                  afVar185 = _local_100;
                  bVar74 = local_a0->dims == 3;
                  local_c8 = 1;
                  if (!bVar74) {
                    local_c8 = local_a0->d;
                  }
                  local_d4 = local_a0->w;
                  local_d0 = local_a0->h;
                  sVar71 = local_a0->cstep;
                  pvVar12 = local_a0->data;
                  local_130 = (void *)local_a0->elemsize;
                  local_e0 = local_a0->allocator;
                  _fStack_f8 = 0;
                  local_100 = (undefined1  [8])
                              (sVar71 * (long)local_158 * (long)local_130 + (long)pvVar12);
                  uStack_f0 = local_130;
                  fStack_e4 = afVar185[7];
                  fStack_e8 = (float)local_a0->elempack;
                  local_d8 = bVar74 ^ 3;
                  local_c0 = (long)local_d0 * (long)local_d4;
                  local_cc = 1;
                  Mat::~Mat((Mat *)local_100);
                  bVar74 = pMVar1[1].dims == 3;
                  local_c8 = 1;
                  if (!bVar74) {
                    local_c8 = pMVar1[1].d;
                  }
                  local_d4 = pMVar1[1].w;
                  local_d0 = pMVar1[1].h;
                  pvVar56 = (void *)(pMVar1[1].cstep * (long)local_158 * pMVar1[1].elemsize +
                                    (long)pMVar1[1].data);
                  local_d8 = bVar74 ^ 3;
                  local_e0 = pMVar1[1].allocator;
                  _fStack_f8 = 0;
                  local_100 = (undefined1  [8])pvVar56;
                  uStack_f0 = pMVar1[1].elemsize;
                  fStack_e8 = (float)pMVar1[1].elempack;
                  local_c0 = (long)local_d0 * (long)local_d4;
                  local_cc = 1;
                  Mat::~Mat((Mat *)local_100);
                  bVar74 = local_120->dims == 3;
                  local_d4 = local_120->w;
                  local_d0 = local_120->h;
                  local_c8 = 1;
                  if (!bVar74) {
                    local_c8 = local_120->d;
                  }
                  sVar11 = local_120->elemsize;
                  pvVar63 = (void *)(local_120->cstep * (long)local_158 * sVar11 +
                                    (long)local_120->data);
                  local_d8 = bVar74 ^ 3;
                  local_e0 = local_120->allocator;
                  fStack_f8 = 0.0;
                  fStack_f4 = 0.0;
                  local_100 = (undefined1  [8])pvVar63;
                  uStack_f0._0_4_ = (float)(int)sVar11;
                  uStack_f0._4_4_ = (float)(int)(sVar11 >> 0x20);
                  fStack_e8 = (float)local_120->elempack;
                  local_c0 = (long)local_d0 * (long)local_d4;
                  local_cc = 1;
                  Mat::~Mat((Mat *)local_100);
                  if (0 < (int)uVar5) {
                    uVar66 = 0;
                    do {
                      if (0 < (int)uVar64) {
                        lVar60 = 0;
                        do {
                          pfVar57 = (float *)((long)pvVar56 + lVar60);
                          pfVar58 = (float *)((long)pvVar12 +
                                             lVar60 + sVar71 * (long)local_130 * (long)local_158);
                          auVar131._0_4_ = *pfVar57 + *pfVar58;
                          auVar131._4_4_ = pfVar57[1] + pfVar58[1];
                          auVar131._8_4_ = pfVar57[2] + pfVar58[2];
                          auVar131._12_4_ = pfVar57[3] + pfVar58[3];
                          *(undefined1 (*) [16])((long)pvVar63 + lVar60) = auVar131;
                          lVar60 = lVar60 + 0x10;
                        } while (uVar47 << 4 != lVar60);
                        pvVar63 = (void *)((long)pvVar63 + lVar60);
                        pvVar56 = (void *)((long)pvVar56 + lVar60);
                      }
                      uVar66 = uVar66 + 1;
                    } while (uVar66 != uVar5);
                  }
                  local_158 = (__m256 *)((long)local_158 + 1);
                } while (local_158 != (__m256 *)local_128);
                return 0;
              }
              return 0;
            }
            return -100;
          }
          local_128 = uVar46;
          Mat::create(this_00,uVar64,uVar7,uVar8,sVar71,iVar45,opt->blob_allocator);
          if (this_00->data == (void *)0x0) {
            return -100;
          }
          if ((long)local_120->c * local_120->cstep != 0) {
            if (0 < (int)local_128) {
              local_158 = (__m256 *)0x0;
              do {
                pMVar1 = local_a0;
                afVar185 = _local_100;
                bVar74 = local_a0->dims == 3;
                local_c8 = 1;
                if (!bVar74) {
                  local_c8 = local_a0->d;
                }
                local_d4 = local_a0->w;
                local_d0 = local_a0->h;
                sVar71 = local_a0->cstep;
                pvVar12 = local_a0->data;
                sVar11 = local_a0->elemsize;
                local_e0 = local_a0->allocator;
                _fStack_f8 = 0;
                local_100 = (undefined1  [8])(sVar71 * (long)local_158 * sVar11 + (long)pvVar12);
                uStack_f0 = sVar11;
                fStack_e4 = afVar185[7];
                fStack_e8 = (float)local_a0->elempack;
                local_d8 = bVar74 ^ 3;
                local_c0 = (long)local_d0 * (long)local_d4;
                local_cc = 1;
                Mat::~Mat((Mat *)local_100);
                bVar74 = pMVar1[1].dims == 3;
                local_c8 = 1;
                if (!bVar74) {
                  local_c8 = pMVar1[1].d;
                }
                local_d4 = pMVar1[1].w;
                local_d0 = pMVar1[1].h;
                local_138 = pMVar1[1].cstep;
                pvVar56 = pMVar1[1].data;
                local_110 = pMVar1[1].elemsize;
                local_e0 = pMVar1[1].allocator;
                _fStack_f8 = 0;
                local_100 = (undefined1  [8])
                            (local_138 * (long)local_158 * local_110 + (long)pvVar56);
                uStack_f0 = local_110;
                fStack_e8 = (float)pMVar1[1].elempack;
                local_d8 = bVar74 ^ 3;
                local_c0 = (long)local_d0 * (long)local_d4;
                local_cc = 1;
                Mat::~Mat((Mat *)local_100);
                bVar74 = local_120->dims == 3;
                local_d4 = local_120->w;
                local_d0 = local_120->h;
                local_c8 = 1;
                if (!bVar74) {
                  local_c8 = local_120->d;
                }
                sVar13 = local_120->cstep;
                pvVar63 = local_120->data;
                sVar14 = local_120->elemsize;
                local_e0 = local_120->allocator;
                fStack_f8 = 0.0;
                fStack_f4 = 0.0;
                local_100 = (undefined1  [8])(sVar13 * (long)local_158 * sVar14 + (long)pvVar63);
                uStack_f0._0_4_ = (float)(int)sVar14;
                uStack_f0._4_4_ = (float)(int)(sVar14 >> 0x20);
                fStack_e8 = (float)local_120->elempack;
                local_d8 = bVar74 ^ 3;
                local_c0 = (long)local_d0 * (long)local_d4;
                local_cc = 1;
                Mat::~Mat((Mat *)local_100);
                if (0 < (int)local_130) {
                  lVar60 = 0;
                  iVar45 = (int)local_130;
                  do {
                    pfVar57 = (float *)((long)pvVar56 +
                                       lVar60 + local_138 * local_110 * (long)local_158);
                    pfVar58 = (float *)((long)pvVar12 + lVar60 + sVar71 * sVar11 * (long)local_158);
                    auVar133._0_4_ = *pfVar57 + *pfVar58;
                    auVar133._4_4_ = pfVar57[1] + pfVar58[1];
                    auVar133._8_4_ = pfVar57[2] + pfVar58[2];
                    auVar133._12_4_ = pfVar57[3] + pfVar58[3];
                    *(undefined1 (*) [16])
                     ((long)pvVar63 + lVar60 + sVar13 * sVar14 * (long)local_158) = auVar133;
                    lVar60 = lVar60 + 0x10;
                    iVar45 = iVar45 + -1;
                  } while (iVar45 != 0);
                }
                local_158 = (__m256 *)((long)local_158 + 1);
              } while (local_158 != (__m256 *)local_128);
              return 0;
            }
            return 0;
          }
          return -100;
        }
      }
      else {
        local_104 = CONCAT31(local_104._1_3_,uVar7 == 1);
        local_128 = uVar46;
        if ((uVar64 != 1 || uVar7 != 1) || uVar6 != uVar8) goto LAB_00248a78;
      }
      Mat::create(this_00,uVar65,uVar5,uVar6,sVar11,uVar66,opt->blob_allocator);
      if (this_00->data == (void *)0x0) {
        return -100;
      }
      if ((long)this_00->c * this_00->cstep != 0) {
        if (0 < (int)local_138) {
          uVar47 = 0;
          do {
            if (0 < iVar72) {
              sVar71 = this_00->cstep;
              sVar11 = this_00->elemsize;
              auVar106 = *(undefined1 (*) [16])
                          ((long)pMVar9->data + pMVar9->cstep * uVar47 * pMVar9->elemsize);
              pvVar12 = this_00->data;
              sVar13 = pMVar9[1].cstep;
              sVar14 = pMVar9[1].elemsize;
              pvVar56 = pMVar9[1].data;
              lVar60 = 0;
              iVar45 = iVar72;
              do {
                pfVar57 = (float *)((long)pvVar56 + lVar60 + sVar13 * sVar14 * uVar47);
                auVar225._0_4_ = auVar106._0_4_ + *pfVar57;
                auVar225._4_4_ = auVar106._4_4_ + pfVar57[1];
                auVar225._8_4_ = auVar106._8_4_ + pfVar57[2];
                auVar225._12_4_ = auVar106._12_4_ + pfVar57[3];
                *(undefined1 (*) [16])((long)pvVar12 + lVar60 + sVar71 * sVar11 * uVar47) = auVar225
                ;
                lVar60 = lVar60 + 0x10;
                iVar45 = iVar45 + -1;
              } while (iVar45 != 0);
            }
            uVar47 = uVar47 + 1;
          } while (uVar47 != local_138);
          return 0;
        }
        return 0;
      }
      return -100;
    case 1:
      uVar64 = pMVar9->w;
      uVar47 = (ulong)uVar64;
      sVar71 = pMVar9->elemsize;
      uVar65 = pMVar9[1].w;
      uVar5 = pMVar9[1].h;
      uVar6 = pMVar9[1].c;
      local_138 = (ulong)uVar6;
      iVar72 = uVar5 * uVar65;
      sVar11 = pMVar9[1].elemsize;
      iVar59 = pMVar9->dims;
      if (iVar59 == 1) {
        iVar59 = pMVar9[1].dims;
        if (iVar45 != 1 || uVar64 != 1) {
          if (iVar59 == 1) {
            Mat::create(this_00,uVar64,sVar71,iVar45,opt->blob_allocator);
            pvVar12 = this_00->data;
            if (pvVar12 == (void *)0x0) {
              return -100;
            }
            if ((long)this_00->c * this_00->cstep == 0) {
              return -100;
            }
            if (uVar66 != 1 || pMVar9[1].w != 1) {
              if (0 < (int)uVar64) {
                pvVar56 = pMVar9->data;
                pvVar63 = pMVar9[1].data;
                lVar60 = 0;
                do {
                  auVar106 = vsubps_avx(*(undefined1 (*) [16])((long)pvVar56 + lVar60),
                                        *(undefined1 (*) [16])((long)pvVar63 + lVar60));
                  *(undefined1 (*) [16])((long)pvVar12 + lVar60) = auVar106;
                  lVar60 = lVar60 + 0x10;
                  uVar66 = (int)uVar47 - 1;
                  uVar47 = (ulong)uVar66;
                } while (uVar66 != 0);
                return 0;
              }
              return 0;
            }
            if (0 < (int)uVar64) {
              uVar4 = *pMVar1->data;
              auVar100._4_4_ = uVar4;
              auVar100._0_4_ = uVar4;
              auVar100._8_4_ = uVar4;
              auVar100._12_4_ = uVar4;
              pvVar56 = pMVar9->data;
              lVar60 = 0;
              do {
                auVar106 = vsubps_avx(*(undefined1 (*) [16])((long)pvVar56 + lVar60),auVar100);
                *(undefined1 (*) [16])((long)pvVar12 + lVar60) = auVar106;
                lVar60 = lVar60 + 0x10;
                uVar66 = (int)uVar47 - 1;
                uVar47 = (ulong)uVar66;
              } while (uVar66 != 0);
              return 0;
            }
            return 0;
          }
          if (iVar59 == 2) {
            Mat::create(this_00,uVar65,uVar5,sVar11,uVar66,opt->blob_allocator);
            pauVar50 = (undefined1 (*) [16])this_00->data;
            if (pauVar50 == (undefined1 (*) [16])0x0) {
              return -100;
            }
            if ((long)this_00->c * this_00->cstep != 0) {
              if (0 < (int)uVar5) {
                pauVar55 = (undefined1 (*) [16])pMVar9->data;
                pauVar53 = (undefined1 (*) [16])pMVar9[1].data;
                uVar66 = 0;
                do {
                  if (0 < (int)uVar65) {
                    auVar106 = *pauVar55;
                    uVar64 = uVar65;
                    do {
                      auVar103 = vsubps_avx(auVar106,*pauVar53);
                      *pauVar50 = auVar103;
                      pauVar53 = pauVar53 + 1;
                      pauVar50 = pauVar50 + 1;
                      uVar64 = uVar64 - 1;
                    } while (uVar64 != 0);
                  }
                  pauVar55 = pauVar55 + 1;
                  uVar66 = uVar66 + 1;
                } while (uVar66 != uVar5);
                return 0;
              }
              return 0;
            }
            return -100;
          }
          if (iVar59 != 3) {
            return 0;
          }
          Mat::create(this_00,uVar65,uVar5,uVar6,sVar11,uVar66,opt->blob_allocator);
          if (this_00->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep == 0) {
            return -100;
          }
          if (0 < (int)local_138) {
            uVar47 = 0;
            do {
              if (0 < iVar72) {
                sVar71 = this_00->cstep;
                sVar11 = this_00->elemsize;
                auVar106 = *(undefined1 (*) [16])((long)pMVar9->data + uVar47 * 0x10);
                pvVar12 = this_00->data;
                sVar13 = pMVar9[1].cstep;
                sVar14 = pMVar9[1].elemsize;
                pvVar56 = pMVar9[1].data;
                lVar60 = 0;
                iVar45 = iVar72;
                do {
                  auVar103 = vsubps_avx(auVar106,*(undefined1 (*) [16])
                                                  ((long)pvVar56 + lVar60 + sVar13 * sVar14 * uVar47
                                                  ));
                  *(undefined1 (*) [16])((long)pvVar12 + lVar60 + sVar71 * sVar11 * uVar47) =
                       auVar103;
                  lVar60 = lVar60 + 0x10;
                  iVar45 = iVar45 + -1;
                } while (iVar45 != 0);
              }
              uVar47 = uVar47 + 1;
            } while (uVar47 != local_138);
            return 0;
          }
          return 0;
        }
        if (iVar59 == 1) {
          Mat::create(this_00,uVar65,sVar11,uVar66,opt->blob_allocator);
          pvVar12 = this_00->data;
          if (pvVar12 == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep != 0) {
            if (0 < (int)uVar65) {
              uVar4 = *pMVar9->data;
              auVar99._4_4_ = uVar4;
              auVar99._0_4_ = uVar4;
              auVar99._8_4_ = uVar4;
              auVar99._12_4_ = uVar4;
              pvVar56 = pMVar1->data;
              lVar60 = 0;
              do {
                auVar106 = vsubps_avx(auVar99,*(undefined1 (*) [16])((long)pvVar56 + lVar60));
                *(undefined1 (*) [16])((long)pvVar12 + lVar60) = auVar106;
                lVar60 = lVar60 + 0x10;
                uVar65 = uVar65 - 1;
              } while (uVar65 != 0);
              return 0;
            }
            return 0;
          }
          return -100;
        }
        if (iVar59 == 2) {
          Mat::create(this_00,uVar65,uVar5,sVar11,uVar66,opt->blob_allocator);
          pvVar12 = this_00->data;
          if (pvVar12 == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep != 0) {
            if (0 < iVar72) {
              uVar4 = *pMVar9->data;
              auVar95._4_4_ = uVar4;
              auVar95._0_4_ = uVar4;
              auVar95._8_4_ = uVar4;
              auVar95._12_4_ = uVar4;
              pvVar56 = pMVar1->data;
              lVar60 = 0;
              do {
                auVar106 = vsubps_avx(auVar95,*(undefined1 (*) [16])((long)pvVar56 + lVar60));
                *(undefined1 (*) [16])((long)pvVar12 + lVar60) = auVar106;
                lVar60 = lVar60 + 0x10;
                iVar72 = iVar72 + -1;
              } while (iVar72 != 0);
              return 0;
            }
            return 0;
          }
          return -100;
        }
        if (iVar59 != 3) {
          return 0;
        }
        Mat::create(this_00,uVar65,uVar5,uVar6,sVar11,uVar66,opt->blob_allocator);
        if (this_00->data == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep == 0) {
          return -100;
        }
        if (0 < (int)local_138) {
          uVar4 = *pMVar9->data;
          auVar79._4_4_ = uVar4;
          auVar79._0_4_ = uVar4;
          auVar79._8_4_ = uVar4;
          auVar79._12_4_ = uVar4;
          uVar47 = 0;
          do {
            if (0 < iVar72) {
              sVar71 = this_00->cstep;
              sVar11 = this_00->elemsize;
              pvVar12 = this_00->data;
              sVar13 = pMVar9[1].cstep;
              sVar14 = pMVar9[1].elemsize;
              pvVar56 = pMVar9[1].data;
              lVar60 = 0;
              iVar45 = iVar72;
              do {
                auVar106 = vsubps_avx(auVar79,*(undefined1 (*) [16])
                                               ((long)pvVar56 + lVar60 + sVar13 * sVar14 * uVar47));
                *(undefined1 (*) [16])((long)pvVar12 + lVar60 + sVar71 * sVar11 * uVar47) = auVar106
                ;
                lVar60 = lVar60 + 0x10;
                iVar45 = iVar45 + -1;
              } while (iVar45 != 0);
            }
            uVar47 = uVar47 + 1;
          } while (uVar47 != local_138);
          return 0;
        }
        return 0;
      }
      uVar7 = pMVar9->h;
      local_130 = (void *)CONCAT44(local_130._4_4_,uVar7 * uVar64);
      if (iVar59 == 2) {
        if (pMVar9[1].dims == 3) {
          Mat::create(this_00,uVar65,uVar5,uVar6,sVar11,uVar66,opt->blob_allocator);
          if (this_00->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep != 0) {
            if (0 < (int)local_138) {
              uVar47 = 0;
              do {
                if (0 < (int)uVar5) {
                  pauVar50 = (undefined1 (*) [16])
                             (this_00->cstep * uVar47 * this_00->elemsize + (long)this_00->data);
                  pauVar55 = (undefined1 (*) [16])
                             (pMVar9[1].cstep * uVar47 * pMVar9[1].elemsize + (long)pMVar9[1].data);
                  pauVar53 = (undefined1 (*) [16])
                             ((long)pMVar9->w * uVar47 * pMVar9->elemsize + (long)pMVar9->data);
                  uVar66 = 0;
                  do {
                    if (0 < (int)uVar65) {
                      auVar106 = *pauVar53;
                      uVar64 = uVar65;
                      do {
                        auVar103 = vsubps_avx(auVar106,*pauVar55);
                        *pauVar50 = auVar103;
                        pauVar55 = pauVar55 + 1;
                        pauVar50 = pauVar50 + 1;
                        uVar64 = uVar64 - 1;
                      } while (uVar64 != 0);
                    }
                    pauVar53 = pauVar53 + 1;
                    uVar66 = uVar66 + 1;
                  } while (uVar66 != uVar5);
                }
                uVar47 = uVar47 + 1;
              } while (uVar47 != local_138);
              return 0;
            }
            return 0;
          }
          return -100;
        }
        local_128 = CONCAT44(uVar4,uVar66);
        Mat::create(this_00,uVar64,uVar7,sVar71,iVar45,opt->blob_allocator);
        pvVar12 = this_00->data;
        if (pvVar12 == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep == 0) {
          return -100;
        }
        if (pMVar9[1].dims != 1) {
          if (pMVar9[1].dims != 2) {
            return 0;
          }
          if (0 < (int)local_130) {
            pvVar56 = pMVar9->data;
            pvVar63 = pMVar9[1].data;
            lVar60 = 0;
            do {
              auVar106 = vsubps_avx(*(undefined1 (*) [16])((long)pvVar56 + lVar60),
                                    *(undefined1 (*) [16])((long)pvVar63 + lVar60));
              *(undefined1 (*) [16])((long)pvVar12 + lVar60) = auVar106;
              lVar60 = lVar60 + 0x10;
              local_130._0_4_ = (int)local_130 + -1;
            } while ((int)local_130 != 0);
            return 0;
          }
          return 0;
        }
        Mat::create(this_00,uVar64,uVar7,sVar71,iVar45,opt->blob_allocator);
        pauVar50 = (undefined1 (*) [16])this_00->data;
        if (pauVar50 == (undefined1 (*) [16])0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep != 0) {
          if ((int)local_128 != 1 || pMVar9[1].w != 1) {
            if (0 < (int)uVar7) {
              pauVar55 = (undefined1 (*) [16])pMVar9->data;
              pauVar53 = (undefined1 (*) [16])pMVar9[1].data;
              uVar66 = 0;
              do {
                if (0 < (int)uVar64) {
                  auVar106 = *pauVar53;
                  uVar46 = uVar47;
                  do {
                    auVar103 = vsubps_avx(*pauVar55,auVar106);
                    *pauVar50 = auVar103;
                    pauVar55 = pauVar55 + 1;
                    pauVar50 = pauVar50 + 1;
                    uVar65 = (int)uVar46 - 1;
                    uVar46 = (ulong)uVar65;
                  } while (uVar65 != 0);
                }
                pauVar53 = pauVar53 + 1;
                uVar66 = uVar66 + 1;
              } while (uVar66 != uVar7);
              return 0;
            }
            return 0;
          }
          if (0 < (int)local_130) {
            uVar4 = *pMVar1->data;
            auVar110._4_4_ = uVar4;
            auVar110._0_4_ = uVar4;
            auVar110._8_4_ = uVar4;
            auVar110._12_4_ = uVar4;
            pvVar12 = pMVar9->data;
            lVar60 = 0;
            do {
              auVar106 = vsubps_avx(*(undefined1 (*) [16])((long)pvVar12 + lVar60),auVar110);
              *(undefined1 (*) [16])((long)*pauVar50 + lVar60) = auVar106;
              lVar60 = lVar60 + 0x10;
              local_130._0_4_ = (int)local_130 + -1;
            } while ((int)local_130 != 0);
            return 0;
          }
          return 0;
        }
        return -100;
      }
      if (iVar59 != 3) {
        return 0;
      }
      uVar8 = pMVar9->c;
      uVar46 = (ulong)uVar8;
      local_110 = sVar71;
      if (pMVar9[1].dims != 3) {
        Mat::create(this_00,uVar64,uVar7,uVar8,sVar71,iVar45,opt->blob_allocator);
        if (this_00->data == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep == 0) {
          return -100;
        }
        if (pMVar9[1].dims == 1) {
          if (uVar66 != 1 || pMVar9[1].w != 1) {
            if (0 < (int)uVar8) {
              uVar47 = 0;
              do {
                if (0 < (int)local_130) {
                  sVar71 = this_00->cstep;
                  sVar11 = this_00->elemsize;
                  auVar106 = *(undefined1 (*) [16])((long)pMVar1->data + uVar47 * 0x10);
                  pvVar12 = this_00->data;
                  sVar13 = pMVar9->cstep;
                  sVar14 = pMVar9->elemsize;
                  pvVar56 = pMVar9->data;
                  lVar60 = 0;
                  iVar45 = (int)local_130;
                  do {
                    auVar103 = vsubps_avx(*(undefined1 (*) [16])
                                           ((long)pvVar56 + lVar60 + sVar13 * sVar14 * uVar47),
                                          auVar106);
                    *(undefined1 (*) [16])((long)pvVar12 + lVar60 + sVar71 * sVar11 * uVar47) =
                         auVar103;
                    lVar60 = lVar60 + 0x10;
                    iVar45 = iVar45 + -1;
                  } while (iVar45 != 0);
                }
                uVar47 = uVar47 + 1;
              } while (uVar47 != uVar46);
              return 0;
            }
            return 0;
          }
          if (0 < (int)uVar8) {
            uVar4 = *pMVar1->data;
            auVar113._4_4_ = uVar4;
            auVar113._0_4_ = uVar4;
            auVar113._8_4_ = uVar4;
            auVar113._12_4_ = uVar4;
            uVar47 = 0;
            do {
              if (0 < (int)local_130) {
                sVar71 = this_00->cstep;
                sVar11 = this_00->elemsize;
                pvVar12 = this_00->data;
                sVar13 = pMVar9->cstep;
                sVar14 = pMVar9->elemsize;
                pvVar56 = pMVar9->data;
                lVar60 = 0;
                iVar45 = (int)local_130;
                do {
                  auVar106 = vsubps_avx(*(undefined1 (*) [16])
                                         ((long)pvVar56 + lVar60 + sVar13 * sVar14 * uVar47),
                                        auVar113);
                  *(undefined1 (*) [16])((long)pvVar12 + lVar60 + sVar71 * sVar11 * uVar47) =
                       auVar106;
                  lVar60 = lVar60 + 0x10;
                  iVar45 = iVar45 + -1;
                } while (iVar45 != 0);
              }
              uVar47 = uVar47 + 1;
            } while (uVar47 != uVar46);
            return 0;
          }
          return 0;
        }
        if (pMVar9[1].dims != 2) {
          return 0;
        }
        if (0 < (int)uVar8) {
          uVar48 = 0;
          do {
            if (0 < (int)uVar7) {
              pauVar50 = (undefined1 (*) [16])
                         (this_00->cstep * uVar48 * this_00->elemsize + (long)this_00->data);
              pauVar55 = (undefined1 (*) [16])
                         ((long)pMVar9[1].w * uVar48 * pMVar9[1].elemsize + (long)pMVar9[1].data);
              pauVar53 = (undefined1 (*) [16])
                         (pMVar9->cstep * uVar48 * pMVar9->elemsize + (long)pMVar9->data);
              uVar66 = 0;
              do {
                if (0 < (int)uVar64) {
                  auVar106 = *pauVar55;
                  uVar62 = uVar47;
                  do {
                    auVar103 = vsubps_avx(*pauVar53,auVar106);
                    *pauVar50 = auVar103;
                    pauVar53 = pauVar53 + 1;
                    pauVar50 = pauVar50 + 1;
                    uVar65 = (int)uVar62 - 1;
                    uVar62 = (ulong)uVar65;
                  } while (uVar65 != 0);
                }
                pauVar55 = pauVar55 + 1;
                uVar66 = uVar66 + 1;
              } while (uVar66 != uVar7);
            }
            uVar48 = uVar48 + 1;
          } while (uVar48 != uVar46);
          return 0;
        }
        return 0;
      }
      if (uVar8 == uVar6 && ((uVar65 ^ 1) == 0 && (uVar5 ^ 1) == 0)) {
        Mat::create(this_00,uVar64,uVar7,uVar8,sVar71,iVar45,opt->blob_allocator);
        if (this_00->data == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep != 0) {
          if (0 < (int)uVar8) {
            uVar47 = 0;
            do {
              if (0 < (int)local_130) {
                sVar71 = pMVar9->cstep;
                sVar11 = pMVar9->elemsize;
                auVar106 = *(undefined1 (*) [16])
                            ((long)pMVar9[1].data + pMVar9[1].cstep * uVar47 * pMVar9[1].elemsize);
                pvVar12 = pMVar9->data;
                sVar13 = this_00->cstep;
                sVar14 = this_00->elemsize;
                pvVar56 = this_00->data;
                lVar60 = 0;
                iVar45 = (int)local_130;
                do {
                  auVar103 = vsubps_avx(*(undefined1 (*) [16])
                                         ((long)pvVar12 + lVar60 + sVar71 * sVar11 * uVar47),
                                        auVar106);
                  *(undefined1 (*) [16])((long)pvVar56 + lVar60 + sVar13 * sVar14 * uVar47) =
                       auVar103;
                  lVar60 = lVar60 + 0x10;
                  iVar45 = iVar45 + -1;
                } while (iVar45 != 0);
              }
              uVar47 = uVar47 + 1;
            } while (uVar47 != uVar46);
            return 0;
          }
          return 0;
        }
        return -100;
      }
      if (uVar65 == uVar64) {
        if (uVar66 == 1 && (uVar6 == 1 && uVar5 == uVar7)) {
          Mat::create(this_00,uVar64,uVar7,uVar8,sVar71,iVar45,opt->blob_allocator);
          if (this_00->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep != 0) {
            if (0 < (int)uVar8) {
              uVar47 = 0;
              do {
                if (0 < (int)local_130) {
                  sVar71 = pMVar9->cstep;
                  sVar11 = pMVar9->elemsize;
                  sVar13 = this_00->cstep;
                  pvVar12 = pMVar9->data;
                  pvVar56 = pMVar9[1].data;
                  sVar14 = this_00->elemsize;
                  pvVar63 = this_00->data;
                  lVar60 = 0;
                  iVar45 = (int)local_130;
                  do {
                    uVar4 = *(undefined4 *)((long)pvVar56 + lVar60);
                    auVar216._4_4_ = uVar4;
                    auVar216._0_4_ = uVar4;
                    auVar216._8_4_ = uVar4;
                    auVar216._12_4_ = uVar4;
                    auVar106 = vsubps_avx(*(undefined1 (*) [16])
                                           ((long)pvVar12 + lVar60 * 4 + sVar71 * sVar11 * uVar47),
                                          auVar216);
                    *(undefined1 (*) [16])((long)pvVar63 + lVar60 * 4 + sVar13 * sVar14 * uVar47) =
                         auVar106;
                    lVar60 = lVar60 + 4;
                    iVar45 = iVar45 + -1;
                  } while (iVar45 != 0);
                }
                uVar47 = uVar47 + 1;
              } while (uVar47 != uVar46);
              return 0;
            }
            return 0;
          }
          return -100;
        }
        local_104 = CONCAT31(local_104._1_3_,uVar7 == 1);
        if ((uVar64 != 1 || uVar7 != 1) || uVar6 != uVar8) {
          if (((iVar45 == 1) && (uVar5 == uVar7)) && (uVar8 == 1)) {
            local_128 = uVar46;
            Mat::create(this_00,uVar64,uVar7,uVar6,sVar11,uVar66,opt->blob_allocator);
            if (this_00->data == (void *)0x0) {
              return -100;
            }
            if ((long)this_00->c * this_00->cstep != 0) {
              if (0 < (int)local_138) {
                uVar47 = 0;
                do {
                  if (0 < iVar72) {
                    sVar71 = pMVar9[1].cstep;
                    sVar11 = pMVar9[1].elemsize;
                    sVar13 = this_00->cstep;
                    pvVar12 = pMVar9[1].data;
                    pvVar56 = pMVar9->data;
                    sVar14 = this_00->elemsize;
                    pvVar63 = this_00->data;
                    lVar60 = 0;
                    iVar45 = iVar72;
                    do {
                      uVar4 = *(undefined4 *)((long)pvVar56 + lVar60);
                      auVar126._4_4_ = uVar4;
                      auVar126._0_4_ = uVar4;
                      auVar126._8_4_ = uVar4;
                      auVar126._12_4_ = uVar4;
                      auVar106 = vsubps_avx(auVar126,*(undefined1 (*) [16])
                                                      ((long)pvVar12 +
                                                      lVar60 * 4 + sVar71 * sVar11 * uVar47));
                      *(undefined1 (*) [16])((long)pvVar63 + lVar60 * 4 + sVar13 * sVar14 * uVar47)
                           = auVar106;
                      lVar60 = lVar60 + 4;
                      iVar45 = iVar45 + -1;
                    } while (iVar45 != 0);
                  }
                  uVar47 = uVar47 + 1;
                } while (uVar47 != local_138);
                return 0;
              }
              return 0;
            }
            return -100;
          }
LAB_00248bbe:
          if ((((uVar65 ^ 1) == 0 && uVar5 == uVar7) && uVar8 == uVar6) && uVar64 != 1) {
            local_128 = uVar46;
            Mat::create(this_00,uVar64,uVar7,uVar8,sVar71,iVar45,opt->blob_allocator);
            if (this_00->data == (void *)0x0) {
              return -100;
            }
            if ((long)this_00->c * this_00->cstep != 0) {
              if (0 < (int)uVar8) {
                uVar48 = 0;
                do {
                  if (0 < (int)uVar7) {
                    sVar71 = pMVar9[1].cstep;
                    sVar11 = pMVar9[1].elemsize;
                    pvVar12 = pMVar9[1].data;
                    pauVar50 = (undefined1 (*) [16])
                               (this_00->cstep * uVar48 * this_00->elemsize + (long)this_00->data);
                    pauVar55 = (undefined1 (*) [16])
                               (pMVar9->cstep * uVar48 * pMVar9->elemsize + (long)pMVar9->data);
                    uVar62 = 0;
                    do {
                      if (0 < (int)uVar64) {
                        auVar106 = *(undefined1 (*) [16])
                                    ((long)pvVar12 + uVar62 * 0x10 + sVar71 * uVar48 * sVar11);
                        uVar67 = uVar47;
                        do {
                          auVar103 = vsubps_avx(*pauVar55,auVar106);
                          *pauVar50 = auVar103;
                          pauVar55 = pauVar55 + 1;
                          pauVar50 = pauVar50 + 1;
                          uVar66 = (int)uVar67 - 1;
                          uVar67 = (ulong)uVar66;
                        } while (uVar66 != 0);
                      }
                      uVar62 = uVar62 + 1;
                    } while (uVar62 != uVar7);
                  }
                  uVar48 = uVar48 + 1;
                } while (uVar48 != uVar46);
                return 0;
              }
              return 0;
            }
            return -100;
          }
          if (((uVar65 == uVar64 && (uVar5 ^ 1) == 0) && uVar8 == uVar6) && uVar7 != 1) {
            local_128 = uVar46;
            Mat::create(this_00,uVar64,uVar7,uVar8,sVar71,iVar45,opt->blob_allocator);
            if (this_00->data == (void *)0x0) {
              return -100;
            }
            if ((long)this_00->c * this_00->cstep != 0) {
              if (0 < (int)uVar8) {
                uVar48 = 0;
                do {
                  if (0 < (int)uVar7) {
                    sVar71 = pMVar9[1].elemsize;
                    pvVar56 = (void *)(this_00->cstep * uVar48 * this_00->elemsize +
                                      (long)this_00->data);
                    pvVar63 = (void *)(pMVar9->cstep * uVar48 * pMVar9->elemsize +
                                      (long)pMVar9->data);
                    sVar11 = pMVar9[1].cstep;
                    pvVar12 = pMVar9[1].data;
                    uVar66 = 0;
                    do {
                      if (0 < (int)uVar64) {
                        lVar60 = 0;
                        do {
                          auVar106 = vsubps_avx(*(undefined1 (*) [16])((long)pvVar63 + lVar60),
                                                *(undefined1 (*) [16])
                                                 ((long)pvVar12 + lVar60 + sVar71 * sVar11 * uVar48)
                                               );
                          *(undefined1 (*) [16])((long)pvVar56 + lVar60) = auVar106;
                          lVar60 = lVar60 + 0x10;
                        } while (uVar47 << 4 != lVar60);
                        pvVar56 = (void *)((long)pvVar56 + lVar60);
                        pvVar63 = (void *)((long)pvVar63 + lVar60);
                      }
                      uVar66 = uVar66 + 1;
                    } while (uVar66 != uVar7);
                  }
                  uVar48 = uVar48 + 1;
                } while (uVar48 != uVar46);
                return 0;
              }
              return 0;
            }
            return -100;
          }
          if ((uVar6 == uVar8 && uVar5 == uVar7) && (uVar65 != 1 && uVar64 == 1)) {
            local_128 = uVar46;
            Mat::create(this_00,uVar65,uVar7,uVar8,sVar11,uVar66,opt->blob_allocator);
            if (this_00->data == (void *)0x0) {
              return -100;
            }
            if ((long)this_00->c * this_00->cstep != 0) {
              if (0 < (int)uVar8) {
                uVar47 = 0;
                do {
                  if (0 < (int)uVar7) {
                    sVar71 = pMVar9->cstep;
                    sVar11 = pMVar9->elemsize;
                    pvVar12 = pMVar9->data;
                    pauVar50 = (undefined1 (*) [16])
                               (this_00->cstep * uVar47 * this_00->elemsize + (long)this_00->data);
                    pauVar55 = (undefined1 (*) [16])
                               (pMVar9[1].cstep * uVar47 * pMVar9[1].elemsize + (long)pMVar9[1].data
                               );
                    uVar48 = 0;
                    do {
                      if (0 < (int)uVar65) {
                        auVar106 = *(undefined1 (*) [16])
                                    ((long)pvVar12 + uVar48 * 0x10 + sVar71 * uVar47 * sVar11);
                        uVar66 = uVar65;
                        do {
                          auVar103 = vsubps_avx(auVar106,*pauVar55);
                          *pauVar50 = auVar103;
                          pauVar55 = pauVar55 + 1;
                          pauVar50 = pauVar50 + 1;
                          uVar66 = uVar66 - 1;
                        } while (uVar66 != 0);
                      }
                      uVar48 = uVar48 + 1;
                    } while (uVar48 != uVar7);
                  }
                  uVar47 = uVar47 + 1;
                } while (uVar47 != uVar46);
                return 0;
              }
              return 0;
            }
            return -100;
          }
          if (((byte)local_104 & uVar6 == uVar8 & (uVar5 != 1 && uVar65 == uVar64)) == 1) {
            local_128 = uVar46;
            Mat::create(this_00,uVar64,uVar5,uVar8,sVar11,uVar66,opt->blob_allocator);
            if (this_00->data == (void *)0x0) {
              return -100;
            }
            if ((long)local_120->c * local_120->cstep != 0) {
              if (0 < (int)local_128) {
                local_158 = (__m256 *)0x0;
                do {
                  pMVar1 = local_a0;
                  afVar185 = _local_100;
                  bVar74 = local_a0->dims == 3;
                  local_c8 = 1;
                  if (!bVar74) {
                    local_c8 = local_a0->d;
                  }
                  local_d4 = local_a0->w;
                  local_d0 = local_a0->h;
                  sVar71 = local_a0->cstep;
                  pvVar12 = local_a0->data;
                  local_130 = (void *)local_a0->elemsize;
                  local_e0 = local_a0->allocator;
                  _fStack_f8 = 0;
                  local_100 = (undefined1  [8])
                              (sVar71 * (long)local_158 * (long)local_130 + (long)pvVar12);
                  uStack_f0 = local_130;
                  fStack_e4 = afVar185[7];
                  fStack_e8 = (float)local_a0->elempack;
                  local_d8 = bVar74 ^ 3;
                  local_c0 = (long)local_d0 * (long)local_d4;
                  local_cc = 1;
                  Mat::~Mat((Mat *)local_100);
                  bVar74 = pMVar1[1].dims == 3;
                  local_c8 = 1;
                  if (!bVar74) {
                    local_c8 = pMVar1[1].d;
                  }
                  local_d4 = pMVar1[1].w;
                  local_d0 = pMVar1[1].h;
                  pvVar56 = (void *)(pMVar1[1].cstep * (long)local_158 * pMVar1[1].elemsize +
                                    (long)pMVar1[1].data);
                  local_d8 = bVar74 ^ 3;
                  local_e0 = pMVar1[1].allocator;
                  _fStack_f8 = 0;
                  local_100 = (undefined1  [8])pvVar56;
                  uStack_f0 = pMVar1[1].elemsize;
                  fStack_e8 = (float)pMVar1[1].elempack;
                  local_c0 = (long)local_d0 * (long)local_d4;
                  local_cc = 1;
                  Mat::~Mat((Mat *)local_100);
                  bVar74 = local_120->dims == 3;
                  local_d4 = local_120->w;
                  local_d0 = local_120->h;
                  local_c8 = 1;
                  if (!bVar74) {
                    local_c8 = local_120->d;
                  }
                  sVar11 = local_120->elemsize;
                  pvVar63 = (void *)(local_120->cstep * (long)local_158 * sVar11 +
                                    (long)local_120->data);
                  local_d8 = bVar74 ^ 3;
                  local_e0 = local_120->allocator;
                  fStack_f8 = 0.0;
                  fStack_f4 = 0.0;
                  local_100 = (undefined1  [8])pvVar63;
                  uStack_f0._0_4_ = (float)(int)sVar11;
                  uStack_f0._4_4_ = (float)(int)(sVar11 >> 0x20);
                  fStack_e8 = (float)local_120->elempack;
                  local_c0 = (long)local_d0 * (long)local_d4;
                  local_cc = 1;
                  Mat::~Mat((Mat *)local_100);
                  if (0 < (int)uVar5) {
                    uVar66 = 0;
                    do {
                      if (0 < (int)uVar64) {
                        lVar60 = 0;
                        do {
                          auVar106 = vsubps_avx(*(undefined1 (*) [16])
                                                 ((long)pvVar12 +
                                                 lVar60 + sVar71 * (long)local_130 * (long)local_158
                                                 ),*(undefined1 (*) [16])((long)pvVar56 + lVar60));
                          *(undefined1 (*) [16])((long)pvVar63 + lVar60) = auVar106;
                          lVar60 = lVar60 + 0x10;
                        } while (uVar47 << 4 != lVar60);
                        pvVar63 = (void *)((long)pvVar63 + lVar60);
                        pvVar56 = (void *)((long)pvVar56 + lVar60);
                      }
                      uVar66 = uVar66 + 1;
                    } while (uVar66 != uVar5);
                  }
                  local_158 = (__m256 *)((long)local_158 + 1);
                } while (local_158 != (__m256 *)local_128);
                return 0;
              }
              return 0;
            }
            return -100;
          }
          local_128 = uVar46;
          Mat::create(this_00,uVar64,uVar7,uVar8,sVar71,iVar45,opt->blob_allocator);
          if (this_00->data == (void *)0x0) {
            return -100;
          }
          if ((long)local_120->c * local_120->cstep != 0) {
            if (0 < (int)local_128) {
              local_158 = (__m256 *)0x0;
              do {
                pMVar1 = local_a0;
                afVar185 = _local_100;
                bVar74 = local_a0->dims == 3;
                local_c8 = 1;
                if (!bVar74) {
                  local_c8 = local_a0->d;
                }
                local_d4 = local_a0->w;
                local_d0 = local_a0->h;
                sVar71 = local_a0->cstep;
                pvVar12 = local_a0->data;
                sVar11 = local_a0->elemsize;
                local_e0 = local_a0->allocator;
                _fStack_f8 = 0;
                local_100 = (undefined1  [8])(sVar71 * (long)local_158 * sVar11 + (long)pvVar12);
                uStack_f0 = sVar11;
                fStack_e4 = afVar185[7];
                fStack_e8 = (float)local_a0->elempack;
                local_d8 = bVar74 ^ 3;
                local_c0 = (long)local_d0 * (long)local_d4;
                local_cc = 1;
                Mat::~Mat((Mat *)local_100);
                bVar74 = pMVar1[1].dims == 3;
                local_c8 = 1;
                if (!bVar74) {
                  local_c8 = pMVar1[1].d;
                }
                local_d4 = pMVar1[1].w;
                local_d0 = pMVar1[1].h;
                local_138 = pMVar1[1].cstep;
                pvVar56 = pMVar1[1].data;
                local_110 = pMVar1[1].elemsize;
                local_e0 = pMVar1[1].allocator;
                _fStack_f8 = 0;
                local_100 = (undefined1  [8])
                            (local_138 * (long)local_158 * local_110 + (long)pvVar56);
                uStack_f0 = local_110;
                fStack_e8 = (float)pMVar1[1].elempack;
                local_d8 = bVar74 ^ 3;
                local_c0 = (long)local_d0 * (long)local_d4;
                local_cc = 1;
                Mat::~Mat((Mat *)local_100);
                bVar74 = local_120->dims == 3;
                local_d4 = local_120->w;
                local_d0 = local_120->h;
                local_c8 = 1;
                if (!bVar74) {
                  local_c8 = local_120->d;
                }
                sVar13 = local_120->cstep;
                pvVar63 = local_120->data;
                sVar14 = local_120->elemsize;
                local_e0 = local_120->allocator;
                fStack_f8 = 0.0;
                fStack_f4 = 0.0;
                local_100 = (undefined1  [8])(sVar13 * (long)local_158 * sVar14 + (long)pvVar63);
                uStack_f0._0_4_ = (float)(int)sVar14;
                uStack_f0._4_4_ = (float)(int)(sVar14 >> 0x20);
                fStack_e8 = (float)local_120->elempack;
                local_d8 = bVar74 ^ 3;
                local_c0 = (long)local_d0 * (long)local_d4;
                local_cc = 1;
                Mat::~Mat((Mat *)local_100);
                if (0 < (int)local_130) {
                  lVar60 = 0;
                  iVar45 = (int)local_130;
                  do {
                    auVar106 = vsubps_avx(*(undefined1 (*) [16])
                                           ((long)pvVar12 +
                                           lVar60 + sVar71 * sVar11 * (long)local_158),
                                          *(undefined1 (*) [16])
                                           ((long)pvVar56 +
                                           lVar60 + local_138 * local_110 * (long)local_158));
                    *(undefined1 (*) [16])
                     ((long)pvVar63 + lVar60 + sVar13 * sVar14 * (long)local_158) = auVar106;
                    lVar60 = lVar60 + 0x10;
                    iVar45 = iVar45 + -1;
                  } while (iVar45 != 0);
                }
                local_158 = (__m256 *)((long)local_158 + 1);
              } while (local_158 != (__m256 *)local_128);
              return 0;
            }
            return 0;
          }
          return -100;
        }
      }
      else {
        local_104 = CONCAT31(local_104._1_3_,uVar7 == 1);
        local_128 = uVar46;
        if ((uVar64 != 1 || uVar7 != 1) || uVar6 != uVar8) goto LAB_00248bbe;
      }
      Mat::create(this_00,uVar65,uVar5,uVar6,sVar11,uVar66,opt->blob_allocator);
      if (this_00->data == (void *)0x0) {
        return -100;
      }
      if ((long)this_00->c * this_00->cstep != 0) {
        if (0 < (int)local_138) {
          uVar47 = 0;
          do {
            if (0 < iVar72) {
              sVar71 = this_00->cstep;
              sVar11 = this_00->elemsize;
              auVar106 = *(undefined1 (*) [16])
                          ((long)pMVar9->data + pMVar9->cstep * uVar47 * pMVar9->elemsize);
              pvVar12 = this_00->data;
              sVar13 = pMVar9[1].cstep;
              sVar14 = pMVar9[1].elemsize;
              pvVar56 = pMVar9[1].data;
              lVar60 = 0;
              iVar45 = iVar72;
              do {
                auVar103 = vsubps_avx(auVar106,*(undefined1 (*) [16])
                                                ((long)pvVar56 + lVar60 + sVar13 * sVar14 * uVar47))
                ;
                *(undefined1 (*) [16])((long)pvVar12 + lVar60 + sVar71 * sVar11 * uVar47) = auVar103
                ;
                lVar60 = lVar60 + 0x10;
                iVar45 = iVar45 + -1;
              } while (iVar45 != 0);
            }
            uVar47 = uVar47 + 1;
          } while (uVar47 != local_138);
          return 0;
        }
        return 0;
      }
      return -100;
    case 2:
      uVar64 = pMVar9->w;
      uVar47 = (ulong)uVar64;
      sVar71 = pMVar9->elemsize;
      uVar65 = pMVar9[1].w;
      uVar5 = pMVar9[1].h;
      uVar6 = pMVar9[1].c;
      local_138 = (ulong)uVar6;
      iVar72 = uVar5 * uVar65;
      sVar11 = pMVar9[1].elemsize;
      iVar59 = pMVar9->dims;
      if (iVar59 == 1) {
        iVar59 = pMVar9[1].dims;
        if (iVar45 != 1 || uVar64 != 1) {
          if (iVar59 == 1) {
            Mat::create(this_00,uVar64,sVar71,iVar45,opt->blob_allocator);
            pvVar12 = this_00->data;
            if (pvVar12 == (void *)0x0) {
              return -100;
            }
            if ((long)this_00->c * this_00->cstep == 0) {
              return -100;
            }
            if (uVar66 != 1 || pMVar9[1].w != 1) {
              if (0 < (int)uVar64) {
                pvVar56 = pMVar9->data;
                pvVar63 = pMVar9[1].data;
                lVar60 = 0;
                do {
                  pfVar57 = (float *)((long)pvVar63 + lVar60);
                  fVar203 = pfVar57[1];
                  fVar31 = pfVar57[2];
                  fVar32 = pfVar57[3];
                  pfVar58 = (float *)((long)pvVar56 + lVar60);
                  fVar33 = pfVar58[1];
                  fVar34 = pfVar58[2];
                  fVar35 = pfVar58[3];
                  pfVar2 = (float *)((long)pvVar12 + lVar60);
                  *pfVar2 = *pfVar57 * *pfVar58;
                  pfVar2[1] = fVar203 * fVar33;
                  pfVar2[2] = fVar31 * fVar34;
                  pfVar2[3] = fVar32 * fVar35;
                  lVar60 = lVar60 + 0x10;
                  uVar66 = (int)uVar47 - 1;
                  uVar47 = (ulong)uVar66;
                } while (uVar66 != 0);
                return 0;
              }
              return 0;
            }
            if (0 < (int)uVar64) {
              fVar203 = *pMVar1->data;
              pvVar56 = pMVar9->data;
              lVar60 = 0;
              do {
                pfVar57 = (float *)((long)pvVar56 + lVar60);
                fVar31 = pfVar57[1];
                fVar32 = pfVar57[2];
                fVar33 = pfVar57[3];
                pfVar58 = (float *)((long)pvVar12 + lVar60);
                *pfVar58 = fVar203 * *pfVar57;
                pfVar58[1] = fVar203 * fVar31;
                pfVar58[2] = fVar203 * fVar32;
                pfVar58[3] = fVar203 * fVar33;
                lVar60 = lVar60 + 0x10;
                uVar66 = (int)uVar47 - 1;
                uVar47 = (ulong)uVar66;
              } while (uVar66 != 0);
              return 0;
            }
            return 0;
          }
          if (iVar59 == 2) {
            Mat::create(this_00,uVar65,uVar5,sVar11,uVar66,opt->blob_allocator);
            pauVar50 = (undefined1 (*) [16])this_00->data;
            if (pauVar50 == (undefined1 (*) [16])0x0) {
              return -100;
            }
            if ((long)this_00->c * this_00->cstep != 0) {
              if (0 < (int)uVar5) {
                pauVar55 = (undefined1 (*) [16])pMVar9->data;
                pfVar57 = (float *)pMVar9[1].data;
                uVar66 = 0;
                do {
                  if (0 < (int)uVar65) {
                    auVar106 = *pauVar55;
                    uVar64 = uVar65;
                    do {
                      auVar217._0_4_ = auVar106._0_4_ * *pfVar57;
                      auVar217._4_4_ = auVar106._4_4_ * pfVar57[1];
                      auVar217._8_4_ = auVar106._8_4_ * pfVar57[2];
                      auVar217._12_4_ = auVar106._12_4_ * pfVar57[3];
                      *pauVar50 = auVar217;
                      pfVar57 = pfVar57 + 4;
                      pauVar50 = pauVar50 + 1;
                      uVar64 = uVar64 - 1;
                    } while (uVar64 != 0);
                  }
                  pauVar55 = pauVar55 + 1;
                  uVar66 = uVar66 + 1;
                } while (uVar66 != uVar5);
                return 0;
              }
              return 0;
            }
            return -100;
          }
          if (iVar59 != 3) {
            return 0;
          }
          Mat::create(this_00,uVar65,uVar5,uVar6,sVar11,uVar66,opt->blob_allocator);
          if (this_00->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep == 0) {
            return -100;
          }
          if (0 < (int)local_138) {
            uVar47 = 0;
            do {
              if (0 < iVar72) {
                sVar71 = this_00->cstep;
                sVar11 = this_00->elemsize;
                auVar106 = *(undefined1 (*) [16])((long)pMVar9->data + uVar47 * 0x10);
                pvVar12 = this_00->data;
                sVar13 = pMVar9[1].cstep;
                sVar14 = pMVar9[1].elemsize;
                pvVar56 = pMVar9[1].data;
                lVar60 = 0;
                iVar45 = iVar72;
                do {
                  pfVar57 = (float *)((long)pvVar56 + lVar60 + sVar13 * sVar14 * uVar47);
                  auVar211._0_4_ = auVar106._0_4_ * *pfVar57;
                  auVar211._4_4_ = auVar106._4_4_ * pfVar57[1];
                  auVar211._8_4_ = auVar106._8_4_ * pfVar57[2];
                  auVar211._12_4_ = auVar106._12_4_ * pfVar57[3];
                  *(undefined1 (*) [16])((long)pvVar12 + lVar60 + sVar71 * sVar11 * uVar47) =
                       auVar211;
                  lVar60 = lVar60 + 0x10;
                  iVar45 = iVar45 + -1;
                } while (iVar45 != 0);
              }
              uVar47 = uVar47 + 1;
            } while (uVar47 != local_138);
            return 0;
          }
          return 0;
        }
        if (iVar59 == 1) {
          Mat::create(this_00,uVar65,sVar11,uVar66,opt->blob_allocator);
          pvVar12 = this_00->data;
          if (pvVar12 == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep != 0) {
            if (0 < (int)uVar65) {
              fVar203 = *pMVar9->data;
              pvVar56 = pMVar1->data;
              lVar60 = 0;
              do {
                pfVar57 = (float *)((long)pvVar56 + lVar60);
                fVar31 = pfVar57[1];
                fVar32 = pfVar57[2];
                fVar33 = pfVar57[3];
                pfVar58 = (float *)((long)pvVar12 + lVar60);
                *pfVar58 = fVar203 * *pfVar57;
                pfVar58[1] = fVar203 * fVar31;
                pfVar58[2] = fVar203 * fVar32;
                pfVar58[3] = fVar203 * fVar33;
                lVar60 = lVar60 + 0x10;
                uVar65 = uVar65 - 1;
              } while (uVar65 != 0);
              return 0;
            }
            return 0;
          }
          return -100;
        }
        if (iVar59 == 2) {
          Mat::create(this_00,uVar65,uVar5,sVar11,uVar66,opt->blob_allocator);
          pvVar12 = this_00->data;
          if (pvVar12 == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep != 0) {
            if (0 < iVar72) {
              fVar203 = *pMVar9->data;
              pvVar56 = pMVar1->data;
              lVar60 = 0;
              do {
                pfVar57 = (float *)((long)pvVar56 + lVar60);
                fVar31 = pfVar57[1];
                fVar32 = pfVar57[2];
                fVar33 = pfVar57[3];
                pfVar58 = (float *)((long)pvVar12 + lVar60);
                *pfVar58 = fVar203 * *pfVar57;
                pfVar58[1] = fVar203 * fVar31;
                pfVar58[2] = fVar203 * fVar32;
                pfVar58[3] = fVar203 * fVar33;
                lVar60 = lVar60 + 0x10;
                iVar72 = iVar72 + -1;
              } while (iVar72 != 0);
              return 0;
            }
            return 0;
          }
          return -100;
        }
        if (iVar59 != 3) {
          return 0;
        }
        Mat::create(this_00,uVar65,uVar5,uVar6,sVar11,uVar66,opt->blob_allocator);
        if (this_00->data == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep == 0) {
          return -100;
        }
        if (0 < (int)local_138) {
          fVar203 = *pMVar9->data;
          uVar47 = 0;
          do {
            if (0 < iVar72) {
              sVar71 = this_00->cstep;
              sVar11 = this_00->elemsize;
              pvVar12 = this_00->data;
              sVar13 = pMVar9[1].cstep;
              sVar14 = pMVar9[1].elemsize;
              pvVar56 = pMVar9[1].data;
              lVar60 = 0;
              iVar45 = iVar72;
              do {
                pfVar57 = (float *)((long)pvVar56 + lVar60 + sVar13 * sVar14 * uVar47);
                auVar207._0_4_ = fVar203 * *pfVar57;
                auVar207._4_4_ = fVar203 * pfVar57[1];
                auVar207._8_4_ = fVar203 * pfVar57[2];
                auVar207._12_4_ = fVar203 * pfVar57[3];
                *(undefined1 (*) [16])((long)pvVar12 + lVar60 + sVar71 * sVar11 * uVar47) = auVar207
                ;
                lVar60 = lVar60 + 0x10;
                iVar45 = iVar45 + -1;
              } while (iVar45 != 0);
            }
            uVar47 = uVar47 + 1;
          } while (uVar47 != local_138);
          return 0;
        }
        return 0;
      }
      uVar7 = pMVar9->h;
      local_130 = (void *)CONCAT44(local_130._4_4_,uVar7 * uVar64);
      if (iVar59 == 2) {
        if (pMVar9[1].dims == 3) {
          Mat::create(this_00,uVar65,uVar5,uVar6,sVar11,uVar66,opt->blob_allocator);
          if (this_00->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep != 0) {
            if (0 < (int)local_138) {
              uVar47 = 0;
              do {
                if (0 < (int)uVar5) {
                  pauVar50 = (undefined1 (*) [16])
                             (this_00->cstep * uVar47 * this_00->elemsize + (long)this_00->data);
                  pfVar57 = (float *)(pMVar9[1].cstep * uVar47 * pMVar9[1].elemsize +
                                     (long)pMVar9[1].data);
                  pauVar55 = (undefined1 (*) [16])
                             ((long)pMVar9->w * uVar47 * pMVar9->elemsize + (long)pMVar9->data);
                  uVar66 = 0;
                  do {
                    if (0 < (int)uVar65) {
                      auVar106 = *pauVar55;
                      uVar64 = uVar65;
                      do {
                        auVar206._0_4_ = auVar106._0_4_ * *pfVar57;
                        auVar206._4_4_ = auVar106._4_4_ * pfVar57[1];
                        auVar206._8_4_ = auVar106._8_4_ * pfVar57[2];
                        auVar206._12_4_ = auVar106._12_4_ * pfVar57[3];
                        *pauVar50 = auVar206;
                        pfVar57 = pfVar57 + 4;
                        pauVar50 = pauVar50 + 1;
                        uVar64 = uVar64 - 1;
                      } while (uVar64 != 0);
                    }
                    pauVar55 = pauVar55 + 1;
                    uVar66 = uVar66 + 1;
                  } while (uVar66 != uVar5);
                }
                uVar47 = uVar47 + 1;
              } while (uVar47 != local_138);
              return 0;
            }
            return 0;
          }
          return -100;
        }
        local_128 = CONCAT44(uVar4,uVar66);
        Mat::create(this_00,uVar64,uVar7,sVar71,iVar45,opt->blob_allocator);
        pvVar12 = this_00->data;
        if (pvVar12 == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep == 0) {
          return -100;
        }
        if (pMVar9[1].dims != 1) {
          if (pMVar9[1].dims != 2) {
            return 0;
          }
          if (0 < (int)local_130) {
            pvVar56 = pMVar9->data;
            pvVar63 = pMVar9[1].data;
            lVar60 = 0;
            do {
              pfVar57 = (float *)((long)pvVar63 + lVar60);
              fVar203 = pfVar57[1];
              fVar31 = pfVar57[2];
              fVar32 = pfVar57[3];
              pfVar58 = (float *)((long)pvVar56 + lVar60);
              fVar33 = pfVar58[1];
              fVar34 = pfVar58[2];
              fVar35 = pfVar58[3];
              pfVar2 = (float *)((long)pvVar12 + lVar60);
              *pfVar2 = *pfVar57 * *pfVar58;
              pfVar2[1] = fVar203 * fVar33;
              pfVar2[2] = fVar31 * fVar34;
              pfVar2[3] = fVar32 * fVar35;
              lVar60 = lVar60 + 0x10;
              local_130._0_4_ = (int)local_130 + -1;
            } while ((int)local_130 != 0);
            return 0;
          }
          return 0;
        }
        Mat::create(this_00,uVar64,uVar7,sVar71,iVar45,opt->blob_allocator);
        pauVar50 = (undefined1 (*) [16])this_00->data;
        if (pauVar50 == (undefined1 (*) [16])0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep != 0) {
          if ((int)local_128 != 1 || pMVar9[1].w != 1) {
            if (0 < (int)uVar7) {
              pfVar57 = (float *)pMVar9->data;
              pauVar55 = (undefined1 (*) [16])pMVar9[1].data;
              uVar66 = 0;
              do {
                if (0 < (int)uVar64) {
                  auVar106 = *pauVar55;
                  uVar46 = uVar47;
                  do {
                    auVar231._0_4_ = auVar106._0_4_ * *pfVar57;
                    auVar231._4_4_ = auVar106._4_4_ * pfVar57[1];
                    auVar231._8_4_ = auVar106._8_4_ * pfVar57[2];
                    auVar231._12_4_ = auVar106._12_4_ * pfVar57[3];
                    *pauVar50 = auVar231;
                    pfVar57 = pfVar57 + 4;
                    pauVar50 = pauVar50 + 1;
                    uVar65 = (int)uVar46 - 1;
                    uVar46 = (ulong)uVar65;
                  } while (uVar65 != 0);
                }
                pauVar55 = pauVar55 + 1;
                uVar66 = uVar66 + 1;
              } while (uVar66 != uVar7);
              return 0;
            }
            return 0;
          }
          if (0 < (int)local_130) {
            fVar203 = *pMVar1->data;
            pvVar12 = pMVar9->data;
            lVar60 = 0;
            do {
              pfVar57 = (float *)((long)pvVar12 + lVar60);
              fVar31 = pfVar57[1];
              fVar32 = pfVar57[2];
              fVar33 = pfVar57[3];
              pfVar58 = (float *)((long)*pauVar50 + lVar60);
              *pfVar58 = fVar203 * *pfVar57;
              pfVar58[1] = fVar203 * fVar31;
              pfVar58[2] = fVar203 * fVar32;
              pfVar58[3] = fVar203 * fVar33;
              lVar60 = lVar60 + 0x10;
              local_130._0_4_ = (int)local_130 + -1;
            } while ((int)local_130 != 0);
            return 0;
          }
          return 0;
        }
        return -100;
      }
      if (iVar59 != 3) {
        return 0;
      }
      uVar8 = pMVar9->c;
      uVar46 = (ulong)uVar8;
      local_110 = sVar71;
      if (pMVar9[1].dims != 3) {
        Mat::create(this_00,uVar64,uVar7,uVar8,sVar71,iVar45,opt->blob_allocator);
        if (this_00->data == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep == 0) {
          return -100;
        }
        if (pMVar9[1].dims == 1) {
          if (uVar66 != 1 || pMVar9[1].w != 1) {
            if (0 < (int)uVar8) {
              uVar47 = 0;
              do {
                if (0 < (int)local_130) {
                  sVar71 = this_00->cstep;
                  sVar11 = this_00->elemsize;
                  auVar106 = *(undefined1 (*) [16])((long)pMVar1->data + uVar47 * 0x10);
                  pvVar12 = this_00->data;
                  sVar13 = pMVar9->cstep;
                  sVar14 = pMVar9->elemsize;
                  pvVar56 = pMVar9->data;
                  lVar60 = 0;
                  iVar45 = (int)local_130;
                  do {
                    pfVar57 = (float *)((long)pvVar56 + lVar60 + sVar13 * sVar14 * uVar47);
                    auVar226._0_4_ = auVar106._0_4_ * *pfVar57;
                    auVar226._4_4_ = auVar106._4_4_ * pfVar57[1];
                    auVar226._8_4_ = auVar106._8_4_ * pfVar57[2];
                    auVar226._12_4_ = auVar106._12_4_ * pfVar57[3];
                    *(undefined1 (*) [16])((long)pvVar12 + lVar60 + sVar71 * sVar11 * uVar47) =
                         auVar226;
                    lVar60 = lVar60 + 0x10;
                    iVar45 = iVar45 + -1;
                  } while (iVar45 != 0);
                }
                uVar47 = uVar47 + 1;
              } while (uVar47 != uVar46);
              return 0;
            }
            return 0;
          }
          if (0 < (int)uVar8) {
            fVar203 = *pMVar1->data;
            uVar47 = 0;
            do {
              if (0 < (int)local_130) {
                sVar71 = this_00->cstep;
                sVar11 = this_00->elemsize;
                pvVar12 = this_00->data;
                sVar13 = pMVar9->cstep;
                sVar14 = pMVar9->elemsize;
                pvVar56 = pMVar9->data;
                lVar60 = 0;
                iVar45 = (int)local_130;
                do {
                  pfVar57 = (float *)((long)pvVar56 + lVar60 + sVar13 * sVar14 * uVar47);
                  auVar221._0_4_ = fVar203 * *pfVar57;
                  auVar221._4_4_ = fVar203 * pfVar57[1];
                  auVar221._8_4_ = fVar203 * pfVar57[2];
                  auVar221._12_4_ = fVar203 * pfVar57[3];
                  *(undefined1 (*) [16])((long)pvVar12 + lVar60 + sVar71 * sVar11 * uVar47) =
                       auVar221;
                  lVar60 = lVar60 + 0x10;
                  iVar45 = iVar45 + -1;
                } while (iVar45 != 0);
              }
              uVar47 = uVar47 + 1;
            } while (uVar47 != uVar46);
            return 0;
          }
          return 0;
        }
        if (pMVar9[1].dims != 2) {
          return 0;
        }
        if (0 < (int)uVar8) {
          uVar48 = 0;
          do {
            if (0 < (int)uVar7) {
              pauVar50 = (undefined1 (*) [16])
                         (this_00->cstep * uVar48 * this_00->elemsize + (long)this_00->data);
              pauVar55 = (undefined1 (*) [16])
                         ((long)pMVar9[1].w * uVar48 * pMVar9[1].elemsize + (long)pMVar9[1].data);
              pfVar57 = (float *)(pMVar9->cstep * uVar48 * pMVar9->elemsize + (long)pMVar9->data);
              uVar66 = 0;
              do {
                if (0 < (int)uVar64) {
                  auVar106 = *pauVar55;
                  uVar62 = uVar47;
                  do {
                    auVar212._0_4_ = auVar106._0_4_ * *pfVar57;
                    auVar212._4_4_ = auVar106._4_4_ * pfVar57[1];
                    auVar212._8_4_ = auVar106._8_4_ * pfVar57[2];
                    auVar212._12_4_ = auVar106._12_4_ * pfVar57[3];
                    *pauVar50 = auVar212;
                    pfVar57 = pfVar57 + 4;
                    pauVar50 = pauVar50 + 1;
                    uVar65 = (int)uVar62 - 1;
                    uVar62 = (ulong)uVar65;
                  } while (uVar65 != 0);
                }
                pauVar55 = pauVar55 + 1;
                uVar66 = uVar66 + 1;
              } while (uVar66 != uVar7);
            }
            uVar48 = uVar48 + 1;
          } while (uVar48 != uVar46);
          return 0;
        }
        return 0;
      }
      if (uVar8 == uVar6 && ((uVar65 ^ 1) == 0 && (uVar5 ^ 1) == 0)) {
        Mat::create(this_00,uVar64,uVar7,uVar8,sVar71,iVar45,opt->blob_allocator);
        if (this_00->data == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep != 0) {
          if (0 < (int)uVar8) {
            uVar47 = 0;
            do {
              if (0 < (int)local_130) {
                sVar71 = pMVar9->cstep;
                sVar11 = pMVar9->elemsize;
                auVar106 = *(undefined1 (*) [16])
                            ((long)pMVar9[1].data + pMVar9[1].cstep * uVar47 * pMVar9[1].elemsize);
                pvVar12 = pMVar9->data;
                sVar13 = this_00->cstep;
                sVar14 = this_00->elemsize;
                pvVar56 = this_00->data;
                lVar60 = 0;
                iVar45 = (int)local_130;
                do {
                  pfVar57 = (float *)((long)pvVar12 + lVar60 + sVar71 * sVar11 * uVar47);
                  auVar205._0_4_ = auVar106._0_4_ * *pfVar57;
                  auVar205._4_4_ = auVar106._4_4_ * pfVar57[1];
                  auVar205._8_4_ = auVar106._8_4_ * pfVar57[2];
                  auVar205._12_4_ = auVar106._12_4_ * pfVar57[3];
                  *(undefined1 (*) [16])((long)pvVar56 + lVar60 + sVar13 * sVar14 * uVar47) =
                       auVar205;
                  lVar60 = lVar60 + 0x10;
                  iVar45 = iVar45 + -1;
                } while (iVar45 != 0);
              }
              uVar47 = uVar47 + 1;
            } while (uVar47 != uVar46);
            return 0;
          }
          return 0;
        }
        return -100;
      }
      if (uVar65 == uVar64) {
        if (uVar66 == 1 && (uVar6 == 1 && uVar5 == uVar7)) {
          Mat::create(this_00,uVar64,uVar7,uVar8,sVar71,iVar45,opt->blob_allocator);
          if (this_00->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep != 0) {
            if (0 < (int)uVar8) {
              uVar47 = 0;
              do {
                if (0 < (int)local_130) {
                  sVar71 = pMVar9->cstep;
                  sVar11 = pMVar9->elemsize;
                  sVar13 = this_00->cstep;
                  pvVar12 = pMVar9->data;
                  pvVar56 = pMVar9[1].data;
                  sVar14 = this_00->elemsize;
                  pvVar63 = this_00->data;
                  lVar60 = 0;
                  iVar45 = (int)local_130;
                  do {
                    fVar203 = *(float *)((long)pvVar56 + lVar60);
                    pfVar57 = (float *)((long)pvVar12 + lVar60 * 4 + sVar71 * sVar11 * uVar47);
                    auVar85._0_4_ = fVar203 * *pfVar57;
                    auVar85._4_4_ = fVar203 * pfVar57[1];
                    auVar85._8_4_ = fVar203 * pfVar57[2];
                    auVar85._12_4_ = fVar203 * pfVar57[3];
                    *(undefined1 (*) [16])((long)pvVar63 + lVar60 * 4 + sVar13 * sVar14 * uVar47) =
                         auVar85;
                    lVar60 = lVar60 + 4;
                    iVar45 = iVar45 + -1;
                  } while (iVar45 != 0);
                }
                uVar47 = uVar47 + 1;
              } while (uVar47 != uVar46);
              return 0;
            }
            return 0;
          }
          return -100;
        }
        local_104 = CONCAT31(local_104._1_3_,uVar7 == 1);
        if ((uVar64 != 1 || uVar7 != 1) || uVar6 != uVar8) {
          if (((iVar45 == 1) && (uVar5 == uVar7)) && (uVar8 == 1)) {
            local_128 = uVar46;
            Mat::create(this_00,uVar64,uVar7,uVar6,sVar11,uVar66,opt->blob_allocator);
            if (this_00->data == (void *)0x0) {
              return -100;
            }
            if ((long)this_00->c * this_00->cstep != 0) {
              if (0 < (int)local_138) {
                uVar47 = 0;
                do {
                  if (0 < iVar72) {
                    sVar71 = pMVar9[1].cstep;
                    sVar11 = pMVar9[1].elemsize;
                    sVar13 = this_00->cstep;
                    pvVar12 = pMVar9[1].data;
                    pvVar56 = pMVar9->data;
                    sVar14 = this_00->elemsize;
                    pvVar63 = this_00->data;
                    lVar60 = 0;
                    iVar45 = iVar72;
                    do {
                      fVar203 = *(float *)((long)pvVar56 + lVar60);
                      pfVar57 = (float *)((long)pvVar12 + lVar60 * 4 + sVar71 * sVar11 * uVar47);
                      auVar122._0_4_ = fVar203 * *pfVar57;
                      auVar122._4_4_ = fVar203 * pfVar57[1];
                      auVar122._8_4_ = fVar203 * pfVar57[2];
                      auVar122._12_4_ = fVar203 * pfVar57[3];
                      *(undefined1 (*) [16])((long)pvVar63 + lVar60 * 4 + sVar13 * sVar14 * uVar47)
                           = auVar122;
                      lVar60 = lVar60 + 4;
                      iVar45 = iVar45 + -1;
                    } while (iVar45 != 0);
                  }
                  uVar47 = uVar47 + 1;
                } while (uVar47 != local_138);
                return 0;
              }
              return 0;
            }
            return -100;
          }
LAB_002480cd:
          if ((((uVar65 ^ 1) == 0 && uVar5 == uVar7) && uVar8 == uVar6) && uVar64 != 1) {
            local_128 = uVar46;
            Mat::create(this_00,uVar64,uVar7,uVar8,sVar71,iVar45,opt->blob_allocator);
            if (this_00->data == (void *)0x0) {
              return -100;
            }
            if ((long)this_00->c * this_00->cstep != 0) {
              if (0 < (int)uVar8) {
                uVar48 = 0;
                do {
                  if (0 < (int)uVar7) {
                    sVar71 = pMVar9[1].cstep;
                    sVar11 = pMVar9[1].elemsize;
                    pvVar12 = pMVar9[1].data;
                    pauVar50 = (undefined1 (*) [16])
                               (this_00->cstep * uVar48 * this_00->elemsize + (long)this_00->data);
                    pfVar57 = (float *)(pMVar9->cstep * uVar48 * pMVar9->elemsize +
                                       (long)pMVar9->data);
                    uVar62 = 0;
                    do {
                      if (0 < (int)uVar64) {
                        auVar106 = *(undefined1 (*) [16])
                                    ((long)pvVar12 + uVar62 * 0x10 + sVar71 * uVar48 * sVar11);
                        uVar67 = uVar47;
                        do {
                          auVar219._0_4_ = auVar106._0_4_ * *pfVar57;
                          auVar219._4_4_ = auVar106._4_4_ * pfVar57[1];
                          auVar219._8_4_ = auVar106._8_4_ * pfVar57[2];
                          auVar219._12_4_ = auVar106._12_4_ * pfVar57[3];
                          *pauVar50 = auVar219;
                          pfVar57 = pfVar57 + 4;
                          pauVar50 = pauVar50 + 1;
                          uVar66 = (int)uVar67 - 1;
                          uVar67 = (ulong)uVar66;
                        } while (uVar66 != 0);
                      }
                      uVar62 = uVar62 + 1;
                    } while (uVar62 != uVar7);
                  }
                  uVar48 = uVar48 + 1;
                } while (uVar48 != uVar46);
                return 0;
              }
              return 0;
            }
            return -100;
          }
          if (((uVar65 == uVar64 && (uVar5 ^ 1) == 0) && uVar8 == uVar6) && uVar7 != 1) {
            local_128 = uVar46;
            Mat::create(this_00,uVar64,uVar7,uVar8,sVar71,iVar45,opt->blob_allocator);
            if (this_00->data == (void *)0x0) {
              return -100;
            }
            if ((long)this_00->c * this_00->cstep != 0) {
              if (0 < (int)uVar8) {
                uVar48 = 0;
                do {
                  if (0 < (int)uVar7) {
                    sVar71 = pMVar9[1].elemsize;
                    pvVar56 = (void *)(this_00->cstep * uVar48 * this_00->elemsize +
                                      (long)this_00->data);
                    pvVar63 = (void *)(pMVar9->cstep * uVar48 * pMVar9->elemsize +
                                      (long)pMVar9->data);
                    sVar11 = pMVar9[1].cstep;
                    pvVar12 = pMVar9[1].data;
                    uVar66 = 0;
                    do {
                      if (0 < (int)uVar64) {
                        lVar60 = 0;
                        do {
                          pfVar57 = (float *)((long)pvVar12 + lVar60 + sVar71 * sVar11 * uVar48);
                          pfVar58 = (float *)((long)pvVar63 + lVar60);
                          auVar118._0_4_ = *pfVar57 * *pfVar58;
                          auVar118._4_4_ = pfVar57[1] * pfVar58[1];
                          auVar118._8_4_ = pfVar57[2] * pfVar58[2];
                          auVar118._12_4_ = pfVar57[3] * pfVar58[3];
                          *(undefined1 (*) [16])((long)pvVar56 + lVar60) = auVar118;
                          lVar60 = lVar60 + 0x10;
                        } while (uVar47 << 4 != lVar60);
                        pvVar56 = (void *)((long)pvVar56 + lVar60);
                        pvVar63 = (void *)((long)pvVar63 + lVar60);
                      }
                      uVar66 = uVar66 + 1;
                    } while (uVar66 != uVar7);
                  }
                  uVar48 = uVar48 + 1;
                } while (uVar48 != uVar46);
                return 0;
              }
              return 0;
            }
            return -100;
          }
          if ((uVar6 == uVar8 && uVar5 == uVar7) && (uVar65 != 1 && uVar64 == 1)) {
            local_128 = uVar46;
            Mat::create(this_00,uVar65,uVar7,uVar8,sVar11,uVar66,opt->blob_allocator);
            if (this_00->data == (void *)0x0) {
              return -100;
            }
            if ((long)this_00->c * this_00->cstep != 0) {
              if (0 < (int)uVar8) {
                uVar47 = 0;
                do {
                  if (0 < (int)uVar7) {
                    sVar71 = pMVar9->cstep;
                    sVar11 = pMVar9->elemsize;
                    pvVar12 = pMVar9->data;
                    pauVar50 = (undefined1 (*) [16])
                               (this_00->cstep * uVar47 * this_00->elemsize + (long)this_00->data);
                    pfVar57 = (float *)(pMVar9[1].cstep * uVar47 * pMVar9[1].elemsize +
                                       (long)pMVar9[1].data);
                    uVar48 = 0;
                    do {
                      if (0 < (int)uVar65) {
                        auVar106 = *(undefined1 (*) [16])
                                    ((long)pvVar12 + uVar48 * 0x10 + sVar71 * uVar47 * sVar11);
                        uVar66 = uVar65;
                        do {
                          auVar229._0_4_ = auVar106._0_4_ * *pfVar57;
                          auVar229._4_4_ = auVar106._4_4_ * pfVar57[1];
                          auVar229._8_4_ = auVar106._8_4_ * pfVar57[2];
                          auVar229._12_4_ = auVar106._12_4_ * pfVar57[3];
                          *pauVar50 = auVar229;
                          pfVar57 = pfVar57 + 4;
                          pauVar50 = pauVar50 + 1;
                          uVar66 = uVar66 - 1;
                        } while (uVar66 != 0);
                      }
                      uVar48 = uVar48 + 1;
                    } while (uVar48 != uVar7);
                  }
                  uVar47 = uVar47 + 1;
                } while (uVar47 != uVar46);
                return 0;
              }
              return 0;
            }
            return -100;
          }
          if (((byte)local_104 & uVar6 == uVar8 & (uVar5 != 1 && uVar65 == uVar64)) == 1) {
            local_128 = uVar46;
            Mat::create(this_00,uVar64,uVar5,uVar8,sVar11,uVar66,opt->blob_allocator);
            if (this_00->data == (void *)0x0) {
              return -100;
            }
            if ((long)local_120->c * local_120->cstep != 0) {
              if (0 < (int)local_128) {
                local_158 = (__m256 *)0x0;
                do {
                  pMVar1 = local_a0;
                  afVar185 = _local_100;
                  bVar74 = local_a0->dims == 3;
                  local_c8 = 1;
                  if (!bVar74) {
                    local_c8 = local_a0->d;
                  }
                  local_d4 = local_a0->w;
                  local_d0 = local_a0->h;
                  sVar71 = local_a0->cstep;
                  pvVar12 = local_a0->data;
                  local_130 = (void *)local_a0->elemsize;
                  local_e0 = local_a0->allocator;
                  _fStack_f8 = 0;
                  local_100 = (undefined1  [8])
                              (sVar71 * (long)local_158 * (long)local_130 + (long)pvVar12);
                  uStack_f0 = local_130;
                  fStack_e4 = afVar185[7];
                  fStack_e8 = (float)local_a0->elempack;
                  local_d8 = bVar74 ^ 3;
                  local_c0 = (long)local_d0 * (long)local_d4;
                  local_cc = 1;
                  Mat::~Mat((Mat *)local_100);
                  bVar74 = pMVar1[1].dims == 3;
                  local_c8 = 1;
                  if (!bVar74) {
                    local_c8 = pMVar1[1].d;
                  }
                  local_d4 = pMVar1[1].w;
                  local_d0 = pMVar1[1].h;
                  pvVar56 = (void *)(pMVar1[1].cstep * (long)local_158 * pMVar1[1].elemsize +
                                    (long)pMVar1[1].data);
                  local_d8 = bVar74 ^ 3;
                  local_e0 = pMVar1[1].allocator;
                  _fStack_f8 = 0;
                  local_100 = (undefined1  [8])pvVar56;
                  uStack_f0 = pMVar1[1].elemsize;
                  fStack_e8 = (float)pMVar1[1].elempack;
                  local_c0 = (long)local_d0 * (long)local_d4;
                  local_cc = 1;
                  Mat::~Mat((Mat *)local_100);
                  bVar74 = local_120->dims == 3;
                  local_d4 = local_120->w;
                  local_d0 = local_120->h;
                  local_c8 = 1;
                  if (!bVar74) {
                    local_c8 = local_120->d;
                  }
                  sVar11 = local_120->elemsize;
                  pvVar63 = (void *)(local_120->cstep * (long)local_158 * sVar11 +
                                    (long)local_120->data);
                  local_d8 = bVar74 ^ 3;
                  local_e0 = local_120->allocator;
                  fStack_f8 = 0.0;
                  fStack_f4 = 0.0;
                  local_100 = (undefined1  [8])pvVar63;
                  uStack_f0._0_4_ = (float)(int)sVar11;
                  uStack_f0._4_4_ = (float)(int)(sVar11 >> 0x20);
                  fStack_e8 = (float)local_120->elempack;
                  local_c0 = (long)local_d0 * (long)local_d4;
                  local_cc = 1;
                  Mat::~Mat((Mat *)local_100);
                  if (0 < (int)uVar5) {
                    uVar66 = 0;
                    do {
                      if (0 < (int)uVar64) {
                        lVar60 = 0;
                        do {
                          pfVar57 = (float *)((long)pvVar56 + lVar60);
                          pfVar58 = (float *)((long)pvVar12 +
                                             lVar60 + sVar71 * (long)local_130 * (long)local_158);
                          auVar130._0_4_ = *pfVar57 * *pfVar58;
                          auVar130._4_4_ = pfVar57[1] * pfVar58[1];
                          auVar130._8_4_ = pfVar57[2] * pfVar58[2];
                          auVar130._12_4_ = pfVar57[3] * pfVar58[3];
                          *(undefined1 (*) [16])((long)pvVar63 + lVar60) = auVar130;
                          lVar60 = lVar60 + 0x10;
                        } while (uVar47 << 4 != lVar60);
                        pvVar63 = (void *)((long)pvVar63 + lVar60);
                        pvVar56 = (void *)((long)pvVar56 + lVar60);
                      }
                      uVar66 = uVar66 + 1;
                    } while (uVar66 != uVar5);
                  }
                  local_158 = (__m256 *)((long)local_158 + 1);
                } while (local_158 != (__m256 *)local_128);
                return 0;
              }
              return 0;
            }
            return -100;
          }
          local_128 = uVar46;
          Mat::create(this_00,uVar64,uVar7,uVar8,sVar71,iVar45,opt->blob_allocator);
          if (this_00->data == (void *)0x0) {
            return -100;
          }
          if ((long)local_120->c * local_120->cstep != 0) {
            if (0 < (int)local_128) {
              local_158 = (__m256 *)0x0;
              do {
                pMVar1 = local_a0;
                afVar185 = _local_100;
                bVar74 = local_a0->dims == 3;
                local_c8 = 1;
                if (!bVar74) {
                  local_c8 = local_a0->d;
                }
                local_d4 = local_a0->w;
                local_d0 = local_a0->h;
                sVar71 = local_a0->cstep;
                pvVar12 = local_a0->data;
                sVar11 = local_a0->elemsize;
                local_e0 = local_a0->allocator;
                _fStack_f8 = 0;
                local_100 = (undefined1  [8])(sVar71 * (long)local_158 * sVar11 + (long)pvVar12);
                uStack_f0 = sVar11;
                fStack_e4 = afVar185[7];
                fStack_e8 = (float)local_a0->elempack;
                local_d8 = bVar74 ^ 3;
                local_c0 = (long)local_d0 * (long)local_d4;
                local_cc = 1;
                Mat::~Mat((Mat *)local_100);
                bVar74 = pMVar1[1].dims == 3;
                local_c8 = 1;
                if (!bVar74) {
                  local_c8 = pMVar1[1].d;
                }
                local_d4 = pMVar1[1].w;
                local_d0 = pMVar1[1].h;
                local_138 = pMVar1[1].cstep;
                pvVar56 = pMVar1[1].data;
                local_110 = pMVar1[1].elemsize;
                local_e0 = pMVar1[1].allocator;
                _fStack_f8 = 0;
                local_100 = (undefined1  [8])
                            (local_138 * (long)local_158 * local_110 + (long)pvVar56);
                uStack_f0 = local_110;
                fStack_e8 = (float)pMVar1[1].elempack;
                local_d8 = bVar74 ^ 3;
                local_c0 = (long)local_d0 * (long)local_d4;
                local_cc = 1;
                Mat::~Mat((Mat *)local_100);
                bVar74 = local_120->dims == 3;
                local_d4 = local_120->w;
                local_d0 = local_120->h;
                local_c8 = 1;
                if (!bVar74) {
                  local_c8 = local_120->d;
                }
                sVar13 = local_120->cstep;
                pvVar63 = local_120->data;
                sVar14 = local_120->elemsize;
                local_e0 = local_120->allocator;
                fStack_f8 = 0.0;
                fStack_f4 = 0.0;
                local_100 = (undefined1  [8])(sVar13 * (long)local_158 * sVar14 + (long)pvVar63);
                uStack_f0._0_4_ = (float)(int)sVar14;
                uStack_f0._4_4_ = (float)(int)(sVar14 >> 0x20);
                fStack_e8 = (float)local_120->elempack;
                local_d8 = bVar74 ^ 3;
                local_c0 = (long)local_d0 * (long)local_d4;
                local_cc = 1;
                Mat::~Mat((Mat *)local_100);
                if (0 < (int)local_130) {
                  lVar60 = 0;
                  iVar45 = (int)local_130;
                  do {
                    pfVar57 = (float *)((long)pvVar56 +
                                       lVar60 + local_138 * local_110 * (long)local_158);
                    pfVar58 = (float *)((long)pvVar12 + lVar60 + sVar71 * sVar11 * (long)local_158);
                    auVar132._0_4_ = *pfVar57 * *pfVar58;
                    auVar132._4_4_ = pfVar57[1] * pfVar58[1];
                    auVar132._8_4_ = pfVar57[2] * pfVar58[2];
                    auVar132._12_4_ = pfVar57[3] * pfVar58[3];
                    *(undefined1 (*) [16])
                     ((long)pvVar63 + lVar60 + sVar13 * sVar14 * (long)local_158) = auVar132;
                    lVar60 = lVar60 + 0x10;
                    iVar45 = iVar45 + -1;
                  } while (iVar45 != 0);
                }
                local_158 = (__m256 *)((long)local_158 + 1);
              } while (local_158 != (__m256 *)local_128);
              return 0;
            }
            return 0;
          }
          return -100;
        }
      }
      else {
        local_104 = CONCAT31(local_104._1_3_,uVar7 == 1);
        local_128 = uVar46;
        if ((uVar64 != 1 || uVar7 != 1) || uVar6 != uVar8) goto LAB_002480cd;
      }
      Mat::create(this_00,uVar65,uVar5,uVar6,sVar11,uVar66,opt->blob_allocator);
      if (this_00->data == (void *)0x0) {
        return -100;
      }
      if ((long)this_00->c * this_00->cstep != 0) {
        if (0 < (int)local_138) {
          uVar47 = 0;
          do {
            if (0 < iVar72) {
              sVar71 = this_00->cstep;
              sVar11 = this_00->elemsize;
              auVar106 = *(undefined1 (*) [16])
                          ((long)pMVar9->data + pMVar9->cstep * uVar47 * pMVar9->elemsize);
              pvVar12 = this_00->data;
              sVar13 = pMVar9[1].cstep;
              sVar14 = pMVar9[1].elemsize;
              pvVar56 = pMVar9[1].data;
              lVar60 = 0;
              iVar45 = iVar72;
              do {
                pfVar57 = (float *)((long)pvVar56 + lVar60 + sVar13 * sVar14 * uVar47);
                auVar224._0_4_ = auVar106._0_4_ * *pfVar57;
                auVar224._4_4_ = auVar106._4_4_ * pfVar57[1];
                auVar224._8_4_ = auVar106._8_4_ * pfVar57[2];
                auVar224._12_4_ = auVar106._12_4_ * pfVar57[3];
                *(undefined1 (*) [16])((long)pvVar12 + lVar60 + sVar71 * sVar11 * uVar47) = auVar224
                ;
                lVar60 = lVar60 + 0x10;
                iVar45 = iVar45 + -1;
              } while (iVar45 != 0);
            }
            uVar47 = uVar47 + 1;
          } while (uVar47 != local_138);
          return 0;
        }
        return 0;
      }
      return -100;
    case 3:
      uVar64 = pMVar9->w;
      uVar47 = (ulong)uVar64;
      sVar71 = pMVar9->elemsize;
      uVar65 = pMVar9[1].w;
      uVar5 = pMVar9[1].h;
      uVar6 = pMVar9[1].c;
      local_138 = (ulong)uVar6;
      iVar72 = uVar5 * uVar65;
      sVar11 = pMVar9[1].elemsize;
      iVar59 = pMVar9->dims;
      if (iVar59 == 1) {
        iVar59 = pMVar9[1].dims;
        if (iVar45 != 1 || uVar64 != 1) {
          if (iVar59 == 1) {
            Mat::create(this_00,uVar64,sVar71,iVar45,opt->blob_allocator);
            pvVar12 = this_00->data;
            if (pvVar12 == (void *)0x0) {
              return -100;
            }
            if ((long)this_00->c * this_00->cstep == 0) {
              return -100;
            }
            if (uVar66 != 1 || pMVar9[1].w != 1) {
              if (0 < (int)uVar64) {
                pvVar56 = pMVar9->data;
                pvVar63 = pMVar9[1].data;
                lVar60 = 0;
                do {
                  auVar106 = *(undefined1 (*) [16])((long)pvVar56 + lVar60);
                  auVar103 = *(undefined1 (*) [16])((long)pvVar63 + lVar60);
                  auVar83 = vrcpps_avx(auVar103);
                  auVar291._0_4_ = auVar106._0_4_ * auVar83._0_4_;
                  auVar291._4_4_ = auVar106._4_4_ * auVar83._4_4_;
                  auVar291._8_4_ = auVar106._8_4_ * auVar83._8_4_;
                  auVar291._12_4_ = auVar106._12_4_ * auVar83._12_4_;
                  auVar106 = vfmsub213ps_fma(auVar103,auVar291,auVar106);
                  auVar106 = vfnmadd213ps_fma(auVar106,auVar83,auVar291);
                  *(undefined1 (*) [16])((long)pvVar12 + lVar60) = auVar106;
                  lVar60 = lVar60 + 0x10;
                  uVar66 = (int)uVar47 - 1;
                  uVar47 = (ulong)uVar66;
                } while (uVar66 != 0);
                return 0;
              }
              return 0;
            }
            if (0 < (int)uVar64) {
              fVar203 = 1.0 / *pMVar1->data;
              pvVar56 = pMVar9->data;
              lVar60 = 0;
              do {
                pfVar57 = (float *)((long)pvVar56 + lVar60);
                fVar31 = pfVar57[1];
                fVar32 = pfVar57[2];
                fVar33 = pfVar57[3];
                pfVar58 = (float *)((long)pvVar12 + lVar60);
                *pfVar58 = fVar203 * *pfVar57;
                pfVar58[1] = fVar203 * fVar31;
                pfVar58[2] = fVar203 * fVar32;
                pfVar58[3] = fVar203 * fVar33;
                lVar60 = lVar60 + 0x10;
                uVar66 = (int)uVar47 - 1;
                uVar47 = (ulong)uVar66;
              } while (uVar66 != 0);
              return 0;
            }
            return 0;
          }
          if (iVar59 == 2) {
            Mat::create(this_00,uVar65,uVar5,sVar11,uVar66,opt->blob_allocator);
            pauVar50 = (undefined1 (*) [16])this_00->data;
            if (pauVar50 == (undefined1 (*) [16])0x0) {
              return -100;
            }
            if ((long)this_00->c * this_00->cstep != 0) {
              if (0 < (int)uVar5) {
                pauVar55 = (undefined1 (*) [16])pMVar9->data;
                pauVar53 = (undefined1 (*) [16])pMVar9[1].data;
                uVar66 = 0;
                do {
                  if (0 < (int)uVar65) {
                    auVar106 = *pauVar55;
                    uVar64 = uVar65;
                    do {
                      auVar103 = vrcpps_avx(*pauVar53);
                      auVar280._0_4_ = auVar106._0_4_ * auVar103._0_4_;
                      auVar280._4_4_ = auVar106._4_4_ * auVar103._4_4_;
                      auVar280._8_4_ = auVar106._8_4_ * auVar103._8_4_;
                      auVar280._12_4_ = auVar106._12_4_ * auVar103._12_4_;
                      auVar83 = vfmsub213ps_fma(*pauVar53,auVar280,auVar106);
                      auVar103 = vfnmadd213ps_fma(auVar83,auVar103,auVar280);
                      *pauVar50 = auVar103;
                      pauVar53 = pauVar53 + 1;
                      pauVar50 = pauVar50 + 1;
                      uVar64 = uVar64 - 1;
                    } while (uVar64 != 0);
                  }
                  pauVar55 = pauVar55 + 1;
                  uVar66 = uVar66 + 1;
                } while (uVar66 != uVar5);
                return 0;
              }
              return 0;
            }
            return -100;
          }
          if (iVar59 != 3) {
            return 0;
          }
          Mat::create(this_00,uVar65,uVar5,uVar6,sVar11,uVar66,opt->blob_allocator);
          if (this_00->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep == 0) {
            return -100;
          }
          if (0 < (int)local_138) {
            uVar47 = 0;
            do {
              if (0 < iVar72) {
                sVar71 = this_00->cstep;
                sVar11 = this_00->elemsize;
                auVar106 = *(undefined1 (*) [16])((long)pMVar9->data + uVar47 * 0x10);
                pvVar12 = this_00->data;
                sVar13 = pMVar9[1].cstep;
                sVar14 = pMVar9[1].elemsize;
                pvVar56 = pMVar9[1].data;
                lVar60 = 0;
                iVar45 = iVar72;
                do {
                  auVar103 = *(undefined1 (*) [16])
                              ((long)pvVar56 + lVar60 + sVar13 * sVar14 * uVar47);
                  auVar83 = vrcpps_avx(auVar103);
                  auVar275._0_4_ = auVar106._0_4_ * auVar83._0_4_;
                  auVar275._4_4_ = auVar106._4_4_ * auVar83._4_4_;
                  auVar275._8_4_ = auVar106._8_4_ * auVar83._8_4_;
                  auVar275._12_4_ = auVar106._12_4_ * auVar83._12_4_;
                  auVar103 = vfmsub213ps_fma(auVar103,auVar275,auVar106);
                  auVar103 = vfnmadd213ps_fma(auVar103,auVar83,auVar275);
                  *(undefined1 (*) [16])((long)pvVar12 + lVar60 + sVar71 * sVar11 * uVar47) =
                       auVar103;
                  lVar60 = lVar60 + 0x10;
                  iVar45 = iVar45 + -1;
                } while (iVar45 != 0);
              }
              uVar47 = uVar47 + 1;
            } while (uVar47 != local_138);
            return 0;
          }
          return 0;
        }
        if (iVar59 == 1) {
          Mat::create(this_00,uVar65,sVar11,uVar66,opt->blob_allocator);
          pvVar12 = this_00->data;
          if (pvVar12 == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep != 0) {
            if (0 < (int)uVar65) {
              fVar203 = *pMVar9->data;
              auVar96._4_4_ = fVar203;
              auVar96._0_4_ = fVar203;
              auVar96._8_4_ = fVar203;
              auVar96._12_4_ = fVar203;
              pvVar56 = pMVar1->data;
              lVar60 = 0;
              do {
                auVar106 = *(undefined1 (*) [16])((long)pvVar56 + lVar60);
                auVar103 = vrcpps_avx(auVar106);
                auVar281._0_4_ = fVar203 * auVar103._0_4_;
                auVar281._4_4_ = fVar203 * auVar103._4_4_;
                auVar281._8_4_ = fVar203 * auVar103._8_4_;
                auVar281._12_4_ = fVar203 * auVar103._12_4_;
                auVar106 = vfmsub213ps_fma(auVar106,auVar281,auVar96);
                auVar106 = vfnmadd213ps_fma(auVar106,auVar103,auVar281);
                *(undefined1 (*) [16])((long)pvVar12 + lVar60) = auVar106;
                lVar60 = lVar60 + 0x10;
                uVar65 = uVar65 - 1;
              } while (uVar65 != 0);
              return 0;
            }
            return 0;
          }
          return -100;
        }
        if (iVar59 == 2) {
          Mat::create(this_00,uVar65,uVar5,sVar11,uVar66,opt->blob_allocator);
          pvVar12 = this_00->data;
          if (pvVar12 == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep != 0) {
            if (0 < iVar72) {
              fVar203 = *pMVar9->data;
              auVar93._4_4_ = fVar203;
              auVar93._0_4_ = fVar203;
              auVar93._8_4_ = fVar203;
              auVar93._12_4_ = fVar203;
              pvVar56 = pMVar1->data;
              lVar60 = 0;
              do {
                auVar106 = *(undefined1 (*) [16])((long)pvVar56 + lVar60);
                auVar103 = vrcpps_avx(auVar106);
                auVar279._0_4_ = fVar203 * auVar103._0_4_;
                auVar279._4_4_ = fVar203 * auVar103._4_4_;
                auVar279._8_4_ = fVar203 * auVar103._8_4_;
                auVar279._12_4_ = fVar203 * auVar103._12_4_;
                auVar106 = vfmsub213ps_fma(auVar106,auVar279,auVar93);
                auVar106 = vfnmadd213ps_fma(auVar106,auVar103,auVar279);
                *(undefined1 (*) [16])((long)pvVar12 + lVar60) = auVar106;
                lVar60 = lVar60 + 0x10;
                iVar72 = iVar72 + -1;
              } while (iVar72 != 0);
              return 0;
            }
            return 0;
          }
          return -100;
        }
        if (iVar59 != 3) {
          return 0;
        }
        Mat::create(this_00,uVar65,uVar5,uVar6,sVar11,uVar66,opt->blob_allocator);
        if (this_00->data == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep == 0) {
          return -100;
        }
        if (0 < (int)local_138) {
          fVar203 = *pMVar9->data;
          auVar77._4_4_ = fVar203;
          auVar77._0_4_ = fVar203;
          auVar77._8_4_ = fVar203;
          auVar77._12_4_ = fVar203;
          uVar47 = 0;
          do {
            if (0 < iVar72) {
              sVar71 = this_00->cstep;
              sVar11 = this_00->elemsize;
              pvVar12 = this_00->data;
              sVar13 = pMVar9[1].cstep;
              sVar14 = pMVar9[1].elemsize;
              pvVar56 = pMVar9[1].data;
              lVar60 = 0;
              iVar45 = iVar72;
              do {
                auVar106 = *(undefined1 (*) [16])((long)pvVar56 + lVar60 + sVar13 * sVar14 * uVar47)
                ;
                auVar103 = vrcpps_avx(auVar106);
                auVar273._0_4_ = fVar203 * auVar103._0_4_;
                auVar273._4_4_ = fVar203 * auVar103._4_4_;
                auVar273._8_4_ = fVar203 * auVar103._8_4_;
                auVar273._12_4_ = fVar203 * auVar103._12_4_;
                auVar106 = vfmsub213ps_fma(auVar106,auVar273,auVar77);
                auVar106 = vfnmadd213ps_fma(auVar106,auVar103,auVar273);
                *(undefined1 (*) [16])((long)pvVar12 + lVar60 + sVar71 * sVar11 * uVar47) = auVar106
                ;
                lVar60 = lVar60 + 0x10;
                iVar45 = iVar45 + -1;
              } while (iVar45 != 0);
            }
            uVar47 = uVar47 + 1;
          } while (uVar47 != local_138);
          return 0;
        }
        return 0;
      }
      uVar7 = pMVar9->h;
      local_130 = (void *)CONCAT44(local_130._4_4_,uVar7 * uVar64);
      if (iVar59 == 2) {
        if (pMVar9[1].dims == 3) {
          Mat::create(this_00,uVar65,uVar5,uVar6,sVar11,uVar66,opt->blob_allocator);
          if (this_00->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep != 0) {
            if (0 < (int)local_138) {
              uVar47 = 0;
              do {
                if (0 < (int)uVar5) {
                  pauVar50 = (undefined1 (*) [16])
                             (this_00->cstep * uVar47 * this_00->elemsize + (long)this_00->data);
                  pauVar55 = (undefined1 (*) [16])
                             (pMVar9[1].cstep * uVar47 * pMVar9[1].elemsize + (long)pMVar9[1].data);
                  pauVar53 = (undefined1 (*) [16])
                             ((long)pMVar9->w * uVar47 * pMVar9->elemsize + (long)pMVar9->data);
                  uVar66 = 0;
                  do {
                    if (0 < (int)uVar65) {
                      auVar106 = *pauVar53;
                      uVar64 = uVar65;
                      do {
                        auVar103 = vrcpps_avx(*pauVar55);
                        auVar272._0_4_ = auVar106._0_4_ * auVar103._0_4_;
                        auVar272._4_4_ = auVar106._4_4_ * auVar103._4_4_;
                        auVar272._8_4_ = auVar106._8_4_ * auVar103._8_4_;
                        auVar272._12_4_ = auVar106._12_4_ * auVar103._12_4_;
                        auVar83 = vfmsub213ps_fma(*pauVar55,auVar272,auVar106);
                        auVar103 = vfnmadd213ps_fma(auVar83,auVar103,auVar272);
                        *pauVar50 = auVar103;
                        pauVar55 = pauVar55 + 1;
                        pauVar50 = pauVar50 + 1;
                        uVar64 = uVar64 - 1;
                      } while (uVar64 != 0);
                    }
                    pauVar53 = pauVar53 + 1;
                    uVar66 = uVar66 + 1;
                  } while (uVar66 != uVar5);
                }
                uVar47 = uVar47 + 1;
              } while (uVar47 != local_138);
              return 0;
            }
            return 0;
          }
          return -100;
        }
        local_128 = CONCAT44(uVar4,uVar66);
        Mat::create(this_00,uVar64,uVar7,sVar71,iVar45,opt->blob_allocator);
        pvVar12 = this_00->data;
        if (pvVar12 == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep == 0) {
          return -100;
        }
        if (pMVar9[1].dims != 1) {
          if (pMVar9[1].dims != 2) {
            return 0;
          }
          if (0 < (int)local_130) {
            pvVar56 = pMVar9->data;
            pvVar63 = pMVar9[1].data;
            lVar60 = 0;
            do {
              auVar106 = *(undefined1 (*) [16])((long)pvVar56 + lVar60);
              auVar103 = *(undefined1 (*) [16])((long)pvVar63 + lVar60);
              auVar83 = vrcpps_avx(auVar103);
              auVar274._0_4_ = auVar106._0_4_ * auVar83._0_4_;
              auVar274._4_4_ = auVar106._4_4_ * auVar83._4_4_;
              auVar274._8_4_ = auVar106._8_4_ * auVar83._8_4_;
              auVar274._12_4_ = auVar106._12_4_ * auVar83._12_4_;
              auVar106 = vfmsub213ps_fma(auVar103,auVar274,auVar106);
              auVar106 = vfnmadd213ps_fma(auVar106,auVar83,auVar274);
              *(undefined1 (*) [16])((long)pvVar12 + lVar60) = auVar106;
              lVar60 = lVar60 + 0x10;
              local_130._0_4_ = (int)local_130 + -1;
            } while ((int)local_130 != 0);
            return 0;
          }
          return 0;
        }
        Mat::create(this_00,uVar64,uVar7,sVar71,iVar45,opt->blob_allocator);
        pfVar57 = (float *)this_00->data;
        if (pfVar57 == (float *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep != 0) {
          if ((int)local_128 != 1 || pMVar9[1].w != 1) {
            if (0 < (int)uVar7) {
              pfVar58 = (float *)pMVar9->data;
              pauVar50 = (undefined1 (*) [16])pMVar9[1].data;
              uVar66 = 0;
              auVar129._8_4_ = 0x3f800000;
              auVar129._0_8_ = 0x3f8000003f800000;
              auVar129._12_4_ = 0x3f800000;
              do {
                if (0 < (int)uVar64) {
                  auVar106 = vrcpps_avx(*pauVar50);
                  auVar103 = vfmsub213ps_fma(*pauVar50,auVar106,auVar129);
                  auVar106 = vfnmadd132ps_fma(auVar103,auVar106,auVar106);
                  uVar46 = uVar47;
                  do {
                    fVar203 = pfVar58[1];
                    fVar31 = pfVar58[2];
                    fVar32 = pfVar58[3];
                    *pfVar57 = auVar106._0_4_ * *pfVar58;
                    pfVar57[1] = auVar106._4_4_ * fVar203;
                    pfVar57[2] = auVar106._8_4_ * fVar31;
                    pfVar57[3] = auVar106._12_4_ * fVar32;
                    pfVar58 = pfVar58 + 4;
                    pfVar57 = pfVar57 + 4;
                    uVar65 = (int)uVar46 - 1;
                    uVar46 = (ulong)uVar65;
                  } while (uVar65 != 0);
                }
                pauVar50 = pauVar50 + 1;
                uVar66 = uVar66 + 1;
              } while (uVar66 != uVar7);
              return 0;
            }
            return 0;
          }
          if (0 < (int)local_130) {
            fVar203 = 1.0 / *pMVar1->data;
            pvVar12 = pMVar9->data;
            lVar60 = 0;
            do {
              pfVar58 = (float *)((long)pvVar12 + lVar60);
              fVar31 = pfVar58[1];
              fVar32 = pfVar58[2];
              fVar33 = pfVar58[3];
              pfVar2 = (float *)((long)pfVar57 + lVar60);
              *pfVar2 = fVar203 * *pfVar58;
              pfVar2[1] = fVar203 * fVar31;
              pfVar2[2] = fVar203 * fVar32;
              pfVar2[3] = fVar203 * fVar33;
              lVar60 = lVar60 + 0x10;
              local_130._0_4_ = (int)local_130 + -1;
            } while ((int)local_130 != 0);
            return 0;
          }
          return 0;
        }
        return -100;
      }
      if (iVar59 != 3) {
        return 0;
      }
      uVar8 = pMVar9->c;
      uVar46 = (ulong)uVar8;
      if (pMVar9[1].dims != 3) {
        Mat::create(this_00,uVar64,uVar7,uVar8,sVar71,iVar45,opt->blob_allocator);
        if (this_00->data == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep == 0) {
          return -100;
        }
        if (pMVar9[1].dims == 1) {
          if (uVar66 != 1 || pMVar9[1].w != 1) {
            if (0 < (int)uVar8) {
              uVar47 = 0;
              auVar120._8_4_ = 0x3f800000;
              auVar120._0_8_ = 0x3f8000003f800000;
              auVar120._12_4_ = 0x3f800000;
              do {
                if (0 < (int)local_130) {
                  sVar71 = pMVar9->cstep;
                  auVar106 = *(undefined1 (*) [16])((long)pMVar9[1].data + uVar47 * 0x10);
                  auVar103 = vrcpps_avx(auVar106);
                  sVar11 = this_00->cstep;
                  sVar13 = this_00->elemsize;
                  auVar106 = vfmsub213ps_fma(auVar106,auVar103,auVar120);
                  pvVar12 = this_00->data;
                  auVar106 = vfnmadd132ps_fma(auVar106,auVar103,auVar103);
                  sVar14 = pMVar9->elemsize;
                  pvVar56 = pMVar9->data;
                  lVar60 = 0;
                  iVar45 = (int)local_130;
                  do {
                    pfVar57 = (float *)((long)pvVar56 + lVar60 + sVar71 * sVar14 * uVar47);
                    fVar203 = pfVar57[1];
                    fVar31 = pfVar57[2];
                    fVar32 = pfVar57[3];
                    pfVar58 = (float *)((long)pvVar12 + lVar60 + sVar11 * sVar13 * uVar47);
                    *pfVar58 = auVar106._0_4_ * *pfVar57;
                    pfVar58[1] = auVar106._4_4_ * fVar203;
                    pfVar58[2] = auVar106._8_4_ * fVar31;
                    pfVar58[3] = auVar106._12_4_ * fVar32;
                    lVar60 = lVar60 + 0x10;
                    iVar45 = iVar45 + -1;
                  } while (iVar45 != 0);
                }
                uVar47 = uVar47 + 1;
              } while (uVar47 != uVar46);
              return 0;
            }
            return 0;
          }
          if (0 < (int)uVar8) {
            fVar203 = 1.0 / *pMVar9[1].data;
            uVar47 = 0;
            do {
              if (0 < (int)local_130) {
                sVar71 = this_00->cstep;
                sVar11 = this_00->elemsize;
                pvVar12 = this_00->data;
                sVar13 = pMVar9->cstep;
                sVar14 = pMVar9->elemsize;
                pvVar56 = pMVar9->data;
                lVar60 = 0;
                iVar45 = (int)local_130;
                do {
                  pfVar57 = (float *)((long)pvVar56 + lVar60 + sVar13 * sVar14 * uVar47);
                  auVar222._0_4_ = fVar203 * *pfVar57;
                  auVar222._4_4_ = fVar203 * pfVar57[1];
                  auVar222._8_4_ = fVar203 * pfVar57[2];
                  auVar222._12_4_ = fVar203 * pfVar57[3];
                  *(undefined1 (*) [16])((long)pvVar12 + lVar60 + sVar71 * sVar11 * uVar47) =
                       auVar222;
                  lVar60 = lVar60 + 0x10;
                  iVar45 = iVar45 + -1;
                } while (iVar45 != 0);
              }
              uVar47 = uVar47 + 1;
            } while (uVar47 != uVar46);
            return 0;
          }
          return 0;
        }
        if (pMVar9[1].dims != 2) {
          return 0;
        }
        if (0 < (int)uVar8) {
          uVar48 = 0;
          auVar82._8_4_ = 0x3f800000;
          auVar82._0_8_ = 0x3f8000003f800000;
          auVar82._12_4_ = 0x3f800000;
          do {
            if (0 < (int)uVar7) {
              pfVar57 = (float *)(this_00->cstep * uVar48 * this_00->elemsize + (long)this_00->data)
              ;
              pauVar50 = (undefined1 (*) [16])
                         ((long)pMVar9[1].w * uVar48 * pMVar9[1].elemsize + (long)pMVar9[1].data);
              pfVar58 = (float *)(pMVar9->cstep * uVar48 * pMVar9->elemsize + (long)pMVar9->data);
              uVar66 = 0;
              do {
                if (0 < (int)uVar64) {
                  auVar106 = vrcpps_avx(*pauVar50);
                  auVar103 = vfmsub213ps_fma(*pauVar50,auVar106,auVar82);
                  auVar106 = vfnmadd132ps_fma(auVar103,auVar106,auVar106);
                  uVar62 = uVar47;
                  do {
                    fVar203 = pfVar58[1];
                    fVar31 = pfVar58[2];
                    fVar32 = pfVar58[3];
                    *pfVar57 = auVar106._0_4_ * *pfVar58;
                    pfVar57[1] = auVar106._4_4_ * fVar203;
                    pfVar57[2] = auVar106._8_4_ * fVar31;
                    pfVar57[3] = auVar106._12_4_ * fVar32;
                    pfVar58 = pfVar58 + 4;
                    pfVar57 = pfVar57 + 4;
                    uVar65 = (int)uVar62 - 1;
                    uVar62 = (ulong)uVar65;
                  } while (uVar65 != 0);
                }
                pauVar50 = pauVar50 + 1;
                uVar66 = uVar66 + 1;
              } while (uVar66 != uVar7);
            }
            uVar48 = uVar48 + 1;
          } while (uVar48 != uVar46);
          return 0;
        }
        return 0;
      }
      if (uVar8 == uVar6 && ((uVar65 ^ 1) == 0 && (uVar5 ^ 1) == 0)) {
        Mat::create(this_00,uVar64,uVar7,uVar8,sVar71,iVar45,opt->blob_allocator);
        if (this_00->data == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep != 0) {
          if (0 < (int)uVar8) {
            uVar47 = 0;
            auVar75._8_4_ = 0x3f800000;
            auVar75._0_8_ = 0x3f8000003f800000;
            auVar75._12_4_ = 0x3f800000;
            do {
              if (0 < (int)local_130) {
                sVar71 = pMVar9->cstep;
                auVar106 = *(undefined1 (*) [16])
                            ((long)pMVar9[1].data + pMVar9[1].cstep * uVar47 * pMVar9[1].elemsize);
                auVar103 = vrcpps_avx(auVar106);
                auVar106 = vfmsub213ps_fma(auVar106,auVar103,auVar75);
                sVar11 = pMVar9->elemsize;
                auVar106 = vfnmadd132ps_fma(auVar106,auVar103,auVar103);
                pvVar12 = pMVar9->data;
                sVar13 = this_00->cstep;
                sVar14 = this_00->elemsize;
                pvVar56 = this_00->data;
                lVar60 = 0;
                iVar45 = (int)local_130;
                do {
                  pfVar57 = (float *)((long)pvVar12 + lVar60 + sVar71 * sVar11 * uVar47);
                  fVar203 = pfVar57[1];
                  fVar31 = pfVar57[2];
                  fVar32 = pfVar57[3];
                  pfVar58 = (float *)((long)pvVar56 + lVar60 + sVar13 * sVar14 * uVar47);
                  *pfVar58 = auVar106._0_4_ * *pfVar57;
                  pfVar58[1] = auVar106._4_4_ * fVar203;
                  pfVar58[2] = auVar106._8_4_ * fVar31;
                  pfVar58[3] = auVar106._12_4_ * fVar32;
                  lVar60 = lVar60 + 0x10;
                  iVar45 = iVar45 + -1;
                } while (iVar45 != 0);
              }
              uVar47 = uVar47 + 1;
            } while (uVar47 != uVar46);
            return 0;
          }
          return 0;
        }
        return -100;
      }
      if (uVar65 == uVar64) {
        if (uVar66 == 1 && (uVar6 == 1 && uVar5 == uVar7)) {
          Mat::create(this_00,uVar64,uVar7,uVar8,sVar71,iVar45,opt->blob_allocator);
          if (this_00->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep != 0) {
            if (0 < (int)uVar8) {
              uVar47 = 0;
              do {
                if (0 < (int)local_130) {
                  sVar71 = pMVar9->cstep;
                  sVar11 = pMVar9->elemsize;
                  sVar13 = this_00->cstep;
                  pvVar12 = pMVar9->data;
                  pvVar56 = pMVar9[1].data;
                  sVar14 = this_00->elemsize;
                  pvVar63 = this_00->data;
                  lVar60 = 0;
                  iVar45 = (int)local_130;
                  do {
                    fVar203 = 1.0 / *(float *)((long)pvVar56 + lVar60);
                    pfVar57 = (float *)((long)pvVar12 + lVar60 * 4 + sVar71 * sVar11 * uVar47);
                    auVar215._0_4_ = fVar203 * *pfVar57;
                    auVar215._4_4_ = fVar203 * pfVar57[1];
                    auVar215._8_4_ = fVar203 * pfVar57[2];
                    auVar215._12_4_ = fVar203 * pfVar57[3];
                    *(undefined1 (*) [16])((long)pvVar63 + lVar60 * 4 + sVar13 * sVar14 * uVar47) =
                         auVar215;
                    lVar60 = lVar60 + 4;
                    iVar45 = iVar45 + -1;
                  } while (iVar45 != 0);
                }
                uVar47 = uVar47 + 1;
              } while (uVar47 != uVar46);
              return 0;
            }
            return 0;
          }
          return -100;
        }
        local_128 = CONCAT71(local_128._1_7_,uVar64 == 1);
        local_104 = CONCAT31(local_104._1_3_,uVar7 == 1);
        if ((uVar64 != 1 || uVar7 != 1) || uVar6 != uVar8) {
          if (((iVar45 == 1) && (uVar5 == uVar7)) && (uVar8 == 1)) {
            local_110 = uVar46;
            Mat::create(this_00,uVar64,uVar7,uVar6,sVar11,uVar66,opt->blob_allocator);
            if (this_00->data == (void *)0x0) {
              return -100;
            }
            if ((long)this_00->c * this_00->cstep != 0) {
              if (0 < (int)local_138) {
                uVar47 = 0;
                do {
                  if (0 < iVar72) {
                    sVar71 = pMVar9[1].cstep;
                    sVar11 = pMVar9[1].elemsize;
                    sVar13 = this_00->cstep;
                    pvVar12 = pMVar9[1].data;
                    pvVar56 = pMVar9->data;
                    sVar14 = this_00->elemsize;
                    pvVar63 = this_00->data;
                    lVar60 = 0;
                    iVar45 = iVar72;
                    do {
                      fVar203 = *(float *)((long)pvVar56 + lVar60);
                      auVar123._4_4_ = fVar203;
                      auVar123._0_4_ = fVar203;
                      auVar123._8_4_ = fVar203;
                      auVar123._12_4_ = fVar203;
                      auVar106 = *(undefined1 (*) [16])
                                  ((long)pvVar12 + lVar60 * 4 + sVar71 * sVar11 * uVar47);
                      auVar103 = vrcpps_avx(auVar106);
                      auVar290._0_4_ = fVar203 * auVar103._0_4_;
                      auVar290._4_4_ = fVar203 * auVar103._4_4_;
                      auVar290._8_4_ = fVar203 * auVar103._8_4_;
                      auVar290._12_4_ = fVar203 * auVar103._12_4_;
                      auVar106 = vfmsub213ps_fma(auVar106,auVar290,auVar123);
                      auVar106 = vfnmadd213ps_fma(auVar106,auVar103,auVar290);
                      *(undefined1 (*) [16])((long)pvVar63 + lVar60 * 4 + sVar13 * sVar14 * uVar47)
                           = auVar106;
                      lVar60 = lVar60 + 4;
                      iVar45 = iVar45 + -1;
                    } while (iVar45 != 0);
                  }
                  uVar47 = uVar47 + 1;
                } while (uVar47 != local_138);
                return 0;
              }
              return 0;
            }
            return -100;
          }
LAB_00248697:
          if ((((uVar65 ^ 1) == 0 && uVar5 == uVar7) && uVar8 == uVar6) && uVar64 != 1) {
            local_110 = uVar46;
            Mat::create(this_00,uVar64,uVar7,uVar8,sVar71,iVar45,opt->blob_allocator);
            if (this_00->data == (void *)0x0) {
              return -100;
            }
            if ((long)this_00->c * this_00->cstep != 0) {
              if (0 < (int)uVar8) {
                uVar48 = 0;
                auVar101._8_4_ = 0x3f800000;
                auVar101._0_8_ = 0x3f8000003f800000;
                auVar101._12_4_ = 0x3f800000;
                do {
                  if (0 < (int)uVar7) {
                    sVar71 = pMVar9[1].cstep;
                    sVar11 = pMVar9[1].elemsize;
                    pvVar12 = pMVar9[1].data;
                    pfVar57 = (float *)(this_00->cstep * uVar48 * this_00->elemsize +
                                       (long)this_00->data);
                    pfVar58 = (float *)(pMVar9->cstep * uVar48 * pMVar9->elemsize +
                                       (long)pMVar9->data);
                    uVar62 = 0;
                    do {
                      if (0 < (int)uVar64) {
                        auVar106 = *(undefined1 (*) [16])
                                    ((long)pvVar12 + uVar62 * 0x10 + sVar71 * uVar48 * sVar11);
                        auVar103 = vrcpps_avx(auVar106);
                        auVar106 = vfmsub213ps_fma(auVar106,auVar103,auVar101);
                        auVar106 = vfnmadd132ps_fma(auVar106,auVar103,auVar103);
                        uVar67 = uVar47;
                        do {
                          fVar203 = pfVar58[1];
                          fVar31 = pfVar58[2];
                          fVar32 = pfVar58[3];
                          *pfVar57 = auVar106._0_4_ * *pfVar58;
                          pfVar57[1] = auVar106._4_4_ * fVar203;
                          pfVar57[2] = auVar106._8_4_ * fVar31;
                          pfVar57[3] = auVar106._12_4_ * fVar32;
                          pfVar58 = pfVar58 + 4;
                          pfVar57 = pfVar57 + 4;
                          uVar66 = (int)uVar67 - 1;
                          uVar67 = (ulong)uVar66;
                        } while (uVar66 != 0);
                      }
                      uVar62 = uVar62 + 1;
                    } while (uVar62 != uVar7);
                  }
                  uVar48 = uVar48 + 1;
                } while (uVar48 != uVar46);
                return 0;
              }
              return 0;
            }
            return -100;
          }
          if (((uVar65 == uVar64 && (uVar5 ^ 1) == 0) && uVar8 == uVar6) && uVar7 != 1) {
            local_110 = uVar46;
            Mat::create(this_00,uVar64,uVar7,uVar8,sVar71,iVar45,opt->blob_allocator);
            if (this_00->data == (void *)0x0) {
              return -100;
            }
            if ((long)this_00->c * this_00->cstep != 0) {
              if (0 < (int)uVar8) {
                uVar48 = 0;
                do {
                  if (0 < (int)uVar7) {
                    sVar71 = pMVar9[1].elemsize;
                    pvVar56 = (void *)(this_00->cstep * uVar48 * this_00->elemsize +
                                      (long)this_00->data);
                    pvVar63 = (void *)(pMVar9->cstep * uVar48 * pMVar9->elemsize +
                                      (long)pMVar9->data);
                    sVar11 = pMVar9[1].cstep;
                    pvVar12 = pMVar9[1].data;
                    uVar66 = 0;
                    do {
                      if (0 < (int)uVar64) {
                        lVar60 = 0;
                        do {
                          auVar106 = *(undefined1 (*) [16])((long)pvVar63 + lVar60);
                          auVar103 = *(undefined1 (*) [16])
                                      ((long)pvVar12 + lVar60 + sVar71 * sVar11 * uVar48);
                          auVar83 = vrcpps_avx(auVar103);
                          auVar287._0_4_ = auVar106._0_4_ * auVar83._0_4_;
                          auVar287._4_4_ = auVar106._4_4_ * auVar83._4_4_;
                          auVar287._8_4_ = auVar106._8_4_ * auVar83._8_4_;
                          auVar287._12_4_ = auVar106._12_4_ * auVar83._12_4_;
                          auVar106 = vfmsub213ps_fma(auVar103,auVar287,auVar106);
                          auVar106 = vfnmadd213ps_fma(auVar106,auVar83,auVar287);
                          *(undefined1 (*) [16])((long)pvVar56 + lVar60) = auVar106;
                          lVar60 = lVar60 + 0x10;
                        } while (uVar47 << 4 != lVar60);
                        pvVar56 = (void *)((long)pvVar56 + lVar60);
                        pvVar63 = (void *)((long)pvVar63 + lVar60);
                      }
                      uVar66 = uVar66 + 1;
                    } while (uVar66 != uVar7);
                  }
                  uVar48 = uVar48 + 1;
                } while (uVar48 != uVar46);
                return 0;
              }
              return 0;
            }
            return -100;
          }
          if (((uVar6 == uVar8 && uVar5 == uVar7) & uVar65 != 1 & (byte)local_128) == 1) {
            local_110 = uVar46;
            Mat::create(this_00,uVar65,uVar7,uVar8,sVar11,uVar66,opt->blob_allocator);
            if (this_00->data == (void *)0x0) {
              return -100;
            }
            if ((long)this_00->c * this_00->cstep != 0) {
              if (0 < (int)uVar8) {
                uVar47 = 0;
                do {
                  if (0 < (int)uVar7) {
                    sVar71 = pMVar9->cstep;
                    sVar11 = pMVar9->elemsize;
                    pvVar12 = pMVar9->data;
                    pauVar50 = (undefined1 (*) [16])
                               (this_00->cstep * uVar47 * this_00->elemsize + (long)this_00->data);
                    pauVar55 = (undefined1 (*) [16])
                               (pMVar9[1].cstep * uVar47 * pMVar9[1].elemsize + (long)pMVar9[1].data
                               );
                    uVar48 = 0;
                    do {
                      if (0 < (int)uVar65) {
                        auVar106 = *(undefined1 (*) [16])
                                    ((long)pvVar12 + uVar48 * 0x10 + sVar71 * uVar47 * sVar11);
                        uVar66 = uVar65;
                        do {
                          auVar103 = vrcpps_avx(*pauVar55);
                          auVar293._0_4_ = auVar106._0_4_ * auVar103._0_4_;
                          auVar293._4_4_ = auVar106._4_4_ * auVar103._4_4_;
                          auVar293._8_4_ = auVar106._8_4_ * auVar103._8_4_;
                          auVar293._12_4_ = auVar106._12_4_ * auVar103._12_4_;
                          auVar83 = vfmsub213ps_fma(*pauVar55,auVar293,auVar106);
                          auVar103 = vfnmadd213ps_fma(auVar83,auVar103,auVar293);
                          *pauVar50 = auVar103;
                          pauVar55 = pauVar55 + 1;
                          pauVar50 = pauVar50 + 1;
                          uVar66 = uVar66 - 1;
                        } while (uVar66 != 0);
                      }
                      uVar48 = uVar48 + 1;
                    } while (uVar48 != uVar7);
                  }
                  uVar47 = uVar47 + 1;
                } while (uVar47 != uVar46);
                return 0;
              }
              return 0;
            }
            return -100;
          }
          if (((byte)local_104 & uVar6 == uVar8 & (uVar5 != 1 && uVar65 == uVar64)) == 1) {
            local_110 = uVar46;
            Mat::create(this_00,uVar64,uVar5,uVar8,sVar11,uVar66,opt->blob_allocator);
            if (this_00->data == (void *)0x0) {
              return -100;
            }
            if ((long)local_120->c * local_120->cstep != 0) {
              if (0 < (int)local_110) {
                local_158 = (__m256 *)0x0;
                do {
                  pMVar1 = local_a0;
                  afVar185 = _local_100;
                  bVar74 = local_a0->dims == 3;
                  local_c8 = 1;
                  if (!bVar74) {
                    local_c8 = local_a0->d;
                  }
                  local_d4 = local_a0->w;
                  local_d0 = local_a0->h;
                  sVar71 = local_a0->cstep;
                  pvVar12 = local_a0->data;
                  local_130 = (void *)local_a0->elemsize;
                  local_e0 = local_a0->allocator;
                  _fStack_f8 = 0;
                  local_100 = (undefined1  [8])
                              (sVar71 * (long)local_158 * (long)local_130 + (long)pvVar12);
                  uStack_f0 = local_130;
                  fStack_e4 = afVar185[7];
                  fStack_e8 = (float)local_a0->elempack;
                  local_d8 = bVar74 ^ 3;
                  local_c0 = (long)local_d0 * (long)local_d4;
                  local_cc = 1;
                  Mat::~Mat((Mat *)local_100);
                  bVar74 = pMVar1[1].dims == 3;
                  local_c8 = 1;
                  if (!bVar74) {
                    local_c8 = pMVar1[1].d;
                  }
                  local_d4 = pMVar1[1].w;
                  local_d0 = pMVar1[1].h;
                  pvVar56 = (void *)(pMVar1[1].cstep * (long)local_158 * pMVar1[1].elemsize +
                                    (long)pMVar1[1].data);
                  local_d8 = bVar74 ^ 3;
                  local_e0 = pMVar1[1].allocator;
                  _fStack_f8 = 0;
                  local_100 = (undefined1  [8])pvVar56;
                  uStack_f0 = pMVar1[1].elemsize;
                  fStack_e8 = (float)pMVar1[1].elempack;
                  local_c0 = (long)local_d0 * (long)local_d4;
                  local_cc = 1;
                  Mat::~Mat((Mat *)local_100);
                  bVar74 = local_120->dims == 3;
                  local_d4 = local_120->w;
                  local_d0 = local_120->h;
                  local_c8 = 1;
                  if (!bVar74) {
                    local_c8 = local_120->d;
                  }
                  sVar11 = local_120->elemsize;
                  pvVar63 = (void *)(local_120->cstep * (long)local_158 * sVar11 +
                                    (long)local_120->data);
                  local_d8 = bVar74 ^ 3;
                  local_e0 = local_120->allocator;
                  fStack_f8 = 0.0;
                  fStack_f4 = 0.0;
                  local_100 = (undefined1  [8])pvVar63;
                  uStack_f0._0_4_ = (float)(int)sVar11;
                  uStack_f0._4_4_ = (float)(int)(sVar11 >> 0x20);
                  fStack_e8 = (float)local_120->elempack;
                  local_c0 = (long)local_d0 * (long)local_d4;
                  local_cc = 1;
                  Mat::~Mat((Mat *)local_100);
                  if (0 < (int)uVar5) {
                    uVar66 = 0;
                    do {
                      if (0 < (int)uVar64) {
                        lVar60 = 0;
                        do {
                          auVar106 = *(undefined1 (*) [16])
                                      ((long)pvVar12 +
                                      lVar60 + sVar71 * (long)local_130 * (long)local_158);
                          auVar103 = vrcpps_avx(*(undefined1 (*) [16])((long)pvVar56 + lVar60));
                          auVar295._0_4_ = auVar106._0_4_ * auVar103._0_4_;
                          auVar295._4_4_ = auVar106._4_4_ * auVar103._4_4_;
                          auVar295._8_4_ = auVar106._8_4_ * auVar103._8_4_;
                          auVar295._12_4_ = auVar106._12_4_ * auVar103._12_4_;
                          auVar106 = vfmsub213ps_fma(*(undefined1 (*) [16])((long)pvVar56 + lVar60),
                                                     auVar295,auVar106);
                          auVar106 = vfnmadd213ps_fma(auVar106,auVar103,auVar295);
                          *(undefined1 (*) [16])((long)pvVar63 + lVar60) = auVar106;
                          lVar60 = lVar60 + 0x10;
                        } while (uVar47 << 4 != lVar60);
                        pvVar63 = (void *)((long)pvVar63 + lVar60);
                        pvVar56 = (void *)((long)pvVar56 + lVar60);
                      }
                      uVar66 = uVar66 + 1;
                    } while (uVar66 != uVar5);
                  }
                  local_158 = (__m256 *)((long)local_158 + 1);
                } while (local_158 != (__m256 *)local_110);
                return 0;
              }
              return 0;
            }
            return -100;
          }
          local_110 = uVar46;
          Mat::create(this_00,uVar64,uVar7,uVar8,sVar71,iVar45,opt->blob_allocator);
          if (this_00->data == (void *)0x0) {
            return -100;
          }
          if ((long)local_120->c * local_120->cstep != 0) {
            if (0 < (int)local_110) {
              local_158 = (__m256 *)0x0;
              do {
                pMVar1 = local_a0;
                afVar185 = _local_100;
                bVar74 = local_a0->dims == 3;
                local_c8 = 1;
                if (!bVar74) {
                  local_c8 = local_a0->d;
                }
                local_d4 = local_a0->w;
                local_d0 = local_a0->h;
                sVar71 = local_a0->cstep;
                pvVar12 = local_a0->data;
                sVar11 = local_a0->elemsize;
                local_e0 = local_a0->allocator;
                _fStack_f8 = 0;
                local_100 = (undefined1  [8])(sVar71 * (long)local_158 * sVar11 + (long)pvVar12);
                uStack_f0 = sVar11;
                fStack_e4 = afVar185[7];
                fStack_e8 = (float)local_a0->elempack;
                local_d8 = bVar74 ^ 3;
                local_c0 = (long)local_d0 * (long)local_d4;
                local_cc = 1;
                Mat::~Mat((Mat *)local_100);
                bVar74 = pMVar1[1].dims == 3;
                local_c8 = 1;
                if (!bVar74) {
                  local_c8 = pMVar1[1].d;
                }
                local_d4 = pMVar1[1].w;
                local_d0 = pMVar1[1].h;
                local_138 = pMVar1[1].cstep;
                pvVar56 = pMVar1[1].data;
                local_128 = pMVar1[1].elemsize;
                local_e0 = pMVar1[1].allocator;
                _fStack_f8 = 0;
                local_100 = (undefined1  [8])
                            (local_138 * (long)local_158 * local_128 + (long)pvVar56);
                uStack_f0 = local_128;
                fStack_e8 = (float)pMVar1[1].elempack;
                local_d8 = bVar74 ^ 3;
                local_c0 = (long)local_d0 * (long)local_d4;
                local_cc = 1;
                Mat::~Mat((Mat *)local_100);
                bVar74 = local_120->dims == 3;
                local_d4 = local_120->w;
                local_d0 = local_120->h;
                local_c8 = 1;
                if (!bVar74) {
                  local_c8 = local_120->d;
                }
                sVar13 = local_120->cstep;
                pvVar63 = local_120->data;
                sVar14 = local_120->elemsize;
                local_e0 = local_120->allocator;
                fStack_f8 = 0.0;
                fStack_f4 = 0.0;
                local_100 = (undefined1  [8])(sVar13 * (long)local_158 * sVar14 + (long)pvVar63);
                uStack_f0._0_4_ = (float)(int)sVar14;
                uStack_f0._4_4_ = (float)(int)(sVar14 >> 0x20);
                fStack_e8 = (float)local_120->elempack;
                local_d8 = bVar74 ^ 3;
                local_c0 = (long)local_d0 * (long)local_d4;
                local_cc = 1;
                Mat::~Mat((Mat *)local_100);
                if (0 < (int)local_130) {
                  lVar60 = 0;
                  iVar45 = (int)local_130;
                  do {
                    auVar106 = *(undefined1 (*) [16])
                                ((long)pvVar12 + lVar60 + sVar71 * sVar11 * (long)local_158);
                    auVar103 = *(undefined1 (*) [16])
                                ((long)pvVar56 + lVar60 + local_138 * local_128 * (long)local_158);
                    auVar83 = vrcpps_avx(auVar103);
                    auVar297._0_4_ = auVar106._0_4_ * auVar83._0_4_;
                    auVar297._4_4_ = auVar106._4_4_ * auVar83._4_4_;
                    auVar297._8_4_ = auVar106._8_4_ * auVar83._8_4_;
                    auVar297._12_4_ = auVar106._12_4_ * auVar83._12_4_;
                    auVar106 = vfmsub213ps_fma(auVar103,auVar297,auVar106);
                    auVar106 = vfnmadd213ps_fma(auVar106,auVar83,auVar297);
                    *(undefined1 (*) [16])
                     ((long)pvVar63 + lVar60 + sVar13 * sVar14 * (long)local_158) = auVar106;
                    lVar60 = lVar60 + 0x10;
                    iVar45 = iVar45 + -1;
                  } while (iVar45 != 0);
                }
                local_158 = (__m256 *)((long)local_158 + 1);
              } while (local_158 != (__m256 *)local_110);
              return 0;
            }
            return 0;
          }
          return -100;
        }
      }
      else {
        local_128 = CONCAT71(local_128._1_7_,uVar64 == 1);
        local_104 = CONCAT31(local_104._1_3_,uVar7 == 1);
        local_110 = uVar46;
        if ((uVar64 != 1 || uVar7 != 1) || uVar6 != uVar8) goto LAB_00248697;
      }
      Mat::create(this_00,uVar65,uVar5,uVar6,sVar11,uVar66,opt->blob_allocator);
      if (this_00->data == (void *)0x0) {
        return -100;
      }
      if ((long)this_00->c * this_00->cstep != 0) {
        if (0 < (int)local_138) {
          uVar47 = 0;
          do {
            if (0 < iVar72) {
              sVar71 = this_00->cstep;
              sVar11 = this_00->elemsize;
              auVar106 = *(undefined1 (*) [16])
                          ((long)pMVar9->data + pMVar9->cstep * uVar47 * pMVar9->elemsize);
              pvVar12 = this_00->data;
              sVar13 = pMVar9[1].cstep;
              sVar14 = pMVar9[1].elemsize;
              pvVar56 = pMVar9[1].data;
              lVar60 = 0;
              iVar45 = iVar72;
              do {
                auVar103 = *(undefined1 (*) [16])((long)pvVar56 + lVar60 + sVar13 * sVar14 * uVar47)
                ;
                auVar83 = vrcpps_avx(auVar103);
                auVar286._0_4_ = auVar106._0_4_ * auVar83._0_4_;
                auVar286._4_4_ = auVar106._4_4_ * auVar83._4_4_;
                auVar286._8_4_ = auVar106._8_4_ * auVar83._8_4_;
                auVar286._12_4_ = auVar106._12_4_ * auVar83._12_4_;
                auVar103 = vfmsub213ps_fma(auVar103,auVar286,auVar106);
                auVar103 = vfnmadd213ps_fma(auVar103,auVar83,auVar286);
                *(undefined1 (*) [16])((long)pvVar12 + lVar60 + sVar71 * sVar11 * uVar47) = auVar103
                ;
                lVar60 = lVar60 + 0x10;
                iVar45 = iVar45 + -1;
              } while (iVar45 != 0);
            }
            uVar47 = uVar47 + 1;
          } while (uVar47 != local_138);
          return 0;
        }
        return 0;
      }
      return -100;
    case 4:
      uVar64 = pMVar9->w;
      uVar47 = (ulong)uVar64;
      sVar71 = pMVar9->elemsize;
      uVar65 = pMVar9[1].w;
      uVar5 = pMVar9[1].h;
      uVar6 = pMVar9[1].c;
      local_138 = (ulong)uVar6;
      iVar72 = uVar5 * uVar65;
      sVar11 = pMVar9[1].elemsize;
      iVar59 = pMVar9->dims;
      if (iVar59 == 1) {
        iVar59 = pMVar9[1].dims;
        if (iVar45 != 1 || uVar64 != 1) {
          if (iVar59 == 1) {
            Mat::create(this_00,uVar64,sVar71,iVar45,opt->blob_allocator);
            pvVar12 = this_00->data;
            if (pvVar12 == (void *)0x0) {
              return -100;
            }
            if ((long)this_00->c * this_00->cstep == 0) {
              return -100;
            }
            if (uVar66 != 1 || pMVar9[1].w != 1) {
              if (0 < (int)uVar64) {
                pvVar56 = pMVar9->data;
                pvVar63 = pMVar9[1].data;
                lVar60 = 0;
                do {
                  auVar106 = vmaxps_avx(*(undefined1 (*) [16])((long)pvVar56 + lVar60),
                                        *(undefined1 (*) [16])((long)pvVar63 + lVar60));
                  *(undefined1 (*) [16])((long)pvVar12 + lVar60) = auVar106;
                  lVar60 = lVar60 + 0x10;
                  uVar66 = (int)uVar47 - 1;
                  uVar47 = (ulong)uVar66;
                } while (uVar66 != 0);
                return 0;
              }
              return 0;
            }
            if (0 < (int)uVar64) {
              uVar4 = *pMVar1->data;
              auVar92._4_4_ = uVar4;
              auVar92._0_4_ = uVar4;
              auVar92._8_4_ = uVar4;
              auVar92._12_4_ = uVar4;
              pvVar56 = pMVar9->data;
              lVar60 = 0;
              do {
                auVar106 = vmaxps_avx(auVar92,*(undefined1 (*) [16])((long)pvVar56 + lVar60));
                *(undefined1 (*) [16])((long)pvVar12 + lVar60) = auVar106;
                lVar60 = lVar60 + 0x10;
                uVar66 = (int)uVar47 - 1;
                uVar47 = (ulong)uVar66;
              } while (uVar66 != 0);
              return 0;
            }
            return 0;
          }
          if (iVar59 == 2) {
            Mat::create(this_00,uVar65,uVar5,sVar11,uVar66,opt->blob_allocator);
            pauVar50 = (undefined1 (*) [16])this_00->data;
            if (pauVar50 == (undefined1 (*) [16])0x0) {
              return -100;
            }
            if ((long)this_00->c * this_00->cstep != 0) {
              if (0 < (int)uVar5) {
                pauVar55 = (undefined1 (*) [16])pMVar9->data;
                pauVar53 = (undefined1 (*) [16])pMVar9[1].data;
                uVar66 = 0;
                do {
                  if (0 < (int)uVar65) {
                    auVar106 = *pauVar55;
                    uVar64 = uVar65;
                    do {
                      auVar103 = vmaxps_avx(auVar106,*pauVar53);
                      *pauVar50 = auVar103;
                      pauVar53 = pauVar53 + 1;
                      pauVar50 = pauVar50 + 1;
                      uVar64 = uVar64 - 1;
                    } while (uVar64 != 0);
                  }
                  pauVar55 = pauVar55 + 1;
                  uVar66 = uVar66 + 1;
                } while (uVar66 != uVar5);
                return 0;
              }
              return 0;
            }
            return -100;
          }
          if (iVar59 != 3) {
            return 0;
          }
          Mat::create(this_00,uVar65,uVar5,uVar6,sVar11,uVar66,opt->blob_allocator);
          if (this_00->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep == 0) {
            return -100;
          }
          if (0 < (int)local_138) {
            uVar47 = 0;
            do {
              if (0 < iVar72) {
                sVar71 = this_00->cstep;
                sVar11 = this_00->elemsize;
                auVar106 = *(undefined1 (*) [16])((long)pMVar9->data + uVar47 * 0x10);
                pvVar12 = this_00->data;
                sVar13 = pMVar9[1].cstep;
                sVar14 = pMVar9[1].elemsize;
                pvVar56 = pMVar9[1].data;
                lVar60 = 0;
                iVar45 = iVar72;
                do {
                  auVar103 = vmaxps_avx(auVar106,*(undefined1 (*) [16])
                                                  ((long)pvVar56 + lVar60 + sVar13 * sVar14 * uVar47
                                                  ));
                  *(undefined1 (*) [16])((long)pvVar12 + lVar60 + sVar71 * sVar11 * uVar47) =
                       auVar103;
                  lVar60 = lVar60 + 0x10;
                  iVar45 = iVar45 + -1;
                } while (iVar45 != 0);
              }
              uVar47 = uVar47 + 1;
            } while (uVar47 != local_138);
            return 0;
          }
          return 0;
        }
        if (iVar59 == 1) {
          Mat::create(this_00,uVar65,sVar11,uVar66,opt->blob_allocator);
          pvVar12 = this_00->data;
          if (pvVar12 == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep != 0) {
            if (0 < (int)uVar65) {
              uVar4 = *pMVar9->data;
              auVar91._4_4_ = uVar4;
              auVar91._0_4_ = uVar4;
              auVar91._8_4_ = uVar4;
              auVar91._12_4_ = uVar4;
              pvVar56 = pMVar1->data;
              lVar60 = 0;
              do {
                auVar106 = vmaxps_avx(auVar91,*(undefined1 (*) [16])((long)pvVar56 + lVar60));
                *(undefined1 (*) [16])((long)pvVar12 + lVar60) = auVar106;
                lVar60 = lVar60 + 0x10;
                uVar65 = uVar65 - 1;
              } while (uVar65 != 0);
              return 0;
            }
            return 0;
          }
          return -100;
        }
        if (iVar59 == 2) {
          Mat::create(this_00,uVar65,uVar5,sVar11,uVar66,opt->blob_allocator);
          pvVar12 = this_00->data;
          if (pvVar12 == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep != 0) {
            if (0 < iVar72) {
              uVar4 = *pMVar9->data;
              auVar90._4_4_ = uVar4;
              auVar90._0_4_ = uVar4;
              auVar90._8_4_ = uVar4;
              auVar90._12_4_ = uVar4;
              pvVar56 = pMVar1->data;
              lVar60 = 0;
              do {
                auVar106 = vmaxps_avx(auVar90,*(undefined1 (*) [16])((long)pvVar56 + lVar60));
                *(undefined1 (*) [16])((long)pvVar12 + lVar60) = auVar106;
                lVar60 = lVar60 + 0x10;
                iVar72 = iVar72 + -1;
              } while (iVar72 != 0);
              return 0;
            }
            return 0;
          }
          return -100;
        }
        if (iVar59 != 3) {
          return 0;
        }
        Mat::create(this_00,uVar65,uVar5,uVar6,sVar11,uVar66,opt->blob_allocator);
        if (this_00->data == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep == 0) {
          return -100;
        }
        if (0 < (int)local_138) {
          uVar4 = *pMVar9->data;
          auVar76._4_4_ = uVar4;
          auVar76._0_4_ = uVar4;
          auVar76._8_4_ = uVar4;
          auVar76._12_4_ = uVar4;
          uVar47 = 0;
          do {
            if (0 < iVar72) {
              sVar71 = this_00->cstep;
              sVar11 = this_00->elemsize;
              pvVar12 = this_00->data;
              sVar13 = pMVar9[1].cstep;
              sVar14 = pMVar9[1].elemsize;
              pvVar56 = pMVar9[1].data;
              lVar60 = 0;
              iVar45 = iVar72;
              do {
                auVar106 = vmaxps_avx(auVar76,*(undefined1 (*) [16])
                                               ((long)pvVar56 + lVar60 + sVar13 * sVar14 * uVar47));
                *(undefined1 (*) [16])((long)pvVar12 + lVar60 + sVar71 * sVar11 * uVar47) = auVar106
                ;
                lVar60 = lVar60 + 0x10;
                iVar45 = iVar45 + -1;
              } while (iVar45 != 0);
            }
            uVar47 = uVar47 + 1;
          } while (uVar47 != local_138);
          return 0;
        }
        return 0;
      }
      uVar7 = pMVar9->h;
      local_130 = (void *)CONCAT44(local_130._4_4_,uVar7 * uVar64);
      if (iVar59 == 2) {
        if (pMVar9[1].dims == 3) {
          Mat::create(this_00,uVar65,uVar5,uVar6,sVar11,uVar66,opt->blob_allocator);
          if (this_00->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep != 0) {
            if (0 < (int)local_138) {
              uVar47 = 0;
              do {
                if (0 < (int)uVar5) {
                  pauVar50 = (undefined1 (*) [16])
                             (this_00->cstep * uVar47 * this_00->elemsize + (long)this_00->data);
                  pauVar55 = (undefined1 (*) [16])
                             (pMVar9[1].cstep * uVar47 * pMVar9[1].elemsize + (long)pMVar9[1].data);
                  pauVar53 = (undefined1 (*) [16])
                             ((long)pMVar9->w * uVar47 * pMVar9->elemsize + (long)pMVar9->data);
                  uVar66 = 0;
                  do {
                    if (0 < (int)uVar65) {
                      auVar106 = *pauVar53;
                      uVar64 = uVar65;
                      do {
                        auVar103 = vmaxps_avx(auVar106,*pauVar55);
                        *pauVar50 = auVar103;
                        pauVar55 = pauVar55 + 1;
                        pauVar50 = pauVar50 + 1;
                        uVar64 = uVar64 - 1;
                      } while (uVar64 != 0);
                    }
                    pauVar53 = pauVar53 + 1;
                    uVar66 = uVar66 + 1;
                  } while (uVar66 != uVar5);
                }
                uVar47 = uVar47 + 1;
              } while (uVar47 != local_138);
              return 0;
            }
            return 0;
          }
          return -100;
        }
        local_128 = CONCAT44(uVar4,uVar66);
        Mat::create(this_00,uVar64,uVar7,sVar71,iVar45,opt->blob_allocator);
        pvVar12 = this_00->data;
        if (pvVar12 == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep == 0) {
          return -100;
        }
        if (pMVar9[1].dims != 1) {
          if (pMVar9[1].dims != 2) {
            return 0;
          }
          if (0 < (int)local_130) {
            pvVar56 = pMVar9->data;
            pvVar63 = pMVar9[1].data;
            lVar60 = 0;
            do {
              auVar106 = vmaxps_avx(*(undefined1 (*) [16])((long)pvVar56 + lVar60),
                                    *(undefined1 (*) [16])((long)pvVar63 + lVar60));
              *(undefined1 (*) [16])((long)pvVar12 + lVar60) = auVar106;
              lVar60 = lVar60 + 0x10;
              local_130._0_4_ = (int)local_130 + -1;
            } while ((int)local_130 != 0);
            return 0;
          }
          return 0;
        }
        Mat::create(this_00,uVar64,uVar7,sVar71,iVar45,opt->blob_allocator);
        pauVar50 = (undefined1 (*) [16])this_00->data;
        if (pauVar50 == (undefined1 (*) [16])0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep != 0) {
          if ((int)local_128 != 1 || pMVar9[1].w != 1) {
            if (0 < (int)uVar7) {
              pauVar55 = (undefined1 (*) [16])pMVar9->data;
              pauVar53 = (undefined1 (*) [16])pMVar9[1].data;
              uVar66 = 0;
              do {
                if (0 < (int)uVar64) {
                  auVar106 = *pauVar53;
                  uVar46 = uVar47;
                  do {
                    auVar103 = vmaxps_avx(auVar106,*pauVar55);
                    *pauVar50 = auVar103;
                    pauVar55 = pauVar55 + 1;
                    pauVar50 = pauVar50 + 1;
                    uVar65 = (int)uVar46 - 1;
                    uVar46 = (ulong)uVar65;
                  } while (uVar65 != 0);
                }
                pauVar53 = pauVar53 + 1;
                uVar66 = uVar66 + 1;
              } while (uVar66 != uVar7);
              return 0;
            }
            return 0;
          }
          if (0 < (int)local_130) {
            uVar4 = *pMVar1->data;
            auVar107._4_4_ = uVar4;
            auVar107._0_4_ = uVar4;
            auVar107._8_4_ = uVar4;
            auVar107._12_4_ = uVar4;
            pvVar12 = pMVar9->data;
            lVar60 = 0;
            do {
              auVar106 = vmaxps_avx(auVar107,*(undefined1 (*) [16])((long)pvVar12 + lVar60));
              *(undefined1 (*) [16])((long)*pauVar50 + lVar60) = auVar106;
              lVar60 = lVar60 + 0x10;
              local_130._0_4_ = (int)local_130 + -1;
            } while ((int)local_130 != 0);
            return 0;
          }
          return 0;
        }
        return -100;
      }
      if (iVar59 != 3) {
        return 0;
      }
      uVar8 = pMVar9->c;
      uVar46 = (ulong)uVar8;
      local_110 = sVar71;
      if (pMVar9[1].dims != 3) {
        Mat::create(this_00,uVar64,uVar7,uVar8,sVar71,iVar45,opt->blob_allocator);
        if (this_00->data == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep == 0) {
          return -100;
        }
        if (pMVar9[1].dims == 1) {
          if (uVar66 != 1 || pMVar9[1].w != 1) {
            if (0 < (int)uVar8) {
              uVar47 = 0;
              do {
                if (0 < (int)local_130) {
                  sVar71 = this_00->cstep;
                  sVar11 = this_00->elemsize;
                  auVar106 = *(undefined1 (*) [16])((long)pMVar1->data + uVar47 * 0x10);
                  pvVar12 = this_00->data;
                  sVar13 = pMVar9->cstep;
                  sVar14 = pMVar9->elemsize;
                  pvVar56 = pMVar9->data;
                  lVar60 = 0;
                  iVar45 = (int)local_130;
                  do {
                    auVar103 = vmaxps_avx(auVar106,*(undefined1 (*) [16])
                                                    ((long)pvVar56 +
                                                    lVar60 + sVar13 * sVar14 * uVar47));
                    *(undefined1 (*) [16])((long)pvVar12 + lVar60 + sVar71 * sVar11 * uVar47) =
                         auVar103;
                    lVar60 = lVar60 + 0x10;
                    iVar45 = iVar45 + -1;
                  } while (iVar45 != 0);
                }
                uVar47 = uVar47 + 1;
              } while (uVar47 != uVar46);
              return 0;
            }
            return 0;
          }
          if (0 < (int)uVar8) {
            uVar4 = *pMVar1->data;
            auVar108._4_4_ = uVar4;
            auVar108._0_4_ = uVar4;
            auVar108._8_4_ = uVar4;
            auVar108._12_4_ = uVar4;
            uVar47 = 0;
            do {
              if (0 < (int)local_130) {
                sVar71 = this_00->cstep;
                sVar11 = this_00->elemsize;
                pvVar12 = this_00->data;
                sVar13 = pMVar9->cstep;
                sVar14 = pMVar9->elemsize;
                pvVar56 = pMVar9->data;
                lVar60 = 0;
                iVar45 = (int)local_130;
                do {
                  auVar106 = vmaxps_avx(auVar108,*(undefined1 (*) [16])
                                                  ((long)pvVar56 + lVar60 + sVar13 * sVar14 * uVar47
                                                  ));
                  *(undefined1 (*) [16])((long)pvVar12 + lVar60 + sVar71 * sVar11 * uVar47) =
                       auVar106;
                  lVar60 = lVar60 + 0x10;
                  iVar45 = iVar45 + -1;
                } while (iVar45 != 0);
              }
              uVar47 = uVar47 + 1;
            } while (uVar47 != uVar46);
            return 0;
          }
          return 0;
        }
        if (pMVar9[1].dims != 2) {
          return 0;
        }
        if (0 < (int)uVar8) {
          uVar48 = 0;
          do {
            if (0 < (int)uVar7) {
              pauVar50 = (undefined1 (*) [16])
                         (this_00->cstep * uVar48 * this_00->elemsize + (long)this_00->data);
              pauVar55 = (undefined1 (*) [16])
                         ((long)pMVar9[1].w * uVar48 * pMVar9[1].elemsize + (long)pMVar9[1].data);
              pauVar53 = (undefined1 (*) [16])
                         (pMVar9->cstep * uVar48 * pMVar9->elemsize + (long)pMVar9->data);
              uVar66 = 0;
              do {
                if (0 < (int)uVar64) {
                  auVar106 = *pauVar55;
                  uVar62 = uVar47;
                  do {
                    auVar103 = vmaxps_avx(auVar106,*pauVar53);
                    *pauVar50 = auVar103;
                    pauVar53 = pauVar53 + 1;
                    pauVar50 = pauVar50 + 1;
                    uVar65 = (int)uVar62 - 1;
                    uVar62 = (ulong)uVar65;
                  } while (uVar65 != 0);
                }
                pauVar55 = pauVar55 + 1;
                uVar66 = uVar66 + 1;
              } while (uVar66 != uVar7);
            }
            uVar48 = uVar48 + 1;
          } while (uVar48 != uVar46);
          return 0;
        }
        return 0;
      }
      if (uVar8 == uVar6 && ((uVar65 ^ 1) == 0 && (uVar5 ^ 1) == 0)) {
        Mat::create(this_00,uVar64,uVar7,uVar8,sVar71,iVar45,opt->blob_allocator);
        if (this_00->data == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep != 0) {
          if (0 < (int)uVar8) {
            uVar47 = 0;
            do {
              if (0 < (int)local_130) {
                sVar71 = pMVar9->cstep;
                sVar11 = pMVar9->elemsize;
                auVar106 = *(undefined1 (*) [16])
                            ((long)pMVar9[1].data + pMVar9[1].cstep * uVar47 * pMVar9[1].elemsize);
                pvVar12 = pMVar9->data;
                sVar13 = this_00->cstep;
                sVar14 = this_00->elemsize;
                pvVar56 = this_00->data;
                lVar60 = 0;
                iVar45 = (int)local_130;
                do {
                  auVar103 = vmaxps_avx(auVar106,*(undefined1 (*) [16])
                                                  ((long)pvVar12 + lVar60 + sVar71 * sVar11 * uVar47
                                                  ));
                  *(undefined1 (*) [16])((long)pvVar56 + lVar60 + sVar13 * sVar14 * uVar47) =
                       auVar103;
                  lVar60 = lVar60 + 0x10;
                  iVar45 = iVar45 + -1;
                } while (iVar45 != 0);
              }
              uVar47 = uVar47 + 1;
            } while (uVar47 != uVar46);
            return 0;
          }
          return 0;
        }
        return -100;
      }
      if (uVar65 == uVar64) {
        if (uVar66 == 1 && (uVar6 == 1 && uVar5 == uVar7)) {
          Mat::create(this_00,uVar64,uVar7,uVar8,sVar71,iVar45,opt->blob_allocator);
          if (this_00->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep != 0) {
            if (0 < (int)uVar8) {
              uVar47 = 0;
              do {
                if (0 < (int)local_130) {
                  sVar71 = pMVar9->cstep;
                  sVar11 = pMVar9->elemsize;
                  sVar13 = this_00->cstep;
                  pvVar12 = pMVar9->data;
                  pvVar56 = pMVar9[1].data;
                  sVar14 = this_00->elemsize;
                  pvVar63 = this_00->data;
                  lVar60 = 0;
                  iVar45 = (int)local_130;
                  do {
                    uVar4 = *(undefined4 *)((long)pvVar56 + lVar60);
                    auVar84._4_4_ = uVar4;
                    auVar84._0_4_ = uVar4;
                    auVar84._8_4_ = uVar4;
                    auVar84._12_4_ = uVar4;
                    auVar106 = vmaxps_avx(auVar84,*(undefined1 (*) [16])
                                                   ((long)pvVar12 +
                                                   lVar60 * 4 + sVar71 * sVar11 * uVar47));
                    *(undefined1 (*) [16])((long)pvVar63 + lVar60 * 4 + sVar13 * sVar14 * uVar47) =
                         auVar106;
                    lVar60 = lVar60 + 4;
                    iVar45 = iVar45 + -1;
                  } while (iVar45 != 0);
                }
                uVar47 = uVar47 + 1;
              } while (uVar47 != uVar46);
              return 0;
            }
            return 0;
          }
          return -100;
        }
        local_104 = CONCAT31(local_104._1_3_,uVar7 == 1);
        if ((uVar64 != 1 || uVar7 != 1) || uVar6 != uVar8) {
          if (((iVar45 == 1) && (uVar5 == uVar7)) && (uVar8 == 1)) {
            local_128 = uVar46;
            Mat::create(this_00,uVar64,uVar7,uVar6,sVar11,uVar66,opt->blob_allocator);
            if (this_00->data == (void *)0x0) {
              return -100;
            }
            if ((long)this_00->c * this_00->cstep != 0) {
              if (0 < (int)local_138) {
                uVar47 = 0;
                do {
                  if (0 < iVar72) {
                    sVar71 = pMVar9[1].cstep;
                    sVar11 = pMVar9[1].elemsize;
                    sVar13 = this_00->cstep;
                    pvVar12 = pMVar9[1].data;
                    pvVar56 = pMVar9->data;
                    sVar14 = this_00->elemsize;
                    pvVar63 = this_00->data;
                    lVar60 = 0;
                    iVar45 = iVar72;
                    do {
                      uVar4 = *(undefined4 *)((long)pvVar56 + lVar60);
                      auVar121._4_4_ = uVar4;
                      auVar121._0_4_ = uVar4;
                      auVar121._8_4_ = uVar4;
                      auVar121._12_4_ = uVar4;
                      auVar106 = vmaxps_avx(auVar121,*(undefined1 (*) [16])
                                                      ((long)pvVar12 +
                                                      lVar60 * 4 + sVar71 * sVar11 * uVar47));
                      *(undefined1 (*) [16])((long)pvVar63 + lVar60 * 4 + sVar13 * sVar14 * uVar47)
                           = auVar106;
                      lVar60 = lVar60 + 4;
                      iVar45 = iVar45 + -1;
                    } while (iVar45 != 0);
                  }
                  uVar47 = uVar47 + 1;
                } while (uVar47 != local_138);
                return 0;
              }
              return 0;
            }
            return -100;
          }
LAB_002479f9:
          if ((((uVar65 ^ 1) == 0 && uVar5 == uVar7) && uVar8 == uVar6) && uVar64 != 1) {
            local_128 = uVar46;
            Mat::create(this_00,uVar64,uVar7,uVar8,sVar71,iVar45,opt->blob_allocator);
            if (this_00->data == (void *)0x0) {
              return -100;
            }
            if ((long)this_00->c * this_00->cstep != 0) {
              if (0 < (int)uVar8) {
                uVar48 = 0;
                do {
                  if (0 < (int)uVar7) {
                    sVar71 = pMVar9[1].cstep;
                    sVar11 = pMVar9[1].elemsize;
                    pvVar12 = pMVar9[1].data;
                    pauVar50 = (undefined1 (*) [16])
                               (this_00->cstep * uVar48 * this_00->elemsize + (long)this_00->data);
                    pauVar55 = (undefined1 (*) [16])
                               (pMVar9->cstep * uVar48 * pMVar9->elemsize + (long)pMVar9->data);
                    uVar62 = 0;
                    do {
                      if (0 < (int)uVar64) {
                        auVar106 = *(undefined1 (*) [16])
                                    ((long)pvVar12 + uVar62 * 0x10 + sVar71 * uVar48 * sVar11);
                        uVar67 = uVar47;
                        do {
                          auVar103 = vmaxps_avx(auVar106,*pauVar55);
                          *pauVar50 = auVar103;
                          pauVar55 = pauVar55 + 1;
                          pauVar50 = pauVar50 + 1;
                          uVar66 = (int)uVar67 - 1;
                          uVar67 = (ulong)uVar66;
                        } while (uVar66 != 0);
                      }
                      uVar62 = uVar62 + 1;
                    } while (uVar62 != uVar7);
                  }
                  uVar48 = uVar48 + 1;
                } while (uVar48 != uVar46);
                return 0;
              }
              return 0;
            }
            return -100;
          }
          if (((uVar65 == uVar64 && (uVar5 ^ 1) == 0) && uVar8 == uVar6) && uVar7 != 1) {
            local_128 = uVar46;
            Mat::create(this_00,uVar64,uVar7,uVar8,sVar71,iVar45,opt->blob_allocator);
            if (this_00->data == (void *)0x0) {
              return -100;
            }
            if ((long)this_00->c * this_00->cstep != 0) {
              if (0 < (int)uVar8) {
                uVar48 = 0;
                do {
                  if (0 < (int)uVar7) {
                    sVar71 = pMVar9[1].elemsize;
                    pvVar56 = (void *)(this_00->cstep * uVar48 * this_00->elemsize +
                                      (long)this_00->data);
                    pvVar63 = (void *)(pMVar9->cstep * uVar48 * pMVar9->elemsize +
                                      (long)pMVar9->data);
                    sVar11 = pMVar9[1].cstep;
                    pvVar12 = pMVar9[1].data;
                    uVar66 = 0;
                    do {
                      if (0 < (int)uVar64) {
                        lVar60 = 0;
                        do {
                          auVar106 = vmaxps_avx(*(undefined1 (*) [16])((long)pvVar63 + lVar60),
                                                *(undefined1 (*) [16])
                                                 ((long)pvVar12 + lVar60 + sVar71 * sVar11 * uVar48)
                                               );
                          *(undefined1 (*) [16])((long)pvVar56 + lVar60) = auVar106;
                          lVar60 = lVar60 + 0x10;
                        } while (uVar47 << 4 != lVar60);
                        pvVar56 = (void *)((long)pvVar56 + lVar60);
                        pvVar63 = (void *)((long)pvVar63 + lVar60);
                      }
                      uVar66 = uVar66 + 1;
                    } while (uVar66 != uVar7);
                  }
                  uVar48 = uVar48 + 1;
                } while (uVar48 != uVar46);
                return 0;
              }
              return 0;
            }
            return -100;
          }
          if ((uVar6 == uVar8 && uVar5 == uVar7) && (uVar65 != 1 && uVar64 == 1)) {
            local_128 = uVar46;
            Mat::create(this_00,uVar65,uVar7,uVar8,sVar11,uVar66,opt->blob_allocator);
            if (this_00->data == (void *)0x0) {
              return -100;
            }
            if ((long)this_00->c * this_00->cstep != 0) {
              if (0 < (int)uVar8) {
                uVar47 = 0;
                do {
                  if (0 < (int)uVar7) {
                    sVar71 = pMVar9->cstep;
                    sVar11 = pMVar9->elemsize;
                    pvVar12 = pMVar9->data;
                    pauVar50 = (undefined1 (*) [16])
                               (this_00->cstep * uVar47 * this_00->elemsize + (long)this_00->data);
                    pauVar55 = (undefined1 (*) [16])
                               (pMVar9[1].cstep * uVar47 * pMVar9[1].elemsize + (long)pMVar9[1].data
                               );
                    uVar48 = 0;
                    do {
                      if (0 < (int)uVar65) {
                        auVar106 = *(undefined1 (*) [16])
                                    ((long)pvVar12 + uVar48 * 0x10 + sVar71 * uVar47 * sVar11);
                        uVar66 = uVar65;
                        do {
                          auVar103 = vmaxps_avx(auVar106,*pauVar55);
                          *pauVar50 = auVar103;
                          pauVar55 = pauVar55 + 1;
                          pauVar50 = pauVar50 + 1;
                          uVar66 = uVar66 - 1;
                        } while (uVar66 != 0);
                      }
                      uVar48 = uVar48 + 1;
                    } while (uVar48 != uVar7);
                  }
                  uVar47 = uVar47 + 1;
                } while (uVar47 != uVar46);
                return 0;
              }
              return 0;
            }
            return -100;
          }
          if (((byte)local_104 & uVar6 == uVar8 & (uVar5 != 1 && uVar65 == uVar64)) == 1) {
            local_128 = uVar46;
            Mat::create(this_00,uVar64,uVar5,uVar8,sVar11,uVar66,opt->blob_allocator);
            if (this_00->data == (void *)0x0) {
              return -100;
            }
            if ((long)local_120->c * local_120->cstep != 0) {
              if (0 < (int)local_128) {
                local_158 = (__m256 *)0x0;
                do {
                  pMVar1 = local_a0;
                  afVar185 = _local_100;
                  bVar74 = local_a0->dims == 3;
                  local_c8 = 1;
                  if (!bVar74) {
                    local_c8 = local_a0->d;
                  }
                  local_d4 = local_a0->w;
                  local_d0 = local_a0->h;
                  sVar71 = local_a0->cstep;
                  pvVar12 = local_a0->data;
                  local_130 = (void *)local_a0->elemsize;
                  local_e0 = local_a0->allocator;
                  _fStack_f8 = 0;
                  local_100 = (undefined1  [8])
                              (sVar71 * (long)local_158 * (long)local_130 + (long)pvVar12);
                  uStack_f0 = local_130;
                  fStack_e4 = afVar185[7];
                  fStack_e8 = (float)local_a0->elempack;
                  local_d8 = bVar74 ^ 3;
                  local_c0 = (long)local_d0 * (long)local_d4;
                  local_cc = 1;
                  Mat::~Mat((Mat *)local_100);
                  bVar74 = pMVar1[1].dims == 3;
                  local_c8 = 1;
                  if (!bVar74) {
                    local_c8 = pMVar1[1].d;
                  }
                  local_d4 = pMVar1[1].w;
                  local_d0 = pMVar1[1].h;
                  pvVar56 = (void *)(pMVar1[1].cstep * (long)local_158 * pMVar1[1].elemsize +
                                    (long)pMVar1[1].data);
                  local_d8 = bVar74 ^ 3;
                  local_e0 = pMVar1[1].allocator;
                  _fStack_f8 = 0;
                  local_100 = (undefined1  [8])pvVar56;
                  uStack_f0 = pMVar1[1].elemsize;
                  fStack_e8 = (float)pMVar1[1].elempack;
                  local_c0 = (long)local_d0 * (long)local_d4;
                  local_cc = 1;
                  Mat::~Mat((Mat *)local_100);
                  bVar74 = local_120->dims == 3;
                  local_d4 = local_120->w;
                  local_d0 = local_120->h;
                  local_c8 = 1;
                  if (!bVar74) {
                    local_c8 = local_120->d;
                  }
                  sVar11 = local_120->elemsize;
                  pvVar63 = (void *)(local_120->cstep * (long)local_158 * sVar11 +
                                    (long)local_120->data);
                  local_d8 = bVar74 ^ 3;
                  local_e0 = local_120->allocator;
                  fStack_f8 = 0.0;
                  fStack_f4 = 0.0;
                  local_100 = (undefined1  [8])pvVar63;
                  uStack_f0._0_4_ = (float)(int)sVar11;
                  uStack_f0._4_4_ = (float)(int)(sVar11 >> 0x20);
                  fStack_e8 = (float)local_120->elempack;
                  local_c0 = (long)local_d0 * (long)local_d4;
                  local_cc = 1;
                  Mat::~Mat((Mat *)local_100);
                  if (0 < (int)uVar5) {
                    uVar66 = 0;
                    do {
                      if (0 < (int)uVar64) {
                        lVar60 = 0;
                        do {
                          auVar106 = vmaxps_avx(*(undefined1 (*) [16])
                                                 ((long)pvVar12 +
                                                 lVar60 + sVar71 * (long)local_130 * (long)local_158
                                                 ),*(undefined1 (*) [16])((long)pvVar56 + lVar60));
                          *(undefined1 (*) [16])((long)pvVar63 + lVar60) = auVar106;
                          lVar60 = lVar60 + 0x10;
                        } while (uVar47 << 4 != lVar60);
                        pvVar63 = (void *)((long)pvVar63 + lVar60);
                        pvVar56 = (void *)((long)pvVar56 + lVar60);
                      }
                      uVar66 = uVar66 + 1;
                    } while (uVar66 != uVar5);
                  }
                  local_158 = (__m256 *)((long)local_158 + 1);
                } while (local_158 != (__m256 *)local_128);
                return 0;
              }
              return 0;
            }
            return -100;
          }
          local_128 = uVar46;
          Mat::create(this_00,uVar64,uVar7,uVar8,sVar71,iVar45,opt->blob_allocator);
          if (this_00->data == (void *)0x0) {
            return -100;
          }
          if ((long)local_120->c * local_120->cstep != 0) {
            if (0 < (int)local_128) {
              local_158 = (__m256 *)0x0;
              do {
                pMVar1 = local_a0;
                afVar185 = _local_100;
                bVar74 = local_a0->dims == 3;
                local_c8 = 1;
                if (!bVar74) {
                  local_c8 = local_a0->d;
                }
                local_d4 = local_a0->w;
                local_d0 = local_a0->h;
                sVar71 = local_a0->cstep;
                pvVar12 = local_a0->data;
                sVar11 = local_a0->elemsize;
                local_e0 = local_a0->allocator;
                _fStack_f8 = 0;
                local_100 = (undefined1  [8])(sVar71 * (long)local_158 * sVar11 + (long)pvVar12);
                uStack_f0 = sVar11;
                fStack_e4 = afVar185[7];
                fStack_e8 = (float)local_a0->elempack;
                local_d8 = bVar74 ^ 3;
                local_c0 = (long)local_d0 * (long)local_d4;
                local_cc = 1;
                Mat::~Mat((Mat *)local_100);
                bVar74 = pMVar1[1].dims == 3;
                local_c8 = 1;
                if (!bVar74) {
                  local_c8 = pMVar1[1].d;
                }
                local_d4 = pMVar1[1].w;
                local_d0 = pMVar1[1].h;
                local_138 = pMVar1[1].cstep;
                pvVar56 = pMVar1[1].data;
                local_110 = pMVar1[1].elemsize;
                local_e0 = pMVar1[1].allocator;
                _fStack_f8 = 0;
                local_100 = (undefined1  [8])
                            (local_138 * (long)local_158 * local_110 + (long)pvVar56);
                uStack_f0 = local_110;
                fStack_e8 = (float)pMVar1[1].elempack;
                local_d8 = bVar74 ^ 3;
                local_c0 = (long)local_d0 * (long)local_d4;
                local_cc = 1;
                Mat::~Mat((Mat *)local_100);
                bVar74 = local_120->dims == 3;
                local_d4 = local_120->w;
                local_d0 = local_120->h;
                local_c8 = 1;
                if (!bVar74) {
                  local_c8 = local_120->d;
                }
                sVar13 = local_120->cstep;
                pvVar63 = local_120->data;
                sVar14 = local_120->elemsize;
                local_e0 = local_120->allocator;
                fStack_f8 = 0.0;
                fStack_f4 = 0.0;
                local_100 = (undefined1  [8])(sVar13 * (long)local_158 * sVar14 + (long)pvVar63);
                uStack_f0._0_4_ = (float)(int)sVar14;
                uStack_f0._4_4_ = (float)(int)(sVar14 >> 0x20);
                fStack_e8 = (float)local_120->elempack;
                local_d8 = bVar74 ^ 3;
                local_c0 = (long)local_d0 * (long)local_d4;
                local_cc = 1;
                Mat::~Mat((Mat *)local_100);
                if (0 < (int)local_130) {
                  lVar60 = 0;
                  iVar45 = (int)local_130;
                  do {
                    auVar106 = vmaxps_avx(*(undefined1 (*) [16])
                                           ((long)pvVar12 +
                                           lVar60 + sVar71 * sVar11 * (long)local_158),
                                          *(undefined1 (*) [16])
                                           ((long)pvVar56 +
                                           lVar60 + local_138 * local_110 * (long)local_158));
                    *(undefined1 (*) [16])
                     ((long)pvVar63 + lVar60 + sVar13 * sVar14 * (long)local_158) = auVar106;
                    lVar60 = lVar60 + 0x10;
                    iVar45 = iVar45 + -1;
                  } while (iVar45 != 0);
                }
                local_158 = (__m256 *)((long)local_158 + 1);
              } while (local_158 != (__m256 *)local_128);
              return 0;
            }
            return 0;
          }
          return -100;
        }
      }
      else {
        local_104 = CONCAT31(local_104._1_3_,uVar7 == 1);
        local_128 = uVar46;
        if ((uVar64 != 1 || uVar7 != 1) || uVar6 != uVar8) goto LAB_002479f9;
      }
      Mat::create(this_00,uVar65,uVar5,uVar6,sVar11,uVar66,opt->blob_allocator);
      if (this_00->data == (void *)0x0) {
        return -100;
      }
      if ((long)this_00->c * this_00->cstep != 0) {
        if (0 < (int)local_138) {
          uVar47 = 0;
          do {
            if (0 < iVar72) {
              sVar71 = this_00->cstep;
              sVar11 = this_00->elemsize;
              auVar106 = *(undefined1 (*) [16])
                          ((long)pMVar9->data + pMVar9->cstep * uVar47 * pMVar9->elemsize);
              pvVar12 = this_00->data;
              sVar13 = pMVar9[1].cstep;
              sVar14 = pMVar9[1].elemsize;
              pvVar56 = pMVar9[1].data;
              lVar60 = 0;
              iVar45 = iVar72;
              do {
                auVar103 = vmaxps_avx(auVar106,*(undefined1 (*) [16])
                                                ((long)pvVar56 + lVar60 + sVar13 * sVar14 * uVar47))
                ;
                *(undefined1 (*) [16])((long)pvVar12 + lVar60 + sVar71 * sVar11 * uVar47) = auVar103
                ;
                lVar60 = lVar60 + 0x10;
                iVar45 = iVar45 + -1;
              } while (iVar45 != 0);
            }
            uVar47 = uVar47 + 1;
          } while (uVar47 != local_138);
          return 0;
        }
        return 0;
      }
      return -100;
    case 5:
      uVar64 = pMVar9->w;
      uVar47 = (ulong)uVar64;
      sVar71 = pMVar9->elemsize;
      uVar65 = pMVar9[1].w;
      uVar5 = pMVar9[1].h;
      uVar6 = pMVar9[1].c;
      local_138 = (ulong)uVar6;
      iVar72 = uVar5 * uVar65;
      sVar11 = pMVar9[1].elemsize;
      iVar59 = pMVar9->dims;
      if (iVar59 == 1) {
        iVar59 = pMVar9[1].dims;
        if (iVar45 != 1 || uVar64 != 1) {
          if (iVar59 == 1) {
            Mat::create(this_00,uVar64,sVar71,iVar45,opt->blob_allocator);
            pvVar12 = this_00->data;
            if (pvVar12 == (void *)0x0) {
              return -100;
            }
            if ((long)this_00->c * this_00->cstep == 0) {
              return -100;
            }
            if (uVar66 != 1 || pMVar9[1].w != 1) {
              if (0 < (int)uVar64) {
                pvVar56 = pMVar9->data;
                pvVar63 = pMVar9[1].data;
                lVar60 = 0;
                do {
                  auVar106 = vminps_avx(*(undefined1 (*) [16])((long)pvVar56 + lVar60),
                                        *(undefined1 (*) [16])((long)pvVar63 + lVar60));
                  *(undefined1 (*) [16])((long)pvVar12 + lVar60) = auVar106;
                  lVar60 = lVar60 + 0x10;
                  uVar66 = (int)uVar47 - 1;
                  uVar47 = (ulong)uVar66;
                } while (uVar66 != 0);
                return 0;
              }
              return 0;
            }
            if (0 < (int)uVar64) {
              uVar4 = *pMVar1->data;
              auVar105._4_4_ = uVar4;
              auVar105._0_4_ = uVar4;
              auVar105._8_4_ = uVar4;
              auVar105._12_4_ = uVar4;
              pvVar56 = pMVar9->data;
              lVar60 = 0;
              do {
                auVar106 = vminps_avx(auVar105,*(undefined1 (*) [16])((long)pvVar56 + lVar60));
                *(undefined1 (*) [16])((long)pvVar12 + lVar60) = auVar106;
                lVar60 = lVar60 + 0x10;
                uVar66 = (int)uVar47 - 1;
                uVar47 = (ulong)uVar66;
              } while (uVar66 != 0);
              return 0;
            }
            return 0;
          }
          if (iVar59 == 2) {
            Mat::create(this_00,uVar65,uVar5,sVar11,uVar66,opt->blob_allocator);
            pauVar50 = (undefined1 (*) [16])this_00->data;
            if (pauVar50 == (undefined1 (*) [16])0x0) {
              return -100;
            }
            if ((long)this_00->c * this_00->cstep != 0) {
              if (0 < (int)uVar5) {
                pauVar55 = (undefined1 (*) [16])pMVar9->data;
                pauVar53 = (undefined1 (*) [16])pMVar9[1].data;
                uVar66 = 0;
                do {
                  if (0 < (int)uVar65) {
                    auVar106 = *pauVar55;
                    uVar64 = uVar65;
                    do {
                      auVar103 = vminps_avx(auVar106,*pauVar53);
                      *pauVar50 = auVar103;
                      pauVar53 = pauVar53 + 1;
                      pauVar50 = pauVar50 + 1;
                      uVar64 = uVar64 - 1;
                    } while (uVar64 != 0);
                  }
                  pauVar55 = pauVar55 + 1;
                  uVar66 = uVar66 + 1;
                } while (uVar66 != uVar5);
                return 0;
              }
              return 0;
            }
            return -100;
          }
          if (iVar59 != 3) {
            return 0;
          }
          Mat::create(this_00,uVar65,uVar5,uVar6,sVar11,uVar66,opt->blob_allocator);
          if (this_00->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep == 0) {
            return -100;
          }
          if (0 < (int)local_138) {
            uVar47 = 0;
            do {
              if (0 < iVar72) {
                sVar71 = this_00->cstep;
                sVar11 = this_00->elemsize;
                auVar106 = *(undefined1 (*) [16])((long)pMVar9->data + uVar47 * 0x10);
                pvVar12 = this_00->data;
                sVar13 = pMVar9[1].cstep;
                sVar14 = pMVar9[1].elemsize;
                pvVar56 = pMVar9[1].data;
                lVar60 = 0;
                iVar45 = iVar72;
                do {
                  auVar103 = vminps_avx(auVar106,*(undefined1 (*) [16])
                                                  ((long)pvVar56 + lVar60 + sVar13 * sVar14 * uVar47
                                                  ));
                  *(undefined1 (*) [16])((long)pvVar12 + lVar60 + sVar71 * sVar11 * uVar47) =
                       auVar103;
                  lVar60 = lVar60 + 0x10;
                  iVar45 = iVar45 + -1;
                } while (iVar45 != 0);
              }
              uVar47 = uVar47 + 1;
            } while (uVar47 != local_138);
            return 0;
          }
          return 0;
        }
        if (iVar59 == 1) {
          Mat::create(this_00,uVar65,sVar11,uVar66,opt->blob_allocator);
          pvVar12 = this_00->data;
          if (pvVar12 == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep != 0) {
            if (0 < (int)uVar65) {
              uVar4 = *pMVar9->data;
              auVar104._4_4_ = uVar4;
              auVar104._0_4_ = uVar4;
              auVar104._8_4_ = uVar4;
              auVar104._12_4_ = uVar4;
              pvVar56 = pMVar1->data;
              lVar60 = 0;
              do {
                auVar106 = vminps_avx(auVar104,*(undefined1 (*) [16])((long)pvVar56 + lVar60));
                *(undefined1 (*) [16])((long)pvVar12 + lVar60) = auVar106;
                lVar60 = lVar60 + 0x10;
                uVar65 = uVar65 - 1;
              } while (uVar65 != 0);
              return 0;
            }
            return 0;
          }
          return -100;
        }
        if (iVar59 == 2) {
          Mat::create(this_00,uVar65,uVar5,sVar11,uVar66,opt->blob_allocator);
          pvVar12 = this_00->data;
          if (pvVar12 == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep != 0) {
            if (0 < iVar72) {
              uVar4 = *pMVar9->data;
              auVar102._4_4_ = uVar4;
              auVar102._0_4_ = uVar4;
              auVar102._8_4_ = uVar4;
              auVar102._12_4_ = uVar4;
              pvVar56 = pMVar1->data;
              lVar60 = 0;
              do {
                auVar106 = vminps_avx(auVar102,*(undefined1 (*) [16])((long)pvVar56 + lVar60));
                *(undefined1 (*) [16])((long)pvVar12 + lVar60) = auVar106;
                lVar60 = lVar60 + 0x10;
                iVar72 = iVar72 + -1;
              } while (iVar72 != 0);
              return 0;
            }
            return 0;
          }
          return -100;
        }
        if (iVar59 != 3) {
          return 0;
        }
        Mat::create(this_00,uVar65,uVar5,uVar6,sVar11,uVar66,opt->blob_allocator);
        if (this_00->data == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep == 0) {
          return -100;
        }
        if (0 < (int)local_138) {
          uVar4 = *pMVar9->data;
          auVar81._4_4_ = uVar4;
          auVar81._0_4_ = uVar4;
          auVar81._8_4_ = uVar4;
          auVar81._12_4_ = uVar4;
          uVar47 = 0;
          do {
            if (0 < iVar72) {
              sVar71 = this_00->cstep;
              sVar11 = this_00->elemsize;
              pvVar12 = this_00->data;
              sVar13 = pMVar9[1].cstep;
              sVar14 = pMVar9[1].elemsize;
              pvVar56 = pMVar9[1].data;
              lVar60 = 0;
              iVar45 = iVar72;
              do {
                auVar106 = vminps_avx(auVar81,*(undefined1 (*) [16])
                                               ((long)pvVar56 + lVar60 + sVar13 * sVar14 * uVar47));
                *(undefined1 (*) [16])((long)pvVar12 + lVar60 + sVar71 * sVar11 * uVar47) = auVar106
                ;
                lVar60 = lVar60 + 0x10;
                iVar45 = iVar45 + -1;
              } while (iVar45 != 0);
            }
            uVar47 = uVar47 + 1;
          } while (uVar47 != local_138);
          return 0;
        }
        return 0;
      }
      uVar7 = pMVar9->h;
      local_130 = (void *)CONCAT44(local_130._4_4_,uVar7 * uVar64);
      if (iVar59 == 2) {
        if (pMVar9[1].dims == 3) {
          Mat::create(this_00,uVar65,uVar5,uVar6,sVar11,uVar66,opt->blob_allocator);
          if (this_00->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep != 0) {
            if (0 < (int)local_138) {
              uVar47 = 0;
              do {
                if (0 < (int)uVar5) {
                  pauVar50 = (undefined1 (*) [16])
                             (this_00->cstep * uVar47 * this_00->elemsize + (long)this_00->data);
                  pauVar55 = (undefined1 (*) [16])
                             (pMVar9[1].cstep * uVar47 * pMVar9[1].elemsize + (long)pMVar9[1].data);
                  pauVar53 = (undefined1 (*) [16])
                             ((long)pMVar9->w * uVar47 * pMVar9->elemsize + (long)pMVar9->data);
                  uVar66 = 0;
                  do {
                    if (0 < (int)uVar65) {
                      auVar106 = *pauVar53;
                      uVar64 = uVar65;
                      do {
                        auVar103 = vminps_avx(auVar106,*pauVar55);
                        *pauVar50 = auVar103;
                        pauVar55 = pauVar55 + 1;
                        pauVar50 = pauVar50 + 1;
                        uVar64 = uVar64 - 1;
                      } while (uVar64 != 0);
                    }
                    pauVar53 = pauVar53 + 1;
                    uVar66 = uVar66 + 1;
                  } while (uVar66 != uVar5);
                }
                uVar47 = uVar47 + 1;
              } while (uVar47 != local_138);
              return 0;
            }
            return 0;
          }
          return -100;
        }
        local_128 = CONCAT44(uVar4,uVar66);
        Mat::create(this_00,uVar64,uVar7,sVar71,iVar45,opt->blob_allocator);
        pvVar12 = this_00->data;
        if (pvVar12 == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep == 0) {
          return -100;
        }
        if (pMVar9[1].dims != 1) {
          if (pMVar9[1].dims != 2) {
            return 0;
          }
          if (0 < (int)local_130) {
            pvVar56 = pMVar9->data;
            pvVar63 = pMVar9[1].data;
            lVar60 = 0;
            do {
              auVar106 = vminps_avx(*(undefined1 (*) [16])((long)pvVar56 + lVar60),
                                    *(undefined1 (*) [16])((long)pvVar63 + lVar60));
              *(undefined1 (*) [16])((long)pvVar12 + lVar60) = auVar106;
              lVar60 = lVar60 + 0x10;
              local_130._0_4_ = (int)local_130 + -1;
            } while ((int)local_130 != 0);
            return 0;
          }
          return 0;
        }
        Mat::create(this_00,uVar64,uVar7,sVar71,iVar45,opt->blob_allocator);
        pauVar50 = (undefined1 (*) [16])this_00->data;
        if (pauVar50 == (undefined1 (*) [16])0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep != 0) {
          if ((int)local_128 != 1 || pMVar9[1].w != 1) {
            if (0 < (int)uVar7) {
              pauVar55 = (undefined1 (*) [16])pMVar9->data;
              pauVar53 = (undefined1 (*) [16])pMVar9[1].data;
              uVar66 = 0;
              do {
                if (0 < (int)uVar64) {
                  auVar106 = *pauVar53;
                  uVar46 = uVar47;
                  do {
                    auVar103 = vminps_avx(auVar106,*pauVar55);
                    *pauVar50 = auVar103;
                    pauVar55 = pauVar55 + 1;
                    pauVar50 = pauVar50 + 1;
                    uVar65 = (int)uVar46 - 1;
                    uVar46 = (ulong)uVar65;
                  } while (uVar65 != 0);
                }
                pauVar53 = pauVar53 + 1;
                uVar66 = uVar66 + 1;
              } while (uVar66 != uVar7);
              return 0;
            }
            return 0;
          }
          if (0 < (int)local_130) {
            uVar4 = *pMVar1->data;
            auVar112._4_4_ = uVar4;
            auVar112._0_4_ = uVar4;
            auVar112._8_4_ = uVar4;
            auVar112._12_4_ = uVar4;
            pvVar12 = pMVar9->data;
            lVar60 = 0;
            do {
              auVar106 = vminps_avx(auVar112,*(undefined1 (*) [16])((long)pvVar12 + lVar60));
              *(undefined1 (*) [16])((long)*pauVar50 + lVar60) = auVar106;
              lVar60 = lVar60 + 0x10;
              local_130._0_4_ = (int)local_130 + -1;
            } while ((int)local_130 != 0);
            return 0;
          }
          return 0;
        }
        return -100;
      }
      if (iVar59 != 3) {
        return 0;
      }
      uVar8 = pMVar9->c;
      uVar46 = (ulong)uVar8;
      local_110 = sVar71;
      if (pMVar9[1].dims != 3) {
        Mat::create(this_00,uVar64,uVar7,uVar8,sVar71,iVar45,opt->blob_allocator);
        if (this_00->data == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep == 0) {
          return -100;
        }
        if (pMVar9[1].dims == 1) {
          if (uVar66 != 1 || pMVar9[1].w != 1) {
            if (0 < (int)uVar8) {
              uVar47 = 0;
              do {
                if (0 < (int)local_130) {
                  sVar71 = this_00->cstep;
                  sVar11 = this_00->elemsize;
                  auVar106 = *(undefined1 (*) [16])((long)pMVar1->data + uVar47 * 0x10);
                  pvVar12 = this_00->data;
                  sVar13 = pMVar9->cstep;
                  sVar14 = pMVar9->elemsize;
                  pvVar56 = pMVar9->data;
                  lVar60 = 0;
                  iVar45 = (int)local_130;
                  do {
                    auVar103 = vminps_avx(auVar106,*(undefined1 (*) [16])
                                                    ((long)pvVar56 +
                                                    lVar60 + sVar13 * sVar14 * uVar47));
                    *(undefined1 (*) [16])((long)pvVar12 + lVar60 + sVar71 * sVar11 * uVar47) =
                         auVar103;
                    lVar60 = lVar60 + 0x10;
                    iVar45 = iVar45 + -1;
                  } while (iVar45 != 0);
                }
                uVar47 = uVar47 + 1;
              } while (uVar47 != uVar46);
              return 0;
            }
            return 0;
          }
          if (0 < (int)uVar8) {
            uVar4 = *pMVar1->data;
            auVar115._4_4_ = uVar4;
            auVar115._0_4_ = uVar4;
            auVar115._8_4_ = uVar4;
            auVar115._12_4_ = uVar4;
            uVar47 = 0;
            do {
              if (0 < (int)local_130) {
                sVar71 = this_00->cstep;
                sVar11 = this_00->elemsize;
                pvVar12 = this_00->data;
                sVar13 = pMVar9->cstep;
                sVar14 = pMVar9->elemsize;
                pvVar56 = pMVar9->data;
                lVar60 = 0;
                iVar45 = (int)local_130;
                do {
                  auVar106 = vminps_avx(auVar115,*(undefined1 (*) [16])
                                                  ((long)pvVar56 + lVar60 + sVar13 * sVar14 * uVar47
                                                  ));
                  *(undefined1 (*) [16])((long)pvVar12 + lVar60 + sVar71 * sVar11 * uVar47) =
                       auVar106;
                  lVar60 = lVar60 + 0x10;
                  iVar45 = iVar45 + -1;
                } while (iVar45 != 0);
              }
              uVar47 = uVar47 + 1;
            } while (uVar47 != uVar46);
            return 0;
          }
          return 0;
        }
        if (pMVar9[1].dims != 2) {
          return 0;
        }
        if (0 < (int)uVar8) {
          uVar48 = 0;
          do {
            if (0 < (int)uVar7) {
              pauVar50 = (undefined1 (*) [16])
                         (this_00->cstep * uVar48 * this_00->elemsize + (long)this_00->data);
              pauVar55 = (undefined1 (*) [16])
                         ((long)pMVar9[1].w * uVar48 * pMVar9[1].elemsize + (long)pMVar9[1].data);
              pauVar53 = (undefined1 (*) [16])
                         (pMVar9->cstep * uVar48 * pMVar9->elemsize + (long)pMVar9->data);
              uVar66 = 0;
              do {
                if (0 < (int)uVar64) {
                  auVar106 = *pauVar55;
                  uVar62 = uVar47;
                  do {
                    auVar103 = vminps_avx(auVar106,*pauVar53);
                    *pauVar50 = auVar103;
                    pauVar53 = pauVar53 + 1;
                    pauVar50 = pauVar50 + 1;
                    uVar65 = (int)uVar62 - 1;
                    uVar62 = (ulong)uVar65;
                  } while (uVar65 != 0);
                }
                pauVar55 = pauVar55 + 1;
                uVar66 = uVar66 + 1;
              } while (uVar66 != uVar7);
            }
            uVar48 = uVar48 + 1;
          } while (uVar48 != uVar46);
          return 0;
        }
        return 0;
      }
      if (uVar8 == uVar6 && ((uVar65 ^ 1) == 0 && (uVar5 ^ 1) == 0)) {
        Mat::create(this_00,uVar64,uVar7,uVar8,sVar71,iVar45,opt->blob_allocator);
        if (this_00->data == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep != 0) {
          if (0 < (int)uVar8) {
            uVar47 = 0;
            do {
              if (0 < (int)local_130) {
                sVar71 = pMVar9->cstep;
                sVar11 = pMVar9->elemsize;
                auVar106 = *(undefined1 (*) [16])
                            ((long)pMVar9[1].data + pMVar9[1].cstep * uVar47 * pMVar9[1].elemsize);
                pvVar12 = pMVar9->data;
                sVar13 = this_00->cstep;
                sVar14 = this_00->elemsize;
                pvVar56 = this_00->data;
                lVar60 = 0;
                iVar45 = (int)local_130;
                do {
                  auVar103 = vminps_avx(auVar106,*(undefined1 (*) [16])
                                                  ((long)pvVar12 + lVar60 + sVar71 * sVar11 * uVar47
                                                  ));
                  *(undefined1 (*) [16])((long)pvVar56 + lVar60 + sVar13 * sVar14 * uVar47) =
                       auVar103;
                  lVar60 = lVar60 + 0x10;
                  iVar45 = iVar45 + -1;
                } while (iVar45 != 0);
              }
              uVar47 = uVar47 + 1;
            } while (uVar47 != uVar46);
            return 0;
          }
          return 0;
        }
        return -100;
      }
      if (uVar65 == uVar64) {
        if (uVar66 == 1 && (uVar6 == 1 && uVar5 == uVar7)) {
          Mat::create(this_00,uVar64,uVar7,uVar8,sVar71,iVar45,opt->blob_allocator);
          if (this_00->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep != 0) {
            if (0 < (int)uVar8) {
              uVar47 = 0;
              do {
                if (0 < (int)local_130) {
                  sVar71 = pMVar9->cstep;
                  sVar11 = pMVar9->elemsize;
                  sVar13 = this_00->cstep;
                  pvVar12 = pMVar9->data;
                  pvVar56 = pMVar9[1].data;
                  sVar14 = this_00->elemsize;
                  pvVar63 = this_00->data;
                  lVar60 = 0;
                  iVar45 = (int)local_130;
                  do {
                    uVar4 = *(undefined4 *)((long)pvVar56 + lVar60);
                    auVar88._4_4_ = uVar4;
                    auVar88._0_4_ = uVar4;
                    auVar88._8_4_ = uVar4;
                    auVar88._12_4_ = uVar4;
                    auVar106 = vminps_avx(auVar88,*(undefined1 (*) [16])
                                                   ((long)pvVar12 +
                                                   lVar60 * 4 + sVar71 * sVar11 * uVar47));
                    *(undefined1 (*) [16])((long)pvVar63 + lVar60 * 4 + sVar13 * sVar14 * uVar47) =
                         auVar106;
                    lVar60 = lVar60 + 4;
                    iVar45 = iVar45 + -1;
                  } while (iVar45 != 0);
                }
                uVar47 = uVar47 + 1;
              } while (uVar47 != uVar46);
              return 0;
            }
            return 0;
          }
          return -100;
        }
        local_104 = CONCAT31(local_104._1_3_,uVar7 == 1);
        if ((uVar64 != 1 || uVar7 != 1) || uVar6 != uVar8) {
          if (((iVar45 == 1) && (uVar5 == uVar7)) && (uVar8 == 1)) {
            local_128 = uVar46;
            Mat::create(this_00,uVar64,uVar7,uVar6,sVar11,uVar66,opt->blob_allocator);
            if (this_00->data == (void *)0x0) {
              return -100;
            }
            if ((long)this_00->c * this_00->cstep != 0) {
              if (0 < (int)local_138) {
                uVar47 = 0;
                do {
                  if (0 < iVar72) {
                    sVar71 = pMVar9[1].cstep;
                    sVar11 = pMVar9[1].elemsize;
                    sVar13 = this_00->cstep;
                    pvVar12 = pMVar9[1].data;
                    pvVar56 = pMVar9->data;
                    sVar14 = this_00->elemsize;
                    pvVar63 = this_00->data;
                    lVar60 = 0;
                    iVar45 = iVar72;
                    do {
                      uVar4 = *(undefined4 *)((long)pvVar56 + lVar60);
                      auVar127._4_4_ = uVar4;
                      auVar127._0_4_ = uVar4;
                      auVar127._8_4_ = uVar4;
                      auVar127._12_4_ = uVar4;
                      auVar106 = vminps_avx(auVar127,*(undefined1 (*) [16])
                                                      ((long)pvVar12 +
                                                      lVar60 * 4 + sVar71 * sVar11 * uVar47));
                      *(undefined1 (*) [16])((long)pvVar63 + lVar60 * 4 + sVar13 * sVar14 * uVar47)
                           = auVar106;
                      lVar60 = lVar60 + 4;
                      iVar45 = iVar45 + -1;
                    } while (iVar45 != 0);
                  }
                  uVar47 = uVar47 + 1;
                } while (uVar47 != local_138);
                return 0;
              }
              return 0;
            }
            return -100;
          }
LAB_0024924b:
          if ((((uVar65 ^ 1) == 0 && uVar5 == uVar7) && uVar8 == uVar6) && uVar64 != 1) {
            local_128 = uVar46;
            Mat::create(this_00,uVar64,uVar7,uVar8,sVar71,iVar45,opt->blob_allocator);
            if (this_00->data == (void *)0x0) {
              return -100;
            }
            if ((long)this_00->c * this_00->cstep != 0) {
              if (0 < (int)uVar8) {
                uVar48 = 0;
                do {
                  if (0 < (int)uVar7) {
                    sVar71 = pMVar9[1].cstep;
                    sVar11 = pMVar9[1].elemsize;
                    pvVar12 = pMVar9[1].data;
                    pauVar50 = (undefined1 (*) [16])
                               (this_00->cstep * uVar48 * this_00->elemsize + (long)this_00->data);
                    pauVar55 = (undefined1 (*) [16])
                               (pMVar9->cstep * uVar48 * pMVar9->elemsize + (long)pMVar9->data);
                    uVar62 = 0;
                    do {
                      if (0 < (int)uVar64) {
                        auVar106 = *(undefined1 (*) [16])
                                    ((long)pvVar12 + uVar62 * 0x10 + sVar71 * uVar48 * sVar11);
                        uVar67 = uVar47;
                        do {
                          auVar103 = vminps_avx(auVar106,*pauVar55);
                          *pauVar50 = auVar103;
                          pauVar55 = pauVar55 + 1;
                          pauVar50 = pauVar50 + 1;
                          uVar66 = (int)uVar67 - 1;
                          uVar67 = (ulong)uVar66;
                        } while (uVar66 != 0);
                      }
                      uVar62 = uVar62 + 1;
                    } while (uVar62 != uVar7);
                  }
                  uVar48 = uVar48 + 1;
                } while (uVar48 != uVar46);
                return 0;
              }
              return 0;
            }
            return -100;
          }
          if (((uVar65 == uVar64 && (uVar5 ^ 1) == 0) && uVar8 == uVar6) && uVar7 != 1) {
            local_128 = uVar46;
            Mat::create(this_00,uVar64,uVar7,uVar8,sVar71,iVar45,opt->blob_allocator);
            if (this_00->data == (void *)0x0) {
              return -100;
            }
            if ((long)this_00->c * this_00->cstep != 0) {
              if (0 < (int)uVar8) {
                uVar48 = 0;
                do {
                  if (0 < (int)uVar7) {
                    sVar71 = pMVar9[1].elemsize;
                    pvVar56 = (void *)(this_00->cstep * uVar48 * this_00->elemsize +
                                      (long)this_00->data);
                    pvVar63 = (void *)(pMVar9->cstep * uVar48 * pMVar9->elemsize +
                                      (long)pMVar9->data);
                    sVar11 = pMVar9[1].cstep;
                    pvVar12 = pMVar9[1].data;
                    uVar66 = 0;
                    do {
                      if (0 < (int)uVar64) {
                        lVar60 = 0;
                        do {
                          auVar106 = vminps_avx(*(undefined1 (*) [16])((long)pvVar63 + lVar60),
                                                *(undefined1 (*) [16])
                                                 ((long)pvVar12 + lVar60 + sVar71 * sVar11 * uVar48)
                                               );
                          *(undefined1 (*) [16])((long)pvVar56 + lVar60) = auVar106;
                          lVar60 = lVar60 + 0x10;
                        } while (uVar47 << 4 != lVar60);
                        pvVar56 = (void *)((long)pvVar56 + lVar60);
                        pvVar63 = (void *)((long)pvVar63 + lVar60);
                      }
                      uVar66 = uVar66 + 1;
                    } while (uVar66 != uVar7);
                  }
                  uVar48 = uVar48 + 1;
                } while (uVar48 != uVar46);
                return 0;
              }
              return 0;
            }
            return -100;
          }
          if ((uVar6 == uVar8 && uVar5 == uVar7) && (uVar65 != 1 && uVar64 == 1)) {
            local_128 = uVar46;
            Mat::create(this_00,uVar65,uVar7,uVar8,sVar11,uVar66,opt->blob_allocator);
            if (this_00->data == (void *)0x0) {
              return -100;
            }
            if ((long)this_00->c * this_00->cstep != 0) {
              if (0 < (int)uVar8) {
                uVar47 = 0;
                do {
                  if (0 < (int)uVar7) {
                    sVar71 = pMVar9->cstep;
                    sVar11 = pMVar9->elemsize;
                    pvVar12 = pMVar9->data;
                    pauVar50 = (undefined1 (*) [16])
                               (this_00->cstep * uVar47 * this_00->elemsize + (long)this_00->data);
                    pauVar55 = (undefined1 (*) [16])
                               (pMVar9[1].cstep * uVar47 * pMVar9[1].elemsize + (long)pMVar9[1].data
                               );
                    uVar48 = 0;
                    do {
                      if (0 < (int)uVar65) {
                        auVar106 = *(undefined1 (*) [16])
                                    ((long)pvVar12 + uVar48 * 0x10 + sVar71 * uVar47 * sVar11);
                        uVar66 = uVar65;
                        do {
                          auVar103 = vminps_avx(auVar106,*pauVar55);
                          *pauVar50 = auVar103;
                          pauVar55 = pauVar55 + 1;
                          pauVar50 = pauVar50 + 1;
                          uVar66 = uVar66 - 1;
                        } while (uVar66 != 0);
                      }
                      uVar48 = uVar48 + 1;
                    } while (uVar48 != uVar7);
                  }
                  uVar47 = uVar47 + 1;
                } while (uVar47 != uVar46);
                return 0;
              }
              return 0;
            }
            return -100;
          }
          if (((byte)local_104 & uVar6 == uVar8 & (uVar5 != 1 && uVar65 == uVar64)) == 1) {
            local_128 = uVar46;
            Mat::create(this_00,uVar64,uVar5,uVar8,sVar11,uVar66,opt->blob_allocator);
            if (this_00->data == (void *)0x0) {
              return -100;
            }
            if ((long)local_120->c * local_120->cstep != 0) {
              if (0 < (int)local_128) {
                local_158 = (__m256 *)0x0;
                do {
                  pMVar1 = local_a0;
                  afVar185 = _local_100;
                  bVar74 = local_a0->dims == 3;
                  local_c8 = 1;
                  if (!bVar74) {
                    local_c8 = local_a0->d;
                  }
                  local_d4 = local_a0->w;
                  local_d0 = local_a0->h;
                  sVar71 = local_a0->cstep;
                  pvVar12 = local_a0->data;
                  local_130 = (void *)local_a0->elemsize;
                  local_e0 = local_a0->allocator;
                  _fStack_f8 = 0;
                  local_100 = (undefined1  [8])
                              (sVar71 * (long)local_158 * (long)local_130 + (long)pvVar12);
                  uStack_f0 = local_130;
                  fStack_e4 = afVar185[7];
                  fStack_e8 = (float)local_a0->elempack;
                  local_d8 = bVar74 ^ 3;
                  local_c0 = (long)local_d0 * (long)local_d4;
                  local_cc = 1;
                  Mat::~Mat((Mat *)local_100);
                  bVar74 = pMVar1[1].dims == 3;
                  local_c8 = 1;
                  if (!bVar74) {
                    local_c8 = pMVar1[1].d;
                  }
                  local_d4 = pMVar1[1].w;
                  local_d0 = pMVar1[1].h;
                  pvVar56 = (void *)(pMVar1[1].cstep * (long)local_158 * pMVar1[1].elemsize +
                                    (long)pMVar1[1].data);
                  local_d8 = bVar74 ^ 3;
                  local_e0 = pMVar1[1].allocator;
                  _fStack_f8 = 0;
                  local_100 = (undefined1  [8])pvVar56;
                  uStack_f0 = pMVar1[1].elemsize;
                  fStack_e8 = (float)pMVar1[1].elempack;
                  local_c0 = (long)local_d0 * (long)local_d4;
                  local_cc = 1;
                  Mat::~Mat((Mat *)local_100);
                  bVar74 = local_120->dims == 3;
                  local_d4 = local_120->w;
                  local_d0 = local_120->h;
                  local_c8 = 1;
                  if (!bVar74) {
                    local_c8 = local_120->d;
                  }
                  sVar11 = local_120->elemsize;
                  pvVar63 = (void *)(local_120->cstep * (long)local_158 * sVar11 +
                                    (long)local_120->data);
                  local_d8 = bVar74 ^ 3;
                  local_e0 = local_120->allocator;
                  fStack_f8 = 0.0;
                  fStack_f4 = 0.0;
                  local_100 = (undefined1  [8])pvVar63;
                  uStack_f0._0_4_ = (float)(int)sVar11;
                  uStack_f0._4_4_ = (float)(int)(sVar11 >> 0x20);
                  fStack_e8 = (float)local_120->elempack;
                  local_c0 = (long)local_d0 * (long)local_d4;
                  local_cc = 1;
                  Mat::~Mat((Mat *)local_100);
                  if (0 < (int)uVar5) {
                    uVar66 = 0;
                    do {
                      if (0 < (int)uVar64) {
                        lVar60 = 0;
                        do {
                          auVar106 = vminps_avx(*(undefined1 (*) [16])
                                                 ((long)pvVar12 +
                                                 lVar60 + sVar71 * (long)local_130 * (long)local_158
                                                 ),*(undefined1 (*) [16])((long)pvVar56 + lVar60));
                          *(undefined1 (*) [16])((long)pvVar63 + lVar60) = auVar106;
                          lVar60 = lVar60 + 0x10;
                        } while (uVar47 << 4 != lVar60);
                        pvVar63 = (void *)((long)pvVar63 + lVar60);
                        pvVar56 = (void *)((long)pvVar56 + lVar60);
                      }
                      uVar66 = uVar66 + 1;
                    } while (uVar66 != uVar5);
                  }
                  local_158 = (__m256 *)((long)local_158 + 1);
                } while (local_158 != (__m256 *)local_128);
                return 0;
              }
              return 0;
            }
            return -100;
          }
          local_128 = uVar46;
          Mat::create(this_00,uVar64,uVar7,uVar8,sVar71,iVar45,opt->blob_allocator);
          if (this_00->data == (void *)0x0) {
            return -100;
          }
          if ((long)local_120->c * local_120->cstep != 0) {
            if (0 < (int)local_128) {
              local_158 = (__m256 *)0x0;
              do {
                pMVar1 = local_a0;
                afVar185 = _local_100;
                bVar74 = local_a0->dims == 3;
                local_c8 = 1;
                if (!bVar74) {
                  local_c8 = local_a0->d;
                }
                local_d4 = local_a0->w;
                local_d0 = local_a0->h;
                sVar71 = local_a0->cstep;
                pvVar12 = local_a0->data;
                sVar11 = local_a0->elemsize;
                local_e0 = local_a0->allocator;
                _fStack_f8 = 0;
                local_100 = (undefined1  [8])(sVar71 * (long)local_158 * sVar11 + (long)pvVar12);
                uStack_f0 = sVar11;
                fStack_e4 = afVar185[7];
                fStack_e8 = (float)local_a0->elempack;
                local_d8 = bVar74 ^ 3;
                local_c0 = (long)local_d0 * (long)local_d4;
                local_cc = 1;
                Mat::~Mat((Mat *)local_100);
                bVar74 = pMVar1[1].dims == 3;
                local_c8 = 1;
                if (!bVar74) {
                  local_c8 = pMVar1[1].d;
                }
                local_d4 = pMVar1[1].w;
                local_d0 = pMVar1[1].h;
                local_138 = pMVar1[1].cstep;
                pvVar56 = pMVar1[1].data;
                local_110 = pMVar1[1].elemsize;
                local_e0 = pMVar1[1].allocator;
                _fStack_f8 = 0;
                local_100 = (undefined1  [8])
                            (local_138 * (long)local_158 * local_110 + (long)pvVar56);
                uStack_f0 = local_110;
                fStack_e8 = (float)pMVar1[1].elempack;
                local_d8 = bVar74 ^ 3;
                local_c0 = (long)local_d0 * (long)local_d4;
                local_cc = 1;
                Mat::~Mat((Mat *)local_100);
                bVar74 = local_120->dims == 3;
                local_d4 = local_120->w;
                local_d0 = local_120->h;
                local_c8 = 1;
                if (!bVar74) {
                  local_c8 = local_120->d;
                }
                sVar13 = local_120->cstep;
                pvVar63 = local_120->data;
                sVar14 = local_120->elemsize;
                local_e0 = local_120->allocator;
                fStack_f8 = 0.0;
                fStack_f4 = 0.0;
                local_100 = (undefined1  [8])(sVar13 * (long)local_158 * sVar14 + (long)pvVar63);
                uStack_f0._0_4_ = (float)(int)sVar14;
                uStack_f0._4_4_ = (float)(int)(sVar14 >> 0x20);
                fStack_e8 = (float)local_120->elempack;
                local_d8 = bVar74 ^ 3;
                local_c0 = (long)local_d0 * (long)local_d4;
                local_cc = 1;
                Mat::~Mat((Mat *)local_100);
                if (0 < (int)local_130) {
                  lVar60 = 0;
                  iVar45 = (int)local_130;
                  do {
                    auVar106 = vminps_avx(*(undefined1 (*) [16])
                                           ((long)pvVar12 +
                                           lVar60 + sVar71 * sVar11 * (long)local_158),
                                          *(undefined1 (*) [16])
                                           ((long)pvVar56 +
                                           lVar60 + local_138 * local_110 * (long)local_158));
                    *(undefined1 (*) [16])
                     ((long)pvVar63 + lVar60 + sVar13 * sVar14 * (long)local_158) = auVar106;
                    lVar60 = lVar60 + 0x10;
                    iVar45 = iVar45 + -1;
                  } while (iVar45 != 0);
                }
                local_158 = (__m256 *)((long)local_158 + 1);
              } while (local_158 != (__m256 *)local_128);
              return 0;
            }
            return 0;
          }
          return -100;
        }
      }
      else {
        local_104 = CONCAT31(local_104._1_3_,uVar7 == 1);
        local_128 = uVar46;
        if ((uVar64 != 1 || uVar7 != 1) || uVar6 != uVar8) goto LAB_0024924b;
      }
      Mat::create(this_00,uVar65,uVar5,uVar6,sVar11,uVar66,opt->blob_allocator);
      if (this_00->data == (void *)0x0) {
        return -100;
      }
      if ((long)this_00->c * this_00->cstep != 0) {
        if (0 < (int)local_138) {
          uVar47 = 0;
          do {
            if (0 < iVar72) {
              sVar71 = this_00->cstep;
              sVar11 = this_00->elemsize;
              auVar106 = *(undefined1 (*) [16])
                          ((long)pMVar9->data + pMVar9->cstep * uVar47 * pMVar9->elemsize);
              pvVar12 = this_00->data;
              sVar13 = pMVar9[1].cstep;
              sVar14 = pMVar9[1].elemsize;
              pvVar56 = pMVar9[1].data;
              lVar60 = 0;
              iVar45 = iVar72;
              do {
                auVar103 = vminps_avx(auVar106,*(undefined1 (*) [16])
                                                ((long)pvVar56 + lVar60 + sVar13 * sVar14 * uVar47))
                ;
                *(undefined1 (*) [16])((long)pvVar12 + lVar60 + sVar71 * sVar11 * uVar47) = auVar103
                ;
                lVar60 = lVar60 + 0x10;
                iVar45 = iVar45 + -1;
              } while (iVar45 != 0);
            }
            uVar47 = uVar47 + 1;
          } while (uVar47 != local_138);
          return 0;
        }
        return 0;
      }
      return -100;
    case 6:
      uVar64 = pMVar9->w;
      local_110 = (size_t)uVar64;
      local_60 = pMVar9->elemsize;
      uVar65 = pMVar9[1].w;
      uVar5 = pMVar9[1].h;
      uVar6 = pMVar9[1].c;
      uVar47 = (ulong)uVar6;
      sVar71 = pMVar9[1].elemsize;
      iVar59 = pMVar9->dims;
      local_130 = (void *)CONCAT44(local_130._4_4_,uVar65);
      local_128 = uVar47;
      if (iVar59 == 1) {
        local_90 = CONCAT44(local_90._4_4_,uVar5 * uVar65);
        iVar59 = pMVar9[1].dims;
        if (iVar45 == 1 && uVar64 == 1) {
          if (iVar59 == 1) {
            Mat::create(this_00,uVar65,sVar71,uVar66,opt->blob_allocator);
            pvVar12 = this_00->data;
            if (pvVar12 == (void *)0x0) {
              return -100;
            }
            if ((long)this_00->c * this_00->cstep == 0) {
              return -100;
            }
            local_100._4_4_ = *pMVar9->data;
            local_100._0_4_ = local_100._4_4_;
            fStack_f8 = (float)local_100._4_4_;
            fStack_f4 = (float)local_100._4_4_;
            if (0 < (int)local_130) {
              pvVar56 = pMVar1->data;
              lVar60 = 0;
              iVar45 = (int)local_130;
              do {
                pauVar50 = (undefined1 (*) [16])((long)pvVar56 + lVar60);
                uVar199 = *(undefined8 *)(*pauVar50 + 8);
                local_80._0_16_ = *pauVar50;
                afVar328 = binary_op_pow_pack4::operator()
                                     ((binary_op_pow_pack4 *)&local_139,(__m128 *)local_100,
                                      (__m128 *)local_80);
                puVar68 = (undefined8 *)((long)pvVar12 + lVar60);
                *puVar68 = afVar328._0_8_;
                puVar68[1] = uVar199;
                lVar60 = lVar60 + 0x10;
                iVar45 = iVar45 + -1;
              } while (iVar45 != 0);
            }
          }
          else if (iVar59 == 2) {
            Mat::create(this_00,uVar65,uVar5,sVar71,uVar66,opt->blob_allocator);
            pvVar12 = this_00->data;
            if (pvVar12 == (void *)0x0) {
              return -100;
            }
            if ((long)this_00->c * this_00->cstep == 0) {
              return -100;
            }
            local_100._4_4_ = *pMVar9->data;
            local_100._0_4_ = local_100._4_4_;
            fStack_f8 = (float)local_100._4_4_;
            fStack_f4 = (float)local_100._4_4_;
            if (0 < (int)local_90) {
              pvVar56 = pMVar1->data;
              lVar60 = 0;
              iVar45 = (int)local_90;
              do {
                pauVar50 = (undefined1 (*) [16])((long)pvVar56 + lVar60);
                uVar199 = *(undefined8 *)(*pauVar50 + 8);
                local_80._0_16_ = *pauVar50;
                afVar328 = binary_op_pow_pack4::operator()
                                     ((binary_op_pow_pack4 *)&local_139,(__m128 *)local_100,
                                      (__m128 *)local_80);
                puVar68 = (undefined8 *)((long)pvVar12 + lVar60);
                *puVar68 = afVar328._0_8_;
                puVar68[1] = uVar199;
                lVar60 = lVar60 + 0x10;
                iVar45 = iVar45 + -1;
              } while (iVar45 != 0);
            }
          }
          else if (iVar59 == 3) {
            Mat::create(this_00,uVar65,uVar5,uVar6,sVar71,uVar66,opt->blob_allocator);
            if (local_120->data == (void *)0x0) {
              return -100;
            }
            if ((long)local_120->c * local_120->cstep == 0) {
              return -100;
            }
            local_100._4_4_ = *pMVar9->data;
            local_100._0_4_ = local_100._4_4_;
            fStack_f8 = (float)local_100._4_4_;
            fStack_f4 = (float)local_100._4_4_;
            if (0 < (int)uVar6) {
              local_150 = 0;
              do {
                if (0 < (int)local_90) {
                  sVar71 = local_120->cstep;
                  sVar11 = local_120->elemsize;
                  pvVar12 = local_120->data;
                  sVar13 = local_a0[1].cstep;
                  sVar14 = local_a0[1].elemsize;
                  pvVar56 = local_a0[1].data;
                  lVar60 = 0;
                  iVar45 = (int)local_90;
                  do {
                    pauVar50 = (undefined1 (*) [16])
                               ((long)pvVar56 + lVar60 + sVar13 * sVar14 * local_150);
                    auVar200 = ZEXT856(*(ulong *)(*pauVar50 + 8));
                    local_80._0_16_ = *pauVar50;
                    afVar328 = binary_op_pow_pack4::operator()
                                         ((binary_op_pow_pack4 *)&local_139,(__m128 *)local_100,
                                          (__m128 *)local_80);
                    auVar188._0_8_ = afVar328._0_8_;
                    auVar188._8_56_ = auVar200;
                    *(undefined1 (*) [16])((long)pvVar12 + lVar60 + sVar71 * sVar11 * local_150) =
                         auVar188._0_16_;
                    lVar60 = lVar60 + 0x10;
                    iVar45 = iVar45 + -1;
                  } while (iVar45 != 0);
                }
                local_150 = local_150 + 1;
              } while (local_150 != local_128);
            }
          }
        }
        else if (iVar59 == 1) {
          Mat::create(this_00,uVar64,local_60,iVar45,opt->blob_allocator);
          afVar185 = _local_100;
          pvVar12 = this_00->data;
          if (pvVar12 == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep == 0) {
            return -100;
          }
          if (uVar66 == 1 && pMVar9[1].w == 1) {
            local_100._4_4_ = *pMVar1->data;
            local_100._0_4_ = local_100._4_4_;
            fStack_f8 = (float)local_100._4_4_;
            _uStack_f0 = afVar185._16_16_;
            fStack_f4 = (float)local_100._4_4_;
            if (0 < (int)local_110) {
              pvVar56 = pMVar9->data;
              lVar60 = 0;
              sVar71 = local_110;
              do {
                pauVar50 = (undefined1 (*) [16])((long)pvVar56 + lVar60);
                uVar199 = *(undefined8 *)(*pauVar50 + 8);
                local_80._0_16_ = *pauVar50;
                afVar328 = binary_op_pow_pack4::operator()
                                     ((binary_op_pow_pack4 *)&local_139,(__m128 *)local_80,
                                      (__m128 *)local_100);
                *(undefined8 *)((long)pvVar12 + lVar60) = afVar328._0_8_;
                ((undefined8 *)((long)pvVar12 + lVar60))[1] = uVar199;
                lVar60 = lVar60 + 0x10;
                uVar66 = (int)sVar71 - 1;
                sVar71 = (size_t)uVar66;
              } while (uVar66 != 0);
            }
          }
          else {
            if ((int)local_110 < 1) {
              return 0;
            }
            pvVar56 = pMVar9->data;
            pvVar63 = pMVar9[1].data;
            lVar60 = 0;
            sVar71 = local_110;
            do {
              _local_100 = (__m128)*(undefined1 (*) [16])((long)pvVar56 + lVar60);
              pauVar50 = (undefined1 (*) [16])((long)pvVar63 + lVar60);
              uVar199 = *(undefined8 *)(*pauVar50 + 8);
              local_80._0_16_ = *pauVar50;
              afVar328 = binary_op_pow_pack4::operator()
                                   ((binary_op_pow_pack4 *)&local_139,(__m128 *)local_100,
                                    (__m128 *)local_80);
              *(undefined8 *)((long)pvVar12 + lVar60) = afVar328._0_8_;
              ((undefined8 *)((long)pvVar12 + lVar60))[1] = uVar199;
              lVar60 = lVar60 + 0x10;
              uVar66 = (int)sVar71 - 1;
              sVar71 = (size_t)uVar66;
            } while (uVar66 != 0);
          }
        }
        else {
          if (iVar59 == 2) {
            Mat::create(this_00,uVar65,uVar5,sVar71,uVar66,opt->blob_allocator);
            puVar68 = (undefined8 *)this_00->data;
            if (puVar68 == (undefined8 *)0x0) {
              return -100;
            }
            if ((long)this_00->c * this_00->cstep != 0) {
              if (0 < (int)uVar5) {
                local_158 = (__m256 *)pMVar9->data;
                pauVar50 = (undefined1 (*) [16])pMVar9[1].data;
                uVar66 = 0;
                do {
                  _local_100 = (__m128)*(undefined1 (*) [16])local_158;
                  iVar45 = (int)local_130;
                  if (0 < (int)local_130) {
                    do {
                      uVar199 = *(undefined8 *)(*pauVar50 + 8);
                      local_80._0_16_ = *pauVar50;
                      afVar328 = binary_op_pow_pack4::operator()
                                           ((binary_op_pow_pack4 *)&local_139,(__m128 *)local_100,
                                            (__m128 *)local_80);
                      *puVar68 = afVar328._0_8_;
                      puVar68[1] = uVar199;
                      pauVar50 = pauVar50 + 1;
                      puVar68 = puVar68 + 2;
                      iVar45 = iVar45 + -1;
                    } while (iVar45 != 0);
                  }
                  local_158 = (__m256 *)((long)local_158 + 0x10);
                  uVar66 = uVar66 + 1;
                } while (uVar66 != uVar5);
                return 0;
              }
              return 0;
            }
            return -100;
          }
          if (iVar59 == 3) {
            Mat::create(this_00,uVar65,uVar5,uVar6,sVar71,uVar66,opt->blob_allocator);
            if (local_120->data == (void *)0x0) {
              return -100;
            }
            if ((long)local_120->c * local_120->cstep != 0) {
              if (0 < (int)uVar6) {
                local_150 = 0;
                do {
                  _local_100 = (__m128)*(undefined1 (*) [16])
                                        ((long)local_a0->data + local_150 * 0x10);
                  if (0 < (int)local_90) {
                    sVar71 = local_120->cstep;
                    sVar11 = local_120->elemsize;
                    pvVar12 = local_120->data;
                    sVar13 = local_a0[1].cstep;
                    sVar14 = local_a0[1].elemsize;
                    pvVar56 = local_a0[1].data;
                    lVar60 = 0;
                    iVar45 = (int)local_90;
                    do {
                      pauVar50 = (undefined1 (*) [16])
                                 ((long)pvVar56 + lVar60 + sVar13 * sVar14 * local_150);
                      uVar199 = *(undefined8 *)(*pauVar50 + 8);
                      local_80._0_16_ = *pauVar50;
                      afVar328 = binary_op_pow_pack4::operator()
                                           ((binary_op_pow_pack4 *)&local_139,(__m128 *)local_100,
                                            (__m128 *)local_80);
                      puVar68 = (undefined8 *)((long)pvVar12 + lVar60 + sVar71 * sVar11 * local_150)
                      ;
                      *puVar68 = afVar328._0_8_;
                      puVar68[1] = uVar199;
                      lVar60 = lVar60 + 0x10;
                      iVar45 = iVar45 + -1;
                    } while (iVar45 != 0);
                  }
                  local_150 = local_150 + 1;
                } while (local_150 != local_128);
                return 0;
              }
              return 0;
            }
            return -100;
          }
        }
      }
      else {
        uVar7 = pMVar9->h;
        local_138 = (ulong)uVar7;
        local_104 = uVar7 * uVar64;
        if (iVar59 == 2) {
          if (pMVar9[1].dims == 3) {
            Mat::create(this_00,uVar65,uVar5,uVar6,sVar71,uVar66,opt->blob_allocator);
            if (local_120->data == (void *)0x0) {
              return -100;
            }
            if ((long)local_120->c * local_120->cstep != 0) {
              if (0 < (int)uVar6) {
                local_138 = 0;
                do {
                  if (0 < (int)uVar5) {
                    pauVar53 = (undefined1 (*) [16])
                               (local_120->cstep * local_138 * local_120->elemsize +
                               (long)local_120->data);
                    pauVar55 = (undefined1 (*) [16])
                               (local_a0[1].cstep * local_138 * local_a0[1].elemsize +
                               (long)local_a0[1].data);
                    pauVar50 = (undefined1 (*) [16])
                               ((long)local_a0->w * local_138 * local_a0->elemsize +
                               (long)local_a0->data);
                    uVar66 = 0;
                    do {
                      _local_100 = (__m128)*pauVar50;
                      iVar45 = (int)local_130;
                      if (0 < (int)local_130) {
                        do {
                          auVar200 = ZEXT856(*(ulong *)(*pauVar55 + 8));
                          local_80._0_16_ = *pauVar55;
                          afVar328 = binary_op_pow_pack4::operator()
                                               ((binary_op_pow_pack4 *)&local_139,
                                                (__m128 *)local_100,(__m128 *)local_80);
                          auVar187._0_8_ = afVar328._0_8_;
                          auVar187._8_56_ = auVar200;
                          *pauVar53 = auVar187._0_16_;
                          pauVar55 = pauVar55 + 1;
                          pauVar53 = pauVar53 + 1;
                          iVar45 = iVar45 + -1;
                        } while (iVar45 != 0);
                      }
                      pauVar50 = pauVar50 + 1;
                      uVar66 = uVar66 + 1;
                    } while (uVar66 != uVar5);
                  }
                  local_138 = local_138 + 1;
                } while (local_138 != local_128);
                return 0;
              }
              return 0;
            }
            return -100;
          }
          local_128 = CONCAT44(uVar4,uVar66);
          Mat::create(this_00,uVar64,uVar7,local_60,iVar45,opt->blob_allocator);
          pvVar12 = this_00->data;
          if (pvVar12 == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep == 0) {
            return -100;
          }
          if (pMVar9[1].dims == 1) {
            Mat::create(this_00,(int)local_110,(int)local_138,local_60,iVar45,opt->blob_allocator);
            afVar185 = _local_100;
            puVar68 = (undefined8 *)this_00->data;
            if (puVar68 == (undefined8 *)0x0) {
              return -100;
            }
            if ((long)this_00->c * this_00->cstep == 0) {
              return -100;
            }
            if ((int)local_128 != 1 || pMVar9[1].w != 1) {
              if (0 < (int)local_138) {
                pauVar50 = (undefined1 (*) [16])pMVar9->data;
                local_158 = (__m256 *)pMVar9[1].data;
                iVar45 = 0;
                do {
                  _local_100 = (__m128)*(undefined1 (*) [16])local_158;
                  uVar47 = local_110 & 0xffffffff;
                  if (0 < (int)local_110) {
                    do {
                      uVar199 = *(undefined8 *)(*pauVar50 + 8);
                      local_80._0_16_ = *pauVar50;
                      afVar328 = binary_op_pow_pack4::operator()
                                           ((binary_op_pow_pack4 *)&local_139,(__m128 *)local_80,
                                            (__m128 *)local_100);
                      *puVar68 = afVar328._0_8_;
                      puVar68[1] = uVar199;
                      pauVar50 = pauVar50 + 1;
                      puVar68 = puVar68 + 2;
                      uVar66 = (int)uVar47 - 1;
                      uVar47 = (ulong)uVar66;
                    } while (uVar66 != 0);
                  }
                  local_158 = (__m256 *)((long)local_158 + 0x10);
                  iVar45 = iVar45 + 1;
                } while (iVar45 != (int)local_138);
                return 0;
              }
              return 0;
            }
            local_100._4_4_ = *pMVar1->data;
            local_100._0_4_ = local_100._4_4_;
            fStack_f8 = (float)local_100._4_4_;
            _uStack_f0 = afVar185._16_16_;
            fStack_f4 = (float)local_100._4_4_;
            if (0 < local_104) {
              pvVar12 = pMVar9->data;
              lVar60 = 0;
              iVar45 = local_104;
              do {
                pauVar50 = (undefined1 (*) [16])((long)pvVar12 + lVar60);
                uVar199 = *(undefined8 *)(*pauVar50 + 8);
                local_80._0_16_ = *pauVar50;
                afVar328 = binary_op_pow_pack4::operator()
                                     ((binary_op_pow_pack4 *)&local_139,(__m128 *)local_80,
                                      (__m128 *)local_100);
                *(undefined8 *)((long)puVar68 + lVar60) = afVar328._0_8_;
                ((undefined8 *)((long)puVar68 + lVar60))[1] = uVar199;
                lVar60 = lVar60 + 0x10;
                iVar45 = iVar45 + -1;
              } while (iVar45 != 0);
            }
          }
          else if (pMVar9[1].dims == 2) {
            if (local_104 < 1) {
              return 0;
            }
            pvVar56 = pMVar9->data;
            pvVar63 = pMVar9[1].data;
            lVar60 = 0;
            iVar45 = local_104;
            do {
              _local_100 = (__m128)*(undefined1 (*) [16])((long)pvVar56 + lVar60);
              pauVar50 = (undefined1 (*) [16])((long)pvVar63 + lVar60);
              uVar199 = *(undefined8 *)(*pauVar50 + 8);
              local_80._0_16_ = *pauVar50;
              afVar328 = binary_op_pow_pack4::operator()
                                   ((binary_op_pow_pack4 *)&local_139,(__m128 *)local_100,
                                    (__m128 *)local_80);
              puVar68 = (undefined8 *)((long)pvVar12 + lVar60);
              *puVar68 = afVar328._0_8_;
              puVar68[1] = uVar199;
              lVar60 = lVar60 + 0x10;
              iVar45 = iVar45 + -1;
            } while (iVar45 != 0);
          }
        }
        else if (iVar59 == 3) {
          uVar8 = pMVar9->c;
          local_98 = (ulong)uVar8;
          if (pMVar9[1].dims == 3) {
            local_90 = CONCAT44(local_90._4_4_,uVar5 * uVar65);
            if (uVar8 == uVar6 && ((uVar65 ^ 1) == 0 && (uVar5 ^ 1) == 0)) {
              Mat::create(this_00,uVar64,uVar7,uVar8,local_60,iVar45,opt->blob_allocator);
              if (local_120->data == (void *)0x0) {
                return -100;
              }
              if ((long)local_120->c * local_120->cstep != 0) {
                if (0 < (int)uVar8) {
                  local_150 = 0;
                  do {
                    pvVar12 = local_a0->data;
                    sVar71 = local_a0->elemsize;
                    sVar11 = local_a0->cstep;
                    pvVar56 = local_120->data;
                    sVar13 = local_120->elemsize;
                    sVar14 = local_120->cstep;
                    _local_100 = (__m128)*(undefined1 (*) [16])
                                          ((long)local_a0[1].data +
                                          local_a0[1].cstep * local_150 * local_a0[1].elemsize);
                    if (0 < local_104) {
                      lVar60 = 0;
                      iVar45 = local_104;
                      do {
                        pauVar50 = (undefined1 (*) [16])
                                   ((long)pvVar12 + lVar60 + sVar11 * sVar71 * local_150);
                        uVar199 = *(undefined8 *)(*pauVar50 + 8);
                        local_80._0_16_ = *pauVar50;
                        afVar328 = binary_op_pow_pack4::operator()
                                             ((binary_op_pow_pack4 *)&local_139,(__m128 *)local_80,
                                              (__m128 *)local_100);
                        puVar68 = (undefined8 *)
                                  ((long)pvVar56 + lVar60 + sVar14 * sVar13 * local_150);
                        *puVar68 = afVar328._0_8_;
                        puVar68[1] = uVar199;
                        lVar60 = lVar60 + 0x10;
                        iVar45 = iVar45 + -1;
                      } while (iVar45 != 0);
                    }
                    local_150 = local_150 + 1;
                  } while (local_150 != local_98);
                  return 0;
                }
                return 0;
              }
              return -100;
            }
            if (uVar65 == uVar64) {
              if (uVar66 == 1 && (uVar6 == 1 && uVar5 == uVar7)) {
                Mat::create(this_00,uVar64,uVar7,uVar8,local_60,iVar45,opt->blob_allocator);
                if (local_120->data == (void *)0x0) {
                  return -100;
                }
                if ((long)local_120->c * local_120->cstep != 0) {
                  if (0 < (int)uVar8) {
                    local_130 = (void *)0x0;
                    do {
                      if (0 < local_104) {
                        lVar60 = local_a0->cstep * local_a0->elemsize * (long)local_130;
                        pvVar12 = local_a0->data;
                        pvVar56 = local_a0[1].data;
                        lVar61 = local_120->cstep * local_120->elemsize * (long)local_130;
                        pvVar63 = local_120->data;
                        lVar73 = 0;
                        iVar45 = local_104;
                        do {
                          _local_100 = (__m128)*(undefined1 (*) [16])
                                                ((long)pvVar12 + lVar73 * 4 + lVar60);
                          uVar4 = *(undefined4 *)((long)pvVar56 + lVar73);
                          auVar89._4_4_ = uVar4;
                          auVar89._0_4_ = uVar4;
                          auVar89._8_4_ = uVar4;
                          auVar89._12_4_ = uVar4;
                          auVar200 = ZEXT856(auVar89._8_8_);
                          local_80[0] = (float)uVar4;
                          local_80[1] = (float)uVar4;
                          local_80[2] = (float)uVar4;
                          local_80[3] = (float)uVar4;
                          afVar328 = binary_op_pow_pack4::operator()
                                               ((binary_op_pow_pack4 *)&local_139,
                                                (__m128 *)local_100,(__m128 *)local_80);
                          auVar190._0_8_ = afVar328._0_8_;
                          auVar190._8_56_ = auVar200;
                          *(undefined1 (*) [16])((long)pvVar63 + lVar73 * 4 + lVar61) =
                               auVar190._0_16_;
                          lVar73 = lVar73 + 4;
                          iVar45 = iVar45 + -1;
                        } while (iVar45 != 0);
                      }
                      local_130 = (void *)((long)local_130 + 1);
                    } while (local_130 != (void *)local_98);
                    return 0;
                  }
                  return 0;
                }
                return -100;
              }
              if ((uVar64 == 1 && uVar7 == 1) && uVar6 == uVar8) {
LAB_0024cb54:
                Mat::create(this_00,uVar65,uVar5,uVar6,sVar71,uVar66,opt->blob_allocator);
                if (local_120->data == (void *)0x0) {
                  return -100;
                }
                if ((long)local_120->c * local_120->cstep != 0) {
                  if (0 < (int)local_128) {
                    local_150 = 0;
                    do {
                      pvVar12 = local_120->data;
                      sVar71 = local_120->elemsize;
                      sVar11 = local_120->cstep;
                      pvVar56 = local_a0[1].data;
                      sVar13 = local_a0[1].cstep;
                      sVar14 = local_a0[1].elemsize;
                      _local_100 = (__m128)*(undefined1 (*) [16])
                                            ((long)local_a0->data +
                                            local_a0->cstep * local_150 * local_a0->elemsize);
                      if (0 < (int)local_90) {
                        lVar60 = 0;
                        iVar45 = (int)local_90;
                        do {
                          pauVar50 = (undefined1 (*) [16])
                                     ((long)pvVar56 + lVar60 + sVar13 * sVar14 * local_150);
                          uVar199 = *(undefined8 *)(*pauVar50 + 8);
                          local_80._0_16_ = *pauVar50;
                          afVar328 = binary_op_pow_pack4::operator()
                                               ((binary_op_pow_pack4 *)&local_139,
                                                (__m128 *)local_100,(__m128 *)local_80);
                          puVar68 = (undefined8 *)
                                    ((long)pvVar12 + lVar60 + sVar11 * sVar71 * local_150);
                          *puVar68 = afVar328._0_8_;
                          puVar68[1] = uVar199;
                          lVar60 = lVar60 + 0x10;
                          iVar45 = iVar45 + -1;
                        } while (iVar45 != 0);
                      }
                      local_150 = local_150 + 1;
                    } while (local_150 != local_128);
                    return 0;
                  }
                  return 0;
                }
                return -100;
              }
              if (iVar45 == 1 && (uVar8 == 1 && uVar5 == uVar7)) {
                Mat::create(this_00,uVar64,uVar7,uVar6,sVar71,uVar66,opt->blob_allocator);
                if (local_120->data == (void *)0x0) {
                  return -100;
                }
                if ((long)local_120->c * local_120->cstep != 0) {
                  if (0 < (int)local_128) {
                    local_130 = (void *)0x0;
                    do {
                      if (0 < (int)local_90) {
                        lVar60 = local_a0[1].cstep * local_a0[1].elemsize * (long)local_130;
                        pvVar12 = local_a0[1].data;
                        pvVar56 = local_a0->data;
                        lVar61 = local_120->cstep * local_120->elemsize * (long)local_130;
                        pvVar63 = local_120->data;
                        lVar73 = 0;
                        iVar45 = (int)local_90;
                        do {
                          afVar185 = _local_100;
                          local_100._4_4_ = *(float *)((long)pvVar56 + lVar73);
                          local_100._0_4_ = local_100._4_4_;
                          fStack_f8 = (float)local_100._4_4_;
                          _uStack_f0 = afVar185._16_16_;
                          fStack_f4 = (float)local_100._4_4_;
                          pauVar50 = (undefined1 (*) [16])((long)pvVar12 + lVar73 * 4 + lVar60);
                          auVar200 = ZEXT856(*(ulong *)(*pauVar50 + 8));
                          local_80._0_16_ = *pauVar50;
                          afVar328 = binary_op_pow_pack4::operator()
                                               ((binary_op_pow_pack4 *)&local_139,
                                                (__m128 *)local_100,(__m128 *)local_80);
                          auVar194._0_8_ = afVar328._0_8_;
                          auVar194._8_56_ = auVar200;
                          *(undefined1 (*) [16])((long)pvVar63 + lVar73 * 4 + lVar61) =
                               auVar194._0_16_;
                          lVar73 = lVar73 + 4;
                          iVar45 = iVar45 + -1;
                        } while (iVar45 != 0);
                      }
                      local_130 = (void *)((long)local_130 + 1);
                    } while (local_130 != (void *)local_128);
                    return 0;
                  }
                  return 0;
                }
                return -100;
              }
            }
            else if ((uVar64 == 1 && uVar7 == 1) && uVar6 == uVar8) goto LAB_0024cb54;
            local_90 = CONCAT71(local_90._1_7_,uVar7 == 1);
            local_128 = (ulong)uVar66;
            if ((((uVar65 ^ 1) == 0 && uVar5 == uVar7) && uVar8 == uVar6) && uVar64 != 1) {
              Mat::create(this_00,uVar64,uVar7,uVar8,local_60,iVar45,opt->blob_allocator);
              if (local_120->data == (void *)0x0) {
                return -100;
              }
              if ((long)local_120->c * local_120->cstep != 0) {
                if (0 < (int)local_98) {
                  local_150 = 0;
                  do {
                    if (0 < (int)local_138) {
                      sVar71 = local_a0[1].cstep;
                      sVar11 = local_a0[1].elemsize;
                      pvVar12 = local_a0[1].data;
                      pauVar50 = (undefined1 (*) [16])
                                 (local_120->cstep * local_150 * local_120->elemsize +
                                 (long)local_120->data);
                      pauVar55 = (undefined1 (*) [16])
                                 (local_a0->cstep * local_150 * local_a0->elemsize +
                                 (long)local_a0->data);
                      uVar47 = 0;
                      do {
                        _local_100 = (__m128)*(undefined1 (*) [16])
                                              ((long)pvVar12 +
                                              uVar47 * 0x10 + sVar71 * local_150 * sVar11);
                        uVar46 = local_110 & 0xffffffff;
                        if (0 < (int)local_110) {
                          do {
                            auVar200 = ZEXT856(*(ulong *)(*pauVar55 + 8));
                            local_80._0_16_ = *pauVar55;
                            afVar328 = binary_op_pow_pack4::operator()
                                                 ((binary_op_pow_pack4 *)&local_139,
                                                  (__m128 *)local_80,(__m128 *)local_100);
                            auVar191._0_8_ = afVar328._0_8_;
                            auVar191._8_56_ = auVar200;
                            *pauVar50 = auVar191._0_16_;
                            pauVar55 = pauVar55 + 1;
                            pauVar50 = pauVar50 + 1;
                            uVar66 = (int)uVar46 - 1;
                            uVar46 = (ulong)uVar66;
                          } while (uVar66 != 0);
                        }
                        uVar47 = uVar47 + 1;
                      } while (uVar47 != local_138);
                    }
                    local_150 = local_150 + 1;
                  } while (local_150 != local_98);
                  return 0;
                }
                return 0;
              }
              return -100;
            }
            if (((uVar65 != uVar64 || (uVar5 ^ 1) != 0) || uVar8 != uVar6) || uVar7 == 1) {
              if ((uVar6 == uVar8 && uVar5 == uVar7) && (uVar65 != 1 && uVar64 == 1)) {
                Mat::create(this_00,uVar65,uVar7,uVar8,sVar71,uVar66,opt->blob_allocator);
                if (this_00->data == (void *)0x0) {
                  return -100;
                }
                if ((long)local_120->c * local_120->cstep != 0) {
                  if (0 < (int)local_98) {
                    local_150 = 0;
                    do {
                      if (0 < (int)local_138) {
                        sVar71 = local_a0->cstep;
                        sVar11 = local_a0->elemsize;
                        pvVar12 = local_a0->data;
                        pauVar50 = (undefined1 (*) [16])
                                   (local_120->cstep * local_150 * local_120->elemsize +
                                   (long)local_120->data);
                        pauVar55 = (undefined1 (*) [16])
                                   (local_a0[1].cstep * local_150 * local_a0[1].elemsize +
                                   (long)local_a0[1].data);
                        uVar47 = 0;
                        do {
                          _local_100 = (__m128)*(undefined1 (*) [16])
                                                ((long)pvVar12 +
                                                uVar47 * 0x10 + sVar71 * local_150 * sVar11);
                          iVar45 = (int)local_130;
                          if (0 < (int)local_130) {
                            do {
                              auVar200 = ZEXT856(*(ulong *)(*pauVar55 + 8));
                              local_80._0_16_ = *pauVar55;
                              afVar328 = binary_op_pow_pack4::operator()
                                                   ((binary_op_pow_pack4 *)&local_139,
                                                    (__m128 *)local_100,(__m128 *)local_80);
                              auVar195._0_8_ = afVar328._0_8_;
                              auVar195._8_56_ = auVar200;
                              *pauVar50 = auVar195._0_16_;
                              pauVar55 = pauVar55 + 1;
                              pauVar50 = pauVar50 + 1;
                              iVar45 = iVar45 + -1;
                            } while (iVar45 != 0);
                          }
                          uVar47 = uVar47 + 1;
                        } while (uVar47 != local_138);
                      }
                      local_150 = local_150 + 1;
                    } while (local_150 != local_98);
                    return 0;
                  }
                  return 0;
                }
                return -100;
              }
              if ((uVar7 == 1 && uVar6 == uVar8) && (uVar5 != 1 && uVar65 == uVar64)) {
                Mat::create(this_00,uVar64,uVar5,uVar8,sVar71,uVar66,opt->blob_allocator);
                if (this_00->data != (void *)0x0) {
                  if ((long)local_120->c * local_120->cstep == 0) {
                    return -100;
                  }
                  if (0 < (int)local_98) {
                    local_130 = (void *)(local_110 << 4);
                    local_138 = 0;
                    do {
                      pMVar1 = local_a0;
                      afVar185 = _local_100;
                      bVar74 = local_a0->dims == 3;
                      local_c8 = 1;
                      if (!bVar74) {
                        local_c8 = local_a0->d;
                      }
                      local_d4 = local_a0->w;
                      local_d0 = local_a0->h;
                      sVar71 = local_a0->cstep;
                      pvVar12 = local_a0->data;
                      sVar11 = local_a0->elemsize;
                      local_e0 = local_a0->allocator;
                      _fStack_f8 = 0;
                      local_100 = (undefined1  [8])(sVar71 * local_138 * sVar11 + (long)pvVar12);
                      uStack_f0 = sVar11;
                      fStack_e4 = afVar185[7];
                      fStack_e8 = (float)local_a0->elempack;
                      local_d8 = bVar74 ^ 3;
                      local_c0 = (long)local_d0 * (long)local_d4;
                      local_cc = 1;
                      Mat::~Mat((Mat *)local_100);
                      bVar74 = pMVar1[1].dims == 3;
                      local_c8 = 1;
                      if (!bVar74) {
                        local_c8 = pMVar1[1].d;
                      }
                      local_d4 = pMVar1[1].w;
                      local_d0 = pMVar1[1].h;
                      pvVar56 = (void *)(pMVar1[1].cstep * local_138 * pMVar1[1].elemsize +
                                        (long)pMVar1[1].data);
                      local_d8 = bVar74 ^ 3;
                      local_e0 = pMVar1[1].allocator;
                      _fStack_f8 = 0;
                      local_100 = (undefined1  [8])pvVar56;
                      uStack_f0 = pMVar1[1].elemsize;
                      fStack_e8 = (float)pMVar1[1].elempack;
                      local_c0 = (long)local_d0 * (long)local_d4;
                      local_cc = 1;
                      Mat::~Mat((Mat *)local_100);
                      bVar74 = local_120->dims == 3;
                      local_d4 = local_120->w;
                      local_d0 = local_120->h;
                      local_c8 = 1;
                      if (!bVar74) {
                        local_c8 = local_120->d;
                      }
                      sVar13 = local_120->elemsize;
                      pvVar63 = (void *)(local_120->cstep * local_138 * sVar13 +
                                        (long)local_120->data);
                      local_d8 = bVar74 ^ 3;
                      local_e0 = local_120->allocator;
                      fStack_f8 = 0.0;
                      fStack_f4 = 0.0;
                      local_100 = (undefined1  [8])pvVar63;
                      uStack_f0._0_4_ = (float)(int)sVar13;
                      uStack_f0._4_4_ = (float)(int)(sVar13 >> 0x20);
                      fStack_e8 = (float)local_120->elempack;
                      local_c0 = (long)local_d0 * (long)local_d4;
                      local_cc = 1;
                      Mat::~Mat((Mat *)local_100);
                      if (0 < (int)uVar5) {
                        lVar60 = sVar71 * sVar11 * local_138;
                        uVar66 = 0;
                        uVar47 = local_110;
                        do {
                          pvVar44 = local_130;
                          if (0 < (int)uVar47) {
                            lVar61 = 0;
                            do {
                              _local_100 = (__m128)*(undefined1 (*) [16])
                                                    ((long)pvVar12 + lVar61 + lVar60);
                              auVar200 = ZEXT856(*(ulong *)(*(undefined1 (*) [16])
                                                             ((long)pvVar56 + lVar61) + 8));
                              local_80._0_16_ = *(undefined1 (*) [16])((long)pvVar56 + lVar61);
                              afVar328 = binary_op_pow_pack4::operator()
                                                   ((binary_op_pow_pack4 *)&local_139,
                                                    (__m128 *)local_100,(__m128 *)local_80);
                              auVar196._0_8_ = afVar328._0_8_;
                              auVar196._8_56_ = auVar200;
                              *(undefined1 (*) [16])((long)pvVar63 + lVar61) = auVar196._0_16_;
                              lVar61 = lVar61 + 0x10;
                            } while (pvVar44 != (void *)lVar61);
                            pvVar63 = (void *)((long)pvVar63 + lVar61);
                            pvVar56 = (void *)((long)pvVar56 + lVar61);
                            uVar47 = local_110;
                          }
                          uVar66 = uVar66 + 1;
                        } while (uVar66 != uVar5);
                      }
                      local_138 = local_138 + 1;
                    } while (local_138 != local_98);
                    return 0;
                  }
                  return 0;
                }
              }
              else {
                Mat::create(this_00,uVar64,uVar7,uVar8,local_60,iVar45,opt->blob_allocator);
                if (this_00->data != (void *)0x0) {
                  if ((long)local_120->c * local_120->cstep == 0) {
                    return -100;
                  }
                  if (0 < (int)local_98) {
                    local_150 = 0;
                    do {
                      pMVar1 = local_a0;
                      afVar185 = _local_100;
                      bVar74 = local_a0->dims == 3;
                      local_c8 = 1;
                      if (!bVar74) {
                        local_c8 = local_a0->d;
                      }
                      local_d4 = local_a0->w;
                      local_d0 = local_a0->h;
                      local_138 = local_a0->cstep;
                      pvVar12 = local_a0->data;
                      local_110 = local_a0->elemsize;
                      local_e0 = local_a0->allocator;
                      _fStack_f8 = 0;
                      local_100 = (undefined1  [8])
                                  (local_138 * local_150 * local_110 + (long)pvVar12);
                      uStack_f0 = local_110;
                      fStack_e4 = afVar185[7];
                      fStack_e8 = (float)local_a0->elempack;
                      local_d8 = bVar74 ^ 3;
                      local_c0 = (long)local_d0 * (long)local_d4;
                      local_cc = 1;
                      Mat::~Mat((Mat *)local_100);
                      bVar74 = pMVar1[1].dims == 3;
                      local_c8 = 1;
                      if (!bVar74) {
                        local_c8 = pMVar1[1].d;
                      }
                      local_d4 = pMVar1[1].w;
                      local_d0 = pMVar1[1].h;
                      local_128 = pMVar1[1].cstep;
                      local_130 = pMVar1[1].data;
                      local_90 = pMVar1[1].elemsize;
                      local_e0 = pMVar1[1].allocator;
                      _fStack_f8 = 0;
                      local_100 = (undefined1  [8])
                                  (local_128 * local_150 * local_90 + (long)local_130);
                      uStack_f0 = local_90;
                      fStack_e8 = (float)pMVar1[1].elempack;
                      local_d8 = bVar74 ^ 3;
                      local_c0 = (long)local_d0 * (long)local_d4;
                      local_cc = 1;
                      Mat::~Mat((Mat *)local_100);
                      bVar74 = local_120->dims == 3;
                      local_d4 = local_120->w;
                      local_d0 = local_120->h;
                      local_c8 = 1;
                      if (!bVar74) {
                        local_c8 = local_120->d;
                      }
                      sVar71 = local_120->cstep;
                      pvVar56 = local_120->data;
                      sVar11 = local_120->elemsize;
                      local_e0 = local_120->allocator;
                      fStack_f8 = 0.0;
                      fStack_f4 = 0.0;
                      local_100 = (undefined1  [8])(sVar71 * local_150 * sVar11 + (long)pvVar56);
                      uStack_f0._0_4_ = (float)(int)sVar11;
                      uStack_f0._4_4_ = (float)(int)(sVar11 >> 0x20);
                      fStack_e8 = (float)local_120->elempack;
                      local_d8 = bVar74 ^ 3;
                      local_c0 = (long)local_d0 * (long)local_d4;
                      local_cc = 1;
                      Mat::~Mat((Mat *)local_100);
                      pvVar63 = local_130;
                      if (0 < local_104) {
                        lVar60 = local_128 * local_90;
                        lVar61 = local_138 * local_110;
                        lVar73 = 0;
                        iVar45 = local_104;
                        do {
                          _local_100 = (__m128)*(undefined1 (*) [16])
                                                ((long)pvVar12 + lVar73 + lVar61 * local_150);
                          pauVar50 = (undefined1 (*) [16])
                                     ((long)pvVar63 + lVar73 + lVar60 * local_150);
                          auVar200 = ZEXT856(*(ulong *)(*pauVar50 + 8));
                          local_80._0_16_ = *pauVar50;
                          afVar328 = binary_op_pow_pack4::operator()
                                               ((binary_op_pow_pack4 *)&local_139,
                                                (__m128 *)local_100,(__m128 *)local_80);
                          auVar197._0_8_ = afVar328._0_8_;
                          auVar197._8_56_ = auVar200;
                          *(undefined1 (*) [16])
                           ((long)pvVar56 + lVar73 + sVar71 * sVar11 * local_150) = auVar197._0_16_;
                          lVar73 = lVar73 + 0x10;
                          iVar45 = iVar45 + -1;
                        } while (iVar45 != 0);
                      }
                      local_150 = local_150 + 1;
                    } while (local_150 != local_98);
                    return 0;
                  }
                  return 0;
                }
              }
              return -100;
            }
            Mat::create(this_00,uVar64,uVar7,uVar8,local_60,iVar45,opt->blob_allocator);
            if (local_120->data == (void *)0x0) {
              return -100;
            }
            if ((long)local_120->c * local_120->cstep != 0) {
              if (0 < (int)local_98) {
                lVar60 = local_110 << 4;
                local_150 = 0;
                do {
                  if (0 < (int)local_138) {
                    sVar71 = local_a0[1].elemsize;
                    pvVar63 = (void *)(local_120->cstep * local_150 * local_120->elemsize +
                                      (long)local_120->data);
                    pvVar56 = (void *)(local_a0->cstep * local_150 * local_a0->elemsize +
                                      (long)local_a0->data);
                    sVar11 = local_a0[1].cstep;
                    pvVar12 = local_a0[1].data;
                    iVar45 = 0;
                    uVar47 = local_110;
                    do {
                      if (0 < (int)uVar47) {
                        lVar61 = 0;
                        do {
                          _local_100 = (__m128)*(undefined1 (*) [16])((long)pvVar56 + lVar61);
                          pauVar50 = (undefined1 (*) [16])
                                     ((long)pvVar12 + lVar61 + sVar71 * sVar11 * local_150);
                          auVar200 = ZEXT856(*(ulong *)(*pauVar50 + 8));
                          local_80._0_16_ = *pauVar50;
                          afVar328 = binary_op_pow_pack4::operator()
                                               ((binary_op_pow_pack4 *)&local_139,
                                                (__m128 *)local_100,(__m128 *)local_80);
                          auVar193._0_8_ = afVar328._0_8_;
                          auVar193._8_56_ = auVar200;
                          *(undefined1 (*) [16])((long)pvVar63 + lVar61) = auVar193._0_16_;
                          lVar61 = lVar61 + 0x10;
                        } while (lVar60 != lVar61);
                        pvVar63 = (void *)((long)pvVar63 + lVar61);
                        pvVar56 = (void *)((long)pvVar56 + lVar61);
                        uVar47 = local_110;
                      }
                      iVar45 = iVar45 + 1;
                    } while (iVar45 != (int)local_138);
                  }
                  local_150 = local_150 + 1;
                } while (local_150 != local_98);
                return 0;
              }
              return 0;
            }
            return -100;
          }
          Mat::create(this_00,uVar64,uVar7,uVar8,local_60,iVar45,opt->blob_allocator);
          afVar185 = _local_100;
          if (local_120->data == (void *)0x0) {
            return -100;
          }
          if ((long)local_120->c * local_120->cstep == 0) {
            return -100;
          }
          if (pMVar9[1].dims == 1) {
            if (uVar66 != 1 || pMVar9[1].w != 1) {
              if (0 < (int)uVar8) {
                local_150 = 0;
                do {
                  pvVar12 = local_a0->data;
                  sVar71 = local_a0->elemsize;
                  sVar11 = local_a0->cstep;
                  _local_100 = (__m128)*(undefined1 (*) [16])
                                        ((long)local_a0[1].data + local_150 * 0x10);
                  if (0 < local_104) {
                    sVar13 = local_120->cstep;
                    sVar14 = local_120->elemsize;
                    pvVar56 = local_120->data;
                    lVar60 = 0;
                    iVar45 = local_104;
                    do {
                      pauVar50 = (undefined1 (*) [16])
                                 ((long)pvVar12 + lVar60 + sVar11 * sVar71 * local_150);
                      uVar199 = *(undefined8 *)(*pauVar50 + 8);
                      local_80._0_16_ = *pauVar50;
                      afVar328 = binary_op_pow_pack4::operator()
                                           ((binary_op_pow_pack4 *)&local_139,(__m128 *)local_80,
                                            (__m128 *)local_100);
                      puVar68 = (undefined8 *)((long)pvVar56 + lVar60 + sVar13 * sVar14 * local_150)
                      ;
                      *puVar68 = afVar328._0_8_;
                      puVar68[1] = uVar199;
                      lVar60 = lVar60 + 0x10;
                      iVar45 = iVar45 + -1;
                    } while (iVar45 != 0);
                  }
                  local_150 = local_150 + 1;
                } while (local_150 != local_98);
                return 0;
              }
              return 0;
            }
            local_100._4_4_ = *pMVar1->data;
            local_100._0_4_ = local_100._4_4_;
            fStack_f8 = (float)local_100._4_4_;
            fStack_f4 = (float)local_100._4_4_;
            _uStack_f0 = afVar185._16_16_;
            if (0 < (int)uVar8) {
              local_150 = 0;
              do {
                if (0 < local_104) {
                  sVar71 = local_120->cstep;
                  sVar11 = local_120->elemsize;
                  pvVar12 = local_120->data;
                  sVar13 = local_a0->cstep;
                  sVar14 = local_a0->elemsize;
                  pvVar56 = local_a0->data;
                  lVar60 = 0;
                  iVar45 = local_104;
                  do {
                    pauVar50 = (undefined1 (*) [16])
                               ((long)pvVar56 + lVar60 + sVar13 * sVar14 * local_150);
                    auVar200 = ZEXT856(*(ulong *)(*pauVar50 + 8));
                    local_80._0_16_ = *pauVar50;
                    afVar328 = binary_op_pow_pack4::operator()
                                         ((binary_op_pow_pack4 *)&local_139,(__m128 *)local_80,
                                          (__m128 *)local_100);
                    auVar192._0_8_ = afVar328._0_8_;
                    auVar192._8_56_ = auVar200;
                    *(undefined1 (*) [16])((long)pvVar12 + lVar60 + sVar71 * sVar11 * local_150) =
                         auVar192._0_16_;
                    lVar60 = lVar60 + 0x10;
                    iVar45 = iVar45 + -1;
                  } while (iVar45 != 0);
                }
                local_150 = local_150 + 1;
              } while (local_150 != local_98);
            }
          }
          else if (pMVar9[1].dims == 2) {
            if (0 < (int)uVar8) {
              local_150 = 0;
              do {
                if (0 < (int)local_138) {
                  pauVar53 = (undefined1 (*) [16])
                             (local_120->cstep * local_150 * local_120->elemsize +
                             (long)local_120->data);
                  pauVar50 = (undefined1 (*) [16])
                             ((long)local_a0[1].w * local_150 * local_a0[1].elemsize +
                             (long)local_a0[1].data);
                  pauVar55 = (undefined1 (*) [16])
                             (local_a0->cstep * local_150 * local_a0->elemsize +
                             (long)local_a0->data);
                  iVar45 = 0;
                  do {
                    _local_100 = (__m128)*pauVar50;
                    uVar47 = local_110 & 0xffffffff;
                    if (0 < (int)local_110) {
                      do {
                        auVar200 = ZEXT856(*(ulong *)(*pauVar55 + 8));
                        local_80._0_16_ = *pauVar55;
                        afVar328 = binary_op_pow_pack4::operator()
                                             ((binary_op_pow_pack4 *)&local_139,(__m128 *)local_80,
                                              (__m128 *)local_100);
                        auVar189._0_8_ = afVar328._0_8_;
                        auVar189._8_56_ = auVar200;
                        *pauVar53 = auVar189._0_16_;
                        pauVar55 = pauVar55 + 1;
                        pauVar53 = pauVar53 + 1;
                        uVar66 = (int)uVar47 - 1;
                        uVar47 = (ulong)uVar66;
                      } while (uVar66 != 0);
                    }
                    pauVar50 = pauVar50 + 1;
                    iVar45 = iVar45 + 1;
                  } while (iVar45 != (int)local_138);
                }
                local_150 = local_150 + 1;
              } while (local_150 != local_98);
              return 0;
            }
            return 0;
          }
        }
      }
      return 0;
    case 7:
      uVar64 = pMVar9->w;
      uVar47 = (ulong)uVar64;
      sVar71 = pMVar9->elemsize;
      uVar65 = pMVar9[1].w;
      uVar5 = pMVar9[1].h;
      uVar6 = pMVar9[1].c;
      local_138 = (ulong)uVar6;
      iVar72 = uVar5 * uVar65;
      sVar11 = pMVar9[1].elemsize;
      iVar59 = pMVar9->dims;
      if (iVar59 == 1) {
        iVar59 = pMVar9[1].dims;
        if (iVar45 != 1 || uVar64 != 1) {
          if (iVar59 == 1) {
            Mat::create(this_00,uVar64,sVar71,iVar45,opt->blob_allocator);
            pvVar12 = this_00->data;
            if (pvVar12 == (void *)0x0) {
              return -100;
            }
            if ((long)this_00->c * this_00->cstep == 0) {
              return -100;
            }
            if (uVar66 != 1 || pMVar9[1].w != 1) {
              if (0 < (int)uVar64) {
                pvVar56 = pMVar9->data;
                pvVar63 = pMVar9[1].data;
                lVar60 = 0;
                do {
                  auVar106 = vsubps_avx(*(undefined1 (*) [16])((long)pvVar63 + lVar60),
                                        *(undefined1 (*) [16])((long)pvVar56 + lVar60));
                  *(undefined1 (*) [16])((long)pvVar12 + lVar60) = auVar106;
                  lVar60 = lVar60 + 0x10;
                  uVar66 = (int)uVar47 - 1;
                  uVar47 = (ulong)uVar66;
                } while (uVar66 != 0);
                return 0;
              }
              return 0;
            }
            if (0 < (int)uVar64) {
              uVar4 = *pMVar1->data;
              auVar98._4_4_ = uVar4;
              auVar98._0_4_ = uVar4;
              auVar98._8_4_ = uVar4;
              auVar98._12_4_ = uVar4;
              pvVar56 = pMVar9->data;
              lVar60 = 0;
              do {
                auVar106 = vsubps_avx(auVar98,*(undefined1 (*) [16])((long)pvVar56 + lVar60));
                *(undefined1 (*) [16])((long)pvVar12 + lVar60) = auVar106;
                lVar60 = lVar60 + 0x10;
                uVar66 = (int)uVar47 - 1;
                uVar47 = (ulong)uVar66;
              } while (uVar66 != 0);
              return 0;
            }
            return 0;
          }
          if (iVar59 == 2) {
            Mat::create(this_00,uVar65,uVar5,sVar11,uVar66,opt->blob_allocator);
            pauVar50 = (undefined1 (*) [16])this_00->data;
            if (pauVar50 == (undefined1 (*) [16])0x0) {
              return -100;
            }
            if ((long)this_00->c * this_00->cstep != 0) {
              if (0 < (int)uVar5) {
                pauVar55 = (undefined1 (*) [16])pMVar9->data;
                pauVar53 = (undefined1 (*) [16])pMVar9[1].data;
                uVar66 = 0;
                do {
                  if (0 < (int)uVar65) {
                    auVar106 = *pauVar55;
                    uVar64 = uVar65;
                    do {
                      auVar103 = vsubps_avx(*pauVar53,auVar106);
                      *pauVar50 = auVar103;
                      pauVar53 = pauVar53 + 1;
                      pauVar50 = pauVar50 + 1;
                      uVar64 = uVar64 - 1;
                    } while (uVar64 != 0);
                  }
                  pauVar55 = pauVar55 + 1;
                  uVar66 = uVar66 + 1;
                } while (uVar66 != uVar5);
                return 0;
              }
              return 0;
            }
            return -100;
          }
          if (iVar59 != 3) {
            return 0;
          }
          Mat::create(this_00,uVar65,uVar5,uVar6,sVar11,uVar66,opt->blob_allocator);
          if (this_00->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep == 0) {
            return -100;
          }
          if (0 < (int)local_138) {
            uVar47 = 0;
            do {
              if (0 < iVar72) {
                sVar71 = this_00->cstep;
                sVar11 = this_00->elemsize;
                auVar106 = *(undefined1 (*) [16])((long)pMVar9->data + uVar47 * 0x10);
                pvVar12 = this_00->data;
                sVar13 = pMVar9[1].cstep;
                sVar14 = pMVar9[1].elemsize;
                pvVar56 = pMVar9[1].data;
                lVar60 = 0;
                iVar45 = iVar72;
                do {
                  auVar103 = vsubps_avx(*(undefined1 (*) [16])
                                         ((long)pvVar56 + lVar60 + sVar13 * sVar14 * uVar47),
                                        auVar106);
                  *(undefined1 (*) [16])((long)pvVar12 + lVar60 + sVar71 * sVar11 * uVar47) =
                       auVar103;
                  lVar60 = lVar60 + 0x10;
                  iVar45 = iVar45 + -1;
                } while (iVar45 != 0);
              }
              uVar47 = uVar47 + 1;
            } while (uVar47 != local_138);
            return 0;
          }
          return 0;
        }
        if (iVar59 == 1) {
          Mat::create(this_00,uVar65,sVar11,uVar66,opt->blob_allocator);
          pvVar12 = this_00->data;
          if (pvVar12 == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep != 0) {
            if (0 < (int)uVar65) {
              uVar4 = *pMVar9->data;
              auVar97._4_4_ = uVar4;
              auVar97._0_4_ = uVar4;
              auVar97._8_4_ = uVar4;
              auVar97._12_4_ = uVar4;
              pvVar56 = pMVar1->data;
              lVar60 = 0;
              do {
                auVar106 = vsubps_avx(*(undefined1 (*) [16])((long)pvVar56 + lVar60),auVar97);
                *(undefined1 (*) [16])((long)pvVar12 + lVar60) = auVar106;
                lVar60 = lVar60 + 0x10;
                uVar65 = uVar65 - 1;
              } while (uVar65 != 0);
              return 0;
            }
            return 0;
          }
          return -100;
        }
        if (iVar59 == 2) {
          Mat::create(this_00,uVar65,uVar5,sVar11,uVar66,opt->blob_allocator);
          pvVar12 = this_00->data;
          if (pvVar12 == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep != 0) {
            if (0 < iVar72) {
              uVar4 = *pMVar9->data;
              auVar94._4_4_ = uVar4;
              auVar94._0_4_ = uVar4;
              auVar94._8_4_ = uVar4;
              auVar94._12_4_ = uVar4;
              pvVar56 = pMVar1->data;
              lVar60 = 0;
              do {
                auVar106 = vsubps_avx(*(undefined1 (*) [16])((long)pvVar56 + lVar60),auVar94);
                *(undefined1 (*) [16])((long)pvVar12 + lVar60) = auVar106;
                lVar60 = lVar60 + 0x10;
                iVar72 = iVar72 + -1;
              } while (iVar72 != 0);
              return 0;
            }
            return 0;
          }
          return -100;
        }
        if (iVar59 != 3) {
          return 0;
        }
        Mat::create(this_00,uVar65,uVar5,uVar6,sVar11,uVar66,opt->blob_allocator);
        if (this_00->data == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep == 0) {
          return -100;
        }
        if (0 < (int)local_138) {
          uVar4 = *pMVar9->data;
          auVar78._4_4_ = uVar4;
          auVar78._0_4_ = uVar4;
          auVar78._8_4_ = uVar4;
          auVar78._12_4_ = uVar4;
          uVar47 = 0;
          do {
            if (0 < iVar72) {
              sVar71 = this_00->cstep;
              sVar11 = this_00->elemsize;
              pvVar12 = this_00->data;
              sVar13 = pMVar9[1].cstep;
              sVar14 = pMVar9[1].elemsize;
              pvVar56 = pMVar9[1].data;
              lVar60 = 0;
              iVar45 = iVar72;
              do {
                auVar106 = vsubps_avx(*(undefined1 (*) [16])
                                       ((long)pvVar56 + lVar60 + sVar13 * sVar14 * uVar47),auVar78);
                *(undefined1 (*) [16])((long)pvVar12 + lVar60 + sVar71 * sVar11 * uVar47) = auVar106
                ;
                lVar60 = lVar60 + 0x10;
                iVar45 = iVar45 + -1;
              } while (iVar45 != 0);
            }
            uVar47 = uVar47 + 1;
          } while (uVar47 != local_138);
          return 0;
        }
        return 0;
      }
      uVar7 = pMVar9->h;
      local_130 = (void *)CONCAT44(local_130._4_4_,uVar7 * uVar64);
      if (iVar59 == 2) {
        if (pMVar9[1].dims == 3) {
          Mat::create(this_00,uVar65,uVar5,uVar6,sVar11,uVar66,opt->blob_allocator);
          if (this_00->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep != 0) {
            if (0 < (int)local_138) {
              uVar47 = 0;
              do {
                if (0 < (int)uVar5) {
                  pauVar50 = (undefined1 (*) [16])
                             (this_00->cstep * uVar47 * this_00->elemsize + (long)this_00->data);
                  pauVar55 = (undefined1 (*) [16])
                             (pMVar9[1].cstep * uVar47 * pMVar9[1].elemsize + (long)pMVar9[1].data);
                  pauVar53 = (undefined1 (*) [16])
                             ((long)pMVar9->w * uVar47 * pMVar9->elemsize + (long)pMVar9->data);
                  uVar66 = 0;
                  do {
                    if (0 < (int)uVar65) {
                      auVar106 = *pauVar53;
                      uVar64 = uVar65;
                      do {
                        auVar103 = vsubps_avx(*pauVar55,auVar106);
                        *pauVar50 = auVar103;
                        pauVar55 = pauVar55 + 1;
                        pauVar50 = pauVar50 + 1;
                        uVar64 = uVar64 - 1;
                      } while (uVar64 != 0);
                    }
                    pauVar53 = pauVar53 + 1;
                    uVar66 = uVar66 + 1;
                  } while (uVar66 != uVar5);
                }
                uVar47 = uVar47 + 1;
              } while (uVar47 != local_138);
              return 0;
            }
            return 0;
          }
          return -100;
        }
        local_128 = CONCAT44(uVar4,uVar66);
        Mat::create(this_00,uVar64,uVar7,sVar71,iVar45,opt->blob_allocator);
        pvVar12 = this_00->data;
        if (pvVar12 == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep == 0) {
          return -100;
        }
        if (pMVar9[1].dims != 1) {
          if (pMVar9[1].dims != 2) {
            return 0;
          }
          if (0 < (int)local_130) {
            pvVar56 = pMVar9->data;
            pvVar63 = pMVar9[1].data;
            lVar60 = 0;
            do {
              auVar106 = vsubps_avx(*(undefined1 (*) [16])((long)pvVar63 + lVar60),
                                    *(undefined1 (*) [16])((long)pvVar56 + lVar60));
              *(undefined1 (*) [16])((long)pvVar12 + lVar60) = auVar106;
              lVar60 = lVar60 + 0x10;
              local_130._0_4_ = (int)local_130 + -1;
            } while ((int)local_130 != 0);
            return 0;
          }
          return 0;
        }
        Mat::create(this_00,uVar64,uVar7,sVar71,iVar45,opt->blob_allocator);
        pauVar50 = (undefined1 (*) [16])this_00->data;
        if (pauVar50 == (undefined1 (*) [16])0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep != 0) {
          if ((int)local_128 != 1 || pMVar9[1].w != 1) {
            if (0 < (int)uVar7) {
              pauVar55 = (undefined1 (*) [16])pMVar9->data;
              pauVar53 = (undefined1 (*) [16])pMVar9[1].data;
              uVar66 = 0;
              do {
                if (0 < (int)uVar64) {
                  auVar106 = *pauVar53;
                  uVar46 = uVar47;
                  do {
                    auVar103 = vsubps_avx(auVar106,*pauVar55);
                    *pauVar50 = auVar103;
                    pauVar55 = pauVar55 + 1;
                    pauVar50 = pauVar50 + 1;
                    uVar65 = (int)uVar46 - 1;
                    uVar46 = (ulong)uVar65;
                  } while (uVar65 != 0);
                }
                pauVar53 = pauVar53 + 1;
                uVar66 = uVar66 + 1;
              } while (uVar66 != uVar7);
              return 0;
            }
            return 0;
          }
          if (0 < (int)local_130) {
            uVar4 = *pMVar1->data;
            auVar109._4_4_ = uVar4;
            auVar109._0_4_ = uVar4;
            auVar109._8_4_ = uVar4;
            auVar109._12_4_ = uVar4;
            pvVar12 = pMVar9->data;
            lVar60 = 0;
            do {
              auVar106 = vsubps_avx(auVar109,*(undefined1 (*) [16])((long)pvVar12 + lVar60));
              *(undefined1 (*) [16])((long)*pauVar50 + lVar60) = auVar106;
              lVar60 = lVar60 + 0x10;
              local_130._0_4_ = (int)local_130 + -1;
            } while ((int)local_130 != 0);
            return 0;
          }
          return 0;
        }
        return -100;
      }
      if (iVar59 != 3) {
        return 0;
      }
      uVar8 = pMVar9->c;
      uVar46 = (ulong)uVar8;
      local_110 = sVar71;
      if (pMVar9[1].dims != 3) {
        Mat::create(this_00,uVar64,uVar7,uVar8,sVar71,iVar45,opt->blob_allocator);
        if (this_00->data == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep == 0) {
          return -100;
        }
        if (pMVar9[1].dims == 1) {
          if (uVar66 != 1 || pMVar9[1].w != 1) {
            if (0 < (int)uVar8) {
              uVar47 = 0;
              do {
                if (0 < (int)local_130) {
                  sVar71 = this_00->cstep;
                  sVar11 = this_00->elemsize;
                  auVar106 = *(undefined1 (*) [16])((long)pMVar1->data + uVar47 * 0x10);
                  pvVar12 = this_00->data;
                  sVar13 = pMVar9->cstep;
                  sVar14 = pMVar9->elemsize;
                  pvVar56 = pMVar9->data;
                  lVar60 = 0;
                  iVar45 = (int)local_130;
                  do {
                    auVar103 = vsubps_avx(auVar106,*(undefined1 (*) [16])
                                                    ((long)pvVar56 +
                                                    lVar60 + sVar13 * sVar14 * uVar47));
                    *(undefined1 (*) [16])((long)pvVar12 + lVar60 + sVar71 * sVar11 * uVar47) =
                         auVar103;
                    lVar60 = lVar60 + 0x10;
                    iVar45 = iVar45 + -1;
                  } while (iVar45 != 0);
                }
                uVar47 = uVar47 + 1;
              } while (uVar47 != uVar46);
              return 0;
            }
            return 0;
          }
          if (0 < (int)uVar8) {
            uVar4 = *pMVar1->data;
            auVar111._4_4_ = uVar4;
            auVar111._0_4_ = uVar4;
            auVar111._8_4_ = uVar4;
            auVar111._12_4_ = uVar4;
            uVar47 = 0;
            do {
              if (0 < (int)local_130) {
                sVar71 = this_00->cstep;
                sVar11 = this_00->elemsize;
                pvVar12 = this_00->data;
                sVar13 = pMVar9->cstep;
                sVar14 = pMVar9->elemsize;
                pvVar56 = pMVar9->data;
                lVar60 = 0;
                iVar45 = (int)local_130;
                do {
                  auVar106 = vsubps_avx(auVar111,*(undefined1 (*) [16])
                                                  ((long)pvVar56 + lVar60 + sVar13 * sVar14 * uVar47
                                                  ));
                  *(undefined1 (*) [16])((long)pvVar12 + lVar60 + sVar71 * sVar11 * uVar47) =
                       auVar106;
                  lVar60 = lVar60 + 0x10;
                  iVar45 = iVar45 + -1;
                } while (iVar45 != 0);
              }
              uVar47 = uVar47 + 1;
            } while (uVar47 != uVar46);
            return 0;
          }
          return 0;
        }
        if (pMVar9[1].dims != 2) {
          return 0;
        }
        if (0 < (int)uVar8) {
          uVar48 = 0;
          do {
            if (0 < (int)uVar7) {
              pauVar50 = (undefined1 (*) [16])
                         (this_00->cstep * uVar48 * this_00->elemsize + (long)this_00->data);
              pauVar55 = (undefined1 (*) [16])
                         ((long)pMVar9[1].w * uVar48 * pMVar9[1].elemsize + (long)pMVar9[1].data);
              pauVar53 = (undefined1 (*) [16])
                         (pMVar9->cstep * uVar48 * pMVar9->elemsize + (long)pMVar9->data);
              uVar66 = 0;
              do {
                if (0 < (int)uVar64) {
                  auVar106 = *pauVar55;
                  uVar62 = uVar47;
                  do {
                    auVar103 = vsubps_avx(auVar106,*pauVar53);
                    *pauVar50 = auVar103;
                    pauVar53 = pauVar53 + 1;
                    pauVar50 = pauVar50 + 1;
                    uVar65 = (int)uVar62 - 1;
                    uVar62 = (ulong)uVar65;
                  } while (uVar65 != 0);
                }
                pauVar55 = pauVar55 + 1;
                uVar66 = uVar66 + 1;
              } while (uVar66 != uVar7);
            }
            uVar48 = uVar48 + 1;
          } while (uVar48 != uVar46);
          return 0;
        }
        return 0;
      }
      if (uVar8 == uVar6 && ((uVar65 ^ 1) == 0 && (uVar5 ^ 1) == 0)) {
        Mat::create(this_00,uVar64,uVar7,uVar8,sVar71,iVar45,opt->blob_allocator);
        if (this_00->data == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep != 0) {
          if (0 < (int)uVar8) {
            uVar47 = 0;
            do {
              if (0 < (int)local_130) {
                sVar71 = pMVar9->cstep;
                sVar11 = pMVar9->elemsize;
                auVar106 = *(undefined1 (*) [16])
                            ((long)pMVar9[1].data + pMVar9[1].cstep * uVar47 * pMVar9[1].elemsize);
                pvVar12 = pMVar9->data;
                sVar13 = this_00->cstep;
                sVar14 = this_00->elemsize;
                pvVar56 = this_00->data;
                lVar60 = 0;
                iVar45 = (int)local_130;
                do {
                  auVar103 = vsubps_avx(auVar106,*(undefined1 (*) [16])
                                                  ((long)pvVar12 + lVar60 + sVar71 * sVar11 * uVar47
                                                  ));
                  *(undefined1 (*) [16])((long)pvVar56 + lVar60 + sVar13 * sVar14 * uVar47) =
                       auVar103;
                  lVar60 = lVar60 + 0x10;
                  iVar45 = iVar45 + -1;
                } while (iVar45 != 0);
              }
              uVar47 = uVar47 + 1;
            } while (uVar47 != uVar46);
            return 0;
          }
          return 0;
        }
        return -100;
      }
      if (uVar65 == uVar64) {
        if (uVar66 == 1 && (uVar6 == 1 && uVar5 == uVar7)) {
          Mat::create(this_00,uVar64,uVar7,uVar8,sVar71,iVar45,opt->blob_allocator);
          if (this_00->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep != 0) {
            if (0 < (int)uVar8) {
              uVar47 = 0;
              do {
                if (0 < (int)local_130) {
                  sVar71 = pMVar9->cstep;
                  sVar11 = pMVar9->elemsize;
                  sVar13 = this_00->cstep;
                  pvVar12 = pMVar9->data;
                  pvVar56 = pMVar9[1].data;
                  sVar14 = this_00->elemsize;
                  pvVar63 = this_00->data;
                  lVar60 = 0;
                  iVar45 = (int)local_130;
                  do {
                    uVar4 = *(undefined4 *)((long)pvVar56 + lVar60);
                    auVar86._4_4_ = uVar4;
                    auVar86._0_4_ = uVar4;
                    auVar86._8_4_ = uVar4;
                    auVar86._12_4_ = uVar4;
                    auVar106 = vsubps_avx(auVar86,*(undefined1 (*) [16])
                                                   ((long)pvVar12 +
                                                   lVar60 * 4 + sVar71 * sVar11 * uVar47));
                    *(undefined1 (*) [16])((long)pvVar63 + lVar60 * 4 + sVar13 * sVar14 * uVar47) =
                         auVar106;
                    lVar60 = lVar60 + 4;
                    iVar45 = iVar45 + -1;
                  } while (iVar45 != 0);
                }
                uVar47 = uVar47 + 1;
              } while (uVar47 != uVar46);
              return 0;
            }
            return 0;
          }
          return -100;
        }
        local_104 = CONCAT31(local_104._1_3_,uVar7 == 1);
        if ((uVar64 != 1 || uVar7 != 1) || uVar6 != uVar8) {
          if (((iVar45 == 1) && (uVar5 == uVar7)) && (uVar8 == 1)) {
            local_128 = uVar46;
            Mat::create(this_00,uVar64,uVar7,uVar6,sVar11,uVar66,opt->blob_allocator);
            if (this_00->data == (void *)0x0) {
              return -100;
            }
            if ((long)this_00->c * this_00->cstep != 0) {
              if (0 < (int)local_138) {
                uVar47 = 0;
                do {
                  if (0 < iVar72) {
                    sVar71 = pMVar9[1].cstep;
                    sVar11 = pMVar9[1].elemsize;
                    sVar13 = this_00->cstep;
                    pvVar12 = pMVar9[1].data;
                    pvVar56 = pMVar9->data;
                    sVar14 = this_00->elemsize;
                    pvVar63 = this_00->data;
                    lVar60 = 0;
                    iVar45 = iVar72;
                    do {
                      uVar4 = *(undefined4 *)((long)pvVar56 + lVar60);
                      auVar124._4_4_ = uVar4;
                      auVar124._0_4_ = uVar4;
                      auVar124._8_4_ = uVar4;
                      auVar124._12_4_ = uVar4;
                      auVar106 = vsubps_avx(*(undefined1 (*) [16])
                                             ((long)pvVar12 + lVar60 * 4 + sVar71 * sVar11 * uVar47)
                                            ,auVar124);
                      *(undefined1 (*) [16])((long)pvVar63 + lVar60 * 4 + sVar13 * sVar14 * uVar47)
                           = auVar106;
                      lVar60 = lVar60 + 4;
                      iVar45 = iVar45 + -1;
                    } while (iVar45 != 0);
                  }
                  uVar47 = uVar47 + 1;
                } while (uVar47 != local_138);
                return 0;
              }
              return 0;
            }
            return -100;
          }
LAB_00248806:
          if ((((uVar65 ^ 1) == 0 && uVar5 == uVar7) && uVar8 == uVar6) && uVar64 != 1) {
            local_128 = uVar46;
            Mat::create(this_00,uVar64,uVar7,uVar8,sVar71,iVar45,opt->blob_allocator);
            if (this_00->data == (void *)0x0) {
              return -100;
            }
            if ((long)this_00->c * this_00->cstep != 0) {
              if (0 < (int)uVar8) {
                uVar48 = 0;
                do {
                  if (0 < (int)uVar7) {
                    sVar71 = pMVar9[1].cstep;
                    sVar11 = pMVar9[1].elemsize;
                    pvVar12 = pMVar9[1].data;
                    pauVar50 = (undefined1 (*) [16])
                               (this_00->cstep * uVar48 * this_00->elemsize + (long)this_00->data);
                    pauVar55 = (undefined1 (*) [16])
                               (pMVar9->cstep * uVar48 * pMVar9->elemsize + (long)pMVar9->data);
                    uVar62 = 0;
                    do {
                      if (0 < (int)uVar64) {
                        auVar106 = *(undefined1 (*) [16])
                                    ((long)pvVar12 + uVar62 * 0x10 + sVar71 * uVar48 * sVar11);
                        uVar67 = uVar47;
                        do {
                          auVar103 = vsubps_avx(auVar106,*pauVar55);
                          *pauVar50 = auVar103;
                          pauVar55 = pauVar55 + 1;
                          pauVar50 = pauVar50 + 1;
                          uVar66 = (int)uVar67 - 1;
                          uVar67 = (ulong)uVar66;
                        } while (uVar66 != 0);
                      }
                      uVar62 = uVar62 + 1;
                    } while (uVar62 != uVar7);
                  }
                  uVar48 = uVar48 + 1;
                } while (uVar48 != uVar46);
                return 0;
              }
              return 0;
            }
            return -100;
          }
          if (((uVar65 == uVar64 && (uVar5 ^ 1) == 0) && uVar8 == uVar6) && uVar7 != 1) {
            local_128 = uVar46;
            Mat::create(this_00,uVar64,uVar7,uVar8,sVar71,iVar45,opt->blob_allocator);
            if (this_00->data == (void *)0x0) {
              return -100;
            }
            if ((long)this_00->c * this_00->cstep != 0) {
              if (0 < (int)uVar8) {
                uVar48 = 0;
                do {
                  if (0 < (int)uVar7) {
                    sVar71 = pMVar9[1].elemsize;
                    pvVar56 = (void *)(this_00->cstep * uVar48 * this_00->elemsize +
                                      (long)this_00->data);
                    pvVar63 = (void *)(pMVar9->cstep * uVar48 * pMVar9->elemsize +
                                      (long)pMVar9->data);
                    sVar11 = pMVar9[1].cstep;
                    pvVar12 = pMVar9[1].data;
                    uVar66 = 0;
                    do {
                      if (0 < (int)uVar64) {
                        lVar60 = 0;
                        do {
                          auVar106 = vsubps_avx(*(undefined1 (*) [16])
                                                 ((long)pvVar12 + lVar60 + sVar71 * sVar11 * uVar48)
                                                ,*(undefined1 (*) [16])((long)pvVar63 + lVar60));
                          *(undefined1 (*) [16])((long)pvVar56 + lVar60) = auVar106;
                          lVar60 = lVar60 + 0x10;
                        } while (uVar47 << 4 != lVar60);
                        pvVar56 = (void *)((long)pvVar56 + lVar60);
                        pvVar63 = (void *)((long)pvVar63 + lVar60);
                      }
                      uVar66 = uVar66 + 1;
                    } while (uVar66 != uVar7);
                  }
                  uVar48 = uVar48 + 1;
                } while (uVar48 != uVar46);
                return 0;
              }
              return 0;
            }
            return -100;
          }
          if ((uVar6 == uVar8 && uVar5 == uVar7) && (uVar65 != 1 && uVar64 == 1)) {
            local_128 = uVar46;
            Mat::create(this_00,uVar65,uVar7,uVar8,sVar11,uVar66,opt->blob_allocator);
            if (this_00->data == (void *)0x0) {
              return -100;
            }
            if ((long)this_00->c * this_00->cstep != 0) {
              if (0 < (int)uVar8) {
                uVar47 = 0;
                do {
                  if (0 < (int)uVar7) {
                    sVar71 = pMVar9->cstep;
                    sVar11 = pMVar9->elemsize;
                    pvVar12 = pMVar9->data;
                    pauVar50 = (undefined1 (*) [16])
                               (this_00->cstep * uVar47 * this_00->elemsize + (long)this_00->data);
                    pauVar55 = (undefined1 (*) [16])
                               (pMVar9[1].cstep * uVar47 * pMVar9[1].elemsize + (long)pMVar9[1].data
                               );
                    uVar48 = 0;
                    do {
                      if (0 < (int)uVar65) {
                        auVar106 = *(undefined1 (*) [16])
                                    ((long)pvVar12 + uVar48 * 0x10 + sVar71 * uVar47 * sVar11);
                        uVar66 = uVar65;
                        do {
                          auVar103 = vsubps_avx(*pauVar55,auVar106);
                          *pauVar50 = auVar103;
                          pauVar55 = pauVar55 + 1;
                          pauVar50 = pauVar50 + 1;
                          uVar66 = uVar66 - 1;
                        } while (uVar66 != 0);
                      }
                      uVar48 = uVar48 + 1;
                    } while (uVar48 != uVar7);
                  }
                  uVar47 = uVar47 + 1;
                } while (uVar47 != uVar46);
                return 0;
              }
              return 0;
            }
            return -100;
          }
          if (((byte)local_104 & uVar6 == uVar8 & (uVar5 != 1 && uVar65 == uVar64)) == 1) {
            local_128 = uVar46;
            Mat::create(this_00,uVar64,uVar5,uVar8,sVar11,uVar66,opt->blob_allocator);
            if (this_00->data == (void *)0x0) {
              return -100;
            }
            if ((long)local_120->c * local_120->cstep != 0) {
              if (0 < (int)local_128) {
                local_158 = (__m256 *)0x0;
                do {
                  pMVar1 = local_a0;
                  afVar185 = _local_100;
                  bVar74 = local_a0->dims == 3;
                  local_c8 = 1;
                  if (!bVar74) {
                    local_c8 = local_a0->d;
                  }
                  local_d4 = local_a0->w;
                  local_d0 = local_a0->h;
                  sVar71 = local_a0->cstep;
                  pvVar12 = local_a0->data;
                  local_130 = (void *)local_a0->elemsize;
                  local_e0 = local_a0->allocator;
                  _fStack_f8 = 0;
                  local_100 = (undefined1  [8])
                              (sVar71 * (long)local_158 * (long)local_130 + (long)pvVar12);
                  uStack_f0 = local_130;
                  fStack_e4 = afVar185[7];
                  fStack_e8 = (float)local_a0->elempack;
                  local_d8 = bVar74 ^ 3;
                  local_c0 = (long)local_d0 * (long)local_d4;
                  local_cc = 1;
                  Mat::~Mat((Mat *)local_100);
                  bVar74 = pMVar1[1].dims == 3;
                  local_c8 = 1;
                  if (!bVar74) {
                    local_c8 = pMVar1[1].d;
                  }
                  local_d4 = pMVar1[1].w;
                  local_d0 = pMVar1[1].h;
                  pvVar56 = (void *)(pMVar1[1].cstep * (long)local_158 * pMVar1[1].elemsize +
                                    (long)pMVar1[1].data);
                  local_d8 = bVar74 ^ 3;
                  local_e0 = pMVar1[1].allocator;
                  _fStack_f8 = 0;
                  local_100 = (undefined1  [8])pvVar56;
                  uStack_f0 = pMVar1[1].elemsize;
                  fStack_e8 = (float)pMVar1[1].elempack;
                  local_c0 = (long)local_d0 * (long)local_d4;
                  local_cc = 1;
                  Mat::~Mat((Mat *)local_100);
                  bVar74 = local_120->dims == 3;
                  local_d4 = local_120->w;
                  local_d0 = local_120->h;
                  local_c8 = 1;
                  if (!bVar74) {
                    local_c8 = local_120->d;
                  }
                  sVar11 = local_120->elemsize;
                  pvVar63 = (void *)(local_120->cstep * (long)local_158 * sVar11 +
                                    (long)local_120->data);
                  local_d8 = bVar74 ^ 3;
                  local_e0 = local_120->allocator;
                  fStack_f8 = 0.0;
                  fStack_f4 = 0.0;
                  local_100 = (undefined1  [8])pvVar63;
                  uStack_f0._0_4_ = (float)(int)sVar11;
                  uStack_f0._4_4_ = (float)(int)(sVar11 >> 0x20);
                  fStack_e8 = (float)local_120->elempack;
                  local_c0 = (long)local_d0 * (long)local_d4;
                  local_cc = 1;
                  Mat::~Mat((Mat *)local_100);
                  if (0 < (int)uVar5) {
                    uVar66 = 0;
                    do {
                      if (0 < (int)uVar64) {
                        lVar60 = 0;
                        do {
                          auVar106 = vsubps_avx(*(undefined1 (*) [16])((long)pvVar56 + lVar60),
                                                *(undefined1 (*) [16])
                                                 ((long)pvVar12 +
                                                 lVar60 + sVar71 * (long)local_130 * (long)local_158
                                                 ));
                          *(undefined1 (*) [16])((long)pvVar63 + lVar60) = auVar106;
                          lVar60 = lVar60 + 0x10;
                        } while (uVar47 << 4 != lVar60);
                        pvVar63 = (void *)((long)pvVar63 + lVar60);
                        pvVar56 = (void *)((long)pvVar56 + lVar60);
                      }
                      uVar66 = uVar66 + 1;
                    } while (uVar66 != uVar5);
                  }
                  local_158 = (__m256 *)((long)local_158 + 1);
                } while (local_158 != (__m256 *)local_128);
                return 0;
              }
              return 0;
            }
            return -100;
          }
          local_128 = uVar46;
          Mat::create(this_00,uVar64,uVar7,uVar8,sVar71,iVar45,opt->blob_allocator);
          if (this_00->data == (void *)0x0) {
            return -100;
          }
          if ((long)local_120->c * local_120->cstep != 0) {
            if (0 < (int)local_128) {
              local_158 = (__m256 *)0x0;
              do {
                pMVar1 = local_a0;
                afVar185 = _local_100;
                bVar74 = local_a0->dims == 3;
                local_c8 = 1;
                if (!bVar74) {
                  local_c8 = local_a0->d;
                }
                local_d4 = local_a0->w;
                local_d0 = local_a0->h;
                sVar71 = local_a0->cstep;
                pvVar12 = local_a0->data;
                sVar11 = local_a0->elemsize;
                local_e0 = local_a0->allocator;
                _fStack_f8 = 0;
                local_100 = (undefined1  [8])(sVar71 * (long)local_158 * sVar11 + (long)pvVar12);
                uStack_f0 = sVar11;
                fStack_e4 = afVar185[7];
                fStack_e8 = (float)local_a0->elempack;
                local_d8 = bVar74 ^ 3;
                local_c0 = (long)local_d0 * (long)local_d4;
                local_cc = 1;
                Mat::~Mat((Mat *)local_100);
                bVar74 = pMVar1[1].dims == 3;
                local_c8 = 1;
                if (!bVar74) {
                  local_c8 = pMVar1[1].d;
                }
                local_d4 = pMVar1[1].w;
                local_d0 = pMVar1[1].h;
                local_138 = pMVar1[1].cstep;
                pvVar56 = pMVar1[1].data;
                local_110 = pMVar1[1].elemsize;
                local_e0 = pMVar1[1].allocator;
                _fStack_f8 = 0;
                local_100 = (undefined1  [8])
                            (local_138 * (long)local_158 * local_110 + (long)pvVar56);
                uStack_f0 = local_110;
                fStack_e8 = (float)pMVar1[1].elempack;
                local_d8 = bVar74 ^ 3;
                local_c0 = (long)local_d0 * (long)local_d4;
                local_cc = 1;
                Mat::~Mat((Mat *)local_100);
                bVar74 = local_120->dims == 3;
                local_d4 = local_120->w;
                local_d0 = local_120->h;
                local_c8 = 1;
                if (!bVar74) {
                  local_c8 = local_120->d;
                }
                sVar13 = local_120->cstep;
                pvVar63 = local_120->data;
                sVar14 = local_120->elemsize;
                local_e0 = local_120->allocator;
                fStack_f8 = 0.0;
                fStack_f4 = 0.0;
                local_100 = (undefined1  [8])(sVar13 * (long)local_158 * sVar14 + (long)pvVar63);
                uStack_f0._0_4_ = (float)(int)sVar14;
                uStack_f0._4_4_ = (float)(int)(sVar14 >> 0x20);
                fStack_e8 = (float)local_120->elempack;
                local_d8 = bVar74 ^ 3;
                local_c0 = (long)local_d0 * (long)local_d4;
                local_cc = 1;
                Mat::~Mat((Mat *)local_100);
                if (0 < (int)local_130) {
                  lVar60 = 0;
                  iVar45 = (int)local_130;
                  do {
                    auVar106 = vsubps_avx(*(undefined1 (*) [16])
                                           ((long)pvVar56 +
                                           lVar60 + local_138 * local_110 * (long)local_158),
                                          *(undefined1 (*) [16])
                                           ((long)pvVar12 +
                                           lVar60 + sVar71 * sVar11 * (long)local_158));
                    *(undefined1 (*) [16])
                     ((long)pvVar63 + lVar60 + sVar13 * sVar14 * (long)local_158) = auVar106;
                    lVar60 = lVar60 + 0x10;
                    iVar45 = iVar45 + -1;
                  } while (iVar45 != 0);
                }
                local_158 = (__m256 *)((long)local_158 + 1);
              } while (local_158 != (__m256 *)local_128);
              return 0;
            }
            return 0;
          }
          return -100;
        }
      }
      else {
        local_104 = CONCAT31(local_104._1_3_,uVar7 == 1);
        local_128 = uVar46;
        if ((uVar64 != 1 || uVar7 != 1) || uVar6 != uVar8) goto LAB_00248806;
      }
      Mat::create(this_00,uVar65,uVar5,uVar6,sVar11,uVar66,opt->blob_allocator);
      if (this_00->data == (void *)0x0) {
        return -100;
      }
      if ((long)this_00->c * this_00->cstep != 0) {
        if (0 < (int)local_138) {
          uVar47 = 0;
          do {
            if (0 < iVar72) {
              sVar71 = this_00->cstep;
              sVar11 = this_00->elemsize;
              auVar106 = *(undefined1 (*) [16])
                          ((long)pMVar9->data + pMVar9->cstep * uVar47 * pMVar9->elemsize);
              pvVar12 = this_00->data;
              sVar13 = pMVar9[1].cstep;
              sVar14 = pMVar9[1].elemsize;
              pvVar56 = pMVar9[1].data;
              lVar60 = 0;
              iVar45 = iVar72;
              do {
                auVar103 = vsubps_avx(*(undefined1 (*) [16])
                                       ((long)pvVar56 + lVar60 + sVar13 * sVar14 * uVar47),auVar106)
                ;
                *(undefined1 (*) [16])((long)pvVar12 + lVar60 + sVar71 * sVar11 * uVar47) = auVar103
                ;
                lVar60 = lVar60 + 0x10;
                iVar45 = iVar45 + -1;
              } while (iVar45 != 0);
            }
            uVar47 = uVar47 + 1;
          } while (uVar47 != local_138);
          return 0;
        }
        return 0;
      }
      return -100;
    case 8:
      uVar64 = pMVar9->w;
      uVar47 = (ulong)uVar64;
      sVar71 = pMVar9->elemsize;
      uVar65 = pMVar9[1].w;
      uVar5 = pMVar9[1].h;
      uVar6 = pMVar9[1].c;
      local_138 = (ulong)uVar6;
      iVar72 = uVar5 * uVar65;
      sVar11 = pMVar9[1].elemsize;
      iVar59 = pMVar9->dims;
      if (iVar59 == 1) {
        iVar59 = pMVar9[1].dims;
        if (iVar45 != 1 || uVar64 != 1) {
          if (iVar59 == 1) {
            Mat::create(this_00,uVar64,sVar71,iVar45,opt->blob_allocator);
            pvVar12 = this_00->data;
            if (pvVar12 == (void *)0x0) {
              return -100;
            }
            if ((long)this_00->c * this_00->cstep == 0) {
              return -100;
            }
            if (uVar66 != 1 || pMVar9[1].w != 1) {
              if (0 < (int)uVar64) {
                pvVar56 = pMVar9->data;
                pvVar63 = pMVar9[1].data;
                lVar60 = 0;
                do {
                  auVar106 = *(undefined1 (*) [16])((long)pvVar56 + lVar60);
                  auVar83 = vrcpps_avx(auVar106);
                  auVar103 = *(undefined1 (*) [16])((long)pvVar63 + lVar60);
                  auVar292._0_4_ = auVar103._0_4_ * auVar83._0_4_;
                  auVar292._4_4_ = auVar103._4_4_ * auVar83._4_4_;
                  auVar292._8_4_ = auVar103._8_4_ * auVar83._8_4_;
                  auVar292._12_4_ = auVar103._12_4_ * auVar83._12_4_;
                  auVar106 = vfmsub213ps_fma(auVar106,auVar292,auVar103);
                  auVar106 = vfnmadd213ps_fma(auVar106,auVar83,auVar292);
                  *(undefined1 (*) [16])((long)pvVar12 + lVar60) = auVar106;
                  lVar60 = lVar60 + 0x10;
                  uVar66 = (int)uVar47 - 1;
                  uVar47 = (ulong)uVar66;
                } while (uVar66 != 0);
                return 0;
              }
              return 0;
            }
            if (0 < (int)uVar64) {
              fVar203 = *pMVar1->data;
              auVar106._4_4_ = fVar203;
              auVar106._0_4_ = fVar203;
              auVar106._8_4_ = fVar203;
              auVar106._12_4_ = fVar203;
              pvVar56 = pMVar9->data;
              lVar60 = 0;
              do {
                auVar103 = *(undefined1 (*) [16])((long)pvVar56 + lVar60);
                auVar83 = vrcpps_avx(auVar103);
                auVar282._0_4_ = fVar203 * auVar83._0_4_;
                auVar282._4_4_ = fVar203 * auVar83._4_4_;
                auVar282._8_4_ = fVar203 * auVar83._8_4_;
                auVar282._12_4_ = fVar203 * auVar83._12_4_;
                auVar103 = vfmsub213ps_fma(auVar103,auVar282,auVar106);
                auVar103 = vfnmadd213ps_fma(auVar103,auVar83,auVar282);
                *(undefined1 (*) [16])((long)pvVar12 + lVar60) = auVar103;
                lVar60 = lVar60 + 0x10;
                uVar66 = (int)uVar47 - 1;
                uVar47 = (ulong)uVar66;
              } while (uVar66 != 0);
              return 0;
            }
            return 0;
          }
          if (iVar59 == 2) {
            Mat::create(this_00,uVar65,uVar5,sVar11,uVar66,opt->blob_allocator);
            pfVar57 = (float *)this_00->data;
            if (pfVar57 == (float *)0x0) {
              return -100;
            }
            if ((long)this_00->c * this_00->cstep != 0) {
              if (0 < (int)uVar5) {
                pauVar50 = (undefined1 (*) [16])pMVar9->data;
                pfVar58 = (float *)pMVar9[1].data;
                uVar66 = 0;
                auVar103._8_4_ = 0x3f800000;
                auVar103._0_8_ = 0x3f8000003f800000;
                auVar103._12_4_ = 0x3f800000;
                do {
                  if (0 < (int)uVar65) {
                    auVar106 = vrcpps_avx(*pauVar50);
                    auVar83 = vfmsub213ps_fma(*pauVar50,auVar106,auVar103);
                    auVar106 = vfnmadd132ps_fma(auVar83,auVar106,auVar106);
                    uVar64 = uVar65;
                    do {
                      fVar203 = pfVar58[1];
                      fVar31 = pfVar58[2];
                      fVar32 = pfVar58[3];
                      *pfVar57 = auVar106._0_4_ * *pfVar58;
                      pfVar57[1] = auVar106._4_4_ * fVar203;
                      pfVar57[2] = auVar106._8_4_ * fVar31;
                      pfVar57[3] = auVar106._12_4_ * fVar32;
                      pfVar58 = pfVar58 + 4;
                      pfVar57 = pfVar57 + 4;
                      uVar64 = uVar64 - 1;
                    } while (uVar64 != 0);
                  }
                  pauVar50 = pauVar50 + 1;
                  uVar66 = uVar66 + 1;
                } while (uVar66 != uVar5);
                return 0;
              }
              return 0;
            }
            return -100;
          }
          if (iVar59 != 3) {
            return 0;
          }
          Mat::create(this_00,uVar65,uVar5,uVar6,sVar11,uVar66,opt->blob_allocator);
          if (this_00->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep == 0) {
            return -100;
          }
          if (0 < (int)local_138) {
            uVar47 = 0;
            auVar83._8_4_ = 0x3f800000;
            auVar83._0_8_ = 0x3f8000003f800000;
            auVar83._12_4_ = 0x3f800000;
            do {
              if (0 < iVar72) {
                sVar71 = pMVar9[1].cstep;
                auVar106 = *(undefined1 (*) [16])((long)pMVar9->data + uVar47 * 0x10);
                auVar103 = vrcpps_avx(auVar106);
                sVar11 = this_00->cstep;
                sVar13 = this_00->elemsize;
                auVar106 = vfmsub213ps_fma(auVar106,auVar103,auVar83);
                pvVar12 = this_00->data;
                auVar106 = vfnmadd132ps_fma(auVar106,auVar103,auVar103);
                sVar14 = pMVar9[1].elemsize;
                pvVar56 = pMVar9[1].data;
                lVar60 = 0;
                iVar45 = iVar72;
                do {
                  pfVar57 = (float *)((long)pvVar56 + lVar60 + sVar71 * sVar14 * uVar47);
                  fVar203 = pfVar57[1];
                  fVar31 = pfVar57[2];
                  fVar32 = pfVar57[3];
                  pfVar58 = (float *)((long)pvVar12 + lVar60 + sVar11 * sVar13 * uVar47);
                  *pfVar58 = auVar106._0_4_ * *pfVar57;
                  pfVar58[1] = auVar106._4_4_ * fVar203;
                  pfVar58[2] = auVar106._8_4_ * fVar31;
                  pfVar58[3] = auVar106._12_4_ * fVar32;
                  lVar60 = lVar60 + 0x10;
                  iVar45 = iVar45 + -1;
                } while (iVar45 != 0);
              }
              uVar47 = uVar47 + 1;
            } while (uVar47 != local_138);
            return 0;
          }
          return 0;
        }
        if (iVar59 == 1) {
          Mat::create(this_00,uVar65,sVar11,uVar66,opt->blob_allocator);
          pvVar12 = this_00->data;
          if (pvVar12 == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep != 0) {
            if (0 < (int)uVar65) {
              fVar203 = 1.0 / *pMVar9->data;
              pvVar56 = pMVar1->data;
              lVar60 = 0;
              do {
                pfVar57 = (float *)((long)pvVar56 + lVar60);
                fVar31 = pfVar57[1];
                fVar32 = pfVar57[2];
                fVar33 = pfVar57[3];
                pfVar58 = (float *)((long)pvVar12 + lVar60);
                *pfVar58 = fVar203 * *pfVar57;
                pfVar58[1] = fVar203 * fVar31;
                pfVar58[2] = fVar203 * fVar32;
                pfVar58[3] = fVar203 * fVar33;
                lVar60 = lVar60 + 0x10;
                uVar65 = uVar65 - 1;
              } while (uVar65 != 0);
              return 0;
            }
            return 0;
          }
          return -100;
        }
        if (iVar59 == 2) {
          Mat::create(this_00,uVar65,uVar5,sVar11,uVar66,opt->blob_allocator);
          pvVar12 = this_00->data;
          if (pvVar12 == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep != 0) {
            if (0 < iVar72) {
              fVar203 = 1.0 / *pMVar9->data;
              pvVar56 = pMVar1->data;
              lVar60 = 0;
              do {
                pfVar57 = (float *)((long)pvVar56 + lVar60);
                fVar31 = pfVar57[1];
                fVar32 = pfVar57[2];
                fVar33 = pfVar57[3];
                pfVar58 = (float *)((long)pvVar12 + lVar60);
                *pfVar58 = fVar203 * *pfVar57;
                pfVar58[1] = fVar203 * fVar31;
                pfVar58[2] = fVar203 * fVar32;
                pfVar58[3] = fVar203 * fVar33;
                lVar60 = lVar60 + 0x10;
                iVar72 = iVar72 + -1;
              } while (iVar72 != 0);
              return 0;
            }
            return 0;
          }
          return -100;
        }
        if (iVar59 != 3) {
          return 0;
        }
        Mat::create(this_00,uVar65,uVar5,uVar6,sVar11,uVar66,opt->blob_allocator);
        if (this_00->data == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep == 0) {
          return -100;
        }
        if (0 < (int)local_138) {
          fVar203 = 1.0 / *pMVar9->data;
          uVar47 = 0;
          do {
            if (0 < iVar72) {
              sVar71 = this_00->cstep;
              sVar11 = this_00->elemsize;
              pvVar12 = this_00->data;
              sVar13 = pMVar9[1].cstep;
              sVar14 = pMVar9[1].elemsize;
              pvVar56 = pMVar9[1].data;
              lVar60 = 0;
              iVar45 = iVar72;
              do {
                pfVar57 = (float *)((long)pvVar56 + lVar60 + sVar13 * sVar14 * uVar47);
                auVar210._0_4_ = fVar203 * *pfVar57;
                auVar210._4_4_ = fVar203 * pfVar57[1];
                auVar210._8_4_ = fVar203 * pfVar57[2];
                auVar210._12_4_ = fVar203 * pfVar57[3];
                *(undefined1 (*) [16])((long)pvVar12 + lVar60 + sVar71 * sVar11 * uVar47) = auVar210
                ;
                lVar60 = lVar60 + 0x10;
                iVar45 = iVar45 + -1;
              } while (iVar45 != 0);
            }
            uVar47 = uVar47 + 1;
          } while (uVar47 != local_138);
          return 0;
        }
        return 0;
      }
      uVar7 = pMVar9->h;
      local_130 = (void *)CONCAT44(local_130._4_4_,uVar7 * uVar64);
      if (iVar59 == 2) {
        if (pMVar9[1].dims == 3) {
          Mat::create(this_00,uVar65,uVar5,uVar6,sVar11,uVar66,opt->blob_allocator);
          if (this_00->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep != 0) {
            if (0 < (int)local_138) {
              uVar47 = 0;
              auVar80._8_4_ = 0x3f800000;
              auVar80._0_8_ = 0x3f8000003f800000;
              auVar80._12_4_ = 0x3f800000;
              do {
                if (0 < (int)uVar5) {
                  pfVar57 = (float *)(this_00->cstep * uVar47 * this_00->elemsize +
                                     (long)this_00->data);
                  pfVar58 = (float *)(pMVar9[1].cstep * uVar47 * pMVar9[1].elemsize +
                                     (long)pMVar9[1].data);
                  pauVar50 = (undefined1 (*) [16])
                             ((long)pMVar9->w * uVar47 * pMVar9->elemsize + (long)pMVar9->data);
                  uVar66 = 0;
                  do {
                    if (0 < (int)uVar65) {
                      auVar106 = vrcpps_avx(*pauVar50);
                      auVar103 = vfmsub213ps_fma(*pauVar50,auVar106,auVar80);
                      auVar106 = vfnmadd132ps_fma(auVar103,auVar106,auVar106);
                      uVar64 = uVar65;
                      do {
                        fVar203 = pfVar58[1];
                        fVar31 = pfVar58[2];
                        fVar32 = pfVar58[3];
                        *pfVar57 = auVar106._0_4_ * *pfVar58;
                        pfVar57[1] = auVar106._4_4_ * fVar203;
                        pfVar57[2] = auVar106._8_4_ * fVar31;
                        pfVar57[3] = auVar106._12_4_ * fVar32;
                        pfVar58 = pfVar58 + 4;
                        pfVar57 = pfVar57 + 4;
                        uVar64 = uVar64 - 1;
                      } while (uVar64 != 0);
                    }
                    pauVar50 = pauVar50 + 1;
                    uVar66 = uVar66 + 1;
                  } while (uVar66 != uVar5);
                }
                uVar47 = uVar47 + 1;
              } while (uVar47 != local_138);
              return 0;
            }
            return 0;
          }
          return -100;
        }
        local_128 = CONCAT44(uVar4,uVar66);
        Mat::create(this_00,uVar64,uVar7,sVar71,iVar45,opt->blob_allocator);
        pvVar12 = this_00->data;
        if (pvVar12 == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep == 0) {
          return -100;
        }
        if (pMVar9[1].dims != 1) {
          if (pMVar9[1].dims != 2) {
            return 0;
          }
          if (0 < (int)local_130) {
            pvVar56 = pMVar9->data;
            pvVar63 = pMVar9[1].data;
            lVar60 = 0;
            do {
              auVar106 = *(undefined1 (*) [16])((long)pvVar56 + lVar60);
              auVar83 = vrcpps_avx(auVar106);
              auVar103 = *(undefined1 (*) [16])((long)pvVar63 + lVar60);
              auVar276._0_4_ = auVar103._0_4_ * auVar83._0_4_;
              auVar276._4_4_ = auVar103._4_4_ * auVar83._4_4_;
              auVar276._8_4_ = auVar103._8_4_ * auVar83._8_4_;
              auVar276._12_4_ = auVar103._12_4_ * auVar83._12_4_;
              auVar106 = vfmsub213ps_fma(auVar106,auVar276,auVar103);
              auVar106 = vfnmadd213ps_fma(auVar106,auVar83,auVar276);
              *(undefined1 (*) [16])((long)pvVar12 + lVar60) = auVar106;
              lVar60 = lVar60 + 0x10;
              local_130._0_4_ = (int)local_130 + -1;
            } while ((int)local_130 != 0);
            return 0;
          }
          return 0;
        }
        Mat::create(this_00,uVar64,uVar7,sVar71,iVar45,opt->blob_allocator);
        pauVar50 = (undefined1 (*) [16])this_00->data;
        if (pauVar50 == (undefined1 (*) [16])0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep != 0) {
          if ((int)local_128 != 1 || pMVar9[1].w != 1) {
            if (0 < (int)uVar7) {
              pauVar55 = (undefined1 (*) [16])pMVar9->data;
              pauVar53 = (undefined1 (*) [16])pMVar9[1].data;
              uVar66 = 0;
              do {
                if (0 < (int)uVar64) {
                  auVar106 = *pauVar53;
                  uVar46 = uVar47;
                  do {
                    auVar103 = vrcpps_avx(*pauVar55);
                    auVar294._0_4_ = auVar106._0_4_ * auVar103._0_4_;
                    auVar294._4_4_ = auVar106._4_4_ * auVar103._4_4_;
                    auVar294._8_4_ = auVar106._8_4_ * auVar103._8_4_;
                    auVar294._12_4_ = auVar106._12_4_ * auVar103._12_4_;
                    auVar83 = vfmsub213ps_fma(*pauVar55,auVar294,auVar106);
                    auVar103 = vfnmadd213ps_fma(auVar83,auVar103,auVar294);
                    *pauVar50 = auVar103;
                    pauVar55 = pauVar55 + 1;
                    pauVar50 = pauVar50 + 1;
                    uVar65 = (int)uVar46 - 1;
                    uVar46 = (ulong)uVar65;
                  } while (uVar65 != 0);
                }
                pauVar53 = pauVar53 + 1;
                uVar66 = uVar66 + 1;
              } while (uVar66 != uVar7);
              return 0;
            }
            return 0;
          }
          if (0 < (int)local_130) {
            fVar203 = *pMVar1->data;
            auVar114._4_4_ = fVar203;
            auVar114._0_4_ = fVar203;
            auVar114._8_4_ = fVar203;
            auVar114._12_4_ = fVar203;
            pvVar12 = pMVar9->data;
            lVar60 = 0;
            do {
              auVar106 = *(undefined1 (*) [16])((long)pvVar12 + lVar60);
              auVar103 = vrcpps_avx(auVar106);
              auVar284._0_4_ = fVar203 * auVar103._0_4_;
              auVar284._4_4_ = fVar203 * auVar103._4_4_;
              auVar284._8_4_ = fVar203 * auVar103._8_4_;
              auVar284._12_4_ = fVar203 * auVar103._12_4_;
              auVar106 = vfmsub213ps_fma(auVar106,auVar284,auVar114);
              auVar106 = vfnmadd213ps_fma(auVar106,auVar103,auVar284);
              *(undefined1 (*) [16])((long)*pauVar50 + lVar60) = auVar106;
              lVar60 = lVar60 + 0x10;
              local_130._0_4_ = (int)local_130 + -1;
            } while ((int)local_130 != 0);
            return 0;
          }
          return 0;
        }
        return -100;
      }
      if (iVar59 != 3) {
        return 0;
      }
      uVar8 = pMVar9->c;
      uVar46 = (ulong)uVar8;
      local_110 = sVar71;
      if (pMVar9[1].dims != 3) {
        Mat::create(this_00,uVar64,uVar7,uVar8,sVar71,iVar45,opt->blob_allocator);
        if (this_00->data == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep == 0) {
          return -100;
        }
        if (pMVar9[1].dims == 1) {
          if (uVar66 != 1 || pMVar9[1].w != 1) {
            if (0 < (int)uVar8) {
              uVar47 = 0;
              do {
                if (0 < (int)local_130) {
                  sVar71 = this_00->cstep;
                  sVar11 = this_00->elemsize;
                  auVar106 = *(undefined1 (*) [16])((long)pMVar1->data + uVar47 * 0x10);
                  pvVar12 = this_00->data;
                  sVar13 = pMVar9->cstep;
                  sVar14 = pMVar9->elemsize;
                  pvVar56 = pMVar9->data;
                  lVar60 = 0;
                  iVar45 = (int)local_130;
                  do {
                    auVar103 = *(undefined1 (*) [16])
                                ((long)pvVar56 + lVar60 + sVar13 * sVar14 * uVar47);
                    auVar83 = vrcpps_avx(auVar103);
                    auVar289._0_4_ = auVar106._0_4_ * auVar83._0_4_;
                    auVar289._4_4_ = auVar106._4_4_ * auVar83._4_4_;
                    auVar289._8_4_ = auVar106._8_4_ * auVar83._8_4_;
                    auVar289._12_4_ = auVar106._12_4_ * auVar83._12_4_;
                    auVar103 = vfmsub213ps_fma(auVar103,auVar289,auVar106);
                    auVar103 = vfnmadd213ps_fma(auVar103,auVar83,auVar289);
                    *(undefined1 (*) [16])((long)pvVar12 + lVar60 + sVar71 * sVar11 * uVar47) =
                         auVar103;
                    lVar60 = lVar60 + 0x10;
                    iVar45 = iVar45 + -1;
                  } while (iVar45 != 0);
                }
                uVar47 = uVar47 + 1;
              } while (uVar47 != uVar46);
              return 0;
            }
            return 0;
          }
          if (0 < (int)uVar8) {
            fVar203 = *pMVar1->data;
            auVar116._4_4_ = fVar203;
            auVar116._0_4_ = fVar203;
            auVar116._8_4_ = fVar203;
            auVar116._12_4_ = fVar203;
            uVar47 = 0;
            do {
              if (0 < (int)local_130) {
                sVar71 = this_00->cstep;
                sVar11 = this_00->elemsize;
                pvVar12 = this_00->data;
                sVar13 = pMVar9->cstep;
                sVar14 = pMVar9->elemsize;
                pvVar56 = pMVar9->data;
                lVar60 = 0;
                iVar45 = (int)local_130;
                do {
                  auVar106 = *(undefined1 (*) [16])
                              ((long)pvVar56 + lVar60 + sVar13 * sVar14 * uVar47);
                  auVar103 = vrcpps_avx(auVar106);
                  auVar285._0_4_ = fVar203 * auVar103._0_4_;
                  auVar285._4_4_ = fVar203 * auVar103._4_4_;
                  auVar285._8_4_ = fVar203 * auVar103._8_4_;
                  auVar285._12_4_ = fVar203 * auVar103._12_4_;
                  auVar106 = vfmsub213ps_fma(auVar106,auVar285,auVar116);
                  auVar106 = vfnmadd213ps_fma(auVar106,auVar103,auVar285);
                  *(undefined1 (*) [16])((long)pvVar12 + lVar60 + sVar71 * sVar11 * uVar47) =
                       auVar106;
                  lVar60 = lVar60 + 0x10;
                  iVar45 = iVar45 + -1;
                } while (iVar45 != 0);
              }
              uVar47 = uVar47 + 1;
            } while (uVar47 != uVar46);
            return 0;
          }
          return 0;
        }
        if (pMVar9[1].dims != 2) {
          return 0;
        }
        if (0 < (int)uVar8) {
          uVar48 = 0;
          do {
            if (0 < (int)uVar7) {
              pauVar50 = (undefined1 (*) [16])
                         (this_00->cstep * uVar48 * this_00->elemsize + (long)this_00->data);
              pauVar55 = (undefined1 (*) [16])
                         ((long)pMVar9[1].w * uVar48 * pMVar9[1].elemsize + (long)pMVar9[1].data);
              pauVar53 = (undefined1 (*) [16])
                         (pMVar9->cstep * uVar48 * pMVar9->elemsize + (long)pMVar9->data);
              uVar66 = 0;
              do {
                if (0 < (int)uVar64) {
                  auVar106 = *pauVar55;
                  uVar62 = uVar47;
                  do {
                    auVar103 = vrcpps_avx(*pauVar53);
                    auVar277._0_4_ = auVar106._0_4_ * auVar103._0_4_;
                    auVar277._4_4_ = auVar106._4_4_ * auVar103._4_4_;
                    auVar277._8_4_ = auVar106._8_4_ * auVar103._8_4_;
                    auVar277._12_4_ = auVar106._12_4_ * auVar103._12_4_;
                    auVar83 = vfmsub213ps_fma(*pauVar53,auVar277,auVar106);
                    auVar103 = vfnmadd213ps_fma(auVar83,auVar103,auVar277);
                    *pauVar50 = auVar103;
                    pauVar53 = pauVar53 + 1;
                    pauVar50 = pauVar50 + 1;
                    uVar65 = (int)uVar62 - 1;
                    uVar62 = (ulong)uVar65;
                  } while (uVar65 != 0);
                }
                pauVar55 = pauVar55 + 1;
                uVar66 = uVar66 + 1;
              } while (uVar66 != uVar7);
            }
            uVar48 = uVar48 + 1;
          } while (uVar48 != uVar46);
          return 0;
        }
        return 0;
      }
      if (uVar8 == uVar6 && ((uVar65 ^ 1) == 0 && (uVar5 ^ 1) == 0)) {
        Mat::create(this_00,uVar64,uVar7,uVar8,sVar71,iVar45,opt->blob_allocator);
        if (this_00->data == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep != 0) {
          if (0 < (int)uVar8) {
            uVar47 = 0;
            do {
              if (0 < (int)local_130) {
                sVar71 = pMVar9->cstep;
                sVar11 = pMVar9->elemsize;
                auVar106 = *(undefined1 (*) [16])
                            ((long)pMVar9[1].data + pMVar9[1].cstep * uVar47 * pMVar9[1].elemsize);
                pvVar12 = pMVar9->data;
                sVar13 = this_00->cstep;
                sVar14 = this_00->elemsize;
                pvVar56 = this_00->data;
                lVar60 = 0;
                iVar45 = (int)local_130;
                do {
                  auVar103 = *(undefined1 (*) [16])
                              ((long)pvVar12 + lVar60 + sVar71 * sVar11 * uVar47);
                  auVar83 = vrcpps_avx(auVar103);
                  auVar271._0_4_ = auVar106._0_4_ * auVar83._0_4_;
                  auVar271._4_4_ = auVar106._4_4_ * auVar83._4_4_;
                  auVar271._8_4_ = auVar106._8_4_ * auVar83._8_4_;
                  auVar271._12_4_ = auVar106._12_4_ * auVar83._12_4_;
                  auVar103 = vfmsub213ps_fma(auVar103,auVar271,auVar106);
                  auVar103 = vfnmadd213ps_fma(auVar103,auVar83,auVar271);
                  *(undefined1 (*) [16])((long)pvVar56 + lVar60 + sVar13 * sVar14 * uVar47) =
                       auVar103;
                  lVar60 = lVar60 + 0x10;
                  iVar45 = iVar45 + -1;
                } while (iVar45 != 0);
              }
              uVar47 = uVar47 + 1;
            } while (uVar47 != uVar46);
            return 0;
          }
          return 0;
        }
        return -100;
      }
      if (uVar65 == uVar64) {
        if (uVar66 == 1 && (uVar6 == 1 && uVar5 == uVar7)) {
          Mat::create(this_00,uVar64,uVar7,uVar8,sVar71,iVar45,opt->blob_allocator);
          if (this_00->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep != 0) {
            if (0 < (int)uVar8) {
              uVar47 = 0;
              do {
                if (0 < (int)local_130) {
                  sVar71 = pMVar9->cstep;
                  sVar11 = pMVar9->elemsize;
                  sVar13 = this_00->cstep;
                  pvVar12 = pMVar9->data;
                  pvVar56 = pMVar9[1].data;
                  sVar14 = this_00->elemsize;
                  pvVar63 = this_00->data;
                  lVar60 = 0;
                  iVar45 = (int)local_130;
                  do {
                    auVar106 = *(undefined1 (*) [16])
                                ((long)pvVar12 + lVar60 * 4 + sVar71 * sVar11 * uVar47);
                    auVar103 = vrcpps_avx(auVar106);
                    fVar203 = *(float *)((long)pvVar56 + lVar60);
                    auVar268._4_4_ = fVar203;
                    auVar268._0_4_ = fVar203;
                    auVar268._8_4_ = fVar203;
                    auVar268._12_4_ = fVar203;
                    auVar278._0_4_ = fVar203 * auVar103._0_4_;
                    auVar278._4_4_ = fVar203 * auVar103._4_4_;
                    auVar278._8_4_ = fVar203 * auVar103._8_4_;
                    auVar278._12_4_ = fVar203 * auVar103._12_4_;
                    auVar106 = vfmsub213ps_fma(auVar106,auVar278,auVar268);
                    auVar106 = vfnmadd213ps_fma(auVar106,auVar103,auVar278);
                    *(undefined1 (*) [16])((long)pvVar63 + lVar60 * 4 + sVar13 * sVar14 * uVar47) =
                         auVar106;
                    lVar60 = lVar60 + 4;
                    iVar45 = iVar45 + -1;
                  } while (iVar45 != 0);
                }
                uVar47 = uVar47 + 1;
              } while (uVar47 != uVar46);
              return 0;
            }
            return 0;
          }
          return -100;
        }
        local_104 = CONCAT31(local_104._1_3_,uVar7 == 1);
        if ((uVar64 != 1 || uVar7 != 1) || uVar6 != uVar8) {
          if (((iVar45 == 1) && (uVar5 == uVar7)) && (uVar8 == 1)) {
            local_128 = uVar46;
            Mat::create(this_00,uVar64,uVar7,uVar6,sVar11,uVar66,opt->blob_allocator);
            if (this_00->data == (void *)0x0) {
              return -100;
            }
            if ((long)this_00->c * this_00->cstep != 0) {
              if (0 < (int)local_138) {
                uVar47 = 0;
                do {
                  if (0 < iVar72) {
                    sVar71 = pMVar9[1].cstep;
                    sVar11 = pMVar9[1].elemsize;
                    sVar13 = this_00->cstep;
                    pvVar12 = pMVar9[1].data;
                    pvVar56 = pMVar9->data;
                    sVar14 = this_00->elemsize;
                    pvVar63 = this_00->data;
                    lVar60 = 0;
                    iVar45 = iVar72;
                    do {
                      fVar203 = 1.0 / *(float *)((long)pvVar56 + lVar60);
                      pfVar57 = (float *)((long)pvVar12 + lVar60 * 4 + sVar71 * sVar11 * uVar47);
                      auVar228._0_4_ = fVar203 * *pfVar57;
                      auVar228._4_4_ = fVar203 * pfVar57[1];
                      auVar228._8_4_ = fVar203 * pfVar57[2];
                      auVar228._12_4_ = fVar203 * pfVar57[3];
                      *(undefined1 (*) [16])((long)pvVar63 + lVar60 * 4 + sVar13 * sVar14 * uVar47)
                           = auVar228;
                      lVar60 = lVar60 + 4;
                      iVar45 = iVar45 + -1;
                    } while (iVar45 != 0);
                  }
                  uVar47 = uVar47 + 1;
                } while (uVar47 != local_138);
                return 0;
              }
              return 0;
            }
            return -100;
          }
LAB_0024969a:
          if ((((uVar65 ^ 1) == 0 && uVar5 == uVar7) && uVar8 == uVar6) && uVar64 != 1) {
            local_128 = uVar46;
            Mat::create(this_00,uVar64,uVar7,uVar8,sVar71,iVar45,opt->blob_allocator);
            if (this_00->data == (void *)0x0) {
              return -100;
            }
            if ((long)this_00->c * this_00->cstep != 0) {
              if (0 < (int)uVar8) {
                uVar48 = 0;
                do {
                  if (0 < (int)uVar7) {
                    sVar71 = pMVar9[1].cstep;
                    sVar11 = pMVar9[1].elemsize;
                    pvVar12 = pMVar9[1].data;
                    pauVar50 = (undefined1 (*) [16])
                               (this_00->cstep * uVar48 * this_00->elemsize + (long)this_00->data);
                    pauVar55 = (undefined1 (*) [16])
                               (pMVar9->cstep * uVar48 * pMVar9->elemsize + (long)pMVar9->data);
                    uVar62 = 0;
                    do {
                      if (0 < (int)uVar64) {
                        auVar106 = *(undefined1 (*) [16])
                                    ((long)pvVar12 + uVar62 * 0x10 + sVar71 * uVar48 * sVar11);
                        uVar67 = uVar47;
                        do {
                          auVar103 = vrcpps_avx(*pauVar55);
                          auVar283._0_4_ = auVar106._0_4_ * auVar103._0_4_;
                          auVar283._4_4_ = auVar106._4_4_ * auVar103._4_4_;
                          auVar283._8_4_ = auVar106._8_4_ * auVar103._8_4_;
                          auVar283._12_4_ = auVar106._12_4_ * auVar103._12_4_;
                          auVar83 = vfmsub213ps_fma(*pauVar55,auVar283,auVar106);
                          auVar103 = vfnmadd213ps_fma(auVar83,auVar103,auVar283);
                          *pauVar50 = auVar103;
                          pauVar55 = pauVar55 + 1;
                          pauVar50 = pauVar50 + 1;
                          uVar66 = (int)uVar67 - 1;
                          uVar67 = (ulong)uVar66;
                        } while (uVar66 != 0);
                      }
                      uVar62 = uVar62 + 1;
                    } while (uVar62 != uVar7);
                  }
                  uVar48 = uVar48 + 1;
                } while (uVar48 != uVar46);
                return 0;
              }
              return 0;
            }
            return -100;
          }
          if (((uVar65 == uVar64 && (uVar5 ^ 1) == 0) && uVar8 == uVar6) && uVar7 != 1) {
            local_128 = uVar46;
            Mat::create(this_00,uVar64,uVar7,uVar8,sVar71,iVar45,opt->blob_allocator);
            if (this_00->data == (void *)0x0) {
              return -100;
            }
            if ((long)this_00->c * this_00->cstep != 0) {
              if (0 < (int)uVar8) {
                uVar48 = 0;
                do {
                  if (0 < (int)uVar7) {
                    sVar71 = pMVar9[1].elemsize;
                    pvVar56 = (void *)(this_00->cstep * uVar48 * this_00->elemsize +
                                      (long)this_00->data);
                    pvVar63 = (void *)(pMVar9->cstep * uVar48 * pMVar9->elemsize +
                                      (long)pMVar9->data);
                    sVar11 = pMVar9[1].cstep;
                    pvVar12 = pMVar9[1].data;
                    uVar66 = 0;
                    do {
                      if (0 < (int)uVar64) {
                        lVar60 = 0;
                        do {
                          auVar103 = vrcpps_avx(*(undefined1 (*) [16])((long)pvVar63 + lVar60));
                          auVar106 = *(undefined1 (*) [16])
                                      ((long)pvVar12 + lVar60 + sVar71 * sVar11 * uVar48);
                          auVar288._0_4_ = auVar106._0_4_ * auVar103._0_4_;
                          auVar288._4_4_ = auVar106._4_4_ * auVar103._4_4_;
                          auVar288._8_4_ = auVar106._8_4_ * auVar103._8_4_;
                          auVar288._12_4_ = auVar106._12_4_ * auVar103._12_4_;
                          auVar106 = vfmsub213ps_fma(*(undefined1 (*) [16])((long)pvVar63 + lVar60),
                                                     auVar288,auVar106);
                          auVar106 = vfnmadd213ps_fma(auVar106,auVar103,auVar288);
                          *(undefined1 (*) [16])((long)pvVar56 + lVar60) = auVar106;
                          lVar60 = lVar60 + 0x10;
                        } while (uVar47 << 4 != lVar60);
                        pvVar56 = (void *)((long)pvVar56 + lVar60);
                        pvVar63 = (void *)((long)pvVar63 + lVar60);
                      }
                      uVar66 = uVar66 + 1;
                    } while (uVar66 != uVar7);
                  }
                  uVar48 = uVar48 + 1;
                } while (uVar48 != uVar46);
                return 0;
              }
              return 0;
            }
            return -100;
          }
          if ((uVar6 == uVar8 && uVar5 == uVar7) && (uVar65 != 1 && uVar64 == 1)) {
            local_128 = uVar46;
            Mat::create(this_00,uVar65,uVar7,uVar8,sVar11,uVar66,opt->blob_allocator);
            if (this_00->data == (void *)0x0) {
              return -100;
            }
            if ((long)this_00->c * this_00->cstep != 0) {
              if (0 < (int)uVar8) {
                uVar47 = 0;
                auVar128._8_4_ = 0x3f800000;
                auVar128._0_8_ = 0x3f8000003f800000;
                auVar128._12_4_ = 0x3f800000;
                do {
                  if (0 < (int)uVar7) {
                    sVar71 = pMVar9->cstep;
                    sVar11 = pMVar9->elemsize;
                    pvVar12 = pMVar9->data;
                    pfVar57 = (float *)(this_00->cstep * uVar47 * this_00->elemsize +
                                       (long)this_00->data);
                    pfVar58 = (float *)(pMVar9[1].cstep * uVar47 * pMVar9[1].elemsize +
                                       (long)pMVar9[1].data);
                    uVar48 = 0;
                    do {
                      if (0 < (int)uVar65) {
                        auVar106 = *(undefined1 (*) [16])
                                    ((long)pvVar12 + uVar48 * 0x10 + sVar71 * uVar47 * sVar11);
                        auVar103 = vrcpps_avx(auVar106);
                        auVar106 = vfmsub213ps_fma(auVar106,auVar103,auVar128);
                        auVar106 = vfnmadd132ps_fma(auVar106,auVar103,auVar103);
                        uVar66 = uVar65;
                        do {
                          fVar203 = pfVar58[1];
                          fVar31 = pfVar58[2];
                          fVar32 = pfVar58[3];
                          *pfVar57 = auVar106._0_4_ * *pfVar58;
                          pfVar57[1] = auVar106._4_4_ * fVar203;
                          pfVar57[2] = auVar106._8_4_ * fVar31;
                          pfVar57[3] = auVar106._12_4_ * fVar32;
                          pfVar58 = pfVar58 + 4;
                          pfVar57 = pfVar57 + 4;
                          uVar66 = uVar66 - 1;
                        } while (uVar66 != 0);
                      }
                      uVar48 = uVar48 + 1;
                    } while (uVar48 != uVar7);
                  }
                  uVar47 = uVar47 + 1;
                } while (uVar47 != uVar46);
                return 0;
              }
              return 0;
            }
            return -100;
          }
          if (((byte)local_104 & uVar6 == uVar8 & (uVar5 != 1 && uVar65 == uVar64)) == 1) {
            local_128 = uVar46;
            Mat::create(this_00,uVar64,uVar5,uVar8,sVar11,uVar66,opt->blob_allocator);
            if (this_00->data == (void *)0x0) {
              return -100;
            }
            if ((long)local_120->c * local_120->cstep != 0) {
              if (0 < (int)local_128) {
                local_158 = (__m256 *)0x0;
                do {
                  pMVar1 = local_a0;
                  afVar185 = _local_100;
                  bVar74 = local_a0->dims == 3;
                  local_c8 = 1;
                  if (!bVar74) {
                    local_c8 = local_a0->d;
                  }
                  local_d4 = local_a0->w;
                  local_d0 = local_a0->h;
                  sVar71 = local_a0->cstep;
                  pvVar12 = local_a0->data;
                  local_130 = (void *)local_a0->elemsize;
                  local_e0 = local_a0->allocator;
                  _fStack_f8 = 0;
                  local_100 = (undefined1  [8])
                              (sVar71 * (long)local_158 * (long)local_130 + (long)pvVar12);
                  uStack_f0 = local_130;
                  fStack_e4 = afVar185[7];
                  fStack_e8 = (float)local_a0->elempack;
                  local_d8 = bVar74 ^ 3;
                  local_c0 = (long)local_d0 * (long)local_d4;
                  local_cc = 1;
                  Mat::~Mat((Mat *)local_100);
                  bVar74 = pMVar1[1].dims == 3;
                  local_c8 = 1;
                  if (!bVar74) {
                    local_c8 = pMVar1[1].d;
                  }
                  local_d4 = pMVar1[1].w;
                  local_d0 = pMVar1[1].h;
                  pvVar56 = (void *)(pMVar1[1].cstep * (long)local_158 * pMVar1[1].elemsize +
                                    (long)pMVar1[1].data);
                  local_d8 = bVar74 ^ 3;
                  local_e0 = pMVar1[1].allocator;
                  _fStack_f8 = 0;
                  local_100 = (undefined1  [8])pvVar56;
                  uStack_f0 = pMVar1[1].elemsize;
                  fStack_e8 = (float)pMVar1[1].elempack;
                  local_c0 = (long)local_d0 * (long)local_d4;
                  local_cc = 1;
                  Mat::~Mat((Mat *)local_100);
                  bVar74 = local_120->dims == 3;
                  local_d4 = local_120->w;
                  local_d0 = local_120->h;
                  local_c8 = 1;
                  if (!bVar74) {
                    local_c8 = local_120->d;
                  }
                  sVar11 = local_120->elemsize;
                  pvVar63 = (void *)(local_120->cstep * (long)local_158 * sVar11 +
                                    (long)local_120->data);
                  local_d8 = bVar74 ^ 3;
                  local_e0 = local_120->allocator;
                  fStack_f8 = 0.0;
                  fStack_f4 = 0.0;
                  local_100 = (undefined1  [8])pvVar63;
                  uStack_f0._0_4_ = (float)(int)sVar11;
                  uStack_f0._4_4_ = (float)(int)(sVar11 >> 0x20);
                  fStack_e8 = (float)local_120->elempack;
                  local_c0 = (long)local_d0 * (long)local_d4;
                  local_cc = 1;
                  Mat::~Mat((Mat *)local_100);
                  if (0 < (int)uVar5) {
                    uVar66 = 0;
                    do {
                      if (0 < (int)uVar64) {
                        lVar60 = 0;
                        do {
                          auVar106 = *(undefined1 (*) [16])
                                      ((long)pvVar12 +
                                      lVar60 + sVar71 * (long)local_130 * (long)local_158);
                          auVar83 = vrcpps_avx(auVar106);
                          auVar103 = *(undefined1 (*) [16])((long)pvVar56 + lVar60);
                          auVar296._0_4_ = auVar103._0_4_ * auVar83._0_4_;
                          auVar296._4_4_ = auVar103._4_4_ * auVar83._4_4_;
                          auVar296._8_4_ = auVar103._8_4_ * auVar83._8_4_;
                          auVar296._12_4_ = auVar103._12_4_ * auVar83._12_4_;
                          auVar106 = vfmsub213ps_fma(auVar106,auVar296,auVar103);
                          auVar106 = vfnmadd213ps_fma(auVar106,auVar83,auVar296);
                          *(undefined1 (*) [16])((long)pvVar63 + lVar60) = auVar106;
                          lVar60 = lVar60 + 0x10;
                        } while (uVar47 << 4 != lVar60);
                        pvVar63 = (void *)((long)pvVar63 + lVar60);
                        pvVar56 = (void *)((long)pvVar56 + lVar60);
                      }
                      uVar66 = uVar66 + 1;
                    } while (uVar66 != uVar5);
                  }
                  local_158 = (__m256 *)((long)local_158 + 1);
                } while (local_158 != (__m256 *)local_128);
                return 0;
              }
              return 0;
            }
            return -100;
          }
          local_128 = uVar46;
          Mat::create(this_00,uVar64,uVar7,uVar8,sVar71,iVar45,opt->blob_allocator);
          if (this_00->data == (void *)0x0) {
            return -100;
          }
          if ((long)local_120->c * local_120->cstep != 0) {
            if (0 < (int)local_128) {
              local_158 = (__m256 *)0x0;
              do {
                pMVar1 = local_a0;
                afVar185 = _local_100;
                bVar74 = local_a0->dims == 3;
                local_c8 = 1;
                if (!bVar74) {
                  local_c8 = local_a0->d;
                }
                local_d4 = local_a0->w;
                local_d0 = local_a0->h;
                sVar71 = local_a0->cstep;
                pvVar12 = local_a0->data;
                sVar11 = local_a0->elemsize;
                local_e0 = local_a0->allocator;
                _fStack_f8 = 0;
                local_100 = (undefined1  [8])(sVar71 * (long)local_158 * sVar11 + (long)pvVar12);
                uStack_f0 = sVar11;
                fStack_e4 = afVar185[7];
                fStack_e8 = (float)local_a0->elempack;
                local_d8 = bVar74 ^ 3;
                local_c0 = (long)local_d0 * (long)local_d4;
                local_cc = 1;
                Mat::~Mat((Mat *)local_100);
                bVar74 = pMVar1[1].dims == 3;
                local_c8 = 1;
                if (!bVar74) {
                  local_c8 = pMVar1[1].d;
                }
                local_d4 = pMVar1[1].w;
                local_d0 = pMVar1[1].h;
                local_138 = pMVar1[1].cstep;
                pvVar56 = pMVar1[1].data;
                local_110 = pMVar1[1].elemsize;
                local_e0 = pMVar1[1].allocator;
                _fStack_f8 = 0;
                local_100 = (undefined1  [8])
                            (local_138 * (long)local_158 * local_110 + (long)pvVar56);
                uStack_f0 = local_110;
                fStack_e8 = (float)pMVar1[1].elempack;
                local_d8 = bVar74 ^ 3;
                local_c0 = (long)local_d0 * (long)local_d4;
                local_cc = 1;
                Mat::~Mat((Mat *)local_100);
                bVar74 = local_120->dims == 3;
                local_d4 = local_120->w;
                local_d0 = local_120->h;
                local_c8 = 1;
                if (!bVar74) {
                  local_c8 = local_120->d;
                }
                sVar13 = local_120->cstep;
                pvVar63 = local_120->data;
                sVar14 = local_120->elemsize;
                local_e0 = local_120->allocator;
                fStack_f8 = 0.0;
                fStack_f4 = 0.0;
                local_100 = (undefined1  [8])(sVar13 * (long)local_158 * sVar14 + (long)pvVar63);
                uStack_f0._0_4_ = (float)(int)sVar14;
                uStack_f0._4_4_ = (float)(int)(sVar14 >> 0x20);
                fStack_e8 = (float)local_120->elempack;
                local_d8 = bVar74 ^ 3;
                local_c0 = (long)local_d0 * (long)local_d4;
                local_cc = 1;
                Mat::~Mat((Mat *)local_100);
                if (0 < (int)local_130) {
                  lVar60 = 0;
                  iVar45 = (int)local_130;
                  do {
                    auVar106 = *(undefined1 (*) [16])
                                ((long)pvVar12 + lVar60 + sVar71 * sVar11 * (long)local_158);
                    auVar83 = vrcpps_avx(auVar106);
                    auVar103 = *(undefined1 (*) [16])
                                ((long)pvVar56 + lVar60 + local_138 * local_110 * (long)local_158);
                    auVar298._0_4_ = auVar103._0_4_ * auVar83._0_4_;
                    auVar298._4_4_ = auVar103._4_4_ * auVar83._4_4_;
                    auVar298._8_4_ = auVar103._8_4_ * auVar83._8_4_;
                    auVar298._12_4_ = auVar103._12_4_ * auVar83._12_4_;
                    auVar106 = vfmsub213ps_fma(auVar106,auVar298,auVar103);
                    auVar106 = vfnmadd213ps_fma(auVar106,auVar83,auVar298);
                    *(undefined1 (*) [16])
                     ((long)pvVar63 + lVar60 + sVar13 * sVar14 * (long)local_158) = auVar106;
                    lVar60 = lVar60 + 0x10;
                    iVar45 = iVar45 + -1;
                  } while (iVar45 != 0);
                }
                local_158 = (__m256 *)((long)local_158 + 1);
              } while (local_158 != (__m256 *)local_128);
              return 0;
            }
            return 0;
          }
          return -100;
        }
      }
      else {
        local_104 = CONCAT31(local_104._1_3_,uVar7 == 1);
        local_128 = uVar46;
        if ((uVar64 != 1 || uVar7 != 1) || uVar6 != uVar8) goto LAB_0024969a;
      }
      Mat::create(this_00,uVar65,uVar5,uVar6,sVar11,uVar66,opt->blob_allocator);
      if (this_00->data == (void *)0x0) {
        return -100;
      }
      if ((long)this_00->c * this_00->cstep != 0) {
        if (0 < (int)local_138) {
          uVar47 = 0;
          auVar117._8_4_ = 0x3f800000;
          auVar117._0_8_ = 0x3f8000003f800000;
          auVar117._12_4_ = 0x3f800000;
          do {
            if (0 < iVar72) {
              sVar71 = pMVar9[1].cstep;
              auVar106 = *(undefined1 (*) [16])
                          ((long)pMVar9->data + pMVar9->cstep * uVar47 * pMVar9->elemsize);
              auVar103 = vrcpps_avx(auVar106);
              sVar11 = this_00->cstep;
              sVar13 = this_00->elemsize;
              auVar106 = vfmsub213ps_fma(auVar106,auVar103,auVar117);
              pvVar12 = this_00->data;
              auVar106 = vfnmadd132ps_fma(auVar106,auVar103,auVar103);
              sVar14 = pMVar9[1].elemsize;
              pvVar56 = pMVar9[1].data;
              lVar60 = 0;
              iVar45 = iVar72;
              do {
                pfVar57 = (float *)((long)pvVar56 + lVar60 + sVar71 * sVar14 * uVar47);
                fVar203 = pfVar57[1];
                fVar31 = pfVar57[2];
                fVar32 = pfVar57[3];
                pfVar58 = (float *)((long)pvVar12 + lVar60 + sVar11 * sVar13 * uVar47);
                *pfVar58 = auVar106._0_4_ * *pfVar57;
                pfVar58[1] = auVar106._4_4_ * fVar203;
                pfVar58[2] = auVar106._8_4_ * fVar31;
                pfVar58[3] = auVar106._12_4_ * fVar32;
                lVar60 = lVar60 + 0x10;
                iVar45 = iVar45 + -1;
              } while (iVar45 != 0);
            }
            uVar47 = uVar47 + 1;
          } while (uVar47 != local_138);
          return 0;
        }
        return 0;
      }
      return -100;
    }
  }
  iVar45 = BinaryOp::forward((BinaryOp *)((long)&this->_vptr_BinaryOp_x86_avx2 + (long)p_Var10),
                             bottom_blobs,top_blobs,opt);
  return iVar45;
}

Assistant:

int BinaryOp_x86_avx2::forward(const std::vector<Mat>& bottom_blobs, std::vector<Mat>& top_blobs, const Option& opt) const
{
#if __SSE2__
    const Mat& bottom_blob = bottom_blobs[0];
    const Mat& bottom_blob1 = bottom_blobs[1];
    Mat& top_blob = top_blobs[0];

    int elempack = bottom_blob.elempack;
    int elempack1 = bottom_blob1.elempack;

#if __AVX__
    if (elempack == 8 || elempack1 == 8)
    {
        if (op_type == Operation_ADD)
            return binary_op_pack8<binary_op_add_pack8>(bottom_blob, bottom_blob1, top_blob, opt);

        if (op_type == Operation_SUB)
            return binary_op_pack8<binary_op_sub_pack8>(bottom_blob, bottom_blob1, top_blob, opt);

        if (op_type == Operation_MUL)
            return binary_op_pack8<binary_op_mul_pack8>(bottom_blob, bottom_blob1, top_blob, opt);

        if (op_type == Operation_DIV)
            return binary_op_pack8<binary_op_div_pack8>(bottom_blob, bottom_blob1, top_blob, opt);

        if (op_type == Operation_MAX)
            return binary_op_pack8<binary_op_max_pack8>(bottom_blob, bottom_blob1, top_blob, opt);

        if (op_type == Operation_MIN)
            return binary_op_pack8<binary_op_min_pack8>(bottom_blob, bottom_blob1, top_blob, opt);

        if (op_type == Operation_POW)
            return binary_op_pack8<binary_op_pow_pack8>(bottom_blob, bottom_blob1, top_blob, opt);

        if (op_type == Operation_RSUB)
            return binary_op_pack8<binary_op_rsub_pack8>(bottom_blob, bottom_blob1, top_blob, opt);

        if (op_type == Operation_RDIV)
            return binary_op_pack8<binary_op_rdiv_pack8>(bottom_blob, bottom_blob1, top_blob, opt);
    }
#endif // __AVX__

    if (elempack == 4 || elempack1 == 4)
    {
        if (op_type == Operation_ADD)
            return binary_op_pack4<binary_op_add_pack4>(bottom_blob, bottom_blob1, top_blob, opt);

        if (op_type == Operation_SUB)
            return binary_op_pack4<binary_op_sub_pack4>(bottom_blob, bottom_blob1, top_blob, opt);

        if (op_type == Operation_MUL)
            return binary_op_pack4<binary_op_mul_pack4>(bottom_blob, bottom_blob1, top_blob, opt);

        if (op_type == Operation_DIV)
            return binary_op_pack4<binary_op_div_pack4>(bottom_blob, bottom_blob1, top_blob, opt);

        if (op_type == Operation_MAX)
            return binary_op_pack4<binary_op_max_pack4>(bottom_blob, bottom_blob1, top_blob, opt);

        if (op_type == Operation_MIN)
            return binary_op_pack4<binary_op_min_pack4>(bottom_blob, bottom_blob1, top_blob, opt);

        if (op_type == Operation_POW)
            return binary_op_pack4<binary_op_pow_pack4>(bottom_blob, bottom_blob1, top_blob, opt);

        if (op_type == Operation_RSUB)
            return binary_op_pack4<binary_op_rsub_pack4>(bottom_blob, bottom_blob1, top_blob, opt);

        if (op_type == Operation_RDIV)
            return binary_op_pack4<binary_op_rdiv_pack4>(bottom_blob, bottom_blob1, top_blob, opt);
    }
#endif // __SSE2__

    return BinaryOp::forward(bottom_blobs, top_blobs, opt);
}